

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86_avx512::forward
          (Deconvolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint *puVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  void *pvVar11;
  undefined4 *puVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  size_t sVar17;
  Layer *pLVar18;
  byte bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  byte bVar27;
  byte bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  ulong uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined4 uVar130;
  undefined4 uVar131;
  undefined8 uVar132;
  undefined8 uVar133;
  undefined8 uVar134;
  undefined8 uVar135;
  undefined8 uVar136;
  undefined8 uVar137;
  float afVar138 [16];
  float afVar139 [16];
  float afVar140 [16];
  float afVar141 [16];
  float afVar142 [16];
  float afVar143 [16];
  float afVar144 [16];
  float afVar145 [16];
  float afVar146 [16];
  float afVar147 [16];
  float afVar148 [16];
  float afVar149 [16];
  float afVar150 [16];
  float afVar151 [16];
  float afVar152 [16];
  float afVar153 [16];
  float afVar154 [16];
  Mat *pMVar155;
  int iVar156;
  int iVar157;
  int iVar158;
  int iVar159;
  int iVar160;
  long lVar161;
  undefined1 (*pauVar162) [16];
  undefined8 *puVar163;
  undefined1 (*pauVar164) [32];
  uint uVar165;
  int iVar166;
  uint uVar167;
  ulong uVar168;
  ulong uVar169;
  int iVar170;
  int iVar171;
  undefined8 *__s;
  float *pfVar172;
  uint uVar173;
  ulong uVar174;
  undefined1 (*pauVar175) [64];
  void *pvVar176;
  uint uVar177;
  ulong uVar178;
  uint uVar179;
  int iVar180;
  uint uVar181;
  int iVar182;
  int y_5;
  ulong uVar183;
  void *pvVar184;
  void *pvVar185;
  int y;
  long lVar186;
  undefined1 (*pauVar187) [16];
  undefined1 (*pauVar188) [64];
  undefined1 (*pauVar189) [32];
  int y_6;
  int y_2;
  int iVar190;
  int iVar191;
  int iVar192;
  float *pfVar193;
  bool bVar194;
  ushort uVar195;
  ulong uVar196;
  ulong uVar197;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  undefined1 auVar316 [64];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar317 [64];
  undefined1 auVar318 [64];
  undefined1 auVar319 [64];
  undefined1 auVar320 [64];
  undefined1 auVar321 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar322 [64];
  undefined1 auVar323 [64];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar327 [64];
  undefined1 auVar328 [64];
  undefined1 auVar329 [64];
  undefined1 auVar330 [64];
  undefined1 auVar331 [64];
  undefined1 auVar332 [64];
  undefined1 auVar333 [64];
  undefined1 auVar334 [64];
  undefined1 auVar335 [64];
  undefined1 auVar336 [64];
  undefined1 auVar337 [64];
  undefined1 auVar338 [64];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  undefined1 auVar342 [64];
  undefined1 auVar343 [64];
  undefined1 auVar344 [64];
  undefined1 auVar345 [64];
  undefined1 auVar346 [64];
  undefined1 auVar347 [64];
  undefined1 auVar348 [64];
  undefined1 auVar349 [64];
  undefined1 auVar350 [64];
  undefined1 auVar351 [64];
  undefined1 auVar352 [64];
  undefined1 auVar353 [64];
  undefined1 auVar354 [64];
  undefined1 auVar355 [64];
  undefined1 auVar356 [64];
  undefined1 auVar357 [64];
  int iVar358;
  int iVar359;
  int iVar360;
  int iVar361;
  int iVar362;
  int iVar363;
  int iVar364;
  int iVar365;
  int iVar366;
  float fVar367;
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  float fVar384;
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [64];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  float fVar391;
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  v4sf one;
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [16];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar424 [64];
  undefined1 auVar436 [32];
  undefined1 auVar425 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar426 [16];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar446 [64];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  undefined1 auVar487 [32];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [32];
  undefined1 auVar492 [32];
  undefined1 auVar493 [32];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [32];
  undefined1 auVar498 [32];
  undefined1 auVar499 [32];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [32];
  undefined1 auVar504 [32];
  undefined1 auVar505 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM29 [64];
  int outw;
  int size;
  int h_3;
  int outh_1;
  int outh_3;
  int outh;
  Option opt_b;
  ulong local_2e8;
  ulong local_2d8;
  float *local_2b8;
  void *local_260;
  Mat local_228;
  undefined8 local_1e0;
  int local_1d4;
  undefined8 local_1d0;
  void *local_1c8;
  long local_1c0;
  Option *local_1b8;
  int local_1ac;
  undefined1 local_1a8 [64];
  undefined8 local_168;
  Mat *local_160;
  undefined1 local_158 [64];
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  long local_d0;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  int local_90;
  size_t local_88;
  undefined1 local_78 [16];
  undefined1 auStack_68 [48];
  
  iVar8 = bottom_blob->w;
  iVar9 = bottom_blob->h;
  uVar168 = bottom_blob->elemsize;
  iVar182 = bottom_blob->elempack;
  local_158._0_8_ = (long)iVar182;
  local_1d4 = ((this->super_Deconvolution).kernel_w + -1) * (this->super_Deconvolution).dilation_w;
  uVar179 = (this->super_Deconvolution).num_output;
  iVar166 = (this->super_Deconvolution).stride_w;
  local_1ac = ((this->super_Deconvolution).kernel_h + -1) * (this->super_Deconvolution).dilation_h;
  iVar156 = (this->super_Deconvolution).stride_h;
  iVar171 = (this->super_Deconvolution).output_pad_right;
  iVar191 = (this->super_Deconvolution).output_pad_bottom;
  uVar177 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar179 & 0xf) == 0) {
      uVar177 = 0x10;
    }
    else if ((uVar179 & 7) == 0) {
      uVar177 = 8;
    }
    else {
      uVar177 = (uint)((uVar179 & 3) == 0) * 3 + 1;
    }
  }
  uVar179 = (int)uVar179 / (int)uVar177;
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  auVar198._0_4_ = (this->super_Deconvolution).pad_left;
  auVar198._4_4_ = (this->super_Deconvolution).pad_right;
  auVar198._8_4_ = (this->super_Deconvolution).pad_top;
  auVar198._12_4_ = (this->super_Deconvolution).pad_bottom;
  uVar169 = vpcmpd_avx512vl((undefined1  [16])0x0,auVar198,1);
  lVar186 = 0x10;
  if (((uVar169 & 0xf) == 0) &&
     ((((this->super_Deconvolution).output_w < 1 || ((this->super_Deconvolution).output_h < 1)) &&
      (lVar186 = 8, &local_228 != top_blob)))) {
    piVar10 = top_blob->refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    local_228.data = top_blob->data;
    local_228.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_228.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_228.elemsize = top_blob->elemsize;
    local_228.elempack = top_blob->elempack;
    local_228.allocator = top_blob->allocator;
    uVar4 = top_blob->dims;
    uVar5 = top_blob->w;
    uVar6 = top_blob->h;
    uVar7 = top_blob->d;
    local_228.c = top_blob->c;
    local_228.cstep = top_blob->cstep;
    local_228.dims = uVar4;
    local_228.w = uVar5;
    local_228.h = uVar6;
    local_228.d = uVar7;
  }
  iVar171 = (iVar8 + -1) * iVar166 + local_1d4 + iVar171 + 1;
  local_1b8 = opt;
  local_160 = top_blob;
  Mat::create(&local_228,iVar171,iVar191 + (iVar9 + -1) * iVar156 + local_1ac + 1,uVar179,
              (uVar168 / (ulong)(long)iVar182) * (ulong)uVar177,uVar177,
              *(Allocator **)(&opt->lightmode + lVar186));
  iVar166 = local_228.h;
  iVar182 = local_228.w;
  afVar147 = ::_ps512_cephes_exp_p5;
  afVar146 = ::_ps512_cephes_exp_p4;
  afVar145 = ::_ps512_cephes_exp_p3;
  afVar144 = ::_ps512_cephes_exp_p2;
  afVar143 = ::_ps512_cephes_exp_p1;
  afVar142 = ::_ps512_cephes_exp_p0;
  afVar141 = ::_ps512_cephes_LOG2EF;
  afVar140 = ::_ps512_exp_lo;
  afVar139 = ::_ps512_exp_hi;
  afVar138 = ::_ps512_1;
  iVar156 = -100;
  if ((local_228.data == (void *)0x0) ||
     (local_1e0 = (ulong)local_228.c, local_228.cstep * local_1e0 == 0)) goto LAB_00292320;
  uVar167 = (this->super_Deconvolution).kernel_w;
  uVar165 = (this->super_Deconvolution).kernel_h;
  iVar191 = uVar165 * uVar167;
  if (local_1b8->use_sgemm_convolution == true) {
    piVar10 = bottom_blob->refcount;
    local_c8 = bottom_blob->data;
    piStack_c0 = bottom_blob->refcount;
    local_b8 = bottom_blob->elemsize;
    local_b0 = bottom_blob->elempack;
    local_a8 = bottom_blob->allocator;
    iVar182 = bottom_blob->h;
    iVar166 = bottom_blob->w;
    uVar130 = bottom_blob->dims;
    uVar131 = bottom_blob->d;
    local_90 = bottom_blob->c;
    local_88 = bottom_blob->cstep;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
      iVar166 = bottom_blob->w;
      iVar182 = bottom_blob->h;
    }
    local_a0 = CONCAT44(iVar182 * iVar166,uVar130);
    uStack_98 = CONCAT44(uVar131,1);
    local_d8 = 0;
    local_118 = (long *)0x0;
    uStack_110 = 0;
    iStack_10c = 0;
    local_108 = 0;
    uStack_100 = 0;
    auStack_e8 = SUB1612(ZEXT816(0),0);
    auStack_68 = SUB6448(*local_1b8,0x10);
    local_78._0_8_ = SUB648(*local_1b8,0);
    local_78._8_8_ = local_228.allocator;
    local_f8 = local_118;
    uStack_f0 = uStack_110;
    iStack_ec = iStack_10c;
    iVar156 = (*this->gemm->_vptr_Layer[7])();
    if (iVar156 != 0) {
      piVar10 = (int *)CONCAT44(iStack_10c,uStack_110);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_f8 == (long *)0x0) {
            if (local_118 != (long *)0x0) {
              free(local_118);
            }
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      if (piStack_c0 != (int *)0x0) {
        LOCK();
        *piStack_c0 = *piStack_c0 + -1;
        UNLOCK();
        if (*piStack_c0 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            if (local_c8 != (void *)0x0) {
              free(local_c8);
            }
          }
          else {
            (*local_a8->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_00292320;
    }
    iVar182 = (iVar171 * (this->super_Deconvolution).stride_h -
              (this->super_Deconvolution).stride_w * iVar8) * uVar177;
    if (uVar177 < 8) {
      bVar194 = uVar177 == 1;
joined_r0x00291f3f:
      if (bVar194) {
        if (0 < (int)uVar179) {
          lVar186 = (long)local_228.h * (long)local_228.w;
          local_2d8 = 0;
          pvVar16 = (this->super_Deconvolution).bias_data.data;
          iVar166 = (this->super_Deconvolution).bias_data.c;
          sVar17 = (this->super_Deconvolution).bias_data.cstep;
          iVar156 = (int)((local_228.elemsize * lVar186 + 0xf & 0xfffffffffffffff0) /
                         local_228.elemsize);
          if (local_228.dims == 4) {
            iVar156 = (int)lVar186;
          }
          uVar177 = (this->super_Deconvolution).kernel_w;
          uVar167 = (this->super_Deconvolution).kernel_h;
          auVar352 = vpbroadcastq_avx512f();
          auVar353 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar354 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          pvVar176 = local_228.data;
          do {
            auVar198 = ZEXT816(0) << 0x40;
            if ((long)iVar166 * sVar17 != 0 && pvVar16 != (void *)0x0) {
              auVar198 = ZEXT416(*(uint *)((long)pvVar16 + local_2d8 * 4));
            }
            if (0 < iVar156 * local_228.d) {
              auVar355 = vbroadcastss_avx512f(auVar198);
              uVar168 = 0;
              do {
                auVar356 = vpbroadcastq_avx512f();
                auVar357 = vporq_avx512f(auVar356,auVar353);
                auVar356 = vporq_avx512f(auVar356,auVar354);
                uVar37 = vpcmpuq_avx512f(auVar356,auVar352,2);
                uVar38 = vpcmpuq_avx512f(auVar357,auVar352,2);
                bVar27 = (byte)uVar38;
                uVar195 = CONCAT11(bVar27,(byte)uVar37);
                puVar1 = (uint *)((long)pvVar176 + uVar168 * 4);
                bVar194 = (bool)((byte)uVar37 & 1);
                bVar20 = (bool)((byte)(uVar195 >> 1) & 1);
                bVar21 = (bool)((byte)(uVar195 >> 2) & 1);
                bVar22 = (bool)((byte)(uVar195 >> 3) & 1);
                bVar23 = (bool)((byte)(uVar195 >> 4) & 1);
                bVar24 = (bool)((byte)(uVar195 >> 5) & 1);
                bVar25 = (bool)((byte)(uVar195 >> 6) & 1);
                bVar26 = (bool)((byte)(uVar195 >> 7) & 1);
                bVar29 = (bool)(bVar27 >> 1 & 1);
                bVar30 = (bool)(bVar27 >> 2 & 1);
                bVar31 = (bool)(bVar27 >> 3 & 1);
                bVar32 = (bool)(bVar27 >> 4 & 1);
                bVar33 = (bool)(bVar27 >> 5 & 1);
                bVar34 = (bool)(bVar27 >> 6 & 1);
                *puVar1 = (uint)bVar194 * auVar355._0_4_ | (uint)!bVar194 * *puVar1;
                puVar1[1] = (uint)bVar20 * auVar355._4_4_ | (uint)!bVar20 * puVar1[1];
                puVar1[2] = (uint)bVar21 * auVar355._8_4_ | (uint)!bVar21 * puVar1[2];
                puVar1[3] = (uint)bVar22 * auVar355._12_4_ | (uint)!bVar22 * puVar1[3];
                puVar1[4] = (uint)bVar23 * auVar355._16_4_ | (uint)!bVar23 * puVar1[4];
                puVar1[5] = (uint)bVar24 * auVar355._20_4_ | (uint)!bVar24 * puVar1[5];
                puVar1[6] = (uint)bVar25 * auVar355._24_4_ | (uint)!bVar25 * puVar1[6];
                puVar1[7] = (uint)bVar26 * auVar355._28_4_ | (uint)!bVar26 * puVar1[7];
                puVar1[8] = (uint)(bVar27 & 1) * auVar355._32_4_ |
                            (uint)!(bool)(bVar27 & 1) * puVar1[8];
                puVar1[9] = (uint)bVar29 * auVar355._36_4_ | (uint)!bVar29 * puVar1[9];
                puVar1[10] = (uint)bVar30 * auVar355._40_4_ | (uint)!bVar30 * puVar1[10];
                puVar1[0xb] = (uint)bVar31 * auVar355._44_4_ | (uint)!bVar31 * puVar1[0xb];
                puVar1[0xc] = (uint)bVar32 * auVar355._48_4_ | (uint)!bVar32 * puVar1[0xc];
                puVar1[0xd] = (uint)bVar33 * auVar355._52_4_ | (uint)!bVar33 * puVar1[0xd];
                puVar1[0xe] = (uint)bVar34 * auVar355._56_4_ | (uint)!bVar34 * puVar1[0xe];
                puVar1[0xf] = (uint)(bVar27 >> 7) * auVar355._60_4_ |
                              (uint)!(bool)(bVar27 >> 7) * puVar1[0xf];
                uVar168 = uVar168 + 0x10;
              } while ((iVar156 * local_228.d + 0xfU & 0xfffffff0) != uVar168);
            }
            if (0 < (int)uVar167) {
              pfVar193 = (float *)(local_2d8 * (long)iVar191 * iStack_ec * local_108 +
                                  (long)local_118);
              iVar171 = (this->super_Deconvolution).dilation_h;
              iVar180 = (this->super_Deconvolution).dilation_w;
              uVar168 = 0;
              do {
                if (0 < (int)uVar177) {
                  uVar169 = 0;
                  do {
                    if (0 < iVar9) {
                      pfVar172 = (float *)((long)local_228.data +
                                          uVar169 * (long)iVar180 * 4 +
                                          uVar168 * (long)iVar171 *
                                                    local_228.elemsize * (long)local_228.w +
                                          local_228.cstep * local_228.elemsize * local_2d8);
                      iVar190 = (this->super_Deconvolution).stride_w;
                      iVar170 = 0;
                      do {
                        iVar192 = iVar8;
                        if (0 < iVar8) {
                          do {
                            *pfVar172 = *pfVar172 + *pfVar193;
                            pfVar193 = pfVar193 + 1;
                            pfVar172 = pfVar172 + iVar190;
                            iVar192 = iVar192 + -1;
                          } while (iVar192 != 0);
                        }
                        pfVar172 = pfVar172 + iVar182;
                        iVar170 = iVar170 + 1;
                      } while (iVar170 != iVar9);
                    }
                    uVar169 = uVar169 + 1;
                  } while (uVar169 != uVar177);
                }
                uVar168 = uVar168 + 1;
              } while (uVar168 != uVar167);
            }
            local_2d8 = local_2d8 + 1;
            pvVar176 = (void *)((long)pvVar176 + local_228.cstep * local_228.elemsize);
          } while (local_2d8 != uVar179);
        }
      }
      else if ((uVar177 == 4) && (0 < (int)uVar179)) {
        local_1d0._4_4_ = (undefined4)((ulong)local_1d0 >> 0x20);
        local_1d0 = CONCAT44(local_1d0._4_4_,iVar191);
        uVar168 = 0;
        do {
          sVar17 = local_228.elemsize;
          pfVar193 = (float *)((long)iStack_ec * uVar168 * (long)iVar191 * local_108 +
                              (long)local_118);
          lVar186 = (long)local_228.w;
          pauVar187 = (undefined1 (*) [16])
                      (local_228.cstep * uVar168 * local_228.elemsize + (long)local_228.data);
          uVar174 = local_228.h * lVar186;
          uVar169 = (local_228.elemsize * uVar174 + 0xf & 0xfffffffffffffff0) / local_228.elemsize;
          if (local_228.dims == 4) {
            uVar169 = uVar174;
          }
          pvVar16 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar16 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            uVar177 = local_228.d * (int)uVar169;
            if (0 < (int)uVar177) {
              memset(pauVar187,0,(ulong)uVar177 << 4);
            }
          }
          else {
            iVar166 = local_228.d * (int)uVar169;
            if (0 < iVar166) {
              auVar198 = *(undefined1 (*) [16])((long)pvVar16 + uVar168 * 0x10);
              pauVar162 = pauVar187;
              do {
                *pauVar162 = auVar198;
                pauVar162 = pauVar162 + 1;
                iVar166 = iVar166 + -1;
              } while (iVar166 != 0);
            }
          }
          iVar166 = (this->super_Deconvolution).kernel_h;
          if (0 < iVar166) {
            iVar156 = (this->super_Deconvolution).kernel_w;
            iVar171 = 0;
            do {
              if (0 < iVar156) {
                iVar166 = 0;
                do {
                  if (0 < iVar9) {
                    pauVar162 = (undefined1 (*) [16])
                                (*pauVar187 +
                                (long)((this->super_Deconvolution).dilation_w * iVar166 * 4) * 4 +
                                (long)(this->super_Deconvolution).dilation_h * (long)iVar171 *
                                sVar17 * lVar186);
                    iVar156 = 0;
                    do {
                      iVar180 = iVar8;
                      if (0 < iVar8) {
                        do {
                          auVar368._0_4_ = *pfVar193 + *(float *)*pauVar162;
                          auVar368._4_4_ = pfVar193[1] + *(float *)(*pauVar162 + 4);
                          auVar368._8_4_ = pfVar193[2] + *(float *)(*pauVar162 + 8);
                          auVar368._12_4_ = pfVar193[3] + *(float *)(*pauVar162 + 0xc);
                          *pauVar162 = auVar368;
                          pauVar162 = pauVar162 + (this->super_Deconvolution).stride_w;
                          pfVar193 = pfVar193 + 4;
                          iVar180 = iVar180 + -1;
                        } while (iVar180 != 0);
                      }
                      pauVar162 = (undefined1 (*) [16])(*pauVar162 + (long)iVar182 * 4);
                      iVar156 = iVar156 + 1;
                    } while (iVar156 != iVar9);
                    iVar156 = (this->super_Deconvolution).kernel_w;
                  }
                  iVar166 = iVar166 + 1;
                } while (iVar166 < iVar156);
                iVar166 = (this->super_Deconvolution).kernel_h;
              }
              iVar171 = iVar171 + 1;
            } while (iVar171 < iVar166);
          }
          uVar168 = uVar168 + 1;
        } while (uVar168 != uVar179);
      }
    }
    else if (uVar177 == 8) {
      if (0 < (int)uVar179) {
        local_1d0 = CONCAT44(local_1d0._4_4_,iVar191);
        uVar168 = 0;
        do {
          sVar17 = local_228.elemsize;
          pfVar193 = (float *)((long)iStack_ec * uVar168 * (long)iVar191 * local_108 +
                              (long)local_118);
          lVar186 = (long)local_228.w;
          pauVar189 = (undefined1 (*) [32])
                      (local_228.cstep * uVar168 * local_228.elemsize + (long)local_228.data);
          uVar174 = local_228.h * lVar186;
          uVar169 = (local_228.elemsize * uVar174 + 0xf & 0xfffffffffffffff0) / local_228.elemsize;
          if (local_228.dims == 4) {
            uVar169 = uVar174;
          }
          pvVar16 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar16 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            uVar167 = local_228.d * (int)uVar169;
            if (0 < (int)uVar167) {
              memset(pauVar189,0,(ulong)uVar167 << 5);
            }
          }
          else {
            iVar166 = local_228.d * (int)uVar169;
            if (0 < iVar166) {
              auVar251 = *(undefined1 (*) [32])((long)pvVar16 + uVar168 * 0x20);
              pauVar164 = pauVar189;
              do {
                *pauVar164 = auVar251;
                pauVar164 = pauVar164 + 1;
                iVar166 = iVar166 + -1;
              } while (iVar166 != 0);
            }
          }
          iVar166 = (this->super_Deconvolution).kernel_h;
          if (0 < iVar166) {
            iVar156 = (this->super_Deconvolution).kernel_w;
            iVar171 = 0;
            do {
              if (0 < iVar156) {
                iVar166 = 0;
                do {
                  if (0 < iVar9) {
                    pauVar164 = (undefined1 (*) [32])
                                (*pauVar189 +
                                (long)((this->super_Deconvolution).dilation_w * iVar166 * 8) * 4 +
                                (long)(this->super_Deconvolution).dilation_h * (long)iVar171 *
                                sVar17 * lVar186);
                    iVar156 = 0;
                    do {
                      iVar180 = iVar8;
                      if (0 < iVar8) {
                        do {
                          auVar251._0_4_ = *pfVar193 + *(float *)*pauVar164;
                          auVar251._4_4_ = pfVar193[1] + *(float *)(*pauVar164 + 4);
                          auVar251._8_4_ = pfVar193[2] + *(float *)(*pauVar164 + 8);
                          auVar251._12_4_ = pfVar193[3] + *(float *)(*pauVar164 + 0xc);
                          auVar251._16_4_ = pfVar193[4] + *(float *)(*pauVar164 + 0x10);
                          auVar251._20_4_ = pfVar193[5] + *(float *)(*pauVar164 + 0x14);
                          auVar251._24_4_ = pfVar193[6] + *(float *)(*pauVar164 + 0x18);
                          auVar251._28_4_ = pfVar193[7] + *(float *)(*pauVar164 + 0x1c);
                          *pauVar164 = auVar251;
                          pauVar164 = pauVar164 + (this->super_Deconvolution).stride_w;
                          pfVar193 = pfVar193 + 8;
                          iVar180 = iVar180 + -1;
                        } while (iVar180 != 0);
                      }
                      pauVar164 = (undefined1 (*) [32])(*pauVar164 + (long)iVar182 * 4);
                      iVar156 = iVar156 + 1;
                    } while (iVar156 != iVar9);
                    iVar156 = (this->super_Deconvolution).kernel_w;
                  }
                  iVar166 = iVar166 + 1;
                } while (iVar166 < iVar156);
                iVar166 = (this->super_Deconvolution).kernel_h;
              }
              iVar171 = iVar171 + 1;
            } while (iVar171 < iVar166);
          }
          uVar168 = uVar168 + 1;
        } while (uVar168 != uVar179);
        bVar194 = false;
        iVar191 = (int)local_1d0;
        goto joined_r0x00291f3f;
      }
    }
    else if ((uVar177 == 0x10) && (0 < (int)uVar179)) {
      uVar168 = 0;
      do {
        sVar17 = local_228.elemsize;
        pauVar188 = (undefined1 (*) [64])
                    ((long)iStack_ec * uVar168 * (long)iVar191 * local_108 + (long)local_118);
        lVar186 = (long)local_228.w;
        __s = (undefined8 *)(local_228.cstep * uVar168 * local_228.elemsize + (long)local_228.data);
        uVar174 = local_228.h * lVar186;
        uVar169 = (local_228.elemsize * uVar174 + 0xf & 0xfffffffffffffff0) / local_228.elemsize;
        if (local_228.dims == 4) {
          uVar169 = uVar174;
        }
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        if ((pvVar16 == (void *)0x0) ||
           ((long)(this->super_Deconvolution).bias_data.c *
            (this->super_Deconvolution).bias_data.cstep == 0)) {
          uVar177 = local_228.d * (int)uVar169;
          if (0 < (int)uVar177) {
            memset(__s,0,(ulong)uVar177 << 6);
          }
        }
        else {
          iVar166 = local_228.d * (int)uVar169;
          if (0 < iVar166) {
            puVar163 = (undefined8 *)((long)pvVar16 + uVar168 * 0x40);
            uVar37 = *puVar163;
            uVar38 = puVar163[1];
            uVar132 = puVar163[2];
            uVar133 = puVar163[3];
            uVar134 = puVar163[4];
            uVar135 = puVar163[5];
            uVar136 = puVar163[6];
            uVar137 = puVar163[7];
            puVar163 = __s;
            do {
              *puVar163 = uVar37;
              puVar163[1] = uVar38;
              puVar163[2] = uVar132;
              puVar163[3] = uVar133;
              puVar163[4] = uVar134;
              puVar163[5] = uVar135;
              puVar163[6] = uVar136;
              puVar163[7] = uVar137;
              puVar163 = puVar163 + 8;
              iVar166 = iVar166 + -1;
            } while (iVar166 != 0);
          }
        }
        iVar166 = (this->super_Deconvolution).kernel_h;
        if (0 < iVar166) {
          iVar156 = (this->super_Deconvolution).kernel_w;
          iVar171 = 0;
          do {
            if (0 < iVar156) {
              iVar166 = 0;
              do {
                if (0 < iVar9) {
                  pauVar175 = (undefined1 (*) [64])
                              ((long)__s +
                              (long)((this->super_Deconvolution).dilation_w * iVar166 * 0x10) * 4 +
                              (long)(this->super_Deconvolution).dilation_h * (long)iVar171 *
                              sVar17 * lVar186);
                  iVar156 = 0;
                  do {
                    iVar180 = iVar8;
                    if (0 < iVar8) {
                      do {
                        auVar352 = vaddps_avx512f(*pauVar188,*pauVar175);
                        *pauVar175 = auVar352;
                        pauVar175 = pauVar175 + (this->super_Deconvolution).stride_w;
                        pauVar188 = pauVar188 + 1;
                        iVar180 = iVar180 + -1;
                      } while (iVar180 != 0);
                    }
                    pauVar175 = (undefined1 (*) [64])(*pauVar175 + (long)iVar182 * 4);
                    iVar156 = iVar156 + 1;
                  } while (iVar156 != iVar9);
                  iVar156 = (this->super_Deconvolution).kernel_w;
                }
                iVar166 = iVar166 + 1;
              } while (iVar166 < iVar156);
              iVar166 = (this->super_Deconvolution).kernel_h;
            }
            iVar171 = iVar171 + 1;
          } while (iVar171 < iVar166);
        }
        uVar168 = uVar168 + 1;
      } while (uVar168 != uVar179);
    }
    pLVar18 = this->activation;
    if (pLVar18 != (Layer *)0x0) {
      (*pLVar18->_vptr_Layer[9])(pLVar18,&local_228,local_1b8);
    }
    piVar10 = (int *)CONCAT44(iStack_10c,uStack_110);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_f8 == (long *)0x0) {
          if (local_118 != (long *)0x0) {
            free(local_118);
          }
        }
        else {
          (**(code **)(*local_f8 + 0x18))();
        }
      }
    }
    if (piStack_c0 != (int *)0x0) {
      LOCK();
      *piStack_c0 = *piStack_c0 + -1;
      UNLOCK();
      if (*piStack_c0 == 0) {
        if (local_a8 == (Allocator *)0x0) {
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (*local_a8->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_1d0 = CONCAT44(local_1d0._4_4_,iVar191);
    if ((local_158._0_4_ == 0x10) && (uVar177 == 0x10)) {
      if (local_228.c < 1) goto LAB_002922db;
      iVar8 = (this->super_Deconvolution).dilation_w;
      iVar9 = (this->super_Deconvolution).dilation_h;
      iVar156 = (this->super_Deconvolution).stride_w;
      iVar171 = (this->super_Deconvolution).stride_h;
      iVar191 = (this->super_Deconvolution).activation_type;
      pvVar16 = (this->super_Deconvolution).bias_data.data;
      auVar352 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar353 = vxorps_avx512dq(auVar352,(undefined1  [64])_ps512_cephes_log_q2);
      auVar354 = vxorps_avx512dq(auVar352,(undefined1  [64])_ps512_cephes_log_q1);
      auVar355 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_1a8 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar352);
      local_2e8 = 0;
      auVar198 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar198);
      auVar352 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        if (0 < local_228.h) {
          iVar180 = bottom_blob->w;
          iVar190 = bottom_blob->h;
          pauVar188 = (undefined1 (*) [64])
                      (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
          uVar179 = bottom_blob->c;
          iVar170 = 0;
          do {
            if (0 < local_228.w) {
              uVar173 = 0;
              iVar192 = (1 - uVar167) * iVar8;
              do {
                if (pvVar16 == (void *)0x0) {
                  auVar356 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar356 = *(undefined1 (*) [64])((long)pvVar16 + local_2e8 * 0x40);
                }
                if (0 < (int)uVar179) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar11 = bottom_blob->data;
                  uVar168 = 0;
                  do {
                    if (0 < (int)uVar165) {
                      uVar174 = 0;
                      uVar169 = 0;
                      do {
                        iVar157 = (((int)uVar169 - uVar165) + 1) * iVar9 + iVar170;
                        if ((((-1 < iVar157) &&
                             (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                            (0 < (int)uVar167)) && (iVar158 < iVar190)) {
                          lVar186 = (long)iVar158 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar168;
                          uVar178 = uVar174;
                          uVar183 = (ulong)uVar167;
                          iVar157 = iVar192;
                          do {
                            if (((-1 < iVar157) &&
                                (iVar158 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                               (iVar158 < iVar180)) {
                              lVar161 = (long)(iVar158 << 4);
                              auVar357 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186)));
                              in_ZMM8 = vbroadcastss_avx512f
                                                  (ZEXT416(*(uint *)((long)pvVar11 +
                                                                    lVar161 * 4 + lVar186 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 8)));
                              auVar303 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0xc)));
                              auVar304 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x10)))
                              ;
                              auVar305 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x14)))
                              ;
                              auVar306 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x18)))
                              ;
                              auVar307 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x1c)))
                              ;
                              auVar308 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x20)))
                              ;
                              auVar309 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x24)))
                              ;
                              auVar310 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x28)))
                              ;
                              auVar311 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x2c)))
                              ;
                              auVar312 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x30)))
                              ;
                              auVar313 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x34)))
                              ;
                              auVar314 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x38)))
                              ;
                              auVar315 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x3c)))
                              ;
                              uVar196 = uVar178 & 0xffffffff;
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar357,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4));
                              auVar356 = vfmadd231ps_avx512f(auVar356,in_ZMM8,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x40))
                              ;
                              auVar356 = vfmadd231ps_avx512f(auVar356,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x80))
                              ;
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar303,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0xc0))
                              ;
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar304,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x100)
                                                            );
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar305,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x140)
                                                            );
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar306,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x180)
                                                            );
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar307,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x1c0)
                                                            );
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar308,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x200)
                                                            );
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar309,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x240)
                                                            );
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar310,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x280)
                                                            );
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar311,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x2c0)
                                                            );
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar312,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x300)
                                                            );
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar313,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x340)
                                                            );
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar314,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x380)
                                                            );
                              auVar356 = vfmadd231ps_avx512f(auVar356,auVar315,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x3c0)
                                                            );
                            }
                            uVar178 = uVar178 + 0x100;
                            iVar157 = iVar157 + iVar8;
                            uVar183 = uVar183 - 1;
                          } while (uVar183 != 0);
                        }
                        uVar169 = uVar169 + 1;
                        uVar174 = uVar174 + (ulong)uVar167 * 0x100;
                      } while (uVar169 != uVar165);
                    }
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar167 * uVar165 * 0x100) * 4)
                    ;
                    uVar168 = uVar168 + 1;
                  } while (uVar168 != uVar179);
                }
                switch(iVar191) {
                case 1:
                  auVar356 = vmaxps_avx512f(auVar356,in_ZMM29);
                  break;
                case 2:
                  uVar168 = vcmpps_avx512f(auVar356,in_ZMM29,1);
                  uVar2 = *(this->super_Deconvolution).activation_params.data;
                  auVar309._4_4_ = uVar2;
                  auVar309._0_4_ = uVar2;
                  auVar309._8_4_ = uVar2;
                  auVar309._12_4_ = uVar2;
                  auVar309._16_4_ = uVar2;
                  auVar309._20_4_ = uVar2;
                  auVar309._24_4_ = uVar2;
                  auVar309._28_4_ = uVar2;
                  auVar309._32_4_ = uVar2;
                  auVar309._36_4_ = uVar2;
                  auVar309._40_4_ = uVar2;
                  auVar309._44_4_ = uVar2;
                  auVar309._48_4_ = uVar2;
                  auVar309._52_4_ = uVar2;
                  auVar309._56_4_ = uVar2;
                  auVar309._60_4_ = uVar2;
                  auVar357 = vmulps_avx512f(auVar356,auVar309);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar310._0_4_ = (uint)bVar194 * auVar357._0_4_ | (uint)!bVar194 * auVar356._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar310._4_4_ = (uint)bVar194 * auVar357._4_4_ | (uint)!bVar194 * auVar356._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar310._8_4_ = (uint)bVar194 * auVar357._8_4_ | (uint)!bVar194 * auVar356._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar310._12_4_ =
                       (uint)bVar194 * auVar357._12_4_ | (uint)!bVar194 * auVar356._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar310._16_4_ =
                       (uint)bVar194 * auVar357._16_4_ | (uint)!bVar194 * auVar356._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar310._20_4_ =
                       (uint)bVar194 * auVar357._20_4_ | (uint)!bVar194 * auVar356._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar310._24_4_ =
                       (uint)bVar194 * auVar357._24_4_ | (uint)!bVar194 * auVar356._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar310._28_4_ =
                       (uint)bVar194 * auVar357._28_4_ | (uint)!bVar194 * auVar356._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  auVar310._32_4_ =
                       (uint)bVar194 * auVar357._32_4_ | (uint)!bVar194 * auVar356._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar310._36_4_ =
                       (uint)bVar194 * auVar357._36_4_ | (uint)!bVar194 * auVar356._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar310._40_4_ =
                       (uint)bVar194 * auVar357._40_4_ | (uint)!bVar194 * auVar356._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar310._44_4_ =
                       (uint)bVar194 * auVar357._44_4_ | (uint)!bVar194 * auVar356._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar310._48_4_ =
                       (uint)bVar194 * auVar357._48_4_ | (uint)!bVar194 * auVar356._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar310._52_4_ =
                       (uint)bVar194 * auVar357._52_4_ | (uint)!bVar194 * auVar356._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar310._56_4_ =
                       (uint)bVar194 * auVar357._56_4_ | (uint)!bVar194 * auVar356._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar310._60_4_ =
                       (uint)bVar194 * auVar357._60_4_ | (uint)!bVar194 * auVar356._60_4_;
                  auVar356 = auVar310;
                  break;
                case 3:
                  puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar2 = *puVar12;
                  auVar308._4_4_ = uVar2;
                  auVar308._0_4_ = uVar2;
                  auVar308._8_4_ = uVar2;
                  auVar308._12_4_ = uVar2;
                  auVar308._16_4_ = uVar2;
                  auVar308._20_4_ = uVar2;
                  auVar308._24_4_ = uVar2;
                  auVar308._28_4_ = uVar2;
                  auVar308._32_4_ = uVar2;
                  auVar308._36_4_ = uVar2;
                  auVar308._40_4_ = uVar2;
                  auVar308._44_4_ = uVar2;
                  auVar308._48_4_ = uVar2;
                  auVar308._52_4_ = uVar2;
                  auVar308._56_4_ = uVar2;
                  auVar308._60_4_ = uVar2;
                  auVar357 = vmaxps_avx512f(auVar356,auVar308);
                  uVar2 = puVar12[1];
                  auVar356._4_4_ = uVar2;
                  auVar356._0_4_ = uVar2;
                  auVar356._8_4_ = uVar2;
                  auVar356._12_4_ = uVar2;
                  auVar356._16_4_ = uVar2;
                  auVar356._20_4_ = uVar2;
                  auVar356._24_4_ = uVar2;
                  auVar356._28_4_ = uVar2;
                  auVar356._32_4_ = uVar2;
                  auVar356._36_4_ = uVar2;
                  auVar356._40_4_ = uVar2;
                  auVar356._44_4_ = uVar2;
                  auVar356._48_4_ = uVar2;
                  auVar356._52_4_ = uVar2;
                  auVar356._56_4_ = uVar2;
                  auVar356._60_4_ = uVar2;
                  auVar356 = vminps_avx512f(auVar357,auVar356);
                  break;
                case 4:
                  auVar304._8_4_ = 0x80000000;
                  auVar304._0_8_ = 0x8000000080000000;
                  auVar304._12_4_ = 0x80000000;
                  auVar304._16_4_ = 0x80000000;
                  auVar304._20_4_ = 0x80000000;
                  auVar304._24_4_ = 0x80000000;
                  auVar304._28_4_ = 0x80000000;
                  auVar304._32_4_ = 0x80000000;
                  auVar304._36_4_ = 0x80000000;
                  auVar304._40_4_ = 0x80000000;
                  auVar304._44_4_ = 0x80000000;
                  auVar304._48_4_ = 0x80000000;
                  auVar304._52_4_ = 0x80000000;
                  auVar304._56_4_ = 0x80000000;
                  auVar304._60_4_ = 0x80000000;
                  auVar356 = vxorps_avx512dq(auVar356,auVar304);
                  auVar356 = vminps_avx512f(auVar356,(undefined1  [64])afVar139);
                  auVar356 = vmaxps_avx512f(auVar356,(undefined1  [64])afVar140);
                  auVar357 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar356,
                                                 (undefined1  [64])afVar147);
                  auVar303 = vrndscaleps_avx512f(auVar357,1);
                  uVar168 = vcmpps_avx512f(auVar357,auVar303,1);
                  auVar357 = vsubps_avx512f(auVar303,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  in_ZMM8._0_4_ = (uint)bVar194 * auVar357._0_4_ | (uint)!bVar194 * auVar303._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  in_ZMM8._4_4_ = (uint)bVar194 * auVar357._4_4_ | (uint)!bVar194 * auVar303._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  in_ZMM8._8_4_ = (uint)bVar194 * auVar357._8_4_ | (uint)!bVar194 * auVar303._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  in_ZMM8._12_4_ =
                       (uint)bVar194 * auVar357._12_4_ | (uint)!bVar194 * auVar303._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  in_ZMM8._16_4_ =
                       (uint)bVar194 * auVar357._16_4_ | (uint)!bVar194 * auVar303._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  in_ZMM8._20_4_ =
                       (uint)bVar194 * auVar357._20_4_ | (uint)!bVar194 * auVar303._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  in_ZMM8._24_4_ =
                       (uint)bVar194 * auVar357._24_4_ | (uint)!bVar194 * auVar303._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  in_ZMM8._28_4_ =
                       (uint)bVar194 * auVar357._28_4_ | (uint)!bVar194 * auVar303._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  in_ZMM8._32_4_ =
                       (uint)bVar194 * auVar357._32_4_ | (uint)!bVar194 * auVar303._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  in_ZMM8._36_4_ =
                       (uint)bVar194 * auVar357._36_4_ | (uint)!bVar194 * auVar303._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  in_ZMM8._40_4_ =
                       (uint)bVar194 * auVar357._40_4_ | (uint)!bVar194 * auVar303._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  in_ZMM8._44_4_ =
                       (uint)bVar194 * auVar357._44_4_ | (uint)!bVar194 * auVar303._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  in_ZMM8._48_4_ =
                       (uint)bVar194 * auVar357._48_4_ | (uint)!bVar194 * auVar303._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  in_ZMM8._52_4_ =
                       (uint)bVar194 * auVar357._52_4_ | (uint)!bVar194 * auVar303._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  in_ZMM8._56_4_ =
                       (uint)bVar194 * auVar357._56_4_ | (uint)!bVar194 * auVar303._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  in_ZMM8._60_4_ =
                       (uint)bVar194 * auVar357._60_4_ | (uint)!bVar194 * auVar303._60_4_;
                  auVar356 = vfmadd231ps_avx512f(auVar356,in_ZMM8,auVar353);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar356,in_ZMM8,auVar354);
                  auVar356 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar357 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar357 = vfmadd213ps_avx512f(auVar357,in_ZMM16,(undefined1  [64])afVar144);
                  auVar357 = vfmadd213ps_avx512f(auVar357,in_ZMM16,(undefined1  [64])afVar145);
                  auVar357 = vfmadd213ps_avx512f(auVar357,in_ZMM16,(undefined1  [64])afVar146);
                  auVar357 = vfmadd213ps_avx512f(auVar357,in_ZMM16,(undefined1  [64])afVar147);
                  auVar356 = vfmadd213ps_avx512f(auVar357,auVar356,in_ZMM16);
                  auVar356 = vaddps_avx512f(auVar356,(undefined1  [64])afVar138);
                  auVar357 = vcvttps2dq_avx512f(in_ZMM8);
                  auVar357 = vpaddd_avx512f(auVar357,auVar355);
                  auVar357 = vpslld_avx512f(auVar357,0x17);
                  auVar356 = vfmadd213ps_avx512f(auVar357,auVar356,auVar352);
                  auVar356 = vdivps_avx512f(auVar352,auVar356);
                  break;
                case 5:
                  auVar357 = vminps_avx512f(auVar356,(undefined1  [64])afVar139);
                  auVar357 = vmaxps_avx512f(auVar357,(undefined1  [64])afVar140);
                  auVar303 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar357,
                                                 (undefined1  [64])afVar147);
                  auVar304 = vrndscaleps_avx512f(auVar303,1);
                  uVar168 = vcmpps_avx512f(auVar303,auVar304,1);
                  auVar305 = vsubps_avx512f(auVar304,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar303._0_4_ = (uint)bVar194 * auVar305._0_4_ | (uint)!bVar194 * auVar304._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar303._4_4_ = (uint)bVar194 * auVar305._4_4_ | (uint)!bVar194 * auVar304._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar303._8_4_ = (uint)bVar194 * auVar305._8_4_ | (uint)!bVar194 * auVar304._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar303._12_4_ =
                       (uint)bVar194 * auVar305._12_4_ | (uint)!bVar194 * auVar304._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar303._16_4_ =
                       (uint)bVar194 * auVar305._16_4_ | (uint)!bVar194 * auVar304._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar303._20_4_ =
                       (uint)bVar194 * auVar305._20_4_ | (uint)!bVar194 * auVar304._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar303._24_4_ =
                       (uint)bVar194 * auVar305._24_4_ | (uint)!bVar194 * auVar304._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar303._28_4_ =
                       (uint)bVar194 * auVar305._28_4_ | (uint)!bVar194 * auVar304._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  auVar303._32_4_ =
                       (uint)bVar194 * auVar305._32_4_ | (uint)!bVar194 * auVar304._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar303._36_4_ =
                       (uint)bVar194 * auVar305._36_4_ | (uint)!bVar194 * auVar304._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar303._40_4_ =
                       (uint)bVar194 * auVar305._40_4_ | (uint)!bVar194 * auVar304._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar303._44_4_ =
                       (uint)bVar194 * auVar305._44_4_ | (uint)!bVar194 * auVar304._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar303._48_4_ =
                       (uint)bVar194 * auVar305._48_4_ | (uint)!bVar194 * auVar304._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar303._52_4_ =
                       (uint)bVar194 * auVar305._52_4_ | (uint)!bVar194 * auVar304._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar303._56_4_ =
                       (uint)bVar194 * auVar305._56_4_ | (uint)!bVar194 * auVar304._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar303._60_4_ =
                       (uint)bVar194 * auVar305._60_4_ | (uint)!bVar194 * auVar304._60_4_;
                  auVar357 = vfmadd231ps_avx512f(auVar357,auVar303,auVar353);
                  auVar357 = vfmadd231ps_avx512f(auVar357,auVar303,auVar354);
                  auVar304 = vmulps_avx512f(auVar357,auVar357);
                  auVar305 = vfmadd213ps_avx512f(auVar357,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar357,(undefined1  [64])afVar144);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar357,(undefined1  [64])afVar145);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar357,(undefined1  [64])afVar146);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar357,(undefined1  [64])afVar147);
                  auVar357 = vfmadd213ps_avx512f(auVar305,auVar304,auVar357);
                  auVar357 = vaddps_avx512f(auVar357,(undefined1  [64])afVar138);
                  auVar303 = vcvttps2dq_avx512f(auVar303);
                  auVar303 = vpaddd_avx512f(auVar303,auVar355);
                  auVar303 = vpslld_avx512f(auVar303,0x17);
                  auVar357 = vfmadd213ps_avx512f(auVar303,auVar357,auVar352);
                  auVar303 = vmaxps_avx512f(auVar357,(undefined1  [64])_ps512_min_norm_pos);
                  auVar304 = vpsrld_avx512f(auVar303,0x17);
                  auVar303 = vpternlogd_avx512f(auVar303,(undefined1  [64])afVar147,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar168 = vcmpps_avx512f(auVar303,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar305 = vsubps_avx512f(auVar303,(undefined1  [64])afVar138);
                  auVar303 = vaddps_avx512f(auVar305,auVar303);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar306._0_4_ = (uint)bVar194 * auVar303._0_4_ | (uint)!bVar194 * auVar305._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar306._4_4_ = (uint)bVar194 * auVar303._4_4_ | (uint)!bVar194 * auVar305._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar306._8_4_ = (uint)bVar194 * auVar303._8_4_ | (uint)!bVar194 * auVar305._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar306._12_4_ =
                       (uint)bVar194 * auVar303._12_4_ | (uint)!bVar194 * auVar305._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar306._16_4_ =
                       (uint)bVar194 * auVar303._16_4_ | (uint)!bVar194 * auVar305._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar306._20_4_ =
                       (uint)bVar194 * auVar303._20_4_ | (uint)!bVar194 * auVar305._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar306._24_4_ =
                       (uint)bVar194 * auVar303._24_4_ | (uint)!bVar194 * auVar305._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar306._28_4_ =
                       (uint)bVar194 * auVar303._28_4_ | (uint)!bVar194 * auVar305._28_4_;
                  bVar27 = (byte)(uVar168 >> 8);
                  bVar194 = (bool)(bVar27 & 1);
                  auVar306._32_4_ =
                       (uint)bVar194 * auVar303._32_4_ | (uint)!bVar194 * auVar305._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar306._36_4_ =
                       (uint)bVar194 * auVar303._36_4_ | (uint)!bVar194 * auVar305._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar306._40_4_ =
                       (uint)bVar194 * auVar303._40_4_ | (uint)!bVar194 * auVar305._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar306._44_4_ =
                       (uint)bVar194 * auVar303._44_4_ | (uint)!bVar194 * auVar305._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar306._48_4_ =
                       (uint)bVar194 * auVar303._48_4_ | (uint)!bVar194 * auVar305._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar306._52_4_ =
                       (uint)bVar194 * auVar303._52_4_ | (uint)!bVar194 * auVar305._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar306._56_4_ =
                       (uint)bVar194 * auVar303._56_4_ | (uint)!bVar194 * auVar305._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar306._60_4_ =
                       (uint)bVar194 * auVar303._60_4_ | (uint)!bVar194 * auVar305._60_4_;
                  auVar303 = vmulps_avx512f(auVar306,auVar306);
                  auVar305 = vfmadd132ps_avx512f(auVar306,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar306,
                                                 (undefined1  [64])_ps512_cephes_log_p2);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar306,
                                                 (undefined1  [64])_ps512_cephes_log_p3);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar306,
                                                 (undefined1  [64])_ps512_cephes_log_p4);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar306,
                                                 (undefined1  [64])_ps512_cephes_log_p5);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar306,
                                                 (undefined1  [64])_ps512_cephes_log_p6);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar306,
                                                 (undefined1  [64])_ps512_cephes_log_p7);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar306,
                                                 (undefined1  [64])_ps512_cephes_log_p8);
                  auVar307 = vmulps_avx512f(auVar303,auVar306);
                  auVar305 = vfmadd213ps_avx512f(auVar307,auVar305,auVar306);
                  uVar169 = vcmpps_avx512f(auVar357,in_ZMM29,2);
                  auVar357 = vpsubd_avx512f(auVar304,auVar355);
                  auVar357 = vcvtdq2ps_avx512f(auVar357);
                  auVar304 = vaddps_avx512f(auVar357,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar307._0_4_ = (uint)bVar194 * auVar357._0_4_ | (uint)!bVar194 * auVar304._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar307._4_4_ = (uint)bVar194 * auVar357._4_4_ | (uint)!bVar194 * auVar304._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar307._8_4_ = (uint)bVar194 * auVar357._8_4_ | (uint)!bVar194 * auVar304._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar307._12_4_ =
                       (uint)bVar194 * auVar357._12_4_ | (uint)!bVar194 * auVar304._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar307._16_4_ =
                       (uint)bVar194 * auVar357._16_4_ | (uint)!bVar194 * auVar304._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar307._20_4_ =
                       (uint)bVar194 * auVar357._20_4_ | (uint)!bVar194 * auVar304._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar307._24_4_ =
                       (uint)bVar194 * auVar357._24_4_ | (uint)!bVar194 * auVar304._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar307._28_4_ =
                       (uint)bVar194 * auVar357._28_4_ | (uint)!bVar194 * auVar304._28_4_;
                  bVar194 = (bool)(bVar27 & 1);
                  auVar307._32_4_ =
                       (uint)bVar194 * auVar357._32_4_ | (uint)!bVar194 * auVar304._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar307._36_4_ =
                       (uint)bVar194 * auVar357._36_4_ | (uint)!bVar194 * auVar304._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar307._40_4_ =
                       (uint)bVar194 * auVar357._40_4_ | (uint)!bVar194 * auVar304._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar307._44_4_ =
                       (uint)bVar194 * auVar357._44_4_ | (uint)!bVar194 * auVar304._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar307._48_4_ =
                       (uint)bVar194 * auVar357._48_4_ | (uint)!bVar194 * auVar304._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar307._52_4_ =
                       (uint)bVar194 * auVar357._52_4_ | (uint)!bVar194 * auVar304._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar307._56_4_ =
                       (uint)bVar194 * auVar357._56_4_ | (uint)!bVar194 * auVar304._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar307._60_4_ =
                       (uint)bVar194 * auVar357._60_4_ | (uint)!bVar194 * auVar304._60_4_;
                  auVar357 = vfmadd231ps_avx512f(auVar305,auVar307,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar357 = vfmadd231ps_avx512f(auVar357,auVar303,local_1a8);
                  auVar357 = vfmadd231ps_avx512f(auVar357,auVar307,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar303 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
                  auVar357 = vmulps_avx512f(auVar357,auVar303);
                  auVar304 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar194 = (bool)((byte)uVar169 & 1);
                  auVar305._0_4_ = (uint)bVar194 * auVar304._0_4_ | (uint)!bVar194 * auVar357._0_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                  auVar305._4_4_ = (uint)bVar194 * auVar304._4_4_ | (uint)!bVar194 * auVar357._4_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                  auVar305._8_4_ = (uint)bVar194 * auVar304._8_4_ | (uint)!bVar194 * auVar357._8_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                  auVar305._12_4_ =
                       (uint)bVar194 * auVar304._12_4_ | (uint)!bVar194 * auVar357._12_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                  auVar305._16_4_ =
                       (uint)bVar194 * auVar304._16_4_ | (uint)!bVar194 * auVar357._16_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                  auVar305._20_4_ =
                       (uint)bVar194 * auVar304._20_4_ | (uint)!bVar194 * auVar357._20_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                  auVar305._24_4_ =
                       (uint)bVar194 * auVar304._24_4_ | (uint)!bVar194 * auVar357._24_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 7) & 1);
                  auVar305._28_4_ =
                       (uint)bVar194 * auVar304._28_4_ | (uint)!bVar194 * auVar357._28_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 8) & 1);
                  auVar305._32_4_ =
                       (uint)bVar194 * auVar304._32_4_ | (uint)!bVar194 * auVar357._32_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 9) & 1);
                  auVar305._36_4_ =
                       (uint)bVar194 * auVar304._36_4_ | (uint)!bVar194 * auVar357._36_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 10) & 1);
                  auVar305._40_4_ =
                       (uint)bVar194 * auVar304._40_4_ | (uint)!bVar194 * auVar357._40_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xb) & 1);
                  auVar305._44_4_ =
                       (uint)bVar194 * auVar304._44_4_ | (uint)!bVar194 * auVar357._44_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xc) & 1);
                  auVar305._48_4_ =
                       (uint)bVar194 * auVar304._48_4_ | (uint)!bVar194 * auVar357._48_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xd) & 1);
                  auVar305._52_4_ =
                       (uint)bVar194 * auVar304._52_4_ | (uint)!bVar194 * auVar357._52_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xe) & 1);
                  auVar305._56_4_ =
                       (uint)bVar194 * auVar304._56_4_ | (uint)!bVar194 * auVar357._56_4_;
                  bVar194 = SUB81(uVar169 >> 0xf,0);
                  auVar305._60_4_ =
                       (uint)bVar194 * auVar304._60_4_ | (uint)!bVar194 * auVar357._60_4_;
                  auVar357 = vminps_avx512f(auVar305,(undefined1  [64])afVar139);
                  auVar357 = vmaxps_avx512f(auVar357,(undefined1  [64])afVar140);
                  auVar304 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar357,
                                                 (undefined1  [64])afVar147);
                  auVar305 = vrndscaleps_avx512f(auVar304,1);
                  uVar168 = vcmpps_avx512f(auVar304,auVar305,1);
                  auVar304 = vsubps_avx512f(auVar305,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  in_ZMM16._0_4_ = (uint)bVar194 * auVar304._0_4_ | (uint)!bVar194 * auVar305._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar194 * auVar304._4_4_ | (uint)!bVar194 * auVar305._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar194 * auVar304._8_4_ | (uint)!bVar194 * auVar305._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  in_ZMM16._12_4_ =
                       (uint)bVar194 * auVar304._12_4_ | (uint)!bVar194 * auVar305._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  in_ZMM16._16_4_ =
                       (uint)bVar194 * auVar304._16_4_ | (uint)!bVar194 * auVar305._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  in_ZMM16._20_4_ =
                       (uint)bVar194 * auVar304._20_4_ | (uint)!bVar194 * auVar305._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  in_ZMM16._24_4_ =
                       (uint)bVar194 * auVar304._24_4_ | (uint)!bVar194 * auVar305._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  in_ZMM16._28_4_ =
                       (uint)bVar194 * auVar304._28_4_ | (uint)!bVar194 * auVar305._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  in_ZMM16._32_4_ =
                       (uint)bVar194 * auVar304._32_4_ | (uint)!bVar194 * auVar305._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  in_ZMM16._36_4_ =
                       (uint)bVar194 * auVar304._36_4_ | (uint)!bVar194 * auVar305._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  in_ZMM16._40_4_ =
                       (uint)bVar194 * auVar304._40_4_ | (uint)!bVar194 * auVar305._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  in_ZMM16._44_4_ =
                       (uint)bVar194 * auVar304._44_4_ | (uint)!bVar194 * auVar305._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  in_ZMM16._48_4_ =
                       (uint)bVar194 * auVar304._48_4_ | (uint)!bVar194 * auVar305._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  in_ZMM16._52_4_ =
                       (uint)bVar194 * auVar304._52_4_ | (uint)!bVar194 * auVar305._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  in_ZMM16._56_4_ =
                       (uint)bVar194 * auVar304._56_4_ | (uint)!bVar194 * auVar305._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  in_ZMM16._60_4_ =
                       (uint)bVar194 * auVar304._60_4_ | (uint)!bVar194 * auVar305._60_4_;
                  auVar357 = vfmadd231ps_avx512f(auVar357,in_ZMM16,auVar353);
                  auVar357 = vfmadd231ps_avx512f(auVar357,in_ZMM16,auVar354);
                  auVar304 = vmulps_avx512f(auVar357,auVar357);
                  auVar305 = vfmadd213ps_avx512f(auVar357,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar357,(undefined1  [64])afVar144);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar357,(undefined1  [64])afVar145);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar357,(undefined1  [64])afVar146);
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar357,(undefined1  [64])afVar147);
                  auVar357 = vfmadd213ps_avx512f(auVar305,auVar304,auVar357);
                  auVar357 = vaddps_avx512f(auVar357,(undefined1  [64])afVar138);
                  auVar304 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar304 = vpaddd_avx512f(auVar304,auVar355);
                  auVar304 = vpslld_avx512f(auVar304,0x17);
                  in_ZMM8 = vfmadd213ps_avx512f(auVar304,auVar357,auVar352);
                  auVar357 = vdivps_avx512f(auVar352,in_ZMM8);
                  auVar357 = vfnmsub213ps_avx512f(auVar357,auVar303,auVar352);
                  goto LAB_0028afd1;
                case 6:
                  puVar1 = (uint *)(this->super_Deconvolution).activation_params.data;
                  auVar303 = vbroadcastss_avx512f(ZEXT416(*puVar1));
                  uVar181 = puVar1[1];
                  auVar357._4_4_ = uVar181;
                  auVar357._0_4_ = uVar181;
                  auVar357._8_4_ = uVar181;
                  auVar357._12_4_ = uVar181;
                  auVar357._16_4_ = uVar181;
                  auVar357._20_4_ = uVar181;
                  auVar357._24_4_ = uVar181;
                  auVar357._28_4_ = uVar181;
                  auVar357._32_4_ = uVar181;
                  auVar357._36_4_ = uVar181;
                  auVar357._40_4_ = uVar181;
                  auVar357._44_4_ = uVar181;
                  auVar357._48_4_ = uVar181;
                  auVar357._52_4_ = uVar181;
                  auVar357._56_4_ = uVar181;
                  auVar357._60_4_ = uVar181;
                  auVar357 = vfmadd213ps_avx512f(auVar303,auVar356,auVar357);
                  auVar357 = vmaxps_avx512f(auVar357,in_ZMM29);
                  auVar357 = vminps_avx512f(auVar357,auVar352);
LAB_0028afd1:
                  auVar356 = vmulps_avx512f(auVar357,auVar356);
                }
                *pauVar188 = auVar356;
                pauVar188 = pauVar188 + 1;
                uVar173 = uVar173 + 1;
                iVar192 = iVar192 + 1;
              } while (uVar173 != local_228.w);
            }
            iVar170 = iVar170 + 1;
          } while (iVar170 != local_228.h);
        }
        local_2e8 = local_2e8 + 1;
      } while (local_2e8 != local_1e0);
    }
    afVar152 = _ps512_cephes_log_p8;
    afVar151 = _ps512_cephes_log_p7;
    afVar150 = _ps512_cephes_log_p6;
    afVar149 = _ps512_cephes_log_p5;
    afVar148 = _ps512_cephes_log_p4;
    afVar147 = ::_ps512_cephes_exp_p5;
    afVar146 = ::_ps512_cephes_exp_p4;
    afVar145 = ::_ps512_cephes_exp_p3;
    afVar144 = ::_ps512_cephes_exp_p2;
    afVar143 = ::_ps512_cephes_exp_p1;
    afVar142 = ::_ps512_cephes_exp_p0;
    afVar141 = ::_ps512_cephes_LOG2EF;
    afVar140 = ::_ps512_exp_lo;
    afVar139 = ::_ps512_exp_hi;
    afVar138 = ::_ps512_1;
    if ((local_158._0_4_ == 8) && (uVar177 == 0x10)) {
      if ((long)local_228.c < 1) goto LAB_002922db;
      iVar8 = (this->super_Deconvolution).dilation_w;
      iVar9 = (this->super_Deconvolution).dilation_h;
      iVar156 = (this->super_Deconvolution).stride_w;
      iVar171 = (this->super_Deconvolution).stride_h;
      iVar191 = (this->super_Deconvolution).activation_type;
      pvVar16 = (this->super_Deconvolution).bias_data.data;
      uVar179 = (this->super_Deconvolution).kernel_w;
      uVar167 = (this->super_Deconvolution).kernel_h;
      auVar352 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar353 = vxorps_avx512dq(auVar352,(undefined1  [64])_ps512_cephes_log_q2);
      auVar354 = vxorps_avx512dq(auVar352,(undefined1  [64])_ps512_cephes_log_q1);
      auVar355 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar356 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar352);
      local_2e8 = 0;
      auVar198 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar198);
      auVar357 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar303 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        local_1a8._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar180 = bottom_blob->w;
          iVar190 = bottom_blob->h;
          pauVar188 = (undefined1 (*) [64])
                      (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
          uVar165 = bottom_blob->c;
          iVar170 = 0;
          do {
            if (0 < local_228.w) {
              uVar173 = 0;
              iVar192 = (1 - uVar179) * iVar8;
              do {
                if (pvVar16 == (void *)0x0) {
                  auVar304 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar304 = *(undefined1 (*) [64])((long)pvVar16 + local_2e8 * 0x40);
                }
                if (0 < (int)uVar165) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar11 = bottom_blob->data;
                  uVar168 = 0;
                  do {
                    if (0 < (int)uVar167) {
                      uVar174 = 0;
                      uVar169 = 0;
                      do {
                        iVar157 = (((int)uVar169 - uVar167) + 1) * iVar9 + iVar170;
                        if ((((-1 < iVar157) &&
                             (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                            (0 < (int)uVar179)) && (iVar158 < iVar190)) {
                          lVar186 = (long)iVar158 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar168;
                          uVar178 = (ulong)uVar179;
                          uVar183 = uVar174;
                          iVar157 = iVar192;
                          do {
                            if (((-1 < iVar157) &&
                                (iVar158 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                               (iVar158 < iVar180)) {
                              lVar161 = (long)(iVar158 << 3);
                              auVar305 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186)));
                              in_ZMM8 = vbroadcastss_avx512f
                                                  (ZEXT416(*(uint *)((long)pvVar11 +
                                                                    lVar161 * 4 + lVar186 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 8)));
                              auVar306 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0xc)));
                              auVar307 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x10)))
                              ;
                              auVar308 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x14)))
                              ;
                              auVar309 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x18)))
                              ;
                              auVar310 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x1c)))
                              ;
                              uVar196 = uVar183 & 0xffffffff;
                              auVar304 = vfmadd231ps_avx512f(auVar304,auVar305,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4));
                              auVar304 = vfmadd231ps_avx512f(auVar304,in_ZMM8,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x40))
                              ;
                              auVar304 = vfmadd231ps_avx512f(auVar304,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x80))
                              ;
                              auVar304 = vfmadd231ps_avx512f(auVar304,auVar306,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0xc0))
                              ;
                              auVar304 = vfmadd231ps_avx512f(auVar304,auVar307,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x100)
                                                            );
                              auVar304 = vfmadd231ps_avx512f(auVar304,auVar308,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x140)
                                                            );
                              auVar304 = vfmadd231ps_avx512f(auVar304,auVar309,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x180)
                                                            );
                              auVar304 = vfmadd231ps_avx512f(auVar304,auVar310,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x1c0)
                                                            );
                            }
                            uVar183 = uVar183 + 0x80;
                            iVar157 = iVar157 + iVar8;
                            uVar178 = uVar178 - 1;
                          } while (uVar178 != 0);
                        }
                        uVar169 = uVar169 + 1;
                        uVar174 = uVar174 + (ulong)uVar179 * 0x80;
                      } while (uVar169 != uVar167);
                    }
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar179 * uVar167 * 0x80) * 4);
                    uVar168 = uVar168 + 1;
                  } while (uVar168 != uVar165);
                }
                switch(iVar191) {
                case 1:
                  auVar304 = vmaxps_avx512f(auVar304,in_ZMM29);
                  break;
                case 2:
                  uVar168 = vcmpps_avx512f(auVar304,in_ZMM29,1);
                  uVar2 = *(this->super_Deconvolution).activation_params.data;
                  auVar121._4_4_ = uVar2;
                  auVar121._0_4_ = uVar2;
                  auVar121._8_4_ = uVar2;
                  auVar121._12_4_ = uVar2;
                  auVar121._16_4_ = uVar2;
                  auVar121._20_4_ = uVar2;
                  auVar121._24_4_ = uVar2;
                  auVar121._28_4_ = uVar2;
                  auVar121._32_4_ = uVar2;
                  auVar121._36_4_ = uVar2;
                  auVar121._40_4_ = uVar2;
                  auVar121._44_4_ = uVar2;
                  auVar121._48_4_ = uVar2;
                  auVar121._52_4_ = uVar2;
                  auVar121._56_4_ = uVar2;
                  auVar121._60_4_ = uVar2;
                  auVar305 = vmulps_avx512f(auVar304,auVar121);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar316._0_4_ = (uint)bVar194 * auVar305._0_4_ | (uint)!bVar194 * auVar304._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar316._4_4_ = (uint)bVar194 * auVar305._4_4_ | (uint)!bVar194 * auVar304._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar316._8_4_ = (uint)bVar194 * auVar305._8_4_ | (uint)!bVar194 * auVar304._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar316._12_4_ =
                       (uint)bVar194 * auVar305._12_4_ | (uint)!bVar194 * auVar304._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar316._16_4_ =
                       (uint)bVar194 * auVar305._16_4_ | (uint)!bVar194 * auVar304._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar316._20_4_ =
                       (uint)bVar194 * auVar305._20_4_ | (uint)!bVar194 * auVar304._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar316._24_4_ =
                       (uint)bVar194 * auVar305._24_4_ | (uint)!bVar194 * auVar304._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar316._28_4_ =
                       (uint)bVar194 * auVar305._28_4_ | (uint)!bVar194 * auVar304._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  auVar316._32_4_ =
                       (uint)bVar194 * auVar305._32_4_ | (uint)!bVar194 * auVar304._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar316._36_4_ =
                       (uint)bVar194 * auVar305._36_4_ | (uint)!bVar194 * auVar304._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar316._40_4_ =
                       (uint)bVar194 * auVar305._40_4_ | (uint)!bVar194 * auVar304._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar316._44_4_ =
                       (uint)bVar194 * auVar305._44_4_ | (uint)!bVar194 * auVar304._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar316._48_4_ =
                       (uint)bVar194 * auVar305._48_4_ | (uint)!bVar194 * auVar304._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar316._52_4_ =
                       (uint)bVar194 * auVar305._52_4_ | (uint)!bVar194 * auVar304._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar316._56_4_ =
                       (uint)bVar194 * auVar305._56_4_ | (uint)!bVar194 * auVar304._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar316._60_4_ =
                       (uint)bVar194 * auVar305._60_4_ | (uint)!bVar194 * auVar304._60_4_;
                  auVar304 = auVar316;
                  break;
                case 3:
                  puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar2 = *puVar12;
                  auVar119._4_4_ = uVar2;
                  auVar119._0_4_ = uVar2;
                  auVar119._8_4_ = uVar2;
                  auVar119._12_4_ = uVar2;
                  auVar119._16_4_ = uVar2;
                  auVar119._20_4_ = uVar2;
                  auVar119._24_4_ = uVar2;
                  auVar119._28_4_ = uVar2;
                  auVar119._32_4_ = uVar2;
                  auVar119._36_4_ = uVar2;
                  auVar119._40_4_ = uVar2;
                  auVar119._44_4_ = uVar2;
                  auVar119._48_4_ = uVar2;
                  auVar119._52_4_ = uVar2;
                  auVar119._56_4_ = uVar2;
                  auVar119._60_4_ = uVar2;
                  auVar304 = vmaxps_avx512f(auVar304,auVar119);
                  uVar2 = puVar12[1];
                  auVar120._4_4_ = uVar2;
                  auVar120._0_4_ = uVar2;
                  auVar120._8_4_ = uVar2;
                  auVar120._12_4_ = uVar2;
                  auVar120._16_4_ = uVar2;
                  auVar120._20_4_ = uVar2;
                  auVar120._24_4_ = uVar2;
                  auVar120._28_4_ = uVar2;
                  auVar120._32_4_ = uVar2;
                  auVar120._36_4_ = uVar2;
                  auVar120._40_4_ = uVar2;
                  auVar120._44_4_ = uVar2;
                  auVar120._48_4_ = uVar2;
                  auVar120._52_4_ = uVar2;
                  auVar120._56_4_ = uVar2;
                  auVar120._60_4_ = uVar2;
                  auVar304 = vminps_avx512f(auVar304,auVar120);
                  break;
                case 4:
                  auVar304 = vxorps_avx512dq(auVar304,auVar352);
                  auVar304 = vminps_avx512f(auVar304,(undefined1  [64])afVar139);
                  auVar304 = vmaxps_avx512f(auVar304,(undefined1  [64])afVar140);
                  auVar305 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar304,
                                                 (undefined1  [64])afVar147);
                  auVar306 = vrndscaleps_avx512f(auVar305,1);
                  uVar168 = vcmpps_avx512f(auVar305,auVar306,1);
                  auVar305 = vsubps_avx512f(auVar306,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  in_ZMM8._0_4_ = (uint)bVar194 * auVar305._0_4_ | (uint)!bVar194 * auVar306._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  in_ZMM8._4_4_ = (uint)bVar194 * auVar305._4_4_ | (uint)!bVar194 * auVar306._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  in_ZMM8._8_4_ = (uint)bVar194 * auVar305._8_4_ | (uint)!bVar194 * auVar306._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  in_ZMM8._12_4_ =
                       (uint)bVar194 * auVar305._12_4_ | (uint)!bVar194 * auVar306._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  in_ZMM8._16_4_ =
                       (uint)bVar194 * auVar305._16_4_ | (uint)!bVar194 * auVar306._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  in_ZMM8._20_4_ =
                       (uint)bVar194 * auVar305._20_4_ | (uint)!bVar194 * auVar306._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  in_ZMM8._24_4_ =
                       (uint)bVar194 * auVar305._24_4_ | (uint)!bVar194 * auVar306._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  in_ZMM8._28_4_ =
                       (uint)bVar194 * auVar305._28_4_ | (uint)!bVar194 * auVar306._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  in_ZMM8._32_4_ =
                       (uint)bVar194 * auVar305._32_4_ | (uint)!bVar194 * auVar306._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  in_ZMM8._36_4_ =
                       (uint)bVar194 * auVar305._36_4_ | (uint)!bVar194 * auVar306._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  in_ZMM8._40_4_ =
                       (uint)bVar194 * auVar305._40_4_ | (uint)!bVar194 * auVar306._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  in_ZMM8._44_4_ =
                       (uint)bVar194 * auVar305._44_4_ | (uint)!bVar194 * auVar306._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  in_ZMM8._48_4_ =
                       (uint)bVar194 * auVar305._48_4_ | (uint)!bVar194 * auVar306._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  in_ZMM8._52_4_ =
                       (uint)bVar194 * auVar305._52_4_ | (uint)!bVar194 * auVar306._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  in_ZMM8._56_4_ =
                       (uint)bVar194 * auVar305._56_4_ | (uint)!bVar194 * auVar306._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  in_ZMM8._60_4_ =
                       (uint)bVar194 * auVar305._60_4_ | (uint)!bVar194 * auVar306._60_4_;
                  auVar304 = vfmadd231ps_avx512f(auVar304,in_ZMM8,auVar353);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar304,in_ZMM8,auVar354);
                  auVar304 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar305 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar305 = vfmadd213ps_avx512f(auVar305,in_ZMM16,(undefined1  [64])afVar144);
                  auVar305 = vfmadd213ps_avx512f(auVar305,in_ZMM16,(undefined1  [64])afVar145);
                  auVar305 = vfmadd213ps_avx512f(auVar305,in_ZMM16,(undefined1  [64])afVar146);
                  auVar305 = vfmadd213ps_avx512f(auVar305,in_ZMM16,(undefined1  [64])afVar147);
                  auVar304 = vfmadd213ps_avx512f(auVar305,auVar304,in_ZMM16);
                  auVar304 = vaddps_avx512f(auVar304,(undefined1  [64])afVar138);
                  auVar305 = vcvttps2dq_avx512f(in_ZMM8);
                  auVar305 = vpaddd_avx512f(auVar305,auVar355);
                  auVar305 = vpslld_avx512f(auVar305,0x17);
                  auVar304 = vfmadd213ps_avx512f(auVar305,auVar304,auVar357);
                  auVar304 = vdivps_avx512f(auVar357,auVar304);
                  break;
                case 5:
                  auVar305 = vminps_avx512f(auVar304,(undefined1  [64])afVar139);
                  auVar305 = vmaxps_avx512f(auVar305,(undefined1  [64])afVar140);
                  auVar306 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar305,
                                                 (undefined1  [64])afVar147);
                  auVar307 = vrndscaleps_avx512f(auVar306,1);
                  uVar168 = vcmpps_avx512f(auVar306,auVar307,1);
                  auVar306 = vsubps_avx512f(auVar307,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar312._0_4_ = (uint)bVar194 * auVar306._0_4_ | (uint)!bVar194 * auVar307._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar312._4_4_ = (uint)bVar194 * auVar306._4_4_ | (uint)!bVar194 * auVar307._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar312._8_4_ = (uint)bVar194 * auVar306._8_4_ | (uint)!bVar194 * auVar307._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar312._12_4_ =
                       (uint)bVar194 * auVar306._12_4_ | (uint)!bVar194 * auVar307._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar312._16_4_ =
                       (uint)bVar194 * auVar306._16_4_ | (uint)!bVar194 * auVar307._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar312._20_4_ =
                       (uint)bVar194 * auVar306._20_4_ | (uint)!bVar194 * auVar307._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar312._24_4_ =
                       (uint)bVar194 * auVar306._24_4_ | (uint)!bVar194 * auVar307._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar312._28_4_ =
                       (uint)bVar194 * auVar306._28_4_ | (uint)!bVar194 * auVar307._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  auVar312._32_4_ =
                       (uint)bVar194 * auVar306._32_4_ | (uint)!bVar194 * auVar307._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar312._36_4_ =
                       (uint)bVar194 * auVar306._36_4_ | (uint)!bVar194 * auVar307._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar312._40_4_ =
                       (uint)bVar194 * auVar306._40_4_ | (uint)!bVar194 * auVar307._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar312._44_4_ =
                       (uint)bVar194 * auVar306._44_4_ | (uint)!bVar194 * auVar307._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar312._48_4_ =
                       (uint)bVar194 * auVar306._48_4_ | (uint)!bVar194 * auVar307._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar312._52_4_ =
                       (uint)bVar194 * auVar306._52_4_ | (uint)!bVar194 * auVar307._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar312._56_4_ =
                       (uint)bVar194 * auVar306._56_4_ | (uint)!bVar194 * auVar307._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar312._60_4_ =
                       (uint)bVar194 * auVar306._60_4_ | (uint)!bVar194 * auVar307._60_4_;
                  auVar305 = vfmadd231ps_avx512f(auVar305,auVar312,auVar353);
                  auVar305 = vfmadd231ps_avx512f(auVar305,auVar312,auVar354);
                  auVar306 = vmulps_avx512f(auVar305,auVar305);
                  auVar307 = vfmadd213ps_avx512f(auVar305,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar144);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar145);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar146);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar147);
                  auVar305 = vfmadd213ps_avx512f(auVar307,auVar306,auVar305);
                  auVar305 = vaddps_avx512f(auVar305,(undefined1  [64])afVar138);
                  auVar306 = vcvttps2dq_avx512f(auVar312);
                  auVar306 = vpaddd_avx512f(auVar306,auVar355);
                  auVar306 = vpslld_avx512f(auVar306,0x17);
                  auVar305 = vfmadd213ps_avx512f(auVar306,auVar305,auVar357);
                  auVar306 = vmaxps_avx512f(auVar305,(undefined1  [64])_ps512_min_norm_pos);
                  auVar307 = vpsrld_avx512f(auVar306,0x17);
                  auVar306 = vpternlogd_avx512f(auVar306,(undefined1  [64])afVar147,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar168 = vcmpps_avx512f(auVar306,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar308 = vsubps_avx512f(auVar306,(undefined1  [64])afVar138);
                  auVar306 = vaddps_avx512f(auVar308,auVar306);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar313._0_4_ = (uint)bVar194 * auVar306._0_4_ | (uint)!bVar194 * auVar308._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar313._4_4_ = (uint)bVar194 * auVar306._4_4_ | (uint)!bVar194 * auVar308._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar313._8_4_ = (uint)bVar194 * auVar306._8_4_ | (uint)!bVar194 * auVar308._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar313._12_4_ =
                       (uint)bVar194 * auVar306._12_4_ | (uint)!bVar194 * auVar308._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar313._16_4_ =
                       (uint)bVar194 * auVar306._16_4_ | (uint)!bVar194 * auVar308._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar313._20_4_ =
                       (uint)bVar194 * auVar306._20_4_ | (uint)!bVar194 * auVar308._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar313._24_4_ =
                       (uint)bVar194 * auVar306._24_4_ | (uint)!bVar194 * auVar308._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar313._28_4_ =
                       (uint)bVar194 * auVar306._28_4_ | (uint)!bVar194 * auVar308._28_4_;
                  bVar27 = (byte)(uVar168 >> 8);
                  bVar194 = (bool)(bVar27 & 1);
                  auVar313._32_4_ =
                       (uint)bVar194 * auVar306._32_4_ | (uint)!bVar194 * auVar308._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar313._36_4_ =
                       (uint)bVar194 * auVar306._36_4_ | (uint)!bVar194 * auVar308._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar313._40_4_ =
                       (uint)bVar194 * auVar306._40_4_ | (uint)!bVar194 * auVar308._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar313._44_4_ =
                       (uint)bVar194 * auVar306._44_4_ | (uint)!bVar194 * auVar308._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar313._48_4_ =
                       (uint)bVar194 * auVar306._48_4_ | (uint)!bVar194 * auVar308._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar313._52_4_ =
                       (uint)bVar194 * auVar306._52_4_ | (uint)!bVar194 * auVar308._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar313._56_4_ =
                       (uint)bVar194 * auVar306._56_4_ | (uint)!bVar194 * auVar308._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar313._60_4_ =
                       (uint)bVar194 * auVar306._60_4_ | (uint)!bVar194 * auVar308._60_4_;
                  auVar306 = vmulps_avx512f(auVar313,auVar313);
                  auVar308 = vfmadd132ps_avx512f(auVar313,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar313,
                                                 (undefined1  [64])_ps512_cephes_log_p2);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar313,
                                                 (undefined1  [64])_ps512_cephes_log_p3);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar313,(undefined1  [64])afVar148);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar313,(undefined1  [64])afVar149);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar313,(undefined1  [64])afVar150);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar313,(undefined1  [64])afVar151);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar313,(undefined1  [64])afVar152);
                  auVar309 = vmulps_avx512f(auVar306,auVar313);
                  auVar308 = vfmadd213ps_avx512f(auVar309,auVar308,auVar313);
                  uVar169 = vcmpps_avx512f(auVar305,in_ZMM29,2);
                  auVar305 = vpsubd_avx512f(auVar307,auVar355);
                  auVar305 = vcvtdq2ps_avx512f(auVar305);
                  auVar307 = vaddps_avx512f(auVar305,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar314._0_4_ = (uint)bVar194 * auVar305._0_4_ | (uint)!bVar194 * auVar307._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar314._4_4_ = (uint)bVar194 * auVar305._4_4_ | (uint)!bVar194 * auVar307._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar314._8_4_ = (uint)bVar194 * auVar305._8_4_ | (uint)!bVar194 * auVar307._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar314._12_4_ =
                       (uint)bVar194 * auVar305._12_4_ | (uint)!bVar194 * auVar307._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar314._16_4_ =
                       (uint)bVar194 * auVar305._16_4_ | (uint)!bVar194 * auVar307._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar314._20_4_ =
                       (uint)bVar194 * auVar305._20_4_ | (uint)!bVar194 * auVar307._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar314._24_4_ =
                       (uint)bVar194 * auVar305._24_4_ | (uint)!bVar194 * auVar307._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar314._28_4_ =
                       (uint)bVar194 * auVar305._28_4_ | (uint)!bVar194 * auVar307._28_4_;
                  bVar194 = (bool)(bVar27 & 1);
                  auVar314._32_4_ =
                       (uint)bVar194 * auVar305._32_4_ | (uint)!bVar194 * auVar307._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar314._36_4_ =
                       (uint)bVar194 * auVar305._36_4_ | (uint)!bVar194 * auVar307._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar314._40_4_ =
                       (uint)bVar194 * auVar305._40_4_ | (uint)!bVar194 * auVar307._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar314._44_4_ =
                       (uint)bVar194 * auVar305._44_4_ | (uint)!bVar194 * auVar307._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar314._48_4_ =
                       (uint)bVar194 * auVar305._48_4_ | (uint)!bVar194 * auVar307._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar314._52_4_ =
                       (uint)bVar194 * auVar305._52_4_ | (uint)!bVar194 * auVar307._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar314._56_4_ =
                       (uint)bVar194 * auVar305._56_4_ | (uint)!bVar194 * auVar307._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar314._60_4_ =
                       (uint)bVar194 * auVar305._60_4_ | (uint)!bVar194 * auVar307._60_4_;
                  auVar305 = vfmadd231ps_avx512f(auVar308,auVar314,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar305 = vfmadd231ps_avx512f(auVar305,auVar356,auVar306);
                  auVar305 = vfmadd231ps_avx512f(auVar305,auVar314,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar305 = vmulps_avx512f(auVar305,auVar303);
                  auVar306 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar194 = (bool)((byte)uVar169 & 1);
                  auVar315._0_4_ = (uint)bVar194 * auVar306._0_4_ | (uint)!bVar194 * auVar305._0_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                  auVar315._4_4_ = (uint)bVar194 * auVar306._4_4_ | (uint)!bVar194 * auVar305._4_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                  auVar315._8_4_ = (uint)bVar194 * auVar306._8_4_ | (uint)!bVar194 * auVar305._8_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                  auVar315._12_4_ =
                       (uint)bVar194 * auVar306._12_4_ | (uint)!bVar194 * auVar305._12_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                  auVar315._16_4_ =
                       (uint)bVar194 * auVar306._16_4_ | (uint)!bVar194 * auVar305._16_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                  auVar315._20_4_ =
                       (uint)bVar194 * auVar306._20_4_ | (uint)!bVar194 * auVar305._20_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                  auVar315._24_4_ =
                       (uint)bVar194 * auVar306._24_4_ | (uint)!bVar194 * auVar305._24_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 7) & 1);
                  auVar315._28_4_ =
                       (uint)bVar194 * auVar306._28_4_ | (uint)!bVar194 * auVar305._28_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 8) & 1);
                  auVar315._32_4_ =
                       (uint)bVar194 * auVar306._32_4_ | (uint)!bVar194 * auVar305._32_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 9) & 1);
                  auVar315._36_4_ =
                       (uint)bVar194 * auVar306._36_4_ | (uint)!bVar194 * auVar305._36_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 10) & 1);
                  auVar315._40_4_ =
                       (uint)bVar194 * auVar306._40_4_ | (uint)!bVar194 * auVar305._40_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xb) & 1);
                  auVar315._44_4_ =
                       (uint)bVar194 * auVar306._44_4_ | (uint)!bVar194 * auVar305._44_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xc) & 1);
                  auVar315._48_4_ =
                       (uint)bVar194 * auVar306._48_4_ | (uint)!bVar194 * auVar305._48_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xd) & 1);
                  auVar315._52_4_ =
                       (uint)bVar194 * auVar306._52_4_ | (uint)!bVar194 * auVar305._52_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xe) & 1);
                  auVar315._56_4_ =
                       (uint)bVar194 * auVar306._56_4_ | (uint)!bVar194 * auVar305._56_4_;
                  bVar194 = SUB81(uVar169 >> 0xf,0);
                  auVar315._60_4_ =
                       (uint)bVar194 * auVar306._60_4_ | (uint)!bVar194 * auVar305._60_4_;
                  auVar305 = vminps_avx512f(auVar315,(undefined1  [64])afVar139);
                  auVar305 = vmaxps_avx512f(auVar305,(undefined1  [64])afVar140);
                  auVar306 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar305,
                                                 (undefined1  [64])afVar147);
                  auVar307 = vrndscaleps_avx512f(auVar306,1);
                  uVar168 = vcmpps_avx512f(auVar306,auVar307,1);
                  auVar306 = vsubps_avx512f(auVar307,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  in_ZMM16._0_4_ = (uint)bVar194 * auVar306._0_4_ | (uint)!bVar194 * auVar307._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar194 * auVar306._4_4_ | (uint)!bVar194 * auVar307._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar194 * auVar306._8_4_ | (uint)!bVar194 * auVar307._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  in_ZMM16._12_4_ =
                       (uint)bVar194 * auVar306._12_4_ | (uint)!bVar194 * auVar307._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  in_ZMM16._16_4_ =
                       (uint)bVar194 * auVar306._16_4_ | (uint)!bVar194 * auVar307._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  in_ZMM16._20_4_ =
                       (uint)bVar194 * auVar306._20_4_ | (uint)!bVar194 * auVar307._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  in_ZMM16._24_4_ =
                       (uint)bVar194 * auVar306._24_4_ | (uint)!bVar194 * auVar307._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  in_ZMM16._28_4_ =
                       (uint)bVar194 * auVar306._28_4_ | (uint)!bVar194 * auVar307._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  in_ZMM16._32_4_ =
                       (uint)bVar194 * auVar306._32_4_ | (uint)!bVar194 * auVar307._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  in_ZMM16._36_4_ =
                       (uint)bVar194 * auVar306._36_4_ | (uint)!bVar194 * auVar307._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  in_ZMM16._40_4_ =
                       (uint)bVar194 * auVar306._40_4_ | (uint)!bVar194 * auVar307._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  in_ZMM16._44_4_ =
                       (uint)bVar194 * auVar306._44_4_ | (uint)!bVar194 * auVar307._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  in_ZMM16._48_4_ =
                       (uint)bVar194 * auVar306._48_4_ | (uint)!bVar194 * auVar307._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  in_ZMM16._52_4_ =
                       (uint)bVar194 * auVar306._52_4_ | (uint)!bVar194 * auVar307._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  in_ZMM16._56_4_ =
                       (uint)bVar194 * auVar306._56_4_ | (uint)!bVar194 * auVar307._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  in_ZMM16._60_4_ =
                       (uint)bVar194 * auVar306._60_4_ | (uint)!bVar194 * auVar307._60_4_;
                  auVar305 = vfmadd231ps_avx512f(auVar305,in_ZMM16,auVar353);
                  auVar305 = vfmadd231ps_avx512f(auVar305,in_ZMM16,auVar354);
                  auVar306 = vmulps_avx512f(auVar305,auVar305);
                  auVar307 = vfmadd213ps_avx512f(auVar305,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar144);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar145);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar146);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar147);
                  auVar305 = vfmadd213ps_avx512f(auVar307,auVar306,auVar305);
                  auVar305 = vaddps_avx512f(auVar305,(undefined1  [64])afVar138);
                  auVar306 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar306 = vpaddd_avx512f(auVar306,auVar355);
                  auVar306 = vpslld_avx512f(auVar306,0x17);
                  in_ZMM8 = vfmadd213ps_avx512f(auVar306,auVar305,auVar357);
                  auVar305 = vdivps_avx512f(auVar357,in_ZMM8);
                  auVar305 = vfnmsub213ps_avx512f(auVar305,auVar303,auVar357);
                  goto LAB_0028b76f;
                case 6:
                  puVar1 = (uint *)(this->super_Deconvolution).activation_params.data;
                  auVar305 = vbroadcastss_avx512f(ZEXT416(*puVar1));
                  uVar181 = puVar1[1];
                  auVar311._4_4_ = uVar181;
                  auVar311._0_4_ = uVar181;
                  auVar311._8_4_ = uVar181;
                  auVar311._12_4_ = uVar181;
                  auVar311._16_4_ = uVar181;
                  auVar311._20_4_ = uVar181;
                  auVar311._24_4_ = uVar181;
                  auVar311._28_4_ = uVar181;
                  auVar311._32_4_ = uVar181;
                  auVar311._36_4_ = uVar181;
                  auVar311._40_4_ = uVar181;
                  auVar311._44_4_ = uVar181;
                  auVar311._48_4_ = uVar181;
                  auVar311._52_4_ = uVar181;
                  auVar311._56_4_ = uVar181;
                  auVar311._60_4_ = uVar181;
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar304,auVar311);
                  auVar305 = vmaxps_avx512f(auVar305,in_ZMM29);
                  auVar305 = vminps_avx512f(auVar305,auVar357);
LAB_0028b76f:
                  auVar304 = vmulps_avx512f(auVar305,auVar304);
                }
                *pauVar188 = auVar304;
                pauVar188 = pauVar188 + 1;
                uVar173 = uVar173 + 1;
                iVar192 = iVar192 + 1;
              } while (uVar173 != local_228.w);
            }
            iVar170 = iVar170 + 1;
          } while (iVar170 != local_228.h);
        }
        local_2e8 = local_2e8 + 1;
      } while (local_2e8 != (long)local_228.c);
    }
    if ((local_158._0_4_ == 0x10) && (uVar177 == 8)) {
      if ((long)local_228.c < 1) goto LAB_002922db;
      iVar8 = (this->super_Deconvolution).dilation_w;
      iVar9 = (this->super_Deconvolution).dilation_h;
      iVar156 = (this->super_Deconvolution).stride_w;
      iVar171 = (this->super_Deconvolution).stride_h;
      iVar191 = (this->super_Deconvolution).activation_type;
      pvVar16 = (this->super_Deconvolution).bias_data.data;
      uVar179 = (this->super_Deconvolution).kernel_w;
      uVar167 = (this->super_Deconvolution).kernel_h;
      local_2e8 = 0;
      auVar273._8_4_ = 0x42b0c0a5;
      auVar273._0_8_ = 0x42b0c0a542b0c0a5;
      auVar273._12_4_ = 0x42b0c0a5;
      auVar273._16_4_ = 0x42b0c0a5;
      auVar273._20_4_ = 0x42b0c0a5;
      auVar273._24_4_ = 0x42b0c0a5;
      auVar273._28_4_ = 0x42b0c0a5;
      auVar274._8_4_ = 0xc2b0c0a5;
      auVar274._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar274._12_4_ = 0xc2b0c0a5;
      auVar274._16_4_ = 0xc2b0c0a5;
      auVar274._20_4_ = 0xc2b0c0a5;
      auVar274._24_4_ = 0xc2b0c0a5;
      auVar274._28_4_ = 0xc2b0c0a5;
      auVar275._8_4_ = 0x3f000000;
      auVar275._0_8_ = 0x3f0000003f000000;
      auVar275._12_4_ = 0x3f000000;
      auVar275._16_4_ = 0x3f000000;
      auVar275._20_4_ = 0x3f000000;
      auVar275._24_4_ = 0x3f000000;
      auVar275._28_4_ = 0x3f000000;
      auVar276._8_4_ = 0x3fb8aa3b;
      auVar276._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar276._12_4_ = 0x3fb8aa3b;
      auVar276._16_4_ = 0x3fb8aa3b;
      auVar276._20_4_ = 0x3fb8aa3b;
      auVar276._24_4_ = 0x3fb8aa3b;
      auVar276._28_4_ = 0x3fb8aa3b;
      auVar277._8_4_ = 0x3f800000;
      auVar277._0_8_ = 0x3f8000003f800000;
      auVar277._12_4_ = 0x3f800000;
      auVar277._16_4_ = 0x3f800000;
      auVar277._20_4_ = 0x3f800000;
      auVar277._24_4_ = 0x3f800000;
      auVar277._28_4_ = 0x3f800000;
      auVar278._8_4_ = 0x3f318000;
      auVar278._0_8_ = 0x3f3180003f318000;
      auVar278._12_4_ = 0x3f318000;
      auVar278._16_4_ = 0x3f318000;
      auVar278._20_4_ = 0x3f318000;
      auVar278._24_4_ = 0x3f318000;
      auVar278._28_4_ = 0x3f318000;
      auVar251 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar279._8_4_ = 0x3ab743ce;
      auVar279._0_8_ = 0x3ab743ce3ab743ce;
      auVar279._12_4_ = 0x3ab743ce;
      auVar279._16_4_ = 0x3ab743ce;
      auVar279._20_4_ = 0x3ab743ce;
      auVar279._24_4_ = 0x3ab743ce;
      auVar279._28_4_ = 0x3ab743ce;
      auVar280._8_4_ = 0x3c088908;
      auVar280._0_8_ = 0x3c0889083c088908;
      auVar280._12_4_ = 0x3c088908;
      auVar280._16_4_ = 0x3c088908;
      auVar280._20_4_ = 0x3c088908;
      auVar280._24_4_ = 0x3c088908;
      auVar280._28_4_ = 0x3c088908;
      auVar281._8_4_ = 0x3d2aa9c1;
      auVar281._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar281._12_4_ = 0x3d2aa9c1;
      auVar281._16_4_ = 0x3d2aa9c1;
      auVar281._20_4_ = 0x3d2aa9c1;
      auVar281._24_4_ = 0x3d2aa9c1;
      auVar281._28_4_ = 0x3d2aa9c1;
      auVar282._8_4_ = 0x3e2aaaaa;
      auVar282._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar282._12_4_ = 0x3e2aaaaa;
      auVar282._16_4_ = 0x3e2aaaaa;
      auVar282._20_4_ = 0x3e2aaaaa;
      auVar282._24_4_ = 0x3e2aaaaa;
      auVar282._28_4_ = 0x3e2aaaaa;
      auVar283._8_4_ = 0x3f800000;
      auVar283._0_8_ = 0x3f8000003f800000;
      auVar283._12_4_ = 0x3f800000;
      auVar283._16_4_ = 0x3f800000;
      auVar283._20_4_ = 0x3f800000;
      auVar283._24_4_ = 0x3f800000;
      auVar283._28_4_ = 0x3f800000;
      auVar284._8_4_ = 0xb95e8083;
      auVar284._0_8_ = 0xb95e8083b95e8083;
      auVar284._12_4_ = 0xb95e8083;
      auVar284._16_4_ = 0xb95e8083;
      auVar284._20_4_ = 0xb95e8083;
      auVar284._24_4_ = 0xb95e8083;
      auVar284._28_4_ = 0xb95e8083;
      auVar252 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        local_1a8._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar180 = bottom_blob->w;
          iVar190 = bottom_blob->h;
          pauVar189 = (undefined1 (*) [32])
                      (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
          uVar165 = bottom_blob->c;
          iVar170 = 0;
          do {
            if (0 < local_228.w) {
              uVar173 = 0;
              iVar192 = (1 - uVar179) * iVar8;
              do {
                if (pvVar16 == (void *)0x0) {
                  auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar352 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar16 + local_2e8 * 0x20));
                }
                if (0 < (int)uVar165) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar11 = bottom_blob->data;
                  uVar168 = 0;
                  do {
                    if (0 < (int)uVar167) {
                      uVar169 = 0;
                      uVar174 = 0;
                      do {
                        iVar157 = (((int)uVar174 - uVar167) + 1) * iVar9 + iVar170;
                        if ((((-1 < iVar157) &&
                             (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                            (0 < (int)uVar179)) && (iVar158 < iVar190)) {
                          lVar186 = (long)iVar158 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar168;
                          uVar178 = (ulong)uVar179;
                          uVar183 = uVar169;
                          iVar157 = iVar192;
                          do {
                            if (((-1 < iVar157) &&
                                (iVar158 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                               (iVar158 < iVar180)) {
                              lVar161 = (long)(iVar158 << 4);
                              uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186);
                              auVar460._4_4_ = uVar2;
                              auVar460._0_4_ = uVar2;
                              auVar460._8_4_ = uVar2;
                              auVar460._12_4_ = uVar2;
                              auVar460._16_4_ = uVar2;
                              auVar460._20_4_ = uVar2;
                              auVar460._24_4_ = uVar2;
                              auVar460._28_4_ = uVar2;
                              in_ZMM8 = ZEXT3264(auVar460);
                              uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186 + 4);
                              auVar458._4_4_ = uVar2;
                              auVar458._0_4_ = uVar2;
                              auVar458._8_4_ = uVar2;
                              auVar458._12_4_ = uVar2;
                              auVar458._16_4_ = uVar2;
                              auVar458._20_4_ = uVar2;
                              auVar458._24_4_ = uVar2;
                              auVar458._28_4_ = uVar2;
                              auVar253 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 8)));
                              in_ZMM16 = ZEXT3264(auVar253);
                              auVar254 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0xc)));
                              auVar255 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x10)))
                              ;
                              auVar256 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x14)))
                              ;
                              auVar257 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x18)))
                              ;
                              auVar258 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x1c)))
                              ;
                              auVar259 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x20)))
                              ;
                              auVar260 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x24)))
                              ;
                              auVar261 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x28)))
                              ;
                              auVar262 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x2c)))
                              ;
                              auVar263 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x30)))
                              ;
                              auVar264 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x34)))
                              ;
                              in_ZMM29 = ZEXT3264(auVar264);
                              auVar265 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x38)))
                              ;
                              auVar266 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x3c)))
                              ;
                              uVar196 = uVar183 & 0xffffffff;
                              auVar198 = vfmadd231ps_fma(auVar352._0_32_,auVar460,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar176 + uVar196 * 4));
                              auVar198 = vfmadd231ps_fma(ZEXT1632(auVar198),auVar458,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar176 + uVar196 * 4 + 0x20));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (ZEXT1632(auVar198),auVar253,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x40));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar254,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x60));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar255,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x80));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar256,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0xa0));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar257,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0xc0));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar258,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0xe0));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar259,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x100));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar260,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x120));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar261,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x140));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar262,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x160));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar263,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x180));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar264,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x1a0));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar265,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x1c0));
                              auVar253 = vfmadd231ps_avx512vl
                                                   (auVar253,auVar266,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x1e0));
                              auVar352 = ZEXT3264(auVar253);
                            }
                            uVar183 = uVar183 + 0x80;
                            iVar157 = iVar157 + iVar8;
                            uVar178 = uVar178 - 1;
                          } while (uVar178 != 0);
                        }
                        uVar174 = uVar174 + 1;
                        uVar169 = uVar169 + (ulong)uVar179 * 0x80;
                      } while (uVar174 != uVar167);
                    }
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar179 * uVar167 * 0x80) * 4);
                    uVar168 = uVar168 + 1;
                  } while (uVar168 != uVar165);
                }
                auVar253 = auVar352._0_32_;
                auVar254 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                switch(iVar191) {
                case 1:
                  auVar253 = vmaxps_avx(auVar253,auVar254);
                  break;
                case 2:
                  auVar255 = vmaxps_avx(auVar253,auVar254);
                  in_ZMM8 = ZEXT3264(auVar255);
                  auVar253 = vminps_avx(auVar253,auVar254);
                  uVar2 = *(this->super_Deconvolution).activation_params.data;
                  auVar88._4_4_ = uVar2;
                  auVar88._0_4_ = uVar2;
                  auVar88._8_4_ = uVar2;
                  auVar88._12_4_ = uVar2;
                  auVar88._16_4_ = uVar2;
                  auVar88._20_4_ = uVar2;
                  auVar88._24_4_ = uVar2;
                  auVar88._28_4_ = uVar2;
                  auVar253 = vfmadd132ps_avx512vl(auVar253,auVar255,auVar88);
                  break;
                case 3:
                  puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar2 = *puVar12;
                  auVar86._4_4_ = uVar2;
                  auVar86._0_4_ = uVar2;
                  auVar86._8_4_ = uVar2;
                  auVar86._12_4_ = uVar2;
                  auVar86._16_4_ = uVar2;
                  auVar86._20_4_ = uVar2;
                  auVar86._24_4_ = uVar2;
                  auVar86._28_4_ = uVar2;
                  auVar253 = vmaxps_avx512vl(auVar253,auVar86);
                  uVar2 = puVar12[1];
                  auVar87._4_4_ = uVar2;
                  auVar87._0_4_ = uVar2;
                  auVar87._8_4_ = uVar2;
                  auVar87._12_4_ = uVar2;
                  auVar87._16_4_ = uVar2;
                  auVar87._20_4_ = uVar2;
                  auVar87._24_4_ = uVar2;
                  auVar87._28_4_ = uVar2;
                  auVar253 = vminps_avx512vl(auVar253,auVar87);
                  break;
                case 4:
                  auVar84._8_4_ = 0x80000000;
                  auVar84._0_8_ = 0x8000000080000000;
                  auVar84._12_4_ = 0x80000000;
                  auVar84._16_4_ = 0x80000000;
                  auVar84._20_4_ = 0x80000000;
                  auVar84._24_4_ = 0x80000000;
                  auVar84._28_4_ = 0x80000000;
                  auVar253 = vxorps_avx512vl(auVar253,auVar84);
                  auVar253 = vminps_avx(auVar253,auVar273);
                  auVar253 = vmaxps_avx(auVar253,auVar274);
                  auVar198 = vfmadd231ps_fma(auVar275,auVar253,auVar276);
                  auVar254 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                  uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar254,1);
                  auVar255 = vsubps_avx512vl(auVar254,auVar277);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar272._0_4_ = (uint)bVar194 * auVar255._0_4_ | (uint)!bVar194 * auVar254._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar272._4_4_ = (uint)bVar194 * auVar255._4_4_ | (uint)!bVar194 * auVar254._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar272._8_4_ = (uint)bVar194 * auVar255._8_4_ | (uint)!bVar194 * auVar254._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar272._12_4_ =
                       (uint)bVar194 * auVar255._12_4_ | (uint)!bVar194 * auVar254._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar272._16_4_ =
                       (uint)bVar194 * auVar255._16_4_ | (uint)!bVar194 * auVar254._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar272._20_4_ =
                       (uint)bVar194 * auVar255._20_4_ | (uint)!bVar194 * auVar254._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar272._24_4_ =
                       (uint)bVar194 * auVar255._24_4_ | (uint)!bVar194 * auVar254._24_4_;
                  bVar194 = SUB81(uVar168 >> 7,0);
                  auVar272._28_4_ =
                       (uint)bVar194 * auVar255._28_4_ | (uint)!bVar194 * auVar254._28_4_;
                  in_ZMM16 = ZEXT3264(auVar272);
                  auVar253 = vfmsub231ps_avx512vl(auVar253,auVar272,auVar278);
                  auVar85._8_4_ = 0x395e8083;
                  auVar85._0_8_ = 0x395e8083395e8083;
                  auVar85._12_4_ = 0x395e8083;
                  auVar85._16_4_ = 0x395e8083;
                  auVar85._20_4_ = 0x395e8083;
                  auVar85._24_4_ = 0x395e8083;
                  auVar85._28_4_ = 0x395e8083;
                  auVar253 = vfmsub231ps_avx512vl(auVar253,auVar272,auVar85);
                  auVar436._0_4_ = auVar253._0_4_ * auVar253._0_4_;
                  auVar436._4_4_ = auVar253._4_4_ * auVar253._4_4_;
                  auVar436._8_4_ = auVar253._8_4_ * auVar253._8_4_;
                  auVar436._12_4_ = auVar253._12_4_ * auVar253._12_4_;
                  auVar436._16_4_ = auVar253._16_4_ * auVar253._16_4_;
                  auVar436._20_4_ = auVar253._20_4_ * auVar253._20_4_;
                  auVar436._24_4_ = auVar253._24_4_ * auVar253._24_4_;
                  auVar436._28_4_ = 0;
                  auVar198 = vfmadd213ps_fma(auVar251,auVar253,auVar279);
                  auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar253,auVar280);
                  auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar253,auVar281);
                  auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar253,auVar282);
                  auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar253,auVar275);
                  auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar436,auVar253);
                  auVar379._0_4_ = auVar198._0_4_ + 1.0;
                  auVar379._4_4_ = auVar198._4_4_ + 1.0;
                  auVar379._8_4_ = auVar198._8_4_ + 1.0;
                  auVar379._12_4_ = auVar198._12_4_ + 1.0;
                  auVar379._16_4_ = 0x3f800000;
                  auVar379._20_4_ = 0x3f800000;
                  auVar379._24_4_ = 0x3f800000;
                  auVar379._28_4_ = 0x3f800000;
                  auVar253 = vcvttps2dq_avx512vl(auVar272);
                  auVar253 = vpslld_avx2(auVar253,0x17);
                  auVar253 = vpaddd_avx2(auVar253,auVar283);
                  auVar198 = vfmadd213ps_fma(auVar253,auVar379,auVar277);
                  in_ZMM8 = ZEXT1664(auVar198);
                  auVar253 = vdivps_avx(auVar277,ZEXT1632(auVar198));
                  break;
                case 5:
                  auVar253 = vminps_avx(auVar253,auVar273);
                  auVar253 = vmaxps_avx(auVar253,auVar274);
                  auVar198 = vfmadd213ps_fma(auVar276,auVar253,auVar275);
                  auVar255 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                  uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar255,1);
                  auVar256 = vsubps_avx512vl(auVar255,auVar277);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar267._0_4_ = (uint)bVar194 * auVar256._0_4_ | (uint)!bVar194 * auVar255._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar267._4_4_ = (uint)bVar194 * auVar256._4_4_ | (uint)!bVar194 * auVar255._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar267._8_4_ = (uint)bVar194 * auVar256._8_4_ | (uint)!bVar194 * auVar255._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar267._12_4_ =
                       (uint)bVar194 * auVar256._12_4_ | (uint)!bVar194 * auVar255._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar267._16_4_ =
                       (uint)bVar194 * auVar256._16_4_ | (uint)!bVar194 * auVar255._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar267._20_4_ =
                       (uint)bVar194 * auVar256._20_4_ | (uint)!bVar194 * auVar255._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar267._24_4_ =
                       (uint)bVar194 * auVar256._24_4_ | (uint)!bVar194 * auVar255._24_4_;
                  bVar194 = SUB81(uVar168 >> 7,0);
                  auVar267._28_4_ =
                       (uint)bVar194 * auVar256._28_4_ | (uint)!bVar194 * auVar255._28_4_;
                  auVar253 = vfmsub231ps_avx512vl(auVar253,auVar267,auVar278);
                  auVar253 = vfnmsub231ps_avx512vl(auVar253,auVar267,auVar284);
                  auVar459._0_4_ = auVar253._0_4_ * auVar253._0_4_;
                  auVar459._4_4_ = auVar253._4_4_ * auVar253._4_4_;
                  auVar459._8_4_ = auVar253._8_4_ * auVar253._8_4_;
                  auVar459._12_4_ = auVar253._12_4_ * auVar253._12_4_;
                  auVar459._16_4_ = auVar253._16_4_ * auVar253._16_4_;
                  auVar459._20_4_ = auVar253._20_4_ * auVar253._20_4_;
                  auVar459._24_4_ = auVar253._24_4_ * auVar253._24_4_;
                  auVar459._28_4_ = 0;
                  auVar255 = vfmadd213ps_avx512vl(auVar251,auVar253,auVar279);
                  auVar255 = vfmadd213ps_avx512vl(auVar255,auVar253,auVar280);
                  auVar255 = vfmadd213ps_avx512vl(auVar255,auVar253,auVar281);
                  auVar255 = vfmadd213ps_avx512vl(auVar255,auVar253,auVar282);
                  auVar255 = vfmadd213ps_avx512vl(auVar255,auVar253,auVar275);
                  auVar253 = vfmadd213ps_avx512vl(auVar255,auVar459,auVar253);
                  auVar255 = vaddps_avx512vl(auVar253,auVar277);
                  auVar253 = vcvttps2dq_avx512vl(auVar267);
                  auVar253 = vpslld_avx2(auVar253,0x17);
                  auVar253 = vpaddd_avx2(auVar253,auVar283);
                  auVar198 = vfmadd213ps_fma(auVar253,auVar255,auVar277);
                  uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar254,2);
                  auVar253._8_4_ = 0x800000;
                  auVar253._0_8_ = 0x80000000800000;
                  auVar253._12_4_ = 0x800000;
                  auVar253._16_4_ = 0x800000;
                  auVar253._20_4_ = 0x800000;
                  auVar253._24_4_ = 0x800000;
                  auVar253._28_4_ = 0x800000;
                  auVar253 = vmaxps_avx512vl(ZEXT1632(auVar198),auVar253);
                  auVar460 = vpsrld_avx2(auVar253,0x17);
                  auVar255 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar254._8_4_ = 0x3f000000;
                  auVar254._0_8_ = 0x3f0000003f000000;
                  auVar254._12_4_ = 0x3f000000;
                  auVar254._16_4_ = 0x3f000000;
                  auVar254._20_4_ = 0x3f000000;
                  auVar254._24_4_ = 0x3f000000;
                  auVar254._28_4_ = 0x3f000000;
                  auVar253 = vpternlogd_avx512vl(auVar253,auVar255,auVar254,0xea);
                  auVar257._8_4_ = 0x3f3504f3;
                  auVar257._0_8_ = 0x3f3504f33f3504f3;
                  auVar257._12_4_ = 0x3f3504f3;
                  auVar257._16_4_ = 0x3f3504f3;
                  auVar257._20_4_ = 0x3f3504f3;
                  auVar257._24_4_ = 0x3f3504f3;
                  auVar257._28_4_ = 0x3f3504f3;
                  uVar169 = vcmpps_avx512vl(auVar253,auVar257,1);
                  auVar254 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                  auVar255 = vaddps_avx512vl(auVar253,auVar254);
                  auVar253 = vaddps_avx512vl(auVar255,auVar253);
                  bVar194 = (bool)((byte)uVar169 & 1);
                  auVar268._0_4_ = (uint)bVar194 * auVar253._0_4_ | (uint)!bVar194 * auVar255._0_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                  auVar268._4_4_ = (uint)bVar194 * auVar253._4_4_ | (uint)!bVar194 * auVar255._4_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                  auVar268._8_4_ = (uint)bVar194 * auVar253._8_4_ | (uint)!bVar194 * auVar255._8_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                  auVar268._12_4_ =
                       (uint)bVar194 * auVar253._12_4_ | (uint)!bVar194 * auVar255._12_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                  auVar268._16_4_ =
                       (uint)bVar194 * auVar253._16_4_ | (uint)!bVar194 * auVar255._16_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                  auVar268._20_4_ =
                       (uint)bVar194 * auVar253._20_4_ | (uint)!bVar194 * auVar255._20_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                  auVar268._24_4_ =
                       (uint)bVar194 * auVar253._24_4_ | (uint)!bVar194 * auVar255._24_4_;
                  bVar194 = SUB81(uVar169 >> 7,0);
                  auVar268._28_4_ =
                       (uint)bVar194 * auVar253._28_4_ | (uint)!bVar194 * auVar255._28_4_;
                  auVar255 = vmulps_avx512vl(auVar268,auVar268);
                  auVar253 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                  auVar258._8_4_ = 0xbdebd1b8;
                  auVar258._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar258._12_4_ = 0xbdebd1b8;
                  auVar258._16_4_ = 0xbdebd1b8;
                  auVar258._20_4_ = 0xbdebd1b8;
                  auVar258._24_4_ = 0xbdebd1b8;
                  auVar258._28_4_ = 0xbdebd1b8;
                  auVar253 = vfmadd213ps_avx512vl(auVar253,auVar268,auVar258);
                  auVar259._8_4_ = 0x3def251a;
                  auVar259._0_8_ = 0x3def251a3def251a;
                  auVar259._12_4_ = 0x3def251a;
                  auVar259._16_4_ = 0x3def251a;
                  auVar259._20_4_ = 0x3def251a;
                  auVar259._24_4_ = 0x3def251a;
                  auVar259._28_4_ = 0x3def251a;
                  auVar253 = vfmadd213ps_avx512vl(auVar253,auVar268,auVar259);
                  auVar260._8_4_ = 0xbdfe5d4f;
                  auVar260._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar260._12_4_ = 0xbdfe5d4f;
                  auVar260._16_4_ = 0xbdfe5d4f;
                  auVar260._20_4_ = 0xbdfe5d4f;
                  auVar260._24_4_ = 0xbdfe5d4f;
                  auVar260._28_4_ = 0xbdfe5d4f;
                  auVar253 = vfmadd213ps_avx512vl(auVar253,auVar268,auVar260);
                  auVar261._8_4_ = 0x3e11e9bf;
                  auVar261._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar261._12_4_ = 0x3e11e9bf;
                  auVar261._16_4_ = 0x3e11e9bf;
                  auVar261._20_4_ = 0x3e11e9bf;
                  auVar261._24_4_ = 0x3e11e9bf;
                  auVar261._28_4_ = 0x3e11e9bf;
                  auVar253 = vfmadd213ps_avx512vl(auVar253,auVar268,auVar261);
                  auVar262._8_4_ = 0xbe2aae50;
                  auVar262._0_8_ = 0xbe2aae50be2aae50;
                  auVar262._12_4_ = 0xbe2aae50;
                  auVar262._16_4_ = 0xbe2aae50;
                  auVar262._20_4_ = 0xbe2aae50;
                  auVar262._24_4_ = 0xbe2aae50;
                  auVar262._28_4_ = 0xbe2aae50;
                  auVar253 = vfmadd213ps_avx512vl(auVar253,auVar268,auVar262);
                  auVar263._8_4_ = 0x3e4cceac;
                  auVar263._0_8_ = 0x3e4cceac3e4cceac;
                  auVar263._12_4_ = 0x3e4cceac;
                  auVar263._16_4_ = 0x3e4cceac;
                  auVar263._20_4_ = 0x3e4cceac;
                  auVar263._24_4_ = 0x3e4cceac;
                  auVar263._28_4_ = 0x3e4cceac;
                  auVar253 = vfmadd213ps_avx512vl(auVar253,auVar268,auVar263);
                  auVar264._8_4_ = 0xbe7ffffc;
                  auVar264._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar264._12_4_ = 0xbe7ffffc;
                  auVar264._16_4_ = 0xbe7ffffc;
                  auVar264._20_4_ = 0xbe7ffffc;
                  auVar264._24_4_ = 0xbe7ffffc;
                  auVar264._28_4_ = 0xbe7ffffc;
                  auVar253 = vfmadd213ps_avx512vl(auVar253,auVar268,auVar264);
                  auVar265._8_4_ = 0x3eaaaaaa;
                  auVar265._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar265._12_4_ = 0x3eaaaaaa;
                  auVar265._16_4_ = 0x3eaaaaaa;
                  auVar265._20_4_ = 0x3eaaaaaa;
                  auVar265._24_4_ = 0x3eaaaaaa;
                  auVar265._28_4_ = 0x3eaaaaaa;
                  auVar253 = vfmadd213ps_avx512vl(auVar253,auVar268,auVar265);
                  auVar256 = vmulps_avx512vl(auVar255,auVar268);
                  auVar256 = vmulps_avx512vl(auVar256,auVar253);
                  auVar266._8_4_ = 0xffffff82;
                  auVar266._0_8_ = 0xffffff82ffffff82;
                  auVar266._12_4_ = 0xffffff82;
                  auVar266._16_4_ = 0xffffff82;
                  auVar266._20_4_ = 0xffffff82;
                  auVar266._24_4_ = 0xffffff82;
                  auVar266._28_4_ = 0xffffff82;
                  auVar253 = vpaddd_avx512vl(auVar460,auVar266);
                  auVar253 = vcvtdq2ps_avx(auVar253);
                  auVar257 = vsubps_avx512vl(auVar253,auVar277);
                  bVar194 = (bool)((byte)uVar169 & 1);
                  auVar269._0_4_ = (uint)bVar194 * auVar257._0_4_ | (uint)!bVar194 * auVar253._0_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                  auVar269._4_4_ = (uint)bVar194 * auVar257._4_4_ | (uint)!bVar194 * auVar253._4_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                  auVar269._8_4_ = (uint)bVar194 * auVar257._8_4_ | (uint)!bVar194 * auVar253._8_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                  auVar269._12_4_ =
                       (uint)bVar194 * auVar257._12_4_ | (uint)!bVar194 * auVar253._12_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                  auVar269._16_4_ =
                       (uint)bVar194 * auVar257._16_4_ | (uint)!bVar194 * auVar253._16_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                  auVar269._20_4_ =
                       (uint)bVar194 * auVar257._20_4_ | (uint)!bVar194 * auVar253._20_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                  auVar269._24_4_ =
                       (uint)bVar194 * auVar257._24_4_ | (uint)!bVar194 * auVar253._24_4_;
                  bVar194 = SUB81(uVar169 >> 7,0);
                  auVar269._28_4_ =
                       (uint)bVar194 * auVar257._28_4_ | (uint)!bVar194 * auVar253._28_4_;
                  auVar253 = vfmadd231ps_avx512vl(auVar256,auVar269,auVar284);
                  auVar253 = vfmsub231ps_avx512vl(auVar253,auVar275,auVar255);
                  auVar253 = vsubps_avx512vl(auVar253,auVar268);
                  auVar198 = vfmsub231ps_fma(auVar253,auVar278,auVar269);
                  auVar253 = vmulps_avx512vl(ZEXT1632(auVar198),auVar252);
                  auVar255 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar270._0_4_ = (uint)bVar194 * auVar255._0_4_ | (uint)!bVar194 * auVar253._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar270._4_4_ = (uint)bVar194 * auVar255._4_4_ | (uint)!bVar194 * auVar253._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar270._8_4_ = (uint)bVar194 * auVar255._8_4_ | (uint)!bVar194 * auVar253._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar270._12_4_ =
                       (uint)bVar194 * auVar255._12_4_ | (uint)!bVar194 * auVar253._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar270._16_4_ =
                       (uint)bVar194 * auVar255._16_4_ | (uint)!bVar194 * auVar253._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar270._20_4_ =
                       (uint)bVar194 * auVar255._20_4_ | (uint)!bVar194 * auVar253._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar270._24_4_ =
                       (uint)bVar194 * auVar255._24_4_ | (uint)!bVar194 * auVar253._24_4_;
                  bVar194 = SUB81(uVar168 >> 7,0);
                  auVar270._28_4_ =
                       (uint)bVar194 * auVar255._28_4_ | (uint)!bVar194 * auVar253._28_4_;
                  auVar253 = vminps_avx(auVar270,auVar273);
                  auVar253 = vmaxps_avx(auVar253,auVar274);
                  auVar198 = vfmadd213ps_fma(auVar276,auVar253,auVar275);
                  auVar255 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                  uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar255,1);
                  auVar256 = vsubps_avx512vl(auVar255,auVar277);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar271._0_4_ = (uint)bVar194 * auVar256._0_4_ | (uint)!bVar194 * auVar255._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar271._4_4_ = (uint)bVar194 * auVar256._4_4_ | (uint)!bVar194 * auVar255._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar271._8_4_ = (uint)bVar194 * auVar256._8_4_ | (uint)!bVar194 * auVar255._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar271._12_4_ =
                       (uint)bVar194 * auVar256._12_4_ | (uint)!bVar194 * auVar255._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar271._16_4_ =
                       (uint)bVar194 * auVar256._16_4_ | (uint)!bVar194 * auVar255._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar271._20_4_ =
                       (uint)bVar194 * auVar256._20_4_ | (uint)!bVar194 * auVar255._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar271._24_4_ =
                       (uint)bVar194 * auVar256._24_4_ | (uint)!bVar194 * auVar255._24_4_;
                  bVar194 = SUB81(uVar168 >> 7,0);
                  auVar271._28_4_ =
                       (uint)bVar194 * auVar256._28_4_ | (uint)!bVar194 * auVar255._28_4_;
                  in_ZMM16 = ZEXT3264(auVar271);
                  auVar253 = vfmsub231ps_avx512vl(auVar253,auVar271,auVar278);
                  auVar253 = vfnmsub231ps_avx512vl(auVar253,auVar271,auVar284);
                  auVar461._0_4_ = auVar253._0_4_ * auVar253._0_4_;
                  auVar461._4_4_ = auVar253._4_4_ * auVar253._4_4_;
                  auVar461._8_4_ = auVar253._8_4_ * auVar253._8_4_;
                  auVar461._12_4_ = auVar253._12_4_ * auVar253._12_4_;
                  auVar461._16_4_ = auVar253._16_4_ * auVar253._16_4_;
                  auVar461._20_4_ = auVar253._20_4_ * auVar253._20_4_;
                  auVar461._24_4_ = auVar253._24_4_ * auVar253._24_4_;
                  auVar461._28_4_ = 0;
                  auVar255 = vfmadd213ps_avx512vl(auVar251,auVar253,auVar279);
                  auVar255 = vfmadd213ps_avx512vl(auVar255,auVar253,auVar280);
                  auVar255 = vfmadd213ps_avx512vl(auVar255,auVar253,auVar281);
                  auVar255 = vfmadd213ps_avx512vl(auVar255,auVar253,auVar282);
                  auVar255 = vfmadd213ps_avx512vl(auVar255,auVar253,auVar275);
                  auVar253 = vfmadd213ps_avx512vl(auVar255,auVar461,auVar253);
                  auVar255 = vaddps_avx512vl(auVar253,auVar277);
                  auVar253 = vcvttps2dq_avx512vl(auVar271);
                  auVar253 = vpslld_avx2(auVar253,0x17);
                  auVar253 = vpaddd_avx2(auVar253,auVar283);
                  auVar198 = vfmadd213ps_fma(auVar253,auVar255,auVar277);
                  auVar253 = vdivps_avx(auVar277,ZEXT1632(auVar198));
                  auVar253 = vfnmadd213ps_avx512vl(auVar253,auVar252,auVar254);
                  goto LAB_0028bf10;
                case 6:
                  puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar2 = *puVar12;
                  auVar256._4_4_ = uVar2;
                  auVar256._0_4_ = uVar2;
                  auVar256._8_4_ = uVar2;
                  auVar256._12_4_ = uVar2;
                  auVar256._16_4_ = uVar2;
                  auVar256._20_4_ = uVar2;
                  auVar256._24_4_ = uVar2;
                  auVar256._28_4_ = uVar2;
                  uVar2 = puVar12[1];
                  auVar255._4_4_ = uVar2;
                  auVar255._0_4_ = uVar2;
                  auVar255._8_4_ = uVar2;
                  auVar255._12_4_ = uVar2;
                  auVar255._16_4_ = uVar2;
                  auVar255._20_4_ = uVar2;
                  auVar255._24_4_ = uVar2;
                  auVar255._28_4_ = uVar2;
                  auVar253 = vfmadd213ps_avx512vl(auVar256,auVar253,auVar255);
                  auVar253 = vmaxps_avx(auVar253,auVar254);
                  auVar253 = vminps_avx(auVar253,auVar277);
LAB_0028bf10:
                  in_ZMM8 = ZEXT3264(auVar253);
                  auVar353._0_4_ = auVar253._0_4_ * auVar352._0_4_;
                  auVar353._4_4_ = auVar253._4_4_ * auVar352._4_4_;
                  auVar353._8_4_ = auVar253._8_4_ * auVar352._8_4_;
                  auVar353._12_4_ = auVar253._12_4_ * auVar352._12_4_;
                  auVar353._16_4_ = auVar253._16_4_ * auVar352._16_4_;
                  auVar353._20_4_ = auVar253._20_4_ * auVar352._20_4_;
                  auVar353._28_36_ = auVar352._28_36_;
                  auVar353._24_4_ = auVar253._24_4_ * auVar352._24_4_;
                  auVar253 = auVar353._0_32_;
                }
                *pauVar189 = auVar253;
                pauVar189 = pauVar189 + 1;
                uVar173 = uVar173 + 1;
                iVar192 = iVar192 + 1;
              } while (uVar173 != local_228.w);
            }
            iVar170 = iVar170 + 1;
          } while (iVar170 != local_228.h);
        }
        local_2e8 = local_2e8 + 1;
      } while (local_2e8 != (long)local_228.c);
    }
    afVar154 = _ps512_cephes_log_p8;
    afVar153 = _ps512_cephes_log_p7;
    afVar152 = _ps512_cephes_log_p6;
    afVar151 = _ps512_cephes_log_p5;
    afVar150 = _ps512_cephes_log_p4;
    afVar149 = _ps512_cephes_log_p3;
    afVar148 = _ps512_cephes_log_p2;
    afVar147 = ::_ps512_cephes_exp_p5;
    afVar146 = ::_ps512_cephes_exp_p4;
    afVar145 = ::_ps512_cephes_exp_p3;
    afVar144 = ::_ps512_cephes_exp_p2;
    afVar143 = ::_ps512_cephes_exp_p1;
    afVar142 = ::_ps512_cephes_exp_p0;
    afVar141 = ::_ps512_cephes_LOG2EF;
    afVar140 = ::_ps512_exp_lo;
    afVar139 = ::_ps512_exp_hi;
    afVar138 = ::_ps512_1;
    if ((local_158._0_4_ == 4) && (uVar177 == 0x10)) {
      if ((long)local_228.c < 1) goto LAB_002922db;
      iVar8 = (this->super_Deconvolution).dilation_w;
      iVar9 = (this->super_Deconvolution).dilation_h;
      iVar156 = (this->super_Deconvolution).stride_w;
      iVar171 = (this->super_Deconvolution).stride_h;
      iVar191 = (this->super_Deconvolution).activation_type;
      pvVar16 = (this->super_Deconvolution).bias_data.data;
      uVar179 = (this->super_Deconvolution).kernel_w;
      uVar167 = (this->super_Deconvolution).kernel_h;
      auVar352 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar353 = vxorps_avx512dq(auVar352,(undefined1  [64])_ps512_cephes_log_q2);
      auVar354 = vxorps_avx512dq(auVar352,(undefined1  [64])_ps512_cephes_log_q1);
      auVar355 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar356 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar352);
      local_2e8 = 0;
      auVar198 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar198);
      auVar357 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar303 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        local_1a8._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar180 = bottom_blob->w;
          iVar190 = bottom_blob->h;
          pauVar188 = (undefined1 (*) [64])
                      (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
          uVar165 = bottom_blob->c;
          iVar170 = 0;
          do {
            if (0 < local_228.w) {
              uVar173 = 0;
              iVar192 = (1 - uVar179) * iVar8;
              do {
                if (pvVar16 == (void *)0x0) {
                  auVar304 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar304 = *(undefined1 (*) [64])((long)pvVar16 + local_2e8 * 0x40);
                }
                if (0 < (int)uVar165) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar11 = bottom_blob->data;
                  uVar168 = 0;
                  do {
                    if (0 < (int)uVar167) {
                      uVar169 = 0;
                      uVar174 = 0;
                      do {
                        iVar157 = (((int)uVar174 - uVar167) + 1) * iVar9 + iVar170;
                        if ((((-1 < iVar157) &&
                             (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                            (0 < (int)uVar179)) && (iVar158 < iVar190)) {
                          lVar186 = (long)iVar158 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar168;
                          uVar178 = (ulong)uVar179;
                          uVar183 = uVar169;
                          iVar157 = iVar192;
                          do {
                            if (((-1 < iVar157) &&
                                (iVar158 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                               (iVar158 < iVar180)) {
                              lVar161 = (long)(iVar158 << 2);
                              auVar305 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186)));
                              in_ZMM8 = vbroadcastss_avx512f
                                                  (ZEXT416(*(uint *)((long)pvVar11 +
                                                                    lVar161 * 4 + lVar186 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 8)));
                              auVar306 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0xc)));
                              uVar196 = uVar183 & 0xffffffff;
                              auVar304 = vfmadd231ps_avx512f(auVar304,auVar305,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4));
                              auVar304 = vfmadd231ps_avx512f(auVar304,in_ZMM8,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x40))
                              ;
                              auVar304 = vfmadd231ps_avx512f(auVar304,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0x80))
                              ;
                              auVar304 = vfmadd231ps_avx512f(auVar304,auVar306,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar196 * 4 + 0xc0))
                              ;
                            }
                            uVar183 = uVar183 + 0x40;
                            iVar157 = iVar157 + iVar8;
                            uVar178 = uVar178 - 1;
                          } while (uVar178 != 0);
                        }
                        uVar174 = uVar174 + 1;
                        uVar169 = uVar169 + (ulong)uVar179 * 0x40;
                      } while (uVar174 != uVar167);
                    }
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar179 * uVar167 * 0x40) * 4);
                    uVar168 = uVar168 + 1;
                  } while (uVar168 != uVar165);
                }
                switch(iVar191) {
                case 1:
                  auVar304 = vmaxps_avx512f(auVar304,in_ZMM29);
                  break;
                case 2:
                  uVar168 = vcmpps_avx512f(auVar304,in_ZMM29,1);
                  uVar2 = *(this->super_Deconvolution).activation_params.data;
                  auVar125._4_4_ = uVar2;
                  auVar125._0_4_ = uVar2;
                  auVar125._8_4_ = uVar2;
                  auVar125._12_4_ = uVar2;
                  auVar125._16_4_ = uVar2;
                  auVar125._20_4_ = uVar2;
                  auVar125._24_4_ = uVar2;
                  auVar125._28_4_ = uVar2;
                  auVar125._32_4_ = uVar2;
                  auVar125._36_4_ = uVar2;
                  auVar125._40_4_ = uVar2;
                  auVar125._44_4_ = uVar2;
                  auVar125._48_4_ = uVar2;
                  auVar125._52_4_ = uVar2;
                  auVar125._56_4_ = uVar2;
                  auVar125._60_4_ = uVar2;
                  auVar305 = vmulps_avx512f(auVar304,auVar125);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar321._0_4_ = (uint)bVar194 * auVar305._0_4_ | (uint)!bVar194 * auVar304._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar321._4_4_ = (uint)bVar194 * auVar305._4_4_ | (uint)!bVar194 * auVar304._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar321._8_4_ = (uint)bVar194 * auVar305._8_4_ | (uint)!bVar194 * auVar304._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar321._12_4_ =
                       (uint)bVar194 * auVar305._12_4_ | (uint)!bVar194 * auVar304._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar321._16_4_ =
                       (uint)bVar194 * auVar305._16_4_ | (uint)!bVar194 * auVar304._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar321._20_4_ =
                       (uint)bVar194 * auVar305._20_4_ | (uint)!bVar194 * auVar304._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar321._24_4_ =
                       (uint)bVar194 * auVar305._24_4_ | (uint)!bVar194 * auVar304._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar321._28_4_ =
                       (uint)bVar194 * auVar305._28_4_ | (uint)!bVar194 * auVar304._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  auVar321._32_4_ =
                       (uint)bVar194 * auVar305._32_4_ | (uint)!bVar194 * auVar304._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar321._36_4_ =
                       (uint)bVar194 * auVar305._36_4_ | (uint)!bVar194 * auVar304._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar321._40_4_ =
                       (uint)bVar194 * auVar305._40_4_ | (uint)!bVar194 * auVar304._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar321._44_4_ =
                       (uint)bVar194 * auVar305._44_4_ | (uint)!bVar194 * auVar304._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar321._48_4_ =
                       (uint)bVar194 * auVar305._48_4_ | (uint)!bVar194 * auVar304._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar321._52_4_ =
                       (uint)bVar194 * auVar305._52_4_ | (uint)!bVar194 * auVar304._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar321._56_4_ =
                       (uint)bVar194 * auVar305._56_4_ | (uint)!bVar194 * auVar304._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar321._60_4_ =
                       (uint)bVar194 * auVar305._60_4_ | (uint)!bVar194 * auVar304._60_4_;
                  auVar304 = auVar321;
                  break;
                case 3:
                  puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar2 = *puVar12;
                  auVar123._4_4_ = uVar2;
                  auVar123._0_4_ = uVar2;
                  auVar123._8_4_ = uVar2;
                  auVar123._12_4_ = uVar2;
                  auVar123._16_4_ = uVar2;
                  auVar123._20_4_ = uVar2;
                  auVar123._24_4_ = uVar2;
                  auVar123._28_4_ = uVar2;
                  auVar123._32_4_ = uVar2;
                  auVar123._36_4_ = uVar2;
                  auVar123._40_4_ = uVar2;
                  auVar123._44_4_ = uVar2;
                  auVar123._48_4_ = uVar2;
                  auVar123._52_4_ = uVar2;
                  auVar123._56_4_ = uVar2;
                  auVar123._60_4_ = uVar2;
                  auVar304 = vmaxps_avx512f(auVar304,auVar123);
                  uVar2 = puVar12[1];
                  auVar124._4_4_ = uVar2;
                  auVar124._0_4_ = uVar2;
                  auVar124._8_4_ = uVar2;
                  auVar124._12_4_ = uVar2;
                  auVar124._16_4_ = uVar2;
                  auVar124._20_4_ = uVar2;
                  auVar124._24_4_ = uVar2;
                  auVar124._28_4_ = uVar2;
                  auVar124._32_4_ = uVar2;
                  auVar124._36_4_ = uVar2;
                  auVar124._40_4_ = uVar2;
                  auVar124._44_4_ = uVar2;
                  auVar124._48_4_ = uVar2;
                  auVar124._52_4_ = uVar2;
                  auVar124._56_4_ = uVar2;
                  auVar124._60_4_ = uVar2;
                  auVar304 = vminps_avx512f(auVar304,auVar124);
                  break;
                case 4:
                  auVar304 = vxorps_avx512dq(auVar304,auVar352);
                  auVar304 = vminps_avx512f(auVar304,(undefined1  [64])afVar139);
                  auVar304 = vmaxps_avx512f(auVar304,(undefined1  [64])afVar140);
                  auVar305 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar304,
                                                 (undefined1  [64])afVar147);
                  auVar306 = vrndscaleps_avx512f(auVar305,1);
                  uVar168 = vcmpps_avx512f(auVar305,auVar306,1);
                  auVar305 = vsubps_avx512f(auVar306,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  in_ZMM8._0_4_ = (uint)bVar194 * auVar305._0_4_ | (uint)!bVar194 * auVar306._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  in_ZMM8._4_4_ = (uint)bVar194 * auVar305._4_4_ | (uint)!bVar194 * auVar306._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  in_ZMM8._8_4_ = (uint)bVar194 * auVar305._8_4_ | (uint)!bVar194 * auVar306._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  in_ZMM8._12_4_ =
                       (uint)bVar194 * auVar305._12_4_ | (uint)!bVar194 * auVar306._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  in_ZMM8._16_4_ =
                       (uint)bVar194 * auVar305._16_4_ | (uint)!bVar194 * auVar306._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  in_ZMM8._20_4_ =
                       (uint)bVar194 * auVar305._20_4_ | (uint)!bVar194 * auVar306._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  in_ZMM8._24_4_ =
                       (uint)bVar194 * auVar305._24_4_ | (uint)!bVar194 * auVar306._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  in_ZMM8._28_4_ =
                       (uint)bVar194 * auVar305._28_4_ | (uint)!bVar194 * auVar306._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  in_ZMM8._32_4_ =
                       (uint)bVar194 * auVar305._32_4_ | (uint)!bVar194 * auVar306._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  in_ZMM8._36_4_ =
                       (uint)bVar194 * auVar305._36_4_ | (uint)!bVar194 * auVar306._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  in_ZMM8._40_4_ =
                       (uint)bVar194 * auVar305._40_4_ | (uint)!bVar194 * auVar306._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  in_ZMM8._44_4_ =
                       (uint)bVar194 * auVar305._44_4_ | (uint)!bVar194 * auVar306._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  in_ZMM8._48_4_ =
                       (uint)bVar194 * auVar305._48_4_ | (uint)!bVar194 * auVar306._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  in_ZMM8._52_4_ =
                       (uint)bVar194 * auVar305._52_4_ | (uint)!bVar194 * auVar306._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  in_ZMM8._56_4_ =
                       (uint)bVar194 * auVar305._56_4_ | (uint)!bVar194 * auVar306._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  in_ZMM8._60_4_ =
                       (uint)bVar194 * auVar305._60_4_ | (uint)!bVar194 * auVar306._60_4_;
                  auVar304 = vfmadd231ps_avx512f(auVar304,in_ZMM8,auVar353);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar304,in_ZMM8,auVar354);
                  auVar304 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar305 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar305 = vfmadd213ps_avx512f(auVar305,in_ZMM16,(undefined1  [64])afVar144);
                  auVar305 = vfmadd213ps_avx512f(auVar305,in_ZMM16,(undefined1  [64])afVar145);
                  auVar305 = vfmadd213ps_avx512f(auVar305,in_ZMM16,(undefined1  [64])afVar146);
                  auVar305 = vfmadd213ps_avx512f(auVar305,in_ZMM16,(undefined1  [64])afVar147);
                  auVar304 = vfmadd213ps_avx512f(auVar305,auVar304,in_ZMM16);
                  auVar304 = vaddps_avx512f(auVar304,(undefined1  [64])afVar138);
                  auVar305 = vcvttps2dq_avx512f(in_ZMM8);
                  auVar305 = vpaddd_avx512f(auVar305,auVar355);
                  auVar305 = vpslld_avx512f(auVar305,0x17);
                  auVar304 = vfmadd213ps_avx512f(auVar305,auVar304,auVar357);
                  auVar304 = vdivps_avx512f(auVar357,auVar304);
                  break;
                case 5:
                  auVar305 = vminps_avx512f(auVar304,(undefined1  [64])afVar139);
                  auVar305 = vmaxps_avx512f(auVar305,(undefined1  [64])afVar140);
                  auVar306 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar305,
                                                 (undefined1  [64])afVar147);
                  auVar307 = vrndscaleps_avx512f(auVar306,1);
                  uVar168 = vcmpps_avx512f(auVar306,auVar307,1);
                  auVar306 = vsubps_avx512f(auVar307,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar317._0_4_ = (uint)bVar194 * auVar306._0_4_ | (uint)!bVar194 * auVar307._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar317._4_4_ = (uint)bVar194 * auVar306._4_4_ | (uint)!bVar194 * auVar307._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar317._8_4_ = (uint)bVar194 * auVar306._8_4_ | (uint)!bVar194 * auVar307._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar317._12_4_ =
                       (uint)bVar194 * auVar306._12_4_ | (uint)!bVar194 * auVar307._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar317._16_4_ =
                       (uint)bVar194 * auVar306._16_4_ | (uint)!bVar194 * auVar307._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar317._20_4_ =
                       (uint)bVar194 * auVar306._20_4_ | (uint)!bVar194 * auVar307._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar317._24_4_ =
                       (uint)bVar194 * auVar306._24_4_ | (uint)!bVar194 * auVar307._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar317._28_4_ =
                       (uint)bVar194 * auVar306._28_4_ | (uint)!bVar194 * auVar307._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  auVar317._32_4_ =
                       (uint)bVar194 * auVar306._32_4_ | (uint)!bVar194 * auVar307._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar317._36_4_ =
                       (uint)bVar194 * auVar306._36_4_ | (uint)!bVar194 * auVar307._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar317._40_4_ =
                       (uint)bVar194 * auVar306._40_4_ | (uint)!bVar194 * auVar307._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar317._44_4_ =
                       (uint)bVar194 * auVar306._44_4_ | (uint)!bVar194 * auVar307._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar317._48_4_ =
                       (uint)bVar194 * auVar306._48_4_ | (uint)!bVar194 * auVar307._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar317._52_4_ =
                       (uint)bVar194 * auVar306._52_4_ | (uint)!bVar194 * auVar307._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar317._56_4_ =
                       (uint)bVar194 * auVar306._56_4_ | (uint)!bVar194 * auVar307._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar317._60_4_ =
                       (uint)bVar194 * auVar306._60_4_ | (uint)!bVar194 * auVar307._60_4_;
                  auVar305 = vfmadd231ps_avx512f(auVar305,auVar317,auVar353);
                  auVar305 = vfmadd231ps_avx512f(auVar305,auVar317,auVar354);
                  auVar306 = vmulps_avx512f(auVar305,auVar305);
                  auVar307 = vfmadd213ps_avx512f(auVar305,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar144);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar145);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar146);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar147);
                  auVar305 = vfmadd213ps_avx512f(auVar307,auVar306,auVar305);
                  auVar305 = vaddps_avx512f(auVar305,(undefined1  [64])afVar138);
                  auVar306 = vcvttps2dq_avx512f(auVar317);
                  auVar306 = vpaddd_avx512f(auVar306,auVar355);
                  auVar306 = vpslld_avx512f(auVar306,0x17);
                  auVar305 = vfmadd213ps_avx512f(auVar306,auVar305,auVar357);
                  auVar306 = vmaxps_avx512f(auVar305,(undefined1  [64])_ps512_min_norm_pos);
                  auVar307 = vpsrld_avx512f(auVar306,0x17);
                  auVar306 = vpternlogd_avx512f(auVar306,(undefined1  [64])afVar147,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar168 = vcmpps_avx512f(auVar306,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar308 = vsubps_avx512f(auVar306,(undefined1  [64])afVar138);
                  auVar306 = vaddps_avx512f(auVar308,auVar306);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar318._0_4_ = (uint)bVar194 * auVar306._0_4_ | (uint)!bVar194 * auVar308._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar318._4_4_ = (uint)bVar194 * auVar306._4_4_ | (uint)!bVar194 * auVar308._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar318._8_4_ = (uint)bVar194 * auVar306._8_4_ | (uint)!bVar194 * auVar308._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar318._12_4_ =
                       (uint)bVar194 * auVar306._12_4_ | (uint)!bVar194 * auVar308._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar318._16_4_ =
                       (uint)bVar194 * auVar306._16_4_ | (uint)!bVar194 * auVar308._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar318._20_4_ =
                       (uint)bVar194 * auVar306._20_4_ | (uint)!bVar194 * auVar308._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar318._24_4_ =
                       (uint)bVar194 * auVar306._24_4_ | (uint)!bVar194 * auVar308._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar318._28_4_ =
                       (uint)bVar194 * auVar306._28_4_ | (uint)!bVar194 * auVar308._28_4_;
                  bVar27 = (byte)(uVar168 >> 8);
                  bVar194 = (bool)(bVar27 & 1);
                  auVar318._32_4_ =
                       (uint)bVar194 * auVar306._32_4_ | (uint)!bVar194 * auVar308._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar318._36_4_ =
                       (uint)bVar194 * auVar306._36_4_ | (uint)!bVar194 * auVar308._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar318._40_4_ =
                       (uint)bVar194 * auVar306._40_4_ | (uint)!bVar194 * auVar308._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar318._44_4_ =
                       (uint)bVar194 * auVar306._44_4_ | (uint)!bVar194 * auVar308._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar318._48_4_ =
                       (uint)bVar194 * auVar306._48_4_ | (uint)!bVar194 * auVar308._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar318._52_4_ =
                       (uint)bVar194 * auVar306._52_4_ | (uint)!bVar194 * auVar308._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar318._56_4_ =
                       (uint)bVar194 * auVar306._56_4_ | (uint)!bVar194 * auVar308._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar318._60_4_ =
                       (uint)bVar194 * auVar306._60_4_ | (uint)!bVar194 * auVar308._60_4_;
                  auVar306 = vmulps_avx512f(auVar318,auVar318);
                  auVar308 = vfmadd132ps_avx512f(auVar318,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar318,(undefined1  [64])afVar148);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar318,(undefined1  [64])afVar149);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar318,(undefined1  [64])afVar150);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar318,(undefined1  [64])afVar151);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar318,(undefined1  [64])afVar152);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar318,(undefined1  [64])afVar153);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar318,(undefined1  [64])afVar154);
                  auVar309 = vmulps_avx512f(auVar306,auVar318);
                  auVar308 = vfmadd213ps_avx512f(auVar309,auVar308,auVar318);
                  uVar169 = vcmpps_avx512f(auVar305,in_ZMM29,2);
                  auVar305 = vpsubd_avx512f(auVar307,auVar355);
                  auVar305 = vcvtdq2ps_avx512f(auVar305);
                  auVar307 = vaddps_avx512f(auVar305,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar319._0_4_ = (uint)bVar194 * auVar305._0_4_ | (uint)!bVar194 * auVar307._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar319._4_4_ = (uint)bVar194 * auVar305._4_4_ | (uint)!bVar194 * auVar307._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar319._8_4_ = (uint)bVar194 * auVar305._8_4_ | (uint)!bVar194 * auVar307._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar319._12_4_ =
                       (uint)bVar194 * auVar305._12_4_ | (uint)!bVar194 * auVar307._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar319._16_4_ =
                       (uint)bVar194 * auVar305._16_4_ | (uint)!bVar194 * auVar307._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar319._20_4_ =
                       (uint)bVar194 * auVar305._20_4_ | (uint)!bVar194 * auVar307._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar319._24_4_ =
                       (uint)bVar194 * auVar305._24_4_ | (uint)!bVar194 * auVar307._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar319._28_4_ =
                       (uint)bVar194 * auVar305._28_4_ | (uint)!bVar194 * auVar307._28_4_;
                  bVar194 = (bool)(bVar27 & 1);
                  auVar319._32_4_ =
                       (uint)bVar194 * auVar305._32_4_ | (uint)!bVar194 * auVar307._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar319._36_4_ =
                       (uint)bVar194 * auVar305._36_4_ | (uint)!bVar194 * auVar307._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar319._40_4_ =
                       (uint)bVar194 * auVar305._40_4_ | (uint)!bVar194 * auVar307._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar319._44_4_ =
                       (uint)bVar194 * auVar305._44_4_ | (uint)!bVar194 * auVar307._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar319._48_4_ =
                       (uint)bVar194 * auVar305._48_4_ | (uint)!bVar194 * auVar307._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar319._52_4_ =
                       (uint)bVar194 * auVar305._52_4_ | (uint)!bVar194 * auVar307._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar319._56_4_ =
                       (uint)bVar194 * auVar305._56_4_ | (uint)!bVar194 * auVar307._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar319._60_4_ =
                       (uint)bVar194 * auVar305._60_4_ | (uint)!bVar194 * auVar307._60_4_;
                  auVar305 = vfmadd231ps_avx512f(auVar308,auVar319,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar305 = vfmadd231ps_avx512f(auVar305,auVar356,auVar306);
                  auVar305 = vfmadd231ps_avx512f(auVar305,auVar319,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar305 = vmulps_avx512f(auVar305,auVar303);
                  auVar306 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar194 = (bool)((byte)uVar169 & 1);
                  auVar320._0_4_ = (uint)bVar194 * auVar306._0_4_ | (uint)!bVar194 * auVar305._0_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                  auVar320._4_4_ = (uint)bVar194 * auVar306._4_4_ | (uint)!bVar194 * auVar305._4_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                  auVar320._8_4_ = (uint)bVar194 * auVar306._8_4_ | (uint)!bVar194 * auVar305._8_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                  auVar320._12_4_ =
                       (uint)bVar194 * auVar306._12_4_ | (uint)!bVar194 * auVar305._12_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                  auVar320._16_4_ =
                       (uint)bVar194 * auVar306._16_4_ | (uint)!bVar194 * auVar305._16_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                  auVar320._20_4_ =
                       (uint)bVar194 * auVar306._20_4_ | (uint)!bVar194 * auVar305._20_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                  auVar320._24_4_ =
                       (uint)bVar194 * auVar306._24_4_ | (uint)!bVar194 * auVar305._24_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 7) & 1);
                  auVar320._28_4_ =
                       (uint)bVar194 * auVar306._28_4_ | (uint)!bVar194 * auVar305._28_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 8) & 1);
                  auVar320._32_4_ =
                       (uint)bVar194 * auVar306._32_4_ | (uint)!bVar194 * auVar305._32_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 9) & 1);
                  auVar320._36_4_ =
                       (uint)bVar194 * auVar306._36_4_ | (uint)!bVar194 * auVar305._36_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 10) & 1);
                  auVar320._40_4_ =
                       (uint)bVar194 * auVar306._40_4_ | (uint)!bVar194 * auVar305._40_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xb) & 1);
                  auVar320._44_4_ =
                       (uint)bVar194 * auVar306._44_4_ | (uint)!bVar194 * auVar305._44_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xc) & 1);
                  auVar320._48_4_ =
                       (uint)bVar194 * auVar306._48_4_ | (uint)!bVar194 * auVar305._48_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xd) & 1);
                  auVar320._52_4_ =
                       (uint)bVar194 * auVar306._52_4_ | (uint)!bVar194 * auVar305._52_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xe) & 1);
                  auVar320._56_4_ =
                       (uint)bVar194 * auVar306._56_4_ | (uint)!bVar194 * auVar305._56_4_;
                  bVar194 = SUB81(uVar169 >> 0xf,0);
                  auVar320._60_4_ =
                       (uint)bVar194 * auVar306._60_4_ | (uint)!bVar194 * auVar305._60_4_;
                  auVar305 = vminps_avx512f(auVar320,(undefined1  [64])afVar139);
                  auVar305 = vmaxps_avx512f(auVar305,(undefined1  [64])afVar140);
                  auVar306 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar305,
                                                 (undefined1  [64])afVar147);
                  auVar307 = vrndscaleps_avx512f(auVar306,1);
                  uVar168 = vcmpps_avx512f(auVar306,auVar307,1);
                  auVar306 = vsubps_avx512f(auVar307,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  in_ZMM16._0_4_ = (uint)bVar194 * auVar306._0_4_ | (uint)!bVar194 * auVar307._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar194 * auVar306._4_4_ | (uint)!bVar194 * auVar307._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar194 * auVar306._8_4_ | (uint)!bVar194 * auVar307._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  in_ZMM16._12_4_ =
                       (uint)bVar194 * auVar306._12_4_ | (uint)!bVar194 * auVar307._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  in_ZMM16._16_4_ =
                       (uint)bVar194 * auVar306._16_4_ | (uint)!bVar194 * auVar307._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  in_ZMM16._20_4_ =
                       (uint)bVar194 * auVar306._20_4_ | (uint)!bVar194 * auVar307._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  in_ZMM16._24_4_ =
                       (uint)bVar194 * auVar306._24_4_ | (uint)!bVar194 * auVar307._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  in_ZMM16._28_4_ =
                       (uint)bVar194 * auVar306._28_4_ | (uint)!bVar194 * auVar307._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  in_ZMM16._32_4_ =
                       (uint)bVar194 * auVar306._32_4_ | (uint)!bVar194 * auVar307._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  in_ZMM16._36_4_ =
                       (uint)bVar194 * auVar306._36_4_ | (uint)!bVar194 * auVar307._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  in_ZMM16._40_4_ =
                       (uint)bVar194 * auVar306._40_4_ | (uint)!bVar194 * auVar307._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  in_ZMM16._44_4_ =
                       (uint)bVar194 * auVar306._44_4_ | (uint)!bVar194 * auVar307._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  in_ZMM16._48_4_ =
                       (uint)bVar194 * auVar306._48_4_ | (uint)!bVar194 * auVar307._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  in_ZMM16._52_4_ =
                       (uint)bVar194 * auVar306._52_4_ | (uint)!bVar194 * auVar307._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  in_ZMM16._56_4_ =
                       (uint)bVar194 * auVar306._56_4_ | (uint)!bVar194 * auVar307._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  in_ZMM16._60_4_ =
                       (uint)bVar194 * auVar306._60_4_ | (uint)!bVar194 * auVar307._60_4_;
                  auVar305 = vfmadd231ps_avx512f(auVar305,in_ZMM16,auVar353);
                  auVar305 = vfmadd231ps_avx512f(auVar305,in_ZMM16,auVar354);
                  auVar306 = vmulps_avx512f(auVar305,auVar305);
                  auVar307 = vfmadd213ps_avx512f(auVar305,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar144);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar145);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar146);
                  auVar307 = vfmadd213ps_avx512f(auVar307,auVar305,(undefined1  [64])afVar147);
                  auVar305 = vfmadd213ps_avx512f(auVar307,auVar306,auVar305);
                  auVar305 = vaddps_avx512f(auVar305,(undefined1  [64])afVar138);
                  auVar306 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar306 = vpaddd_avx512f(auVar306,auVar355);
                  auVar306 = vpslld_avx512f(auVar306,0x17);
                  in_ZMM8 = vfmadd213ps_avx512f(auVar306,auVar305,auVar357);
                  auVar305 = vdivps_avx512f(auVar357,in_ZMM8);
                  auVar305 = vfnmsub213ps_avx512f(auVar305,auVar303,auVar357);
                  goto LAB_0028c659;
                case 6:
                  puVar1 = (uint *)(this->super_Deconvolution).activation_params.data;
                  auVar305 = vbroadcastss_avx512f(ZEXT416(*puVar1));
                  uVar181 = puVar1[1];
                  auVar122._4_4_ = uVar181;
                  auVar122._0_4_ = uVar181;
                  auVar122._8_4_ = uVar181;
                  auVar122._12_4_ = uVar181;
                  auVar122._16_4_ = uVar181;
                  auVar122._20_4_ = uVar181;
                  auVar122._24_4_ = uVar181;
                  auVar122._28_4_ = uVar181;
                  auVar122._32_4_ = uVar181;
                  auVar122._36_4_ = uVar181;
                  auVar122._40_4_ = uVar181;
                  auVar122._44_4_ = uVar181;
                  auVar122._48_4_ = uVar181;
                  auVar122._52_4_ = uVar181;
                  auVar122._56_4_ = uVar181;
                  auVar122._60_4_ = uVar181;
                  auVar305 = vfmadd213ps_avx512f(auVar305,auVar304,auVar122);
                  auVar305 = vmaxps_avx512f(auVar305,in_ZMM29);
                  auVar305 = vminps_avx512f(auVar305,auVar357);
LAB_0028c659:
                  auVar304 = vmulps_avx512f(auVar305,auVar304);
                }
                *pauVar188 = auVar304;
                pauVar188 = pauVar188 + 1;
                uVar173 = uVar173 + 1;
                iVar192 = iVar192 + 1;
              } while (uVar173 != local_228.w);
            }
            iVar170 = iVar170 + 1;
          } while (iVar170 != local_228.h);
        }
        local_2e8 = local_2e8 + 1;
      } while (local_2e8 != (long)local_228.c);
    }
    auVar198 = in_ZMM29._0_16_;
    if ((local_158._0_4_ == 0x10) && (uVar177 == 4)) {
      if ((long)local_228.c < 1) goto LAB_002922db;
      iVar8 = (this->super_Deconvolution).dilation_w;
      iVar9 = (this->super_Deconvolution).dilation_h;
      iVar156 = (this->super_Deconvolution).stride_w;
      iVar171 = (this->super_Deconvolution).stride_h;
      iVar191 = (this->super_Deconvolution).activation_type;
      pvVar16 = (this->super_Deconvolution).bias_data.data;
      uVar179 = (this->super_Deconvolution).kernel_w;
      uVar167 = (this->super_Deconvolution).kernel_h;
      local_2e8 = 0;
      auVar221._8_4_ = 0x42b0c0a5;
      auVar221._0_8_ = 0x42b0c0a542b0c0a5;
      auVar221._12_4_ = 0x42b0c0a5;
      auVar222._8_4_ = 0xc2b0c0a5;
      auVar222._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar222._12_4_ = 0xc2b0c0a5;
      auVar223._8_4_ = 0x3f000000;
      auVar223._0_8_ = 0x3f0000003f000000;
      auVar223._12_4_ = 0x3f000000;
      auVar224._8_4_ = 0x3fb8aa3b;
      auVar224._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar224._12_4_ = 0x3fb8aa3b;
      auVar225._8_4_ = 0x3f800000;
      auVar225._0_8_ = 0x3f8000003f800000;
      auVar225._12_4_ = 0x3f800000;
      auVar226._8_4_ = 0x3f318000;
      auVar226._0_8_ = 0x3f3180003f318000;
      auVar226._12_4_ = 0x3f318000;
      auVar199 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar227._8_4_ = 0x3ab743ce;
      auVar227._0_8_ = 0x3ab743ce3ab743ce;
      auVar227._12_4_ = 0x3ab743ce;
      auVar232._8_4_ = 0x3c088908;
      auVar232._0_8_ = 0x3c0889083c088908;
      auVar232._12_4_ = 0x3c088908;
      auVar228._8_4_ = 0x3d2aa9c1;
      auVar228._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar228._12_4_ = 0x3d2aa9c1;
      auVar229._8_4_ = 0x3e2aaaaa;
      auVar229._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar229._12_4_ = 0x3e2aaaaa;
      auVar230._8_4_ = 0x3f800000;
      auVar230._0_8_ = 0x3f8000003f800000;
      auVar230._12_4_ = 0x3f800000;
      auVar231._8_4_ = 0xb95e8083;
      auVar231._0_8_ = 0xb95e8083b95e8083;
      auVar231._12_4_ = 0xb95e8083;
      auVar200 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        local_1a8._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar180 = bottom_blob->w;
          iVar190 = bottom_blob->h;
          pauVar187 = (undefined1 (*) [16])
                      (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
          uVar165 = bottom_blob->c;
          iVar170 = 0;
          do {
            if (0 < local_228.w) {
              uVar173 = 0;
              iVar192 = (1 - uVar179) * iVar8;
              do {
                if (pvVar16 == (void *)0x0) {
                  auVar198 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar198 = *(undefined1 (*) [16])((long)pvVar16 + local_2e8 * 0x10);
                }
                auVar352 = ZEXT1664(auVar198);
                if (0 < (int)uVar165) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar11 = bottom_blob->data;
                  uVar168 = 0;
                  do {
                    if (0 < (int)uVar167) {
                      uVar169 = 0;
                      uVar174 = 0;
                      do {
                        iVar157 = (((int)uVar174 - uVar167) + 1) * iVar9 + iVar170;
                        if ((((-1 < iVar157) &&
                             (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                            (0 < (int)uVar179)) && (iVar158 < iVar190)) {
                          lVar186 = (long)iVar158 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar168;
                          uVar178 = (ulong)uVar179;
                          uVar183 = uVar169;
                          iVar157 = iVar192;
                          do {
                            if (((-1 < iVar157) &&
                                (iVar158 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                               (iVar158 < iVar180)) {
                              lVar161 = (long)(iVar158 << 4);
                              uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186);
                              auVar425._4_4_ = uVar2;
                              auVar425._0_4_ = uVar2;
                              auVar425._8_4_ = uVar2;
                              auVar425._12_4_ = uVar2;
                              in_ZMM8 = ZEXT1664(auVar425);
                              uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186 + 4);
                              auVar447._4_4_ = uVar2;
                              auVar447._0_4_ = uVar2;
                              auVar447._8_4_ = uVar2;
                              auVar447._12_4_ = uVar2;
                              auVar201 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 8)));
                              in_ZMM16 = ZEXT1664(auVar201);
                              auVar202 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0xc)));
                              auVar203 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x10)))
                              ;
                              auVar204 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x14)))
                              ;
                              auVar205 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x18)))
                              ;
                              auVar206 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x1c)))
                              ;
                              auVar207 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x20)))
                              ;
                              auVar208 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x24)))
                              ;
                              auVar209 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x28)))
                              ;
                              auVar210 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x2c)))
                              ;
                              auVar211 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x30)))
                              ;
                              auVar212 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x34)))
                              ;
                              auVar213 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x38)))
                              ;
                              in_ZMM29 = ZEXT1664(auVar213);
                              auVar214 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar11 +
                                                                     lVar161 * 4 + lVar186 + 0x3c)))
                              ;
                              uVar196 = uVar183 & 0xffffffff;
                              auVar198 = vfmadd231ps_fma(auVar352._0_16_,auVar425,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar176 + uVar196 * 4));
                              auVar198 = vfmadd231ps_fma(auVar198,auVar447,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar176 + uVar196 * 4 + 0x10));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar201,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x20));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar202,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x30));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar203,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x40));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar204,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x50));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar205,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x60));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar206,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x70));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar207,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x80));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar208,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0x90));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar209,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0xa0));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar210,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0xb0));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar211,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0xc0));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar212,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0xd0));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar213,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0xe0));
                              auVar198 = vfmadd231ps_avx512vl
                                                   (auVar198,auVar214,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar196 * 4 + 0xf0));
                              auVar352 = ZEXT1664(auVar198);
                            }
                            uVar183 = uVar183 + 0x40;
                            iVar157 = iVar157 + iVar8;
                            uVar178 = uVar178 - 1;
                          } while (uVar178 != 0);
                        }
                        uVar174 = uVar174 + 1;
                        uVar169 = uVar169 + (ulong)uVar179 * 0x40;
                      } while (uVar174 != uVar167);
                    }
                    auVar198 = auVar352._0_16_;
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar179 * uVar167 * 0x40) * 4);
                    uVar168 = uVar168 + 1;
                  } while (uVar168 != uVar165);
                }
                switch(iVar191) {
                case 1:
                  auVar198 = vmaxps_avx(auVar198,(undefined1  [16])0x0);
                  break;
                case 2:
                  auVar201 = vmaxps_avx(auVar198,(undefined1  [16])0x0);
                  in_ZMM8 = ZEXT1664(auVar201);
                  auVar198 = vminps_avx(auVar198,(undefined1  [16])0x0);
                  uVar2 = *(this->super_Deconvolution).activation_params.data;
                  auVar45._4_4_ = uVar2;
                  auVar45._0_4_ = uVar2;
                  auVar45._8_4_ = uVar2;
                  auVar45._12_4_ = uVar2;
                  auVar198 = vfmadd132ps_avx512vl(auVar198,auVar201,auVar45);
                  break;
                case 3:
                  puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar2 = *puVar12;
                  auVar43._4_4_ = uVar2;
                  auVar43._0_4_ = uVar2;
                  auVar43._8_4_ = uVar2;
                  auVar43._12_4_ = uVar2;
                  auVar198 = vmaxps_avx512vl(auVar198,auVar43);
                  uVar2 = puVar12[1];
                  auVar44._4_4_ = uVar2;
                  auVar44._0_4_ = uVar2;
                  auVar44._8_4_ = uVar2;
                  auVar44._12_4_ = uVar2;
                  auVar198 = vminps_avx512vl(auVar198,auVar44);
                  break;
                case 4:
                  auVar41._8_4_ = 0x80000000;
                  auVar41._0_8_ = 0x8000000080000000;
                  auVar41._12_4_ = 0x80000000;
                  auVar198 = vxorps_avx512vl(auVar198,auVar41);
                  auVar198 = vminps_avx(auVar198,auVar221);
                  auVar198 = vmaxps_avx(auVar198,auVar222);
                  auVar201 = vfmadd231ps_fma(auVar223,auVar198,auVar224);
                  auVar202 = vcvttps2dq_avx512vl(auVar201);
                  auVar202 = vcvtdq2ps_avx512vl(auVar202);
                  uVar168 = vcmpps_avx512vl(auVar201,auVar202,1);
                  auVar201 = vsubps_avx512vl(auVar202,auVar225);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar220._0_4_ = (uint)bVar194 * auVar201._0_4_ | (uint)!bVar194 * auVar202._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar220._4_4_ = (uint)bVar194 * auVar201._4_4_ | (uint)!bVar194 * auVar202._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar220._8_4_ = (uint)bVar194 * auVar201._8_4_ | (uint)!bVar194 * auVar202._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar220._12_4_ =
                       (uint)bVar194 * auVar201._12_4_ | (uint)!bVar194 * auVar202._12_4_;
                  in_ZMM16 = ZEXT1664(auVar220);
                  auVar198 = vfmsub231ps_avx512vl(auVar198,auVar220,auVar226);
                  auVar42._8_4_ = 0x395e8083;
                  auVar42._0_8_ = 0x395e8083395e8083;
                  auVar42._12_4_ = 0x395e8083;
                  auVar201 = vfmsub231ps_avx512vl(auVar198,auVar220,auVar42);
                  auVar426._0_4_ = auVar201._0_4_ * auVar201._0_4_;
                  auVar426._4_4_ = auVar201._4_4_ * auVar201._4_4_;
                  auVar426._8_4_ = auVar201._8_4_ * auVar201._8_4_;
                  auVar426._12_4_ = auVar201._12_4_ * auVar201._12_4_;
                  auVar198 = vfmadd213ps_fma(auVar199,auVar201,auVar227);
                  auVar198 = vfmadd213ps_fma(auVar198,auVar201,auVar232);
                  auVar198 = vfmadd213ps_fma(auVar198,auVar201,auVar228);
                  auVar198 = vfmadd213ps_fma(auVar198,auVar201,auVar229);
                  auVar198 = vfmadd213ps_fma(auVar198,auVar201,auVar223);
                  auVar198 = vfmadd213ps_fma(auVar198,auVar426,auVar201);
                  auVar369._0_4_ = auVar198._0_4_ + 1.0;
                  auVar369._4_4_ = auVar198._4_4_ + 1.0;
                  auVar369._8_4_ = auVar198._8_4_ + 1.0;
                  auVar369._12_4_ = auVar198._12_4_ + 1.0;
                  auVar198 = vcvttps2dq_avx512vl(auVar220);
                  auVar198 = vpslld_avx(auVar198,0x17);
                  auVar198 = vpaddd_avx(auVar198,auVar230);
                  auVar198 = vfmadd213ps_fma(auVar198,auVar369,auVar225);
                  in_ZMM8 = ZEXT1664(auVar198);
                  auVar198 = vdivps_avx(auVar225,auVar198);
                  break;
                case 5:
                  auVar201 = vminps_avx(auVar198,auVar221);
                  auVar201 = vmaxps_avx(auVar201,auVar222);
                  auVar202 = vfmadd213ps_fma(auVar224,auVar201,auVar223);
                  auVar203 = vcvttps2dq_avx512vl(auVar202);
                  auVar203 = vcvtdq2ps_avx512vl(auVar203);
                  uVar168 = vcmpps_avx512vl(auVar202,auVar203,1);
                  auVar202 = vsubps_avx512vl(auVar203,auVar225);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar215._0_4_ = (uint)bVar194 * auVar202._0_4_ | (uint)!bVar194 * auVar203._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar215._4_4_ = (uint)bVar194 * auVar202._4_4_ | (uint)!bVar194 * auVar203._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar215._8_4_ = (uint)bVar194 * auVar202._8_4_ | (uint)!bVar194 * auVar203._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar215._12_4_ =
                       (uint)bVar194 * auVar202._12_4_ | (uint)!bVar194 * auVar203._12_4_;
                  auVar201 = vfmsub231ps_avx512vl(auVar201,auVar215,auVar226);
                  auVar201 = vfnmsub231ps_avx512vl(auVar201,auVar215,auVar231);
                  auVar448._0_4_ = auVar201._0_4_ * auVar201._0_4_;
                  auVar448._4_4_ = auVar201._4_4_ * auVar201._4_4_;
                  auVar448._8_4_ = auVar201._8_4_ * auVar201._8_4_;
                  auVar448._12_4_ = auVar201._12_4_ * auVar201._12_4_;
                  auVar202 = vfmadd213ps_avx512vl(auVar199,auVar201,auVar227);
                  auVar202 = vfmadd213ps_avx512vl(auVar202,auVar201,auVar232);
                  auVar202 = vfmadd213ps_avx512vl(auVar202,auVar201,auVar228);
                  auVar202 = vfmadd213ps_avx512vl(auVar202,auVar201,auVar229);
                  auVar202 = vfmadd213ps_avx512vl(auVar202,auVar201,auVar223);
                  auVar201 = vfmadd213ps_avx512vl(auVar202,auVar448,auVar201);
                  auVar202 = vaddps_avx512vl(auVar201,auVar225);
                  auVar201 = vcvttps2dq_avx512vl(auVar215);
                  auVar201 = vpslld_avx(auVar201,0x17);
                  auVar201 = vpaddd_avx(auVar201,auVar230);
                  auVar201 = vfmadd213ps_fma(auVar201,auVar202,auVar225);
                  uVar168 = vcmpps_avx512vl(auVar201,(undefined1  [16])0x0,2);
                  auVar204._8_4_ = 0x800000;
                  auVar204._0_8_ = 0x80000000800000;
                  auVar204._12_4_ = 0x800000;
                  auVar201 = vmaxps_avx512vl(auVar201,auVar204);
                  auVar204 = vpsrld_avx(auVar201,0x17);
                  auVar202 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar205._8_4_ = 0x3f000000;
                  auVar205._0_8_ = 0x3f0000003f000000;
                  auVar205._12_4_ = 0x3f000000;
                  auVar201 = vpternlogd_avx512vl(auVar201,auVar202,auVar205,0xea);
                  auVar206._8_4_ = 0x3f3504f3;
                  auVar206._0_8_ = 0x3f3504f33f3504f3;
                  auVar206._12_4_ = 0x3f3504f3;
                  uVar169 = vcmpps_avx512vl(auVar201,auVar206,1);
                  auVar207._8_4_ = 0xbf800000;
                  auVar207._0_8_ = 0xbf800000bf800000;
                  auVar207._12_4_ = 0xbf800000;
                  auVar202 = vaddps_avx512vl(auVar201,auVar207);
                  auVar201 = vaddps_avx512vl(auVar202,auVar201);
                  bVar194 = (bool)((byte)uVar169 & 1);
                  auVar216._0_4_ = (uint)bVar194 * auVar201._0_4_ | (uint)!bVar194 * auVar202._0_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                  auVar216._4_4_ = (uint)bVar194 * auVar201._4_4_ | (uint)!bVar194 * auVar202._4_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                  auVar216._8_4_ = (uint)bVar194 * auVar201._8_4_ | (uint)!bVar194 * auVar202._8_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                  auVar216._12_4_ =
                       (uint)bVar194 * auVar201._12_4_ | (uint)!bVar194 * auVar202._12_4_;
                  auVar202 = vmulps_avx512vl(auVar216,auVar216);
                  auVar201 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                  auVar208._8_4_ = 0xbdebd1b8;
                  auVar208._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar208._12_4_ = 0xbdebd1b8;
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar216,auVar208);
                  auVar209._8_4_ = 0x3def251a;
                  auVar209._0_8_ = 0x3def251a3def251a;
                  auVar209._12_4_ = 0x3def251a;
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar216,auVar209);
                  auVar210._8_4_ = 0xbdfe5d4f;
                  auVar210._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar210._12_4_ = 0xbdfe5d4f;
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar216,auVar210);
                  auVar211._8_4_ = 0x3e11e9bf;
                  auVar211._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar211._12_4_ = 0x3e11e9bf;
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar216,auVar211);
                  auVar212._8_4_ = 0xbe2aae50;
                  auVar212._0_8_ = 0xbe2aae50be2aae50;
                  auVar212._12_4_ = 0xbe2aae50;
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar216,auVar212);
                  auVar213._8_4_ = 0x3e4cceac;
                  auVar213._0_8_ = 0x3e4cceac3e4cceac;
                  auVar213._12_4_ = 0x3e4cceac;
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar216,auVar213);
                  auVar214._8_4_ = 0xbe7ffffc;
                  auVar214._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar214._12_4_ = 0xbe7ffffc;
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar216,auVar214);
                  auVar39._8_4_ = 0x3eaaaaaa;
                  auVar39._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar39._12_4_ = 0x3eaaaaaa;
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar216,auVar39);
                  auVar203 = vmulps_avx512vl(auVar202,auVar216);
                  auVar203 = vmulps_avx512vl(auVar203,auVar201);
                  auVar40._8_4_ = 0xffffff82;
                  auVar40._0_8_ = 0xffffff82ffffff82;
                  auVar40._12_4_ = 0xffffff82;
                  auVar201 = vpaddd_avx512vl(auVar204,auVar40);
                  auVar201 = vcvtdq2ps_avx(auVar201);
                  auVar204 = vsubps_avx512vl(auVar201,auVar225);
                  bVar194 = (bool)((byte)uVar169 & 1);
                  auVar217._0_4_ = (uint)bVar194 * auVar204._0_4_ | (uint)!bVar194 * auVar201._0_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                  auVar217._4_4_ = (uint)bVar194 * auVar204._4_4_ | (uint)!bVar194 * auVar201._4_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                  auVar217._8_4_ = (uint)bVar194 * auVar204._8_4_ | (uint)!bVar194 * auVar201._8_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                  auVar217._12_4_ =
                       (uint)bVar194 * auVar204._12_4_ | (uint)!bVar194 * auVar201._12_4_;
                  auVar201 = vfmadd231ps_avx512vl(auVar203,auVar217,auVar231);
                  auVar201 = vfmsub231ps_avx512vl(auVar201,auVar223,auVar202);
                  auVar201 = vsubps_avx512vl(auVar201,auVar216);
                  auVar201 = vfnmadd231ps_fma(auVar201,auVar226,auVar217);
                  auVar202 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar218._0_4_ =
                       (uint)bVar194 * auVar202._0_4_ |
                       (uint)!bVar194 * (int)(auVar201._0_4_ + auVar201._0_4_);
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar218._4_4_ =
                       (uint)bVar194 * auVar202._4_4_ |
                       (uint)!bVar194 * (int)(auVar201._4_4_ + auVar201._4_4_);
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar218._8_4_ =
                       (uint)bVar194 * auVar202._8_4_ |
                       (uint)!bVar194 * (int)(auVar201._8_4_ + auVar201._8_4_);
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar218._12_4_ =
                       (uint)bVar194 * auVar202._12_4_ |
                       (uint)!bVar194 * (int)(auVar201._12_4_ + auVar201._12_4_);
                  auVar201 = vminps_avx(auVar218,auVar221);
                  auVar201 = vmaxps_avx(auVar201,auVar222);
                  auVar202 = vfmadd213ps_fma(auVar224,auVar201,auVar223);
                  auVar203 = vcvttps2dq_avx512vl(auVar202);
                  auVar203 = vcvtdq2ps_avx512vl(auVar203);
                  uVar168 = vcmpps_avx512vl(auVar202,auVar203,1);
                  auVar202 = vsubps_avx512vl(auVar203,auVar225);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar219._0_4_ = (uint)bVar194 * auVar202._0_4_ | (uint)!bVar194 * auVar203._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar219._4_4_ = (uint)bVar194 * auVar202._4_4_ | (uint)!bVar194 * auVar203._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar219._8_4_ = (uint)bVar194 * auVar202._8_4_ | (uint)!bVar194 * auVar203._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar219._12_4_ =
                       (uint)bVar194 * auVar202._12_4_ | (uint)!bVar194 * auVar203._12_4_;
                  in_ZMM16 = ZEXT1664(auVar219);
                  auVar201 = vfmsub231ps_avx512vl(auVar201,auVar219,auVar226);
                  auVar201 = vfnmsub231ps_avx512vl(auVar201,auVar219,auVar231);
                  auVar449._0_4_ = auVar201._0_4_ * auVar201._0_4_;
                  auVar449._4_4_ = auVar201._4_4_ * auVar201._4_4_;
                  auVar449._8_4_ = auVar201._8_4_ * auVar201._8_4_;
                  auVar449._12_4_ = auVar201._12_4_ * auVar201._12_4_;
                  auVar202 = vfmadd213ps_avx512vl(auVar199,auVar201,auVar227);
                  auVar202 = vfmadd213ps_avx512vl(auVar202,auVar201,auVar232);
                  auVar202 = vfmadd213ps_avx512vl(auVar202,auVar201,auVar228);
                  auVar202 = vfmadd213ps_avx512vl(auVar202,auVar201,auVar229);
                  auVar202 = vfmadd213ps_avx512vl(auVar202,auVar201,auVar223);
                  auVar201 = vfmadd213ps_avx512vl(auVar202,auVar449,auVar201);
                  auVar202 = vaddps_avx512vl(auVar201,auVar225);
                  auVar201 = vcvttps2dq_avx512vl(auVar219);
                  auVar201 = vpslld_avx(auVar201,0x17);
                  auVar201 = vpaddd_avx(auVar201,auVar230);
                  auVar201 = vfmadd213ps_fma(auVar201,auVar202,auVar225);
                  auVar201 = vdivps_avx512vl(auVar200,auVar201);
                  in_ZMM8 = ZEXT1664(auVar201);
                  auVar198 = vfmsub231ps_fma(auVar198,auVar198,auVar201);
                  break;
                case 6:
                  puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar2 = *puVar12;
                  auVar203._4_4_ = uVar2;
                  auVar203._0_4_ = uVar2;
                  auVar203._8_4_ = uVar2;
                  auVar203._12_4_ = uVar2;
                  uVar2 = puVar12[1];
                  auVar201._4_4_ = uVar2;
                  auVar201._0_4_ = uVar2;
                  auVar201._8_4_ = uVar2;
                  auVar201._12_4_ = uVar2;
                  auVar201 = vfmadd213ps_avx512vl(auVar203,auVar198,auVar201);
                  auVar201 = vmaxps_avx(auVar201,(undefined1  [16])0x0);
                  auVar201 = vminps_avx(auVar201,auVar225);
                  in_ZMM8 = ZEXT1664(auVar201);
                  auVar202._0_4_ = auVar201._0_4_ * auVar198._0_4_;
                  auVar202._4_4_ = auVar201._4_4_ * auVar198._4_4_;
                  auVar202._8_4_ = auVar201._8_4_ * auVar198._8_4_;
                  auVar202._12_4_ = auVar201._12_4_ * auVar198._12_4_;
                  auVar198 = auVar202;
                }
                *pauVar187 = auVar198;
                pauVar187 = pauVar187 + 1;
                uVar173 = uVar173 + 1;
                iVar192 = iVar192 + 1;
              } while (uVar173 != local_228.w);
            }
            iVar170 = iVar170 + 1;
          } while (iVar170 != local_228.h);
        }
        auVar198 = in_ZMM29._0_16_;
        local_2e8 = local_2e8 + 1;
      } while (local_2e8 != (long)local_228.c);
    }
    afVar154 = _ps512_cephes_log_p8;
    afVar153 = _ps512_cephes_log_p7;
    afVar152 = _ps512_cephes_log_p6;
    afVar151 = _ps512_cephes_log_p5;
    afVar150 = _ps512_cephes_log_p4;
    afVar149 = _ps512_cephes_log_p3;
    afVar148 = _ps512_cephes_log_p2;
    afVar147 = ::_ps512_cephes_exp_p5;
    afVar146 = ::_ps512_cephes_exp_p4;
    afVar145 = ::_ps512_cephes_exp_p3;
    afVar144 = ::_ps512_cephes_exp_p2;
    afVar143 = ::_ps512_cephes_exp_p1;
    afVar142 = ::_ps512_cephes_exp_p0;
    afVar141 = ::_ps512_cephes_LOG2EF;
    afVar140 = ::_ps512_exp_lo;
    afVar139 = ::_ps512_exp_hi;
    afVar138 = ::_ps512_1;
    if ((local_158._0_4_ == 1) && (uVar177 == 0x10)) {
      if ((long)local_228.c < 1) goto LAB_002922db;
      iVar8 = (this->super_Deconvolution).dilation_w;
      iVar9 = (this->super_Deconvolution).dilation_h;
      iVar156 = (this->super_Deconvolution).stride_w;
      iVar171 = (this->super_Deconvolution).stride_h;
      iVar191 = (this->super_Deconvolution).activation_type;
      pvVar16 = (this->super_Deconvolution).bias_data.data;
      uVar179 = (this->super_Deconvolution).kernel_w;
      uVar167 = (this->super_Deconvolution).kernel_h;
      auVar352 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar353 = vxorps_avx512dq(auVar352,(undefined1  [64])_ps512_cephes_log_q2);
      auVar354 = vxorps_avx512dq(auVar352,(undefined1  [64])_ps512_cephes_log_q1);
      auVar355 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar356 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar352);
      local_2e8 = 0;
      auVar198 = vxorps_avx512vl(auVar198,auVar198);
      auVar304 = ZEXT1664(auVar198);
      auVar357 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar303 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        local_1a8._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar180 = bottom_blob->w;
          iVar190 = bottom_blob->h;
          pauVar188 = (undefined1 (*) [64])
                      (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
          uVar165 = bottom_blob->c;
          iVar170 = 0;
          do {
            if (0 < local_228.w) {
              uVar173 = 0;
              iVar192 = (1 - uVar179) * iVar8;
              do {
                if (pvVar16 == (void *)0x0) {
                  auVar305 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar305 = *(undefined1 (*) [64])((long)pvVar16 + local_2e8 * 0x40);
                }
                if (0 < (int)uVar165) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar168 = 0;
                  do {
                    if (0 < (int)uVar167) {
                      uVar174 = 0;
                      uVar169 = 0;
                      do {
                        iVar157 = (((int)uVar169 - uVar167) + 1) * iVar9 + iVar170;
                        if ((((-1 < iVar157) &&
                             (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                            (iVar158 < iVar190)) && (0 < (int)uVar179)) {
                          uVar178 = uVar174;
                          uVar183 = (ulong)uVar179;
                          iVar157 = iVar192;
                          do {
                            if (((-1 < iVar157) &&
                                (iVar159 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                               (iVar159 < iVar180)) {
                              auVar306 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)bottom_blob->data +
                                                                     (long)iVar159 * 4 +
                                                                     (long)iVar158 *
                                                                     (long)bottom_blob->w *
                                                                     bottom_blob->elemsize +
                                                                     bottom_blob->cstep *
                                                                     bottom_blob->elemsize * uVar168
                                                                     )));
                              auVar305 = vfmadd231ps_avx512f(auVar305,auVar306,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 +
                                                              (uVar178 & 0xffffffff) * 4));
                            }
                            uVar178 = uVar178 + 0x10;
                            iVar157 = iVar157 + iVar8;
                            uVar183 = uVar183 - 1;
                          } while (uVar183 != 0);
                        }
                        uVar169 = uVar169 + 1;
                        uVar174 = uVar174 + (ulong)uVar179 * 0x10;
                      } while (uVar169 != uVar167);
                    }
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar179 * uVar167 * 0x10) * 4);
                    uVar168 = uVar168 + 1;
                  } while (uVar168 != uVar165);
                }
                switch(iVar191) {
                case 1:
                  auVar305 = vmaxps_avx512f(auVar305,auVar304);
                  break;
                case 2:
                  uVar168 = vcmpps_avx512f(auVar305,auVar304,1);
                  uVar2 = *(this->super_Deconvolution).activation_params.data;
                  auVar129._4_4_ = uVar2;
                  auVar129._0_4_ = uVar2;
                  auVar129._8_4_ = uVar2;
                  auVar129._12_4_ = uVar2;
                  auVar129._16_4_ = uVar2;
                  auVar129._20_4_ = uVar2;
                  auVar129._24_4_ = uVar2;
                  auVar129._28_4_ = uVar2;
                  auVar129._32_4_ = uVar2;
                  auVar129._36_4_ = uVar2;
                  auVar129._40_4_ = uVar2;
                  auVar129._44_4_ = uVar2;
                  auVar129._48_4_ = uVar2;
                  auVar129._52_4_ = uVar2;
                  auVar129._56_4_ = uVar2;
                  auVar129._60_4_ = uVar2;
                  auVar306 = vmulps_avx512f(auVar305,auVar129);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar326._0_4_ = (uint)bVar194 * auVar306._0_4_ | (uint)!bVar194 * auVar305._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar326._4_4_ = (uint)bVar194 * auVar306._4_4_ | (uint)!bVar194 * auVar305._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar326._8_4_ = (uint)bVar194 * auVar306._8_4_ | (uint)!bVar194 * auVar305._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar326._12_4_ =
                       (uint)bVar194 * auVar306._12_4_ | (uint)!bVar194 * auVar305._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar326._16_4_ =
                       (uint)bVar194 * auVar306._16_4_ | (uint)!bVar194 * auVar305._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar326._20_4_ =
                       (uint)bVar194 * auVar306._20_4_ | (uint)!bVar194 * auVar305._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar326._24_4_ =
                       (uint)bVar194 * auVar306._24_4_ | (uint)!bVar194 * auVar305._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar326._28_4_ =
                       (uint)bVar194 * auVar306._28_4_ | (uint)!bVar194 * auVar305._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  auVar326._32_4_ =
                       (uint)bVar194 * auVar306._32_4_ | (uint)!bVar194 * auVar305._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar326._36_4_ =
                       (uint)bVar194 * auVar306._36_4_ | (uint)!bVar194 * auVar305._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar326._40_4_ =
                       (uint)bVar194 * auVar306._40_4_ | (uint)!bVar194 * auVar305._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar326._44_4_ =
                       (uint)bVar194 * auVar306._44_4_ | (uint)!bVar194 * auVar305._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar326._48_4_ =
                       (uint)bVar194 * auVar306._48_4_ | (uint)!bVar194 * auVar305._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar326._52_4_ =
                       (uint)bVar194 * auVar306._52_4_ | (uint)!bVar194 * auVar305._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar326._56_4_ =
                       (uint)bVar194 * auVar306._56_4_ | (uint)!bVar194 * auVar305._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar326._60_4_ =
                       (uint)bVar194 * auVar306._60_4_ | (uint)!bVar194 * auVar305._60_4_;
                  auVar305 = auVar326;
                  break;
                case 3:
                  puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar2 = *puVar12;
                  auVar127._4_4_ = uVar2;
                  auVar127._0_4_ = uVar2;
                  auVar127._8_4_ = uVar2;
                  auVar127._12_4_ = uVar2;
                  auVar127._16_4_ = uVar2;
                  auVar127._20_4_ = uVar2;
                  auVar127._24_4_ = uVar2;
                  auVar127._28_4_ = uVar2;
                  auVar127._32_4_ = uVar2;
                  auVar127._36_4_ = uVar2;
                  auVar127._40_4_ = uVar2;
                  auVar127._44_4_ = uVar2;
                  auVar127._48_4_ = uVar2;
                  auVar127._52_4_ = uVar2;
                  auVar127._56_4_ = uVar2;
                  auVar127._60_4_ = uVar2;
                  auVar305 = vmaxps_avx512f(auVar305,auVar127);
                  uVar2 = puVar12[1];
                  auVar128._4_4_ = uVar2;
                  auVar128._0_4_ = uVar2;
                  auVar128._8_4_ = uVar2;
                  auVar128._12_4_ = uVar2;
                  auVar128._16_4_ = uVar2;
                  auVar128._20_4_ = uVar2;
                  auVar128._24_4_ = uVar2;
                  auVar128._28_4_ = uVar2;
                  auVar128._32_4_ = uVar2;
                  auVar128._36_4_ = uVar2;
                  auVar128._40_4_ = uVar2;
                  auVar128._44_4_ = uVar2;
                  auVar128._48_4_ = uVar2;
                  auVar128._52_4_ = uVar2;
                  auVar128._56_4_ = uVar2;
                  auVar128._60_4_ = uVar2;
                  auVar305 = vminps_avx512f(auVar305,auVar128);
                  break;
                case 4:
                  auVar305 = vxorps_avx512dq(auVar305,auVar352);
                  auVar305 = vminps_avx512f(auVar305,(undefined1  [64])afVar139);
                  auVar305 = vmaxps_avx512f(auVar305,(undefined1  [64])afVar140);
                  auVar306 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar305,
                                                 (undefined1  [64])afVar147);
                  auVar307 = vrndscaleps_avx512f(auVar306,1);
                  uVar168 = vcmpps_avx512f(auVar306,auVar307,1);
                  auVar306 = vsubps_avx512f(auVar307,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  in_ZMM8._0_4_ = (uint)bVar194 * auVar306._0_4_ | (uint)!bVar194 * auVar307._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  in_ZMM8._4_4_ = (uint)bVar194 * auVar306._4_4_ | (uint)!bVar194 * auVar307._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  in_ZMM8._8_4_ = (uint)bVar194 * auVar306._8_4_ | (uint)!bVar194 * auVar307._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  in_ZMM8._12_4_ =
                       (uint)bVar194 * auVar306._12_4_ | (uint)!bVar194 * auVar307._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  in_ZMM8._16_4_ =
                       (uint)bVar194 * auVar306._16_4_ | (uint)!bVar194 * auVar307._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  in_ZMM8._20_4_ =
                       (uint)bVar194 * auVar306._20_4_ | (uint)!bVar194 * auVar307._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  in_ZMM8._24_4_ =
                       (uint)bVar194 * auVar306._24_4_ | (uint)!bVar194 * auVar307._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  in_ZMM8._28_4_ =
                       (uint)bVar194 * auVar306._28_4_ | (uint)!bVar194 * auVar307._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  in_ZMM8._32_4_ =
                       (uint)bVar194 * auVar306._32_4_ | (uint)!bVar194 * auVar307._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  in_ZMM8._36_4_ =
                       (uint)bVar194 * auVar306._36_4_ | (uint)!bVar194 * auVar307._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  in_ZMM8._40_4_ =
                       (uint)bVar194 * auVar306._40_4_ | (uint)!bVar194 * auVar307._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  in_ZMM8._44_4_ =
                       (uint)bVar194 * auVar306._44_4_ | (uint)!bVar194 * auVar307._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  in_ZMM8._48_4_ =
                       (uint)bVar194 * auVar306._48_4_ | (uint)!bVar194 * auVar307._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  in_ZMM8._52_4_ =
                       (uint)bVar194 * auVar306._52_4_ | (uint)!bVar194 * auVar307._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  in_ZMM8._56_4_ =
                       (uint)bVar194 * auVar306._56_4_ | (uint)!bVar194 * auVar307._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  in_ZMM8._60_4_ =
                       (uint)bVar194 * auVar306._60_4_ | (uint)!bVar194 * auVar307._60_4_;
                  auVar305 = vfmadd231ps_avx512f(auVar305,in_ZMM8,auVar353);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar305,in_ZMM8,auVar354);
                  auVar305 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar306 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar306 = vfmadd213ps_avx512f(auVar306,in_ZMM16,(undefined1  [64])afVar144);
                  auVar306 = vfmadd213ps_avx512f(auVar306,in_ZMM16,(undefined1  [64])afVar145);
                  auVar306 = vfmadd213ps_avx512f(auVar306,in_ZMM16,(undefined1  [64])afVar146);
                  auVar306 = vfmadd213ps_avx512f(auVar306,in_ZMM16,(undefined1  [64])afVar147);
                  auVar305 = vfmadd213ps_avx512f(auVar306,auVar305,in_ZMM16);
                  auVar305 = vaddps_avx512f(auVar305,(undefined1  [64])afVar138);
                  auVar306 = vcvttps2dq_avx512f(in_ZMM8);
                  auVar306 = vpaddd_avx512f(auVar306,auVar355);
                  auVar306 = vpslld_avx512f(auVar306,0x17);
                  auVar305 = vfmadd213ps_avx512f(auVar306,auVar305,auVar357);
                  auVar305 = vdivps_avx512f(auVar357,auVar305);
                  break;
                case 5:
                  auVar306 = vminps_avx512f(auVar305,(undefined1  [64])afVar139);
                  auVar306 = vmaxps_avx512f(auVar306,(undefined1  [64])afVar140);
                  auVar307 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar306,
                                                 (undefined1  [64])afVar147);
                  auVar308 = vrndscaleps_avx512f(auVar307,1);
                  uVar168 = vcmpps_avx512f(auVar307,auVar308,1);
                  auVar307 = vsubps_avx512f(auVar308,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar322._0_4_ = (uint)bVar194 * auVar307._0_4_ | (uint)!bVar194 * auVar308._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar322._4_4_ = (uint)bVar194 * auVar307._4_4_ | (uint)!bVar194 * auVar308._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar322._8_4_ = (uint)bVar194 * auVar307._8_4_ | (uint)!bVar194 * auVar308._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar322._12_4_ =
                       (uint)bVar194 * auVar307._12_4_ | (uint)!bVar194 * auVar308._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar322._16_4_ =
                       (uint)bVar194 * auVar307._16_4_ | (uint)!bVar194 * auVar308._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar322._20_4_ =
                       (uint)bVar194 * auVar307._20_4_ | (uint)!bVar194 * auVar308._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar322._24_4_ =
                       (uint)bVar194 * auVar307._24_4_ | (uint)!bVar194 * auVar308._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar322._28_4_ =
                       (uint)bVar194 * auVar307._28_4_ | (uint)!bVar194 * auVar308._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  auVar322._32_4_ =
                       (uint)bVar194 * auVar307._32_4_ | (uint)!bVar194 * auVar308._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar322._36_4_ =
                       (uint)bVar194 * auVar307._36_4_ | (uint)!bVar194 * auVar308._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar322._40_4_ =
                       (uint)bVar194 * auVar307._40_4_ | (uint)!bVar194 * auVar308._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar322._44_4_ =
                       (uint)bVar194 * auVar307._44_4_ | (uint)!bVar194 * auVar308._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar322._48_4_ =
                       (uint)bVar194 * auVar307._48_4_ | (uint)!bVar194 * auVar308._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar322._52_4_ =
                       (uint)bVar194 * auVar307._52_4_ | (uint)!bVar194 * auVar308._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar322._56_4_ =
                       (uint)bVar194 * auVar307._56_4_ | (uint)!bVar194 * auVar308._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar322._60_4_ =
                       (uint)bVar194 * auVar307._60_4_ | (uint)!bVar194 * auVar308._60_4_;
                  auVar306 = vfmadd231ps_avx512f(auVar306,auVar322,auVar353);
                  auVar306 = vfmadd231ps_avx512f(auVar306,auVar322,auVar354);
                  auVar307 = vmulps_avx512f(auVar306,auVar306);
                  auVar308 = vfmadd213ps_avx512f(auVar306,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar144);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar145);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar146);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar147);
                  auVar306 = vfmadd213ps_avx512f(auVar308,auVar307,auVar306);
                  auVar306 = vaddps_avx512f(auVar306,(undefined1  [64])afVar138);
                  auVar307 = vcvttps2dq_avx512f(auVar322);
                  auVar307 = vpaddd_avx512f(auVar307,auVar355);
                  auVar307 = vpslld_avx512f(auVar307,0x17);
                  auVar306 = vfmadd213ps_avx512f(auVar307,auVar306,auVar357);
                  auVar307 = vmaxps_avx512f(auVar306,(undefined1  [64])_ps512_min_norm_pos);
                  auVar308 = vpsrld_avx512f(auVar307,0x17);
                  auVar307 = vpternlogd_avx512f(auVar307,(undefined1  [64])afVar147,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar168 = vcmpps_avx512f(auVar307,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar309 = vsubps_avx512f(auVar307,(undefined1  [64])afVar138);
                  auVar307 = vaddps_avx512f(auVar309,auVar307);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar323._0_4_ = (uint)bVar194 * auVar307._0_4_ | (uint)!bVar194 * auVar309._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar323._4_4_ = (uint)bVar194 * auVar307._4_4_ | (uint)!bVar194 * auVar309._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar323._8_4_ = (uint)bVar194 * auVar307._8_4_ | (uint)!bVar194 * auVar309._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar323._12_4_ =
                       (uint)bVar194 * auVar307._12_4_ | (uint)!bVar194 * auVar309._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar323._16_4_ =
                       (uint)bVar194 * auVar307._16_4_ | (uint)!bVar194 * auVar309._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar323._20_4_ =
                       (uint)bVar194 * auVar307._20_4_ | (uint)!bVar194 * auVar309._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar323._24_4_ =
                       (uint)bVar194 * auVar307._24_4_ | (uint)!bVar194 * auVar309._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar323._28_4_ =
                       (uint)bVar194 * auVar307._28_4_ | (uint)!bVar194 * auVar309._28_4_;
                  bVar27 = (byte)(uVar168 >> 8);
                  bVar194 = (bool)(bVar27 & 1);
                  auVar323._32_4_ =
                       (uint)bVar194 * auVar307._32_4_ | (uint)!bVar194 * auVar309._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar323._36_4_ =
                       (uint)bVar194 * auVar307._36_4_ | (uint)!bVar194 * auVar309._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar323._40_4_ =
                       (uint)bVar194 * auVar307._40_4_ | (uint)!bVar194 * auVar309._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar323._44_4_ =
                       (uint)bVar194 * auVar307._44_4_ | (uint)!bVar194 * auVar309._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar323._48_4_ =
                       (uint)bVar194 * auVar307._48_4_ | (uint)!bVar194 * auVar309._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar323._52_4_ =
                       (uint)bVar194 * auVar307._52_4_ | (uint)!bVar194 * auVar309._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar323._56_4_ =
                       (uint)bVar194 * auVar307._56_4_ | (uint)!bVar194 * auVar309._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar323._60_4_ =
                       (uint)bVar194 * auVar307._60_4_ | (uint)!bVar194 * auVar309._60_4_;
                  auVar307 = vmulps_avx512f(auVar323,auVar323);
                  auVar309 = vfmadd132ps_avx512f(auVar323,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar309 = vfmadd213ps_avx512f(auVar309,auVar323,(undefined1  [64])afVar148);
                  auVar309 = vfmadd213ps_avx512f(auVar309,auVar323,(undefined1  [64])afVar149);
                  auVar309 = vfmadd213ps_avx512f(auVar309,auVar323,(undefined1  [64])afVar150);
                  auVar309 = vfmadd213ps_avx512f(auVar309,auVar323,(undefined1  [64])afVar151);
                  auVar309 = vfmadd213ps_avx512f(auVar309,auVar323,(undefined1  [64])afVar152);
                  auVar309 = vfmadd213ps_avx512f(auVar309,auVar323,(undefined1  [64])afVar153);
                  auVar309 = vfmadd213ps_avx512f(auVar309,auVar323,(undefined1  [64])afVar154);
                  auVar310 = vmulps_avx512f(auVar307,auVar323);
                  auVar309 = vfmadd213ps_avx512f(auVar310,auVar309,auVar323);
                  uVar169 = vcmpps_avx512f(auVar306,auVar304,2);
                  auVar306 = vpsubd_avx512f(auVar308,auVar355);
                  auVar306 = vcvtdq2ps_avx512f(auVar306);
                  auVar308 = vaddps_avx512f(auVar306,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  auVar324._0_4_ = (uint)bVar194 * auVar306._0_4_ | (uint)!bVar194 * auVar308._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  auVar324._4_4_ = (uint)bVar194 * auVar306._4_4_ | (uint)!bVar194 * auVar308._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  auVar324._8_4_ = (uint)bVar194 * auVar306._8_4_ | (uint)!bVar194 * auVar308._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  auVar324._12_4_ =
                       (uint)bVar194 * auVar306._12_4_ | (uint)!bVar194 * auVar308._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  auVar324._16_4_ =
                       (uint)bVar194 * auVar306._16_4_ | (uint)!bVar194 * auVar308._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  auVar324._20_4_ =
                       (uint)bVar194 * auVar306._20_4_ | (uint)!bVar194 * auVar308._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  auVar324._24_4_ =
                       (uint)bVar194 * auVar306._24_4_ | (uint)!bVar194 * auVar308._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  auVar324._28_4_ =
                       (uint)bVar194 * auVar306._28_4_ | (uint)!bVar194 * auVar308._28_4_;
                  bVar194 = (bool)(bVar27 & 1);
                  auVar324._32_4_ =
                       (uint)bVar194 * auVar306._32_4_ | (uint)!bVar194 * auVar308._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  auVar324._36_4_ =
                       (uint)bVar194 * auVar306._36_4_ | (uint)!bVar194 * auVar308._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  auVar324._40_4_ =
                       (uint)bVar194 * auVar306._40_4_ | (uint)!bVar194 * auVar308._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  auVar324._44_4_ =
                       (uint)bVar194 * auVar306._44_4_ | (uint)!bVar194 * auVar308._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  auVar324._48_4_ =
                       (uint)bVar194 * auVar306._48_4_ | (uint)!bVar194 * auVar308._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  auVar324._52_4_ =
                       (uint)bVar194 * auVar306._52_4_ | (uint)!bVar194 * auVar308._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  auVar324._56_4_ =
                       (uint)bVar194 * auVar306._56_4_ | (uint)!bVar194 * auVar308._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  auVar324._60_4_ =
                       (uint)bVar194 * auVar306._60_4_ | (uint)!bVar194 * auVar308._60_4_;
                  auVar306 = vfmadd231ps_avx512f(auVar309,auVar324,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar306 = vfmadd231ps_avx512f(auVar306,auVar356,auVar307);
                  auVar306 = vfmadd231ps_avx512f(auVar306,auVar324,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar306 = vmulps_avx512f(auVar306,auVar303);
                  auVar307 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar194 = (bool)((byte)uVar169 & 1);
                  auVar325._0_4_ = (uint)bVar194 * auVar307._0_4_ | (uint)!bVar194 * auVar306._0_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                  auVar325._4_4_ = (uint)bVar194 * auVar307._4_4_ | (uint)!bVar194 * auVar306._4_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                  auVar325._8_4_ = (uint)bVar194 * auVar307._8_4_ | (uint)!bVar194 * auVar306._8_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                  auVar325._12_4_ =
                       (uint)bVar194 * auVar307._12_4_ | (uint)!bVar194 * auVar306._12_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                  auVar325._16_4_ =
                       (uint)bVar194 * auVar307._16_4_ | (uint)!bVar194 * auVar306._16_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                  auVar325._20_4_ =
                       (uint)bVar194 * auVar307._20_4_ | (uint)!bVar194 * auVar306._20_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                  auVar325._24_4_ =
                       (uint)bVar194 * auVar307._24_4_ | (uint)!bVar194 * auVar306._24_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 7) & 1);
                  auVar325._28_4_ =
                       (uint)bVar194 * auVar307._28_4_ | (uint)!bVar194 * auVar306._28_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 8) & 1);
                  auVar325._32_4_ =
                       (uint)bVar194 * auVar307._32_4_ | (uint)!bVar194 * auVar306._32_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 9) & 1);
                  auVar325._36_4_ =
                       (uint)bVar194 * auVar307._36_4_ | (uint)!bVar194 * auVar306._36_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 10) & 1);
                  auVar325._40_4_ =
                       (uint)bVar194 * auVar307._40_4_ | (uint)!bVar194 * auVar306._40_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xb) & 1);
                  auVar325._44_4_ =
                       (uint)bVar194 * auVar307._44_4_ | (uint)!bVar194 * auVar306._44_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xc) & 1);
                  auVar325._48_4_ =
                       (uint)bVar194 * auVar307._48_4_ | (uint)!bVar194 * auVar306._48_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xd) & 1);
                  auVar325._52_4_ =
                       (uint)bVar194 * auVar307._52_4_ | (uint)!bVar194 * auVar306._52_4_;
                  bVar194 = (bool)((byte)(uVar169 >> 0xe) & 1);
                  auVar325._56_4_ =
                       (uint)bVar194 * auVar307._56_4_ | (uint)!bVar194 * auVar306._56_4_;
                  bVar194 = SUB81(uVar169 >> 0xf,0);
                  auVar325._60_4_ =
                       (uint)bVar194 * auVar307._60_4_ | (uint)!bVar194 * auVar306._60_4_;
                  auVar306 = vminps_avx512f(auVar325,(undefined1  [64])afVar139);
                  auVar306 = vmaxps_avx512f(auVar306,(undefined1  [64])afVar140);
                  auVar307 = vfmadd213ps_avx512f((undefined1  [64])afVar141,auVar306,
                                                 (undefined1  [64])afVar147);
                  auVar308 = vrndscaleps_avx512f(auVar307,1);
                  uVar168 = vcmpps_avx512f(auVar307,auVar308,1);
                  auVar307 = vsubps_avx512f(auVar308,(undefined1  [64])afVar138);
                  bVar194 = (bool)((byte)uVar168 & 1);
                  in_ZMM16._0_4_ = (uint)bVar194 * auVar307._0_4_ | (uint)!bVar194 * auVar308._0_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar194 * auVar307._4_4_ | (uint)!bVar194 * auVar308._4_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar194 * auVar307._8_4_ | (uint)!bVar194 * auVar308._8_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                  in_ZMM16._12_4_ =
                       (uint)bVar194 * auVar307._12_4_ | (uint)!bVar194 * auVar308._12_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                  in_ZMM16._16_4_ =
                       (uint)bVar194 * auVar307._16_4_ | (uint)!bVar194 * auVar308._16_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                  in_ZMM16._20_4_ =
                       (uint)bVar194 * auVar307._20_4_ | (uint)!bVar194 * auVar308._20_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                  in_ZMM16._24_4_ =
                       (uint)bVar194 * auVar307._24_4_ | (uint)!bVar194 * auVar308._24_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 7) & 1);
                  in_ZMM16._28_4_ =
                       (uint)bVar194 * auVar307._28_4_ | (uint)!bVar194 * auVar308._28_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 8) & 1);
                  in_ZMM16._32_4_ =
                       (uint)bVar194 * auVar307._32_4_ | (uint)!bVar194 * auVar308._32_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 9) & 1);
                  in_ZMM16._36_4_ =
                       (uint)bVar194 * auVar307._36_4_ | (uint)!bVar194 * auVar308._36_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 10) & 1);
                  in_ZMM16._40_4_ =
                       (uint)bVar194 * auVar307._40_4_ | (uint)!bVar194 * auVar308._40_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xb) & 1);
                  in_ZMM16._44_4_ =
                       (uint)bVar194 * auVar307._44_4_ | (uint)!bVar194 * auVar308._44_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xc) & 1);
                  in_ZMM16._48_4_ =
                       (uint)bVar194 * auVar307._48_4_ | (uint)!bVar194 * auVar308._48_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xd) & 1);
                  in_ZMM16._52_4_ =
                       (uint)bVar194 * auVar307._52_4_ | (uint)!bVar194 * auVar308._52_4_;
                  bVar194 = (bool)((byte)(uVar168 >> 0xe) & 1);
                  in_ZMM16._56_4_ =
                       (uint)bVar194 * auVar307._56_4_ | (uint)!bVar194 * auVar308._56_4_;
                  bVar194 = SUB81(uVar168 >> 0xf,0);
                  in_ZMM16._60_4_ =
                       (uint)bVar194 * auVar307._60_4_ | (uint)!bVar194 * auVar308._60_4_;
                  auVar306 = vfmadd231ps_avx512f(auVar306,in_ZMM16,auVar353);
                  auVar306 = vfmadd231ps_avx512f(auVar306,in_ZMM16,auVar354);
                  auVar307 = vmulps_avx512f(auVar306,auVar306);
                  auVar308 = vfmadd213ps_avx512f(auVar306,(undefined1  [64])afVar142,
                                                 (undefined1  [64])afVar143);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar144);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar145);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar146);
                  auVar308 = vfmadd213ps_avx512f(auVar308,auVar306,(undefined1  [64])afVar147);
                  auVar306 = vfmadd213ps_avx512f(auVar308,auVar307,auVar306);
                  auVar306 = vaddps_avx512f(auVar306,(undefined1  [64])afVar138);
                  auVar307 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar307 = vpaddd_avx512f(auVar307,auVar355);
                  auVar307 = vpslld_avx512f(auVar307,0x17);
                  in_ZMM8 = vfmadd213ps_avx512f(auVar307,auVar306,auVar357);
                  auVar306 = vdivps_avx512f(auVar357,in_ZMM8);
                  auVar306 = vfnmsub213ps_avx512f(auVar306,auVar303,auVar357);
                  goto LAB_0028d50a;
                case 6:
                  puVar1 = (uint *)(this->super_Deconvolution).activation_params.data;
                  auVar306 = vbroadcastss_avx512f(ZEXT416(*puVar1));
                  uVar181 = puVar1[1];
                  auVar126._4_4_ = uVar181;
                  auVar126._0_4_ = uVar181;
                  auVar126._8_4_ = uVar181;
                  auVar126._12_4_ = uVar181;
                  auVar126._16_4_ = uVar181;
                  auVar126._20_4_ = uVar181;
                  auVar126._24_4_ = uVar181;
                  auVar126._28_4_ = uVar181;
                  auVar126._32_4_ = uVar181;
                  auVar126._36_4_ = uVar181;
                  auVar126._40_4_ = uVar181;
                  auVar126._44_4_ = uVar181;
                  auVar126._48_4_ = uVar181;
                  auVar126._52_4_ = uVar181;
                  auVar126._56_4_ = uVar181;
                  auVar126._60_4_ = uVar181;
                  auVar306 = vfmadd213ps_avx512f(auVar306,auVar305,auVar126);
                  auVar306 = vmaxps_avx512f(auVar306,auVar304);
                  auVar306 = vminps_avx512f(auVar306,auVar357);
LAB_0028d50a:
                  auVar305 = vmulps_avx512f(auVar306,auVar305);
                }
                *pauVar188 = auVar305;
                pauVar188 = pauVar188 + 1;
                uVar173 = uVar173 + 1;
                iVar192 = iVar192 + 1;
              } while (uVar173 != local_228.w);
            }
            iVar170 = iVar170 + 1;
          } while (iVar170 != local_228.h);
        }
        local_2e8 = local_2e8 + 1;
      } while (local_2e8 != (long)local_228.c);
    }
    if ((local_158._0_4_ == 0x10) && (uVar177 == 1)) {
      lVar186 = (long)local_228.c;
      if (0 < lVar186) {
        iVar8 = (this->super_Deconvolution).dilation_w;
        iVar9 = (this->super_Deconvolution).dilation_h;
        iVar166 = (this->super_Deconvolution).stride_w;
        iVar156 = (this->super_Deconvolution).stride_h;
        iVar171 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar179 = (this->super_Deconvolution).kernel_w;
        uVar177 = (this->super_Deconvolution).kernel_h;
        lVar161 = local_228.elemsize * local_228.cstep;
        local_158._0_8_ = local_228.data;
        iVar191 = bottom_blob->w;
        iVar180 = bottom_blob->h;
        local_1d4 = (1 - uVar179) * iVar8;
        uVar167 = bottom_blob->c;
        local_1a8._0_4_ = local_228.h;
        local_2e8 = 0;
        do {
          if (0 < (int)local_1a8._0_4_) {
            sVar17 = (this->weight_data_tm).cstep;
            sVar13 = (this->weight_data_tm).elemsize;
            local_2b8 = (float *)(lVar161 * local_2e8 + local_158._0_8_);
            pvVar176 = (this->weight_data_tm).data;
            iVar190 = 0;
            do {
              if (0 < iVar182) {
                iVar192 = bottom_blob->w;
                pvVar11 = bottom_blob->data;
                sVar14 = bottom_blob->elemsize;
                sVar15 = bottom_blob->cstep;
                pfVar193 = (float *)(this->super_Deconvolution).activation_params.data;
                uVar165 = 0;
                iVar170 = local_1d4;
                do {
                  if (pvVar16 == (void *)0x0) {
                    fVar367 = 0.0;
                  }
                  else {
                    fVar367 = *(float *)((long)pvVar16 + local_2e8 * 4);
                  }
                  if ((int)uVar167 < 1) {
                    auVar352 = ZEXT864(0);
                  }
                  else {
                    auVar352 = ZEXT864(0);
                    uVar168 = 0;
                    pvVar185 = (void *)(sVar17 * local_2e8 * sVar13 + (long)pvVar176);
                    do {
                      if (0 < (int)uVar177) {
                        uVar169 = 0;
                        uVar174 = 0;
                        do {
                          iVar157 = (((int)uVar174 - uVar177) + 1) * iVar9 + iVar190;
                          if (((-1 < iVar157) &&
                              (iVar158 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                             ((0 < (int)uVar179 && (iVar158 < iVar180)))) {
                            uVar178 = (ulong)uVar179;
                            uVar183 = uVar169;
                            iVar157 = iVar170;
                            do {
                              if (((-1 < iVar157) &&
                                  (iVar159 = iVar157 / iVar166, iVar157 % iVar166 == 0)) &&
                                 (iVar159 < iVar191)) {
                                auVar352 = vfmadd231ps_avx512f(auVar352,*(undefined1 (*) [64])
                                                                         ((long)pvVar11 +
                                                                         (long)(iVar159 << 4) * 4 +
                                                                         (long)iVar158 *
                                                                         (long)iVar192 * sVar14 +
                                                                         sVar15 * sVar14 * uVar168),
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar185 +
                                                                (uVar183 & 0xffffffff) * 4));
                              }
                              uVar183 = uVar183 + 0x10;
                              iVar157 = iVar157 + iVar8;
                              uVar178 = uVar178 - 1;
                            } while (uVar178 != 0);
                          }
                          uVar174 = uVar174 + 1;
                          uVar169 = uVar169 + (ulong)uVar179 * 0x10;
                        } while (uVar174 != uVar177);
                      }
                      pvVar185 = (void *)((long)pvVar185 + (long)(int)(uVar179 * uVar177 * 0x10) * 4
                                         );
                      uVar168 = uVar168 + 1;
                    } while (uVar168 != uVar167);
                  }
                  auVar251 = vextractf64x4_avx512f(auVar352,1);
                  fVar384 = auVar352._4_4_ + auVar251._4_4_;
                  auVar370._0_4_ =
                       auVar352._0_4_ + auVar251._0_4_ + auVar352._16_4_ + auVar251._16_4_;
                  auVar370._4_4_ = fVar384 + fVar384;
                  auVar370._8_4_ =
                       auVar352._8_4_ + auVar251._8_4_ + auVar352._24_4_ + auVar251._24_4_;
                  auVar370._12_4_ =
                       auVar352._12_4_ + auVar251._12_4_ + auVar352._28_4_ + auVar251._28_4_;
                  auVar198 = vshufpd_avx(auVar370,auVar370,1);
                  auVar371._0_4_ = auVar198._0_4_ + auVar370._0_4_;
                  auVar371._4_4_ = auVar198._4_4_ + auVar370._4_4_;
                  auVar371._8_4_ = auVar198._8_4_ + auVar370._8_4_;
                  auVar371._12_4_ = auVar198._12_4_ + auVar370._12_4_;
                  auVar198 = vmovshdup_avx(auVar371);
                  fVar367 = auVar198._0_4_ + fVar367 + auVar371._0_4_;
                  auVar198 = ZEXT416((uint)fVar367);
                  fVar384 = fVar367;
                  switch(iVar171) {
                  case 1:
                    auVar198 = vmaxss_avx(auVar198,ZEXT416(0));
                    fVar384 = auVar198._0_4_;
                    break;
                  case 2:
                    uVar37 = vcmpss_avx512f(auVar198,ZEXT416(0),0xe);
                    bVar194 = (bool)((byte)uVar37 & 1);
                    fVar384 = (float)((uint)bVar194 * 0x3f800000 + (uint)!bVar194 * (int)*pfVar193)
                              * fVar367;
                    break;
                  case 3:
                    auVar198 = vmaxss_avx(auVar198,ZEXT416((uint)*pfVar193));
                    fVar384 = auVar198._0_4_;
                    if (pfVar193[1] < auVar198._0_4_) {
                      fVar384 = pfVar193[1];
                    }
                    break;
                  case 4:
                    auVar198 = vminss_avx(auVar198,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar47._8_4_ = 0x80000000;
                    auVar47._0_8_ = 0x8000000080000000;
                    auVar47._12_4_ = 0x80000000;
                    auVar199 = vxorps_avx512vl(auVar198,auVar47);
                    uVar37 = vcmpss_avx512f(auVar198,ZEXT416(0xc2b0c0a5),1);
                    bVar194 = (bool)((byte)uVar37 & 1);
                    fVar367 = expf((float)((uint)bVar194 * 0x42b0c0a5 +
                                          (uint)!bVar194 * auVar199._0_4_));
                    fVar384 = 1.0 / (fVar367 + 1.0);
                    break;
                  case 5:
                    fVar384 = expf(fVar367);
                    fVar384 = logf(fVar384 + 1.0);
                    fVar384 = tanhf(fVar384);
                    fVar384 = fVar384 * fVar367;
                    break;
                  case 6:
                    fVar3 = *pfVar193;
                    auVar46._8_4_ = 0x80000000;
                    auVar46._0_8_ = 0x8000000080000000;
                    auVar46._12_4_ = 0x80000000;
                    auVar199 = vxorps_avx512vl(ZEXT416((uint)pfVar193[1]),auVar46);
                    fVar391 = auVar199._0_4_ / fVar3;
                    fVar384 = 0.0;
                    if ((fVar391 <= fVar367) &&
                       (fVar384 = fVar367, fVar367 <= fVar391 + 1.0 / fVar3)) {
                      auVar198 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar198,
                                                 ZEXT416((uint)pfVar193[1]));
                      fVar384 = auVar198._0_4_ * fVar367;
                    }
                  }
                  *local_2b8 = fVar384;
                  local_2b8 = local_2b8 + 1;
                  uVar165 = uVar165 + 1;
                  iVar170 = iVar170 + 1;
                } while (uVar165 != iVar182);
              }
              iVar190 = iVar190 + 1;
            } while (iVar190 != local_1a8._0_4_);
          }
          local_2e8 = local_2e8 + 1;
        } while (local_2e8 != lVar186);
      }
    }
    else {
      local_1e0._4_4_ = local_228.c >> 0x1f;
      local_1e0._0_4_ = uVar177 ^ 8;
      if ((local_158._0_4_ == 8 && uVar177 == 8) && (0 < (long)local_228.c)) {
        iVar8 = (this->super_Deconvolution).dilation_w;
        iVar9 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar171 = (this->super_Deconvolution).stride_h;
        iVar191 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar179 = (this->super_Deconvolution).kernel_w;
        uVar167 = (this->super_Deconvolution).kernel_h;
        local_2e8 = 0;
        auVar388._8_4_ = 0x42b0c0a5;
        auVar388._0_8_ = 0x42b0c0a542b0c0a5;
        auVar388._12_4_ = 0x42b0c0a5;
        auVar388._16_4_ = 0x42b0c0a5;
        auVar388._20_4_ = 0x42b0c0a5;
        auVar388._24_4_ = 0x42b0c0a5;
        auVar388._28_4_ = 0x42b0c0a5;
        auVar397._8_4_ = 0xc2b0c0a5;
        auVar397._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar397._12_4_ = 0xc2b0c0a5;
        auVar397._16_4_ = 0xc2b0c0a5;
        auVar397._20_4_ = 0xc2b0c0a5;
        auVar397._24_4_ = 0xc2b0c0a5;
        auVar397._28_4_ = 0xc2b0c0a5;
        auVar403._8_4_ = 0x3f000000;
        auVar403._0_8_ = 0x3f0000003f000000;
        auVar403._12_4_ = 0x3f000000;
        auVar403._16_4_ = 0x3f000000;
        auVar403._20_4_ = 0x3f000000;
        auVar403._24_4_ = 0x3f000000;
        auVar403._28_4_ = 0x3f000000;
        auVar409._8_4_ = 0x3fb8aa3b;
        auVar409._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar409._12_4_ = 0x3fb8aa3b;
        auVar409._16_4_ = 0x3fb8aa3b;
        auVar409._20_4_ = 0x3fb8aa3b;
        auVar409._24_4_ = 0x3fb8aa3b;
        auVar409._28_4_ = 0x3fb8aa3b;
        auVar415._8_4_ = 0x3f800000;
        auVar415._0_8_ = 0x3f8000003f800000;
        auVar415._12_4_ = 0x3f800000;
        auVar415._16_4_ = 0x3f800000;
        auVar415._20_4_ = 0x3f800000;
        auVar415._24_4_ = 0x3f800000;
        auVar415._28_4_ = 0x3f800000;
        auVar421._8_4_ = 0x3f318000;
        auVar421._0_8_ = 0x3f3180003f318000;
        auVar421._12_4_ = 0x3f318000;
        auVar421._16_4_ = 0x3f318000;
        auVar421._20_4_ = 0x3f318000;
        auVar421._24_4_ = 0x3f318000;
        auVar421._28_4_ = 0x3f318000;
        auVar251 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar473._8_4_ = 0x3ab743ce;
        auVar473._0_8_ = 0x3ab743ce3ab743ce;
        auVar473._12_4_ = 0x3ab743ce;
        auVar473._16_4_ = 0x3ab743ce;
        auVar473._20_4_ = 0x3ab743ce;
        auVar473._24_4_ = 0x3ab743ce;
        auVar473._28_4_ = 0x3ab743ce;
        auVar479._8_4_ = 0x3c088908;
        auVar479._0_8_ = 0x3c0889083c088908;
        auVar479._12_4_ = 0x3c088908;
        auVar479._16_4_ = 0x3c088908;
        auVar479._20_4_ = 0x3c088908;
        auVar479._24_4_ = 0x3c088908;
        auVar479._28_4_ = 0x3c088908;
        auVar485._8_4_ = 0x3d2aa9c1;
        auVar485._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar485._12_4_ = 0x3d2aa9c1;
        auVar485._16_4_ = 0x3d2aa9c1;
        auVar485._20_4_ = 0x3d2aa9c1;
        auVar485._24_4_ = 0x3d2aa9c1;
        auVar485._28_4_ = 0x3d2aa9c1;
        auVar491._8_4_ = 0x3e2aaaaa;
        auVar491._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar491._12_4_ = 0x3e2aaaaa;
        auVar491._16_4_ = 0x3e2aaaaa;
        auVar491._20_4_ = 0x3e2aaaaa;
        auVar491._24_4_ = 0x3e2aaaaa;
        auVar491._28_4_ = 0x3e2aaaaa;
        auVar497._8_4_ = 0x3f800000;
        auVar497._0_8_ = 0x3f8000003f800000;
        auVar497._12_4_ = 0x3f800000;
        auVar497._16_4_ = 0x3f800000;
        auVar497._20_4_ = 0x3f800000;
        auVar497._24_4_ = 0x3f800000;
        auVar497._28_4_ = 0x3f800000;
        auVar503._8_4_ = 0xb95e8083;
        auVar503._0_8_ = 0xb95e8083b95e8083;
        auVar503._12_4_ = 0xb95e8083;
        auVar503._16_4_ = 0xb95e8083;
        auVar503._20_4_ = 0xb95e8083;
        auVar503._24_4_ = 0xb95e8083;
        auVar503._28_4_ = 0xb95e8083;
        auVar252 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar273 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar274 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar275 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar276 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar277 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar278 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar279 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar280 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar180 = bottom_blob->w;
            iVar190 = bottom_blob->h;
            pauVar189 = (undefined1 (*) [32])
                        (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
            uVar165 = bottom_blob->c;
            iVar170 = 0;
            do {
              if (0 < local_228.w) {
                uVar173 = 0;
                iVar192 = (1 - uVar179) * iVar8;
                do {
                  if (pvVar16 == (void *)0x0) {
                    auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar352 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar16 + local_2e8 * 0x20));
                  }
                  if (0 < (int)uVar165) {
                    pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar11 = bottom_blob->data;
                    uVar168 = 0;
                    do {
                      if (0 < (int)uVar167) {
                        uVar169 = 0;
                        uVar174 = 0;
                        do {
                          iVar157 = (((int)uVar174 - uVar167) + 1) * iVar9 + iVar170;
                          if ((((-1 < iVar157) &&
                               (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                              (0 < (int)uVar179)) && (iVar158 < iVar190)) {
                            lVar186 = (long)iVar158 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar168;
                            uVar178 = (ulong)uVar179;
                            uVar183 = uVar169;
                            iVar157 = iVar192;
                            do {
                              if (((-1 < iVar157) &&
                                  (iVar158 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                                 (iVar158 < iVar180)) {
                                lVar161 = (long)(iVar158 << 3);
                                uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186);
                                auVar437._4_4_ = uVar2;
                                auVar437._0_4_ = uVar2;
                                auVar437._8_4_ = uVar2;
                                auVar437._12_4_ = uVar2;
                                auVar437._16_4_ = uVar2;
                                auVar437._20_4_ = uVar2;
                                auVar437._24_4_ = uVar2;
                                auVar437._28_4_ = uVar2;
                                in_ZMM8 = ZEXT3264(auVar437);
                                uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186 + 4);
                                auVar462._4_4_ = uVar2;
                                auVar462._0_4_ = uVar2;
                                auVar462._8_4_ = uVar2;
                                auVar462._12_4_ = uVar2;
                                auVar462._16_4_ = uVar2;
                                auVar462._20_4_ = uVar2;
                                auVar462._24_4_ = uVar2;
                                auVar462._28_4_ = uVar2;
                                auVar281 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 8)));
                                in_ZMM16 = ZEXT3264(auVar281);
                                auVar282 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0xc))
                                                     );
                                auVar283 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0x10)
                                                             ));
                                auVar284 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0x14)
                                                             ));
                                auVar253 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0x18)
                                                             ));
                                auVar254 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0x1c)
                                                             ));
                                uVar196 = uVar183 & 0xffffffff;
                                auVar198 = vfmadd231ps_fma(auVar352._0_32_,auVar437,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar176 + uVar196 * 4));
                                auVar198 = vfmadd231ps_fma(ZEXT1632(auVar198),auVar462,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar176 + uVar196 * 4 + 0x20));
                                auVar281 = vfmadd231ps_avx512vl
                                                     (ZEXT1632(auVar198),auVar281,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x40));
                                auVar281 = vfmadd231ps_avx512vl
                                                     (auVar281,auVar282,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x60));
                                auVar281 = vfmadd231ps_avx512vl
                                                     (auVar281,auVar283,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x80));
                                auVar281 = vfmadd231ps_avx512vl
                                                     (auVar281,auVar284,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar176 + uVar196 * 4 + 0xa0));
                                auVar281 = vfmadd231ps_avx512vl
                                                     (auVar281,auVar253,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar176 + uVar196 * 4 + 0xc0));
                                auVar281 = vfmadd231ps_avx512vl
                                                     (auVar281,auVar254,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar176 + uVar196 * 4 + 0xe0));
                                auVar352 = ZEXT3264(auVar281);
                              }
                              uVar183 = uVar183 + 0x40;
                              iVar157 = iVar157 + iVar8;
                              uVar178 = uVar178 - 1;
                            } while (uVar178 != 0);
                          }
                          uVar174 = uVar174 + 1;
                          uVar169 = uVar169 + (ulong)uVar179 * 0x40;
                        } while (uVar174 != uVar167);
                      }
                      pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar179 * uVar167 * 0x40) * 4
                                         );
                      uVar168 = uVar168 + 1;
                    } while (uVar168 != uVar165);
                  }
                  auVar281 = auVar352._0_32_;
                  auVar282 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                  switch(iVar191) {
                  case 1:
                    auVar281 = vmaxps_avx(auVar281,auVar282);
                    break;
                  case 2:
                    auVar283 = vmaxps_avx(auVar281,auVar282);
                    in_ZMM8 = ZEXT3264(auVar283);
                    auVar281 = vminps_avx(auVar281,auVar282);
                    uVar2 = *(this->super_Deconvolution).activation_params.data;
                    auVar100._4_4_ = uVar2;
                    auVar100._0_4_ = uVar2;
                    auVar100._8_4_ = uVar2;
                    auVar100._12_4_ = uVar2;
                    auVar100._16_4_ = uVar2;
                    auVar100._20_4_ = uVar2;
                    auVar100._24_4_ = uVar2;
                    auVar100._28_4_ = uVar2;
                    auVar281 = vfmadd132ps_avx512vl(auVar281,auVar283,auVar100);
                    break;
                  case 3:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar98._4_4_ = uVar2;
                    auVar98._0_4_ = uVar2;
                    auVar98._8_4_ = uVar2;
                    auVar98._12_4_ = uVar2;
                    auVar98._16_4_ = uVar2;
                    auVar98._20_4_ = uVar2;
                    auVar98._24_4_ = uVar2;
                    auVar98._28_4_ = uVar2;
                    auVar281 = vmaxps_avx512vl(auVar281,auVar98);
                    uVar2 = puVar12[1];
                    auVar99._4_4_ = uVar2;
                    auVar99._0_4_ = uVar2;
                    auVar99._8_4_ = uVar2;
                    auVar99._12_4_ = uVar2;
                    auVar99._16_4_ = uVar2;
                    auVar99._20_4_ = uVar2;
                    auVar99._24_4_ = uVar2;
                    auVar99._28_4_ = uVar2;
                    auVar281 = vminps_avx512vl(auVar281,auVar99);
                    break;
                  case 4:
                    auVar96._8_4_ = 0x80000000;
                    auVar96._0_8_ = 0x8000000080000000;
                    auVar96._12_4_ = 0x80000000;
                    auVar96._16_4_ = 0x80000000;
                    auVar96._20_4_ = 0x80000000;
                    auVar96._24_4_ = 0x80000000;
                    auVar96._28_4_ = 0x80000000;
                    auVar281 = vxorps_avx512vl(auVar281,auVar96);
                    auVar281 = vminps_avx(auVar281,auVar388);
                    auVar281 = vmaxps_avx(auVar281,auVar397);
                    auVar198 = vfmadd231ps_fma(auVar403,auVar281,auVar409);
                    auVar282 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar282,1);
                    auVar283 = vsubps_avx512vl(auVar282,auVar415);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar290._0_4_ =
                         (uint)bVar194 * auVar283._0_4_ | (uint)!bVar194 * auVar282._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar290._4_4_ =
                         (uint)bVar194 * auVar283._4_4_ | (uint)!bVar194 * auVar282._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar290._8_4_ =
                         (uint)bVar194 * auVar283._8_4_ | (uint)!bVar194 * auVar282._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar290._12_4_ =
                         (uint)bVar194 * auVar283._12_4_ | (uint)!bVar194 * auVar282._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar290._16_4_ =
                         (uint)bVar194 * auVar283._16_4_ | (uint)!bVar194 * auVar282._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar290._20_4_ =
                         (uint)bVar194 * auVar283._20_4_ | (uint)!bVar194 * auVar282._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar290._24_4_ =
                         (uint)bVar194 * auVar283._24_4_ | (uint)!bVar194 * auVar282._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar290._28_4_ =
                         (uint)bVar194 * auVar283._28_4_ | (uint)!bVar194 * auVar282._28_4_;
                    in_ZMM16 = ZEXT3264(auVar290);
                    auVar281 = vfmsub231ps_avx512vl(auVar281,auVar290,auVar421);
                    auVar97._8_4_ = 0x395e8083;
                    auVar97._0_8_ = 0x395e8083395e8083;
                    auVar97._12_4_ = 0x395e8083;
                    auVar97._16_4_ = 0x395e8083;
                    auVar97._20_4_ = 0x395e8083;
                    auVar97._24_4_ = 0x395e8083;
                    auVar97._28_4_ = 0x395e8083;
                    auVar281 = vfmsub231ps_avx512vl(auVar281,auVar290,auVar97);
                    auVar438._0_4_ = auVar281._0_4_ * auVar281._0_4_;
                    auVar438._4_4_ = auVar281._4_4_ * auVar281._4_4_;
                    auVar438._8_4_ = auVar281._8_4_ * auVar281._8_4_;
                    auVar438._12_4_ = auVar281._12_4_ * auVar281._12_4_;
                    auVar438._16_4_ = auVar281._16_4_ * auVar281._16_4_;
                    auVar438._20_4_ = auVar281._20_4_ * auVar281._20_4_;
                    auVar438._24_4_ = auVar281._24_4_ * auVar281._24_4_;
                    auVar438._28_4_ = 0;
                    auVar198 = vfmadd213ps_fma(auVar251,auVar281,auVar473);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar281,auVar479);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar281,auVar485);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar281,auVar491);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar281,auVar403);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar438,auVar281);
                    auVar380._0_4_ = auVar198._0_4_ + 1.0;
                    auVar380._4_4_ = auVar198._4_4_ + 1.0;
                    auVar380._8_4_ = auVar198._8_4_ + 1.0;
                    auVar380._12_4_ = auVar198._12_4_ + 1.0;
                    auVar380._16_4_ = 0x3f800000;
                    auVar380._20_4_ = 0x3f800000;
                    auVar380._24_4_ = 0x3f800000;
                    auVar380._28_4_ = 0x3f800000;
                    auVar281 = vcvttps2dq_avx512vl(auVar290);
                    auVar281 = vpslld_avx2(auVar281,0x17);
                    auVar281 = vpaddd_avx2(auVar281,auVar497);
                    auVar198 = vfmadd213ps_fma(auVar281,auVar380,auVar415);
                    in_ZMM8 = ZEXT1664(auVar198);
                    auVar281 = vdivps_avx(auVar415,ZEXT1632(auVar198));
                    break;
                  case 5:
                    auVar281 = vminps_avx(auVar281,auVar388);
                    auVar281 = vmaxps_avx(auVar281,auVar397);
                    auVar198 = vfmadd213ps_fma(auVar409,auVar281,auVar403);
                    auVar283 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar283,1);
                    auVar284 = vsubps_avx512vl(auVar283,auVar415);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar285._0_4_ =
                         (uint)bVar194 * auVar284._0_4_ | (uint)!bVar194 * auVar283._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar285._4_4_ =
                         (uint)bVar194 * auVar284._4_4_ | (uint)!bVar194 * auVar283._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar285._8_4_ =
                         (uint)bVar194 * auVar284._8_4_ | (uint)!bVar194 * auVar283._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar285._12_4_ =
                         (uint)bVar194 * auVar284._12_4_ | (uint)!bVar194 * auVar283._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar285._16_4_ =
                         (uint)bVar194 * auVar284._16_4_ | (uint)!bVar194 * auVar283._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar285._20_4_ =
                         (uint)bVar194 * auVar284._20_4_ | (uint)!bVar194 * auVar283._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar285._24_4_ =
                         (uint)bVar194 * auVar284._24_4_ | (uint)!bVar194 * auVar283._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar285._28_4_ =
                         (uint)bVar194 * auVar284._28_4_ | (uint)!bVar194 * auVar283._28_4_;
                    auVar281 = vfmsub231ps_avx512vl(auVar281,auVar285,auVar421);
                    auVar281 = vfnmsub231ps_avx512vl(auVar281,auVar285,auVar503);
                    auVar463._0_4_ = auVar281._0_4_ * auVar281._0_4_;
                    auVar463._4_4_ = auVar281._4_4_ * auVar281._4_4_;
                    auVar463._8_4_ = auVar281._8_4_ * auVar281._8_4_;
                    auVar463._12_4_ = auVar281._12_4_ * auVar281._12_4_;
                    auVar463._16_4_ = auVar281._16_4_ * auVar281._16_4_;
                    auVar463._20_4_ = auVar281._20_4_ * auVar281._20_4_;
                    auVar463._24_4_ = auVar281._24_4_ * auVar281._24_4_;
                    auVar463._28_4_ = 0;
                    auVar283 = vfmadd213ps_avx512vl(auVar251,auVar281,auVar473);
                    auVar283 = vfmadd213ps_avx512vl(auVar283,auVar281,auVar479);
                    auVar283 = vfmadd213ps_avx512vl(auVar283,auVar281,auVar485);
                    auVar283 = vfmadd213ps_avx512vl(auVar283,auVar281,auVar491);
                    auVar283 = vfmadd213ps_avx512vl(auVar283,auVar281,auVar403);
                    auVar281 = vfmadd213ps_avx512vl(auVar283,auVar463,auVar281);
                    auVar283 = vaddps_avx512vl(auVar281,auVar415);
                    auVar281 = vcvttps2dq_avx512vl(auVar285);
                    auVar281 = vpslld_avx2(auVar281,0x17);
                    auVar281 = vpaddd_avx2(auVar281,auVar497);
                    auVar198 = vfmadd213ps_fma(auVar281,auVar283,auVar415);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar282,2);
                    auVar90._8_4_ = 0x800000;
                    auVar90._0_8_ = 0x80000000800000;
                    auVar90._12_4_ = 0x800000;
                    auVar90._16_4_ = 0x800000;
                    auVar90._20_4_ = 0x800000;
                    auVar90._24_4_ = 0x800000;
                    auVar90._28_4_ = 0x800000;
                    auVar281 = vmaxps_avx512vl(ZEXT1632(auVar198),auVar90);
                    auVar284 = vpsrld_avx2(auVar281,0x17);
                    auVar282 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar91._8_4_ = 0x3f000000;
                    auVar91._0_8_ = 0x3f0000003f000000;
                    auVar91._12_4_ = 0x3f000000;
                    auVar91._16_4_ = 0x3f000000;
                    auVar91._20_4_ = 0x3f000000;
                    auVar91._24_4_ = 0x3f000000;
                    auVar91._28_4_ = 0x3f000000;
                    auVar281 = vpternlogd_avx512vl(auVar281,auVar282,auVar91,0xea);
                    auVar92._8_4_ = 0x3f3504f3;
                    auVar92._0_8_ = 0x3f3504f33f3504f3;
                    auVar92._12_4_ = 0x3f3504f3;
                    auVar92._16_4_ = 0x3f3504f3;
                    auVar92._20_4_ = 0x3f3504f3;
                    auVar92._24_4_ = 0x3f3504f3;
                    auVar92._28_4_ = 0x3f3504f3;
                    uVar169 = vcmpps_avx512vl(auVar281,auVar92,1);
                    auVar282 = vaddps_avx512vl(auVar281,auVar252);
                    auVar281 = vaddps_avx512vl(auVar282,auVar281);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar286._0_4_ =
                         (uint)bVar194 * auVar281._0_4_ | (uint)!bVar194 * auVar282._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar286._4_4_ =
                         (uint)bVar194 * auVar281._4_4_ | (uint)!bVar194 * auVar282._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar286._8_4_ =
                         (uint)bVar194 * auVar281._8_4_ | (uint)!bVar194 * auVar282._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar286._12_4_ =
                         (uint)bVar194 * auVar281._12_4_ | (uint)!bVar194 * auVar282._12_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                    auVar286._16_4_ =
                         (uint)bVar194 * auVar281._16_4_ | (uint)!bVar194 * auVar282._16_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                    auVar286._20_4_ =
                         (uint)bVar194 * auVar281._20_4_ | (uint)!bVar194 * auVar282._20_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                    auVar286._24_4_ =
                         (uint)bVar194 * auVar281._24_4_ | (uint)!bVar194 * auVar282._24_4_;
                    bVar194 = SUB81(uVar169 >> 7,0);
                    auVar286._28_4_ =
                         (uint)bVar194 * auVar281._28_4_ | (uint)!bVar194 * auVar282._28_4_;
                    auVar282 = vmulps_avx512vl(auVar286,auVar286);
                    auVar93._8_4_ = 0xbdebd1b8;
                    auVar93._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar93._12_4_ = 0xbdebd1b8;
                    auVar93._16_4_ = 0xbdebd1b8;
                    auVar93._20_4_ = 0xbdebd1b8;
                    auVar93._24_4_ = 0xbdebd1b8;
                    auVar93._28_4_ = 0xbdebd1b8;
                    auVar281 = vfmadd213ps_avx512vl(auVar273,auVar286,auVar93);
                    auVar94._8_4_ = 0x3def251a;
                    auVar94._0_8_ = 0x3def251a3def251a;
                    auVar94._12_4_ = 0x3def251a;
                    auVar94._16_4_ = 0x3def251a;
                    auVar94._20_4_ = 0x3def251a;
                    auVar94._24_4_ = 0x3def251a;
                    auVar94._28_4_ = 0x3def251a;
                    auVar281 = vfmadd213ps_avx512vl(auVar281,auVar286,auVar94);
                    auVar281 = vfmadd213ps_avx512vl(auVar281,auVar286,auVar274);
                    auVar281 = vfmadd213ps_avx512vl(auVar281,auVar286,auVar275);
                    auVar281 = vfmadd213ps_avx512vl(auVar281,auVar286,auVar276);
                    auVar281 = vfmadd213ps_avx512vl(auVar281,auVar286,auVar277);
                    auVar281 = vfmadd213ps_avx512vl(auVar281,auVar286,auVar278);
                    auVar281 = vfmadd213ps_avx512vl(auVar281,auVar286,auVar279);
                    auVar283 = vmulps_avx512vl(auVar282,auVar286);
                    auVar283 = vmulps_avx512vl(auVar283,auVar281);
                    auVar95._8_4_ = 0xffffff82;
                    auVar95._0_8_ = 0xffffff82ffffff82;
                    auVar95._12_4_ = 0xffffff82;
                    auVar95._16_4_ = 0xffffff82;
                    auVar95._20_4_ = 0xffffff82;
                    auVar95._24_4_ = 0xffffff82;
                    auVar95._28_4_ = 0xffffff82;
                    auVar281 = vpaddd_avx512vl(auVar284,auVar95);
                    auVar281 = vcvtdq2ps_avx(auVar281);
                    auVar284 = vsubps_avx512vl(auVar281,auVar415);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar287._0_4_ =
                         (uint)bVar194 * auVar284._0_4_ | (uint)!bVar194 * auVar281._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar287._4_4_ =
                         (uint)bVar194 * auVar284._4_4_ | (uint)!bVar194 * auVar281._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar287._8_4_ =
                         (uint)bVar194 * auVar284._8_4_ | (uint)!bVar194 * auVar281._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar287._12_4_ =
                         (uint)bVar194 * auVar284._12_4_ | (uint)!bVar194 * auVar281._12_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                    auVar287._16_4_ =
                         (uint)bVar194 * auVar284._16_4_ | (uint)!bVar194 * auVar281._16_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                    auVar287._20_4_ =
                         (uint)bVar194 * auVar284._20_4_ | (uint)!bVar194 * auVar281._20_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                    auVar287._24_4_ =
                         (uint)bVar194 * auVar284._24_4_ | (uint)!bVar194 * auVar281._24_4_;
                    bVar194 = SUB81(uVar169 >> 7,0);
                    auVar287._28_4_ =
                         (uint)bVar194 * auVar284._28_4_ | (uint)!bVar194 * auVar281._28_4_;
                    auVar281 = vfmadd231ps_avx512vl(auVar283,auVar287,auVar503);
                    auVar281 = vfmsub231ps_avx512vl(auVar281,auVar403,auVar282);
                    auVar281 = vsubps_avx512vl(auVar281,auVar286);
                    auVar198 = vfmsub231ps_fma(auVar281,auVar421,auVar287);
                    auVar281 = vmulps_avx512vl(ZEXT1632(auVar198),auVar280);
                    auVar282 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar288._0_4_ =
                         (uint)bVar194 * auVar282._0_4_ | (uint)!bVar194 * auVar281._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar288._4_4_ =
                         (uint)bVar194 * auVar282._4_4_ | (uint)!bVar194 * auVar281._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar288._8_4_ =
                         (uint)bVar194 * auVar282._8_4_ | (uint)!bVar194 * auVar281._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar288._12_4_ =
                         (uint)bVar194 * auVar282._12_4_ | (uint)!bVar194 * auVar281._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar288._16_4_ =
                         (uint)bVar194 * auVar282._16_4_ | (uint)!bVar194 * auVar281._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar288._20_4_ =
                         (uint)bVar194 * auVar282._20_4_ | (uint)!bVar194 * auVar281._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar288._24_4_ =
                         (uint)bVar194 * auVar282._24_4_ | (uint)!bVar194 * auVar281._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar288._28_4_ =
                         (uint)bVar194 * auVar282._28_4_ | (uint)!bVar194 * auVar281._28_4_;
                    auVar281 = vminps_avx(auVar288,auVar388);
                    auVar281 = vmaxps_avx(auVar281,auVar397);
                    auVar198 = vfmadd213ps_fma(auVar409,auVar281,auVar403);
                    auVar282 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar282,1);
                    auVar283 = vsubps_avx512vl(auVar282,auVar415);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar289._0_4_ =
                         (uint)bVar194 * auVar283._0_4_ | (uint)!bVar194 * auVar282._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar289._4_4_ =
                         (uint)bVar194 * auVar283._4_4_ | (uint)!bVar194 * auVar282._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar289._8_4_ =
                         (uint)bVar194 * auVar283._8_4_ | (uint)!bVar194 * auVar282._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar289._12_4_ =
                         (uint)bVar194 * auVar283._12_4_ | (uint)!bVar194 * auVar282._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar289._16_4_ =
                         (uint)bVar194 * auVar283._16_4_ | (uint)!bVar194 * auVar282._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar289._20_4_ =
                         (uint)bVar194 * auVar283._20_4_ | (uint)!bVar194 * auVar282._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar289._24_4_ =
                         (uint)bVar194 * auVar283._24_4_ | (uint)!bVar194 * auVar282._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar289._28_4_ =
                         (uint)bVar194 * auVar283._28_4_ | (uint)!bVar194 * auVar282._28_4_;
                    in_ZMM16 = ZEXT3264(auVar289);
                    auVar281 = vfmsub231ps_avx512vl(auVar281,auVar289,auVar421);
                    auVar281 = vfnmsub231ps_avx512vl(auVar281,auVar289,auVar503);
                    auVar464._0_4_ = auVar281._0_4_ * auVar281._0_4_;
                    auVar464._4_4_ = auVar281._4_4_ * auVar281._4_4_;
                    auVar464._8_4_ = auVar281._8_4_ * auVar281._8_4_;
                    auVar464._12_4_ = auVar281._12_4_ * auVar281._12_4_;
                    auVar464._16_4_ = auVar281._16_4_ * auVar281._16_4_;
                    auVar464._20_4_ = auVar281._20_4_ * auVar281._20_4_;
                    auVar464._24_4_ = auVar281._24_4_ * auVar281._24_4_;
                    auVar464._28_4_ = 0;
                    auVar282 = vfmadd213ps_avx512vl(auVar251,auVar281,auVar473);
                    auVar282 = vfmadd213ps_avx512vl(auVar282,auVar281,auVar479);
                    auVar282 = vfmadd213ps_avx512vl(auVar282,auVar281,auVar485);
                    auVar282 = vfmadd213ps_avx512vl(auVar282,auVar281,auVar491);
                    auVar282 = vfmadd213ps_avx512vl(auVar282,auVar281,auVar403);
                    auVar281 = vfmadd213ps_avx512vl(auVar282,auVar464,auVar281);
                    auVar282 = vaddps_avx512vl(auVar281,auVar415);
                    auVar281 = vcvttps2dq_avx512vl(auVar289);
                    auVar281 = vpslld_avx2(auVar281,0x17);
                    auVar281 = vpaddd_avx2(auVar281,auVar497);
                    auVar198 = vfmadd213ps_fma(auVar281,auVar282,auVar415);
                    auVar281 = vdivps_avx(auVar415,ZEXT1632(auVar198));
                    auVar281 = vfnmadd213ps_avx512vl(auVar281,auVar280,auVar252);
                    goto LAB_0028e58d;
                  case 6:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar439._4_4_ = uVar2;
                    auVar439._0_4_ = uVar2;
                    auVar439._8_4_ = uVar2;
                    auVar439._12_4_ = uVar2;
                    auVar439._16_4_ = uVar2;
                    auVar439._20_4_ = uVar2;
                    auVar439._24_4_ = uVar2;
                    auVar439._28_4_ = uVar2;
                    uVar2 = puVar12[1];
                    auVar89._4_4_ = uVar2;
                    auVar89._0_4_ = uVar2;
                    auVar89._8_4_ = uVar2;
                    auVar89._12_4_ = uVar2;
                    auVar89._16_4_ = uVar2;
                    auVar89._20_4_ = uVar2;
                    auVar89._24_4_ = uVar2;
                    auVar89._28_4_ = uVar2;
                    auVar281 = vfmadd213ps_avx512vl(auVar439,auVar281,auVar89);
                    auVar281 = vmaxps_avx(auVar281,auVar282);
                    auVar281 = vminps_avx(auVar281,auVar415);
LAB_0028e58d:
                    in_ZMM8 = ZEXT3264(auVar281);
                    auVar354._0_4_ = auVar281._0_4_ * auVar352._0_4_;
                    auVar354._4_4_ = auVar281._4_4_ * auVar352._4_4_;
                    auVar354._8_4_ = auVar281._8_4_ * auVar352._8_4_;
                    auVar354._12_4_ = auVar281._12_4_ * auVar352._12_4_;
                    auVar354._16_4_ = auVar281._16_4_ * auVar352._16_4_;
                    auVar354._20_4_ = auVar281._20_4_ * auVar352._20_4_;
                    auVar354._28_36_ = auVar352._28_36_;
                    auVar354._24_4_ = auVar281._24_4_ * auVar352._24_4_;
                    auVar281 = auVar354._0_32_;
                  }
                  *pauVar189 = auVar281;
                  pauVar189 = pauVar189 + 1;
                  uVar173 = uVar173 + 1;
                  iVar192 = iVar192 + 1;
                } while (uVar173 != local_228.w);
              }
              iVar170 = iVar170 + 1;
            } while (iVar170 != local_228.h);
          }
          local_2e8 = local_2e8 + 1;
        } while (local_2e8 != (long)local_228.c);
      }
      if ((local_158._0_4_ == 4 && (uint)local_1e0 == 0) && (0 < (long)local_228.c)) {
        iVar8 = (this->super_Deconvolution).dilation_w;
        iVar9 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar171 = (this->super_Deconvolution).stride_h;
        iVar191 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar179 = (this->super_Deconvolution).kernel_w;
        uVar167 = (this->super_Deconvolution).kernel_h;
        local_2e8 = 0;
        auVar389._8_4_ = 0x42b0c0a5;
        auVar389._0_8_ = 0x42b0c0a542b0c0a5;
        auVar389._12_4_ = 0x42b0c0a5;
        auVar389._16_4_ = 0x42b0c0a5;
        auVar389._20_4_ = 0x42b0c0a5;
        auVar389._24_4_ = 0x42b0c0a5;
        auVar389._28_4_ = 0x42b0c0a5;
        auVar398._8_4_ = 0xc2b0c0a5;
        auVar398._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar398._12_4_ = 0xc2b0c0a5;
        auVar398._16_4_ = 0xc2b0c0a5;
        auVar398._20_4_ = 0xc2b0c0a5;
        auVar398._24_4_ = 0xc2b0c0a5;
        auVar398._28_4_ = 0xc2b0c0a5;
        auVar404._8_4_ = 0x3f000000;
        auVar404._0_8_ = 0x3f0000003f000000;
        auVar404._12_4_ = 0x3f000000;
        auVar404._16_4_ = 0x3f000000;
        auVar404._20_4_ = 0x3f000000;
        auVar404._24_4_ = 0x3f000000;
        auVar404._28_4_ = 0x3f000000;
        auVar410._8_4_ = 0x3fb8aa3b;
        auVar410._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar410._12_4_ = 0x3fb8aa3b;
        auVar410._16_4_ = 0x3fb8aa3b;
        auVar410._20_4_ = 0x3fb8aa3b;
        auVar410._24_4_ = 0x3fb8aa3b;
        auVar410._28_4_ = 0x3fb8aa3b;
        auVar416._8_4_ = 0x3f800000;
        auVar416._0_8_ = 0x3f8000003f800000;
        auVar416._12_4_ = 0x3f800000;
        auVar416._16_4_ = 0x3f800000;
        auVar416._20_4_ = 0x3f800000;
        auVar416._24_4_ = 0x3f800000;
        auVar416._28_4_ = 0x3f800000;
        auVar422._8_4_ = 0x3f318000;
        auVar422._0_8_ = 0x3f3180003f318000;
        auVar422._12_4_ = 0x3f318000;
        auVar422._16_4_ = 0x3f318000;
        auVar422._20_4_ = 0x3f318000;
        auVar422._24_4_ = 0x3f318000;
        auVar422._28_4_ = 0x3f318000;
        auVar251 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar474._8_4_ = 0x3ab743ce;
        auVar474._0_8_ = 0x3ab743ce3ab743ce;
        auVar474._12_4_ = 0x3ab743ce;
        auVar474._16_4_ = 0x3ab743ce;
        auVar474._20_4_ = 0x3ab743ce;
        auVar474._24_4_ = 0x3ab743ce;
        auVar474._28_4_ = 0x3ab743ce;
        auVar480._8_4_ = 0x3c088908;
        auVar480._0_8_ = 0x3c0889083c088908;
        auVar480._12_4_ = 0x3c088908;
        auVar480._16_4_ = 0x3c088908;
        auVar480._20_4_ = 0x3c088908;
        auVar480._24_4_ = 0x3c088908;
        auVar480._28_4_ = 0x3c088908;
        auVar486._8_4_ = 0x3d2aa9c1;
        auVar486._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar486._12_4_ = 0x3d2aa9c1;
        auVar486._16_4_ = 0x3d2aa9c1;
        auVar486._20_4_ = 0x3d2aa9c1;
        auVar486._24_4_ = 0x3d2aa9c1;
        auVar486._28_4_ = 0x3d2aa9c1;
        auVar492._8_4_ = 0x3e2aaaaa;
        auVar492._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar492._12_4_ = 0x3e2aaaaa;
        auVar492._16_4_ = 0x3e2aaaaa;
        auVar492._20_4_ = 0x3e2aaaaa;
        auVar492._24_4_ = 0x3e2aaaaa;
        auVar492._28_4_ = 0x3e2aaaaa;
        auVar498._8_4_ = 0x3f800000;
        auVar498._0_8_ = 0x3f8000003f800000;
        auVar498._12_4_ = 0x3f800000;
        auVar498._16_4_ = 0x3f800000;
        auVar498._20_4_ = 0x3f800000;
        auVar498._24_4_ = 0x3f800000;
        auVar498._28_4_ = 0x3f800000;
        auVar504._8_4_ = 0xb95e8083;
        auVar504._0_8_ = 0xb95e8083b95e8083;
        auVar504._12_4_ = 0xb95e8083;
        auVar504._16_4_ = 0xb95e8083;
        auVar504._20_4_ = 0xb95e8083;
        auVar504._24_4_ = 0xb95e8083;
        auVar504._28_4_ = 0xb95e8083;
        auVar252 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar273 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar274 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar275 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar276 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar277 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar278 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar279 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar280 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar281 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar282 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar283 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar180 = bottom_blob->w;
            iVar190 = bottom_blob->h;
            pauVar189 = (undefined1 (*) [32])
                        (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
            uVar165 = bottom_blob->c;
            iVar170 = 0;
            do {
              if (0 < local_228.w) {
                uVar173 = 0;
                iVar192 = (1 - uVar179) * iVar8;
                do {
                  if (pvVar16 == (void *)0x0) {
                    auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar352 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar16 + local_2e8 * 0x20));
                  }
                  if (0 < (int)uVar165) {
                    pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar11 = bottom_blob->data;
                    uVar168 = 0;
                    do {
                      if (0 < (int)uVar167) {
                        uVar169 = 0;
                        uVar174 = 0;
                        do {
                          iVar157 = (((int)uVar174 - uVar167) + 1) * iVar9 + iVar170;
                          if ((((-1 < iVar157) &&
                               (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                              (0 < (int)uVar179)) && (iVar158 < iVar190)) {
                            lVar186 = (long)iVar158 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar168;
                            uVar178 = uVar169;
                            uVar183 = (ulong)uVar179;
                            iVar157 = iVar192;
                            do {
                              if (((-1 < iVar157) &&
                                  (iVar158 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                                 (iVar158 < iVar180)) {
                                lVar161 = (long)(iVar158 << 2);
                                uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186);
                                auVar440._4_4_ = uVar2;
                                auVar440._0_4_ = uVar2;
                                auVar440._8_4_ = uVar2;
                                auVar440._12_4_ = uVar2;
                                auVar440._16_4_ = uVar2;
                                auVar440._20_4_ = uVar2;
                                auVar440._24_4_ = uVar2;
                                auVar440._28_4_ = uVar2;
                                in_ZMM8 = ZEXT3264(auVar440);
                                uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186 + 4);
                                auVar465._4_4_ = uVar2;
                                auVar465._0_4_ = uVar2;
                                auVar465._8_4_ = uVar2;
                                auVar465._12_4_ = uVar2;
                                auVar465._16_4_ = uVar2;
                                auVar465._20_4_ = uVar2;
                                auVar465._24_4_ = uVar2;
                                auVar465._28_4_ = uVar2;
                                auVar284 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 8)));
                                in_ZMM16 = ZEXT3264(auVar284);
                                auVar253 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0xc))
                                                     );
                                uVar196 = uVar178 & 0xffffffff;
                                auVar198 = vfmadd231ps_fma(auVar352._0_32_,auVar440,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar176 + uVar196 * 4));
                                auVar198 = vfmadd231ps_fma(ZEXT1632(auVar198),auVar465,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar176 + uVar196 * 4 + 0x20));
                                auVar284 = vfmadd231ps_avx512vl
                                                     (ZEXT1632(auVar198),auVar284,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x40));
                                auVar284 = vfmadd231ps_avx512vl
                                                     (auVar284,auVar253,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x60));
                                auVar352 = ZEXT3264(auVar284);
                              }
                              uVar178 = uVar178 + 0x20;
                              iVar157 = iVar157 + iVar8;
                              uVar183 = uVar183 - 1;
                            } while (uVar183 != 0);
                          }
                          uVar174 = uVar174 + 1;
                          uVar169 = uVar169 + (ulong)uVar179 * 0x20;
                        } while (uVar174 != uVar167);
                      }
                      pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar179 * uVar167 * 0x20) * 4
                                         );
                      uVar168 = uVar168 + 1;
                    } while (uVar168 != uVar165);
                  }
                  auVar284 = auVar352._0_32_;
                  auVar253 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                  switch(iVar191) {
                  case 1:
                    auVar284 = vmaxps_avx(auVar284,auVar253);
                    break;
                  case 2:
                    auVar254 = vmaxps_avx(auVar284,auVar253);
                    in_ZMM8 = ZEXT3264(auVar254);
                    auVar284 = vminps_avx(auVar284,auVar253);
                    uVar2 = *(this->super_Deconvolution).activation_params.data;
                    auVar109._4_4_ = uVar2;
                    auVar109._0_4_ = uVar2;
                    auVar109._8_4_ = uVar2;
                    auVar109._12_4_ = uVar2;
                    auVar109._16_4_ = uVar2;
                    auVar109._20_4_ = uVar2;
                    auVar109._24_4_ = uVar2;
                    auVar109._28_4_ = uVar2;
                    auVar284 = vfmadd132ps_avx512vl(auVar284,auVar254,auVar109);
                    break;
                  case 3:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar107._4_4_ = uVar2;
                    auVar107._0_4_ = uVar2;
                    auVar107._8_4_ = uVar2;
                    auVar107._12_4_ = uVar2;
                    auVar107._16_4_ = uVar2;
                    auVar107._20_4_ = uVar2;
                    auVar107._24_4_ = uVar2;
                    auVar107._28_4_ = uVar2;
                    auVar284 = vmaxps_avx512vl(auVar284,auVar107);
                    uVar2 = puVar12[1];
                    auVar108._4_4_ = uVar2;
                    auVar108._0_4_ = uVar2;
                    auVar108._8_4_ = uVar2;
                    auVar108._12_4_ = uVar2;
                    auVar108._16_4_ = uVar2;
                    auVar108._20_4_ = uVar2;
                    auVar108._24_4_ = uVar2;
                    auVar108._28_4_ = uVar2;
                    auVar284 = vminps_avx512vl(auVar284,auVar108);
                    break;
                  case 4:
                    auVar105._8_4_ = 0x80000000;
                    auVar105._0_8_ = 0x8000000080000000;
                    auVar105._12_4_ = 0x80000000;
                    auVar105._16_4_ = 0x80000000;
                    auVar105._20_4_ = 0x80000000;
                    auVar105._24_4_ = 0x80000000;
                    auVar105._28_4_ = 0x80000000;
                    auVar284 = vxorps_avx512vl(auVar284,auVar105);
                    auVar284 = vminps_avx(auVar284,auVar389);
                    auVar284 = vmaxps_avx(auVar284,auVar398);
                    auVar198 = vfmadd231ps_fma(auVar404,auVar284,auVar410);
                    auVar253 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar253,1);
                    auVar254 = vsubps_avx512vl(auVar253,auVar416);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar296._0_4_ =
                         (uint)bVar194 * auVar254._0_4_ | (uint)!bVar194 * auVar253._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar296._4_4_ =
                         (uint)bVar194 * auVar254._4_4_ | (uint)!bVar194 * auVar253._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar296._8_4_ =
                         (uint)bVar194 * auVar254._8_4_ | (uint)!bVar194 * auVar253._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar296._12_4_ =
                         (uint)bVar194 * auVar254._12_4_ | (uint)!bVar194 * auVar253._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar296._16_4_ =
                         (uint)bVar194 * auVar254._16_4_ | (uint)!bVar194 * auVar253._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar296._20_4_ =
                         (uint)bVar194 * auVar254._20_4_ | (uint)!bVar194 * auVar253._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar296._24_4_ =
                         (uint)bVar194 * auVar254._24_4_ | (uint)!bVar194 * auVar253._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar296._28_4_ =
                         (uint)bVar194 * auVar254._28_4_ | (uint)!bVar194 * auVar253._28_4_;
                    in_ZMM16 = ZEXT3264(auVar296);
                    auVar284 = vfmsub231ps_avx512vl(auVar284,auVar296,auVar422);
                    auVar106._8_4_ = 0x395e8083;
                    auVar106._0_8_ = 0x395e8083395e8083;
                    auVar106._12_4_ = 0x395e8083;
                    auVar106._16_4_ = 0x395e8083;
                    auVar106._20_4_ = 0x395e8083;
                    auVar106._24_4_ = 0x395e8083;
                    auVar106._28_4_ = 0x395e8083;
                    auVar284 = vfmsub231ps_avx512vl(auVar284,auVar296,auVar106);
                    auVar441._0_4_ = auVar284._0_4_ * auVar284._0_4_;
                    auVar441._4_4_ = auVar284._4_4_ * auVar284._4_4_;
                    auVar441._8_4_ = auVar284._8_4_ * auVar284._8_4_;
                    auVar441._12_4_ = auVar284._12_4_ * auVar284._12_4_;
                    auVar441._16_4_ = auVar284._16_4_ * auVar284._16_4_;
                    auVar441._20_4_ = auVar284._20_4_ * auVar284._20_4_;
                    auVar441._24_4_ = auVar284._24_4_ * auVar284._24_4_;
                    auVar441._28_4_ = 0;
                    auVar198 = vfmadd213ps_fma(auVar251,auVar284,auVar474);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar284,auVar480);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar284,auVar486);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar284,auVar492);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar284,auVar404);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar441,auVar284);
                    auVar381._0_4_ = auVar198._0_4_ + 1.0;
                    auVar381._4_4_ = auVar198._4_4_ + 1.0;
                    auVar381._8_4_ = auVar198._8_4_ + 1.0;
                    auVar381._12_4_ = auVar198._12_4_ + 1.0;
                    auVar381._16_4_ = 0x3f800000;
                    auVar381._20_4_ = 0x3f800000;
                    auVar381._24_4_ = 0x3f800000;
                    auVar381._28_4_ = 0x3f800000;
                    auVar284 = vcvttps2dq_avx512vl(auVar296);
                    auVar284 = vpslld_avx2(auVar284,0x17);
                    auVar284 = vpaddd_avx2(auVar284,auVar498);
                    auVar198 = vfmadd213ps_fma(auVar284,auVar381,auVar416);
                    in_ZMM8 = ZEXT1664(auVar198);
                    auVar284 = vdivps_avx(auVar416,ZEXT1632(auVar198));
                    break;
                  case 5:
                    auVar284 = vminps_avx(auVar284,auVar389);
                    auVar284 = vmaxps_avx(auVar284,auVar398);
                    auVar198 = vfmadd213ps_fma(auVar410,auVar284,auVar404);
                    auVar254 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar254,1);
                    auVar255 = vsubps_avx512vl(auVar254,auVar416);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar291._0_4_ =
                         (uint)bVar194 * auVar255._0_4_ | (uint)!bVar194 * auVar254._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar291._4_4_ =
                         (uint)bVar194 * auVar255._4_4_ | (uint)!bVar194 * auVar254._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar291._8_4_ =
                         (uint)bVar194 * auVar255._8_4_ | (uint)!bVar194 * auVar254._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar291._12_4_ =
                         (uint)bVar194 * auVar255._12_4_ | (uint)!bVar194 * auVar254._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar291._16_4_ =
                         (uint)bVar194 * auVar255._16_4_ | (uint)!bVar194 * auVar254._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar291._20_4_ =
                         (uint)bVar194 * auVar255._20_4_ | (uint)!bVar194 * auVar254._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar291._24_4_ =
                         (uint)bVar194 * auVar255._24_4_ | (uint)!bVar194 * auVar254._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar291._28_4_ =
                         (uint)bVar194 * auVar255._28_4_ | (uint)!bVar194 * auVar254._28_4_;
                    auVar284 = vfmsub231ps_avx512vl(auVar284,auVar291,auVar422);
                    auVar284 = vfnmsub231ps_avx512vl(auVar284,auVar291,auVar504);
                    auVar466._0_4_ = auVar284._0_4_ * auVar284._0_4_;
                    auVar466._4_4_ = auVar284._4_4_ * auVar284._4_4_;
                    auVar466._8_4_ = auVar284._8_4_ * auVar284._8_4_;
                    auVar466._12_4_ = auVar284._12_4_ * auVar284._12_4_;
                    auVar466._16_4_ = auVar284._16_4_ * auVar284._16_4_;
                    auVar466._20_4_ = auVar284._20_4_ * auVar284._20_4_;
                    auVar466._24_4_ = auVar284._24_4_ * auVar284._24_4_;
                    auVar466._28_4_ = 0;
                    auVar254 = vfmadd213ps_avx512vl(auVar251,auVar284,auVar474);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar284,auVar480);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar284,auVar486);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar284,auVar492);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar284,auVar404);
                    auVar284 = vfmadd213ps_avx512vl(auVar254,auVar466,auVar284);
                    auVar254 = vaddps_avx512vl(auVar284,auVar416);
                    auVar284 = vcvttps2dq_avx512vl(auVar291);
                    auVar284 = vpslld_avx2(auVar284,0x17);
                    auVar284 = vpaddd_avx2(auVar284,auVar498);
                    auVar198 = vfmadd213ps_fma(auVar284,auVar254,auVar416);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar253,2);
                    auVar102._8_4_ = 0x800000;
                    auVar102._0_8_ = 0x80000000800000;
                    auVar102._12_4_ = 0x800000;
                    auVar102._16_4_ = 0x800000;
                    auVar102._20_4_ = 0x800000;
                    auVar102._24_4_ = 0x800000;
                    auVar102._28_4_ = 0x800000;
                    auVar284 = vmaxps_avx512vl(ZEXT1632(auVar198),auVar102);
                    auVar255 = vpsrld_avx2(auVar284,0x17);
                    auVar253 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar103._8_4_ = 0x3f000000;
                    auVar103._0_8_ = 0x3f0000003f000000;
                    auVar103._12_4_ = 0x3f000000;
                    auVar103._16_4_ = 0x3f000000;
                    auVar103._20_4_ = 0x3f000000;
                    auVar103._24_4_ = 0x3f000000;
                    auVar103._28_4_ = 0x3f000000;
                    auVar284 = vpternlogd_avx512vl(auVar284,auVar253,auVar103,0xea);
                    uVar169 = vcmpps_avx512vl(auVar284,auVar252,1);
                    auVar253 = vaddps_avx512vl(auVar284,auVar273);
                    auVar284 = vaddps_avx512vl(auVar253,auVar284);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar292._0_4_ =
                         (uint)bVar194 * auVar284._0_4_ | (uint)!bVar194 * auVar253._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar292._4_4_ =
                         (uint)bVar194 * auVar284._4_4_ | (uint)!bVar194 * auVar253._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar292._8_4_ =
                         (uint)bVar194 * auVar284._8_4_ | (uint)!bVar194 * auVar253._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar292._12_4_ =
                         (uint)bVar194 * auVar284._12_4_ | (uint)!bVar194 * auVar253._12_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                    auVar292._16_4_ =
                         (uint)bVar194 * auVar284._16_4_ | (uint)!bVar194 * auVar253._16_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                    auVar292._20_4_ =
                         (uint)bVar194 * auVar284._20_4_ | (uint)!bVar194 * auVar253._20_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                    auVar292._24_4_ =
                         (uint)bVar194 * auVar284._24_4_ | (uint)!bVar194 * auVar253._24_4_;
                    bVar194 = SUB81(uVar169 >> 7,0);
                    auVar292._28_4_ =
                         (uint)bVar194 * auVar284._28_4_ | (uint)!bVar194 * auVar253._28_4_;
                    auVar253 = vmulps_avx512vl(auVar292,auVar292);
                    auVar284 = vfmadd213ps_avx512vl(auVar274,auVar292,auVar275);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar292,auVar276);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar292,auVar277);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar292,auVar278);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar292,auVar279);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar292,auVar280);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar292,auVar281);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar292,auVar282);
                    auVar254 = vmulps_avx512vl(auVar253,auVar292);
                    auVar254 = vmulps_avx512vl(auVar254,auVar284);
                    auVar104._8_4_ = 0xffffff82;
                    auVar104._0_8_ = 0xffffff82ffffff82;
                    auVar104._12_4_ = 0xffffff82;
                    auVar104._16_4_ = 0xffffff82;
                    auVar104._20_4_ = 0xffffff82;
                    auVar104._24_4_ = 0xffffff82;
                    auVar104._28_4_ = 0xffffff82;
                    auVar284 = vpaddd_avx512vl(auVar255,auVar104);
                    auVar284 = vcvtdq2ps_avx(auVar284);
                    auVar255 = vsubps_avx512vl(auVar284,auVar416);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar293._0_4_ =
                         (uint)bVar194 * auVar255._0_4_ | (uint)!bVar194 * auVar284._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar293._4_4_ =
                         (uint)bVar194 * auVar255._4_4_ | (uint)!bVar194 * auVar284._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar293._8_4_ =
                         (uint)bVar194 * auVar255._8_4_ | (uint)!bVar194 * auVar284._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar293._12_4_ =
                         (uint)bVar194 * auVar255._12_4_ | (uint)!bVar194 * auVar284._12_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                    auVar293._16_4_ =
                         (uint)bVar194 * auVar255._16_4_ | (uint)!bVar194 * auVar284._16_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                    auVar293._20_4_ =
                         (uint)bVar194 * auVar255._20_4_ | (uint)!bVar194 * auVar284._20_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                    auVar293._24_4_ =
                         (uint)bVar194 * auVar255._24_4_ | (uint)!bVar194 * auVar284._24_4_;
                    bVar194 = SUB81(uVar169 >> 7,0);
                    auVar293._28_4_ =
                         (uint)bVar194 * auVar255._28_4_ | (uint)!bVar194 * auVar284._28_4_;
                    auVar284 = vfmadd231ps_avx512vl(auVar254,auVar293,auVar504);
                    auVar284 = vfmsub231ps_avx512vl(auVar284,auVar404,auVar253);
                    auVar284 = vsubps_avx512vl(auVar284,auVar292);
                    auVar198 = vfmsub231ps_fma(auVar284,auVar422,auVar293);
                    auVar284 = vmulps_avx512vl(ZEXT1632(auVar198),auVar283);
                    auVar253 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar294._0_4_ =
                         (uint)bVar194 * auVar253._0_4_ | (uint)!bVar194 * auVar284._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar294._4_4_ =
                         (uint)bVar194 * auVar253._4_4_ | (uint)!bVar194 * auVar284._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar294._8_4_ =
                         (uint)bVar194 * auVar253._8_4_ | (uint)!bVar194 * auVar284._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar294._12_4_ =
                         (uint)bVar194 * auVar253._12_4_ | (uint)!bVar194 * auVar284._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar294._16_4_ =
                         (uint)bVar194 * auVar253._16_4_ | (uint)!bVar194 * auVar284._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar294._20_4_ =
                         (uint)bVar194 * auVar253._20_4_ | (uint)!bVar194 * auVar284._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar294._24_4_ =
                         (uint)bVar194 * auVar253._24_4_ | (uint)!bVar194 * auVar284._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar294._28_4_ =
                         (uint)bVar194 * auVar253._28_4_ | (uint)!bVar194 * auVar284._28_4_;
                    auVar284 = vminps_avx(auVar294,auVar389);
                    auVar284 = vmaxps_avx(auVar284,auVar398);
                    auVar198 = vfmadd213ps_fma(auVar410,auVar284,auVar404);
                    auVar253 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar253,1);
                    auVar254 = vsubps_avx512vl(auVar253,auVar416);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar295._0_4_ =
                         (uint)bVar194 * auVar254._0_4_ | (uint)!bVar194 * auVar253._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar295._4_4_ =
                         (uint)bVar194 * auVar254._4_4_ | (uint)!bVar194 * auVar253._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar295._8_4_ =
                         (uint)bVar194 * auVar254._8_4_ | (uint)!bVar194 * auVar253._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar295._12_4_ =
                         (uint)bVar194 * auVar254._12_4_ | (uint)!bVar194 * auVar253._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar295._16_4_ =
                         (uint)bVar194 * auVar254._16_4_ | (uint)!bVar194 * auVar253._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar295._20_4_ =
                         (uint)bVar194 * auVar254._20_4_ | (uint)!bVar194 * auVar253._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar295._24_4_ =
                         (uint)bVar194 * auVar254._24_4_ | (uint)!bVar194 * auVar253._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar295._28_4_ =
                         (uint)bVar194 * auVar254._28_4_ | (uint)!bVar194 * auVar253._28_4_;
                    in_ZMM16 = ZEXT3264(auVar295);
                    auVar284 = vfmsub231ps_avx512vl(auVar284,auVar295,auVar422);
                    auVar284 = vfnmsub231ps_avx512vl(auVar284,auVar295,auVar504);
                    auVar467._0_4_ = auVar284._0_4_ * auVar284._0_4_;
                    auVar467._4_4_ = auVar284._4_4_ * auVar284._4_4_;
                    auVar467._8_4_ = auVar284._8_4_ * auVar284._8_4_;
                    auVar467._12_4_ = auVar284._12_4_ * auVar284._12_4_;
                    auVar467._16_4_ = auVar284._16_4_ * auVar284._16_4_;
                    auVar467._20_4_ = auVar284._20_4_ * auVar284._20_4_;
                    auVar467._24_4_ = auVar284._24_4_ * auVar284._24_4_;
                    auVar467._28_4_ = 0;
                    auVar253 = vfmadd213ps_avx512vl(auVar251,auVar284,auVar474);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar284,auVar480);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar284,auVar486);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar284,auVar492);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar284,auVar404);
                    auVar284 = vfmadd213ps_avx512vl(auVar253,auVar467,auVar284);
                    auVar253 = vaddps_avx512vl(auVar284,auVar416);
                    auVar284 = vcvttps2dq_avx512vl(auVar295);
                    auVar284 = vpslld_avx2(auVar284,0x17);
                    auVar284 = vpaddd_avx2(auVar284,auVar498);
                    auVar198 = vfmadd213ps_fma(auVar284,auVar253,auVar416);
                    auVar284 = vdivps_avx(auVar416,ZEXT1632(auVar198));
                    auVar284 = vfnmadd213ps_avx512vl(auVar284,auVar283,auVar273);
                    goto LAB_0028ec91;
                  case 6:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar442._4_4_ = uVar2;
                    auVar442._0_4_ = uVar2;
                    auVar442._8_4_ = uVar2;
                    auVar442._12_4_ = uVar2;
                    auVar442._16_4_ = uVar2;
                    auVar442._20_4_ = uVar2;
                    auVar442._24_4_ = uVar2;
                    auVar442._28_4_ = uVar2;
                    uVar2 = puVar12[1];
                    auVar101._4_4_ = uVar2;
                    auVar101._0_4_ = uVar2;
                    auVar101._8_4_ = uVar2;
                    auVar101._12_4_ = uVar2;
                    auVar101._16_4_ = uVar2;
                    auVar101._20_4_ = uVar2;
                    auVar101._24_4_ = uVar2;
                    auVar101._28_4_ = uVar2;
                    auVar284 = vfmadd213ps_avx512vl(auVar442,auVar284,auVar101);
                    auVar284 = vmaxps_avx(auVar284,auVar253);
                    auVar284 = vminps_avx(auVar284,auVar416);
LAB_0028ec91:
                    in_ZMM8 = ZEXT3264(auVar284);
                    auVar355._0_4_ = auVar284._0_4_ * auVar352._0_4_;
                    auVar355._4_4_ = auVar284._4_4_ * auVar352._4_4_;
                    auVar355._8_4_ = auVar284._8_4_ * auVar352._8_4_;
                    auVar355._12_4_ = auVar284._12_4_ * auVar352._12_4_;
                    auVar355._16_4_ = auVar284._16_4_ * auVar352._16_4_;
                    auVar355._20_4_ = auVar284._20_4_ * auVar352._20_4_;
                    auVar355._28_36_ = auVar352._28_36_;
                    auVar355._24_4_ = auVar284._24_4_ * auVar352._24_4_;
                    auVar284 = auVar355._0_32_;
                  }
                  *pauVar189 = auVar284;
                  pauVar189 = pauVar189 + 1;
                  uVar173 = uVar173 + 1;
                  iVar192 = iVar192 + 1;
                } while (uVar173 != local_228.w);
              }
              iVar170 = iVar170 + 1;
            } while (iVar170 != local_228.h);
          }
          local_2e8 = local_2e8 + 1;
        } while (local_2e8 != (long)local_228.c);
      }
      local_168 = (void *)(CONCAT44(local_168._4_4_,uVar177) ^ 4);
      if ((local_158._0_4_ == 8 && uVar177 == 4) && (0 < (long)local_228.c)) {
        iVar8 = (this->super_Deconvolution).dilation_w;
        iVar9 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar171 = (this->super_Deconvolution).stride_h;
        iVar191 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar179 = (this->super_Deconvolution).kernel_w;
        uVar167 = (this->super_Deconvolution).kernel_h;
        local_2e8 = 0;
        auVar385._8_4_ = 0x42b0c0a5;
        auVar385._0_8_ = 0x42b0c0a542b0c0a5;
        auVar385._12_4_ = 0x42b0c0a5;
        auVar392._8_4_ = 0xc2b0c0a5;
        auVar392._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar392._12_4_ = 0xc2b0c0a5;
        auVar400._8_4_ = 0x3f000000;
        auVar400._0_8_ = 0x3f0000003f000000;
        auVar400._12_4_ = 0x3f000000;
        auVar406._8_4_ = 0x3fb8aa3b;
        auVar406._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar406._12_4_ = 0x3fb8aa3b;
        auVar412._8_4_ = 0x3f800000;
        auVar412._0_8_ = 0x3f8000003f800000;
        auVar412._12_4_ = 0x3f800000;
        auVar418._8_4_ = 0x3f318000;
        auVar418._0_8_ = 0x3f3180003f318000;
        auVar418._12_4_ = 0x3f318000;
        auVar198 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar470._8_4_ = 0x3ab743ce;
        auVar470._0_8_ = 0x3ab743ce3ab743ce;
        auVar470._12_4_ = 0x3ab743ce;
        auVar476._8_4_ = 0x3c088908;
        auVar476._0_8_ = 0x3c0889083c088908;
        auVar476._12_4_ = 0x3c088908;
        auVar482._8_4_ = 0x3d2aa9c1;
        auVar482._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar482._12_4_ = 0x3d2aa9c1;
        auVar488._8_4_ = 0x3e2aaaaa;
        auVar488._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar488._12_4_ = 0x3e2aaaaa;
        auVar494._8_4_ = 0x3f800000;
        auVar494._0_8_ = 0x3f8000003f800000;
        auVar494._12_4_ = 0x3f800000;
        auVar500._8_4_ = 0xb95e8083;
        auVar500._0_8_ = 0xb95e8083b95e8083;
        auVar500._12_4_ = 0xb95e8083;
        auVar199 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar200 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar221 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar222 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar223 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar224 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar225 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar226 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar227 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar180 = bottom_blob->w;
            iVar190 = bottom_blob->h;
            pauVar187 = (undefined1 (*) [16])
                        (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
            uVar165 = bottom_blob->c;
            iVar170 = 0;
            do {
              if (0 < local_228.w) {
                uVar173 = 0;
                iVar192 = (1 - uVar179) * iVar8;
                do {
                  if (pvVar16 == (void *)0x0) {
                    auVar232 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar232 = *(undefined1 (*) [16])((long)pvVar16 + local_2e8 * 0x10);
                  }
                  auVar352 = ZEXT1664(auVar232);
                  if (0 < (int)uVar165) {
                    pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar11 = bottom_blob->data;
                    uVar168 = 0;
                    do {
                      if (0 < (int)uVar167) {
                        uVar169 = 0;
                        uVar174 = 0;
                        do {
                          iVar157 = (((int)uVar174 - uVar167) + 1) * iVar9 + iVar170;
                          if ((((-1 < iVar157) &&
                               (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                              (0 < (int)uVar179)) && (iVar158 < iVar190)) {
                            lVar186 = (long)iVar158 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar168;
                            uVar178 = uVar169;
                            uVar183 = (ulong)uVar179;
                            iVar157 = iVar192;
                            do {
                              if (((-1 < iVar157) &&
                                  (iVar158 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                                 (iVar158 < iVar180)) {
                                lVar161 = (long)(iVar158 << 3);
                                uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186);
                                auVar427._4_4_ = uVar2;
                                auVar427._0_4_ = uVar2;
                                auVar427._8_4_ = uVar2;
                                auVar427._12_4_ = uVar2;
                                in_ZMM8 = ZEXT1664(auVar427);
                                uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186 + 4);
                                auVar450._4_4_ = uVar2;
                                auVar450._0_4_ = uVar2;
                                auVar450._8_4_ = uVar2;
                                auVar450._12_4_ = uVar2;
                                auVar228 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 8)));
                                in_ZMM16 = ZEXT1664(auVar228);
                                auVar229 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0xc))
                                                     );
                                auVar230 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0x10)
                                                             ));
                                auVar231 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0x14)
                                                             ));
                                auVar201 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0x18)
                                                             ));
                                auVar202 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0x1c)
                                                             ));
                                uVar196 = uVar178 & 0xffffffff;
                                auVar232 = vfmadd231ps_fma(auVar352._0_16_,auVar427,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar176 + uVar196 * 4));
                                auVar232 = vfmadd231ps_fma(auVar232,auVar450,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar176 + uVar196 * 4 + 0x10));
                                auVar232 = vfmadd231ps_avx512vl
                                                     (auVar232,auVar228,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x20));
                                auVar232 = vfmadd231ps_avx512vl
                                                     (auVar232,auVar229,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x30));
                                auVar232 = vfmadd231ps_avx512vl
                                                     (auVar232,auVar230,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x40));
                                auVar232 = vfmadd231ps_avx512vl
                                                     (auVar232,auVar231,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x50));
                                auVar232 = vfmadd231ps_avx512vl
                                                     (auVar232,auVar201,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x60));
                                auVar232 = vfmadd231ps_avx512vl
                                                     (auVar232,auVar202,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x70));
                                auVar352 = ZEXT1664(auVar232);
                              }
                              uVar178 = uVar178 + 0x20;
                              iVar157 = iVar157 + iVar8;
                              uVar183 = uVar183 - 1;
                            } while (uVar183 != 0);
                          }
                          uVar174 = uVar174 + 1;
                          uVar169 = uVar169 + (ulong)uVar179 * 0x20;
                        } while (uVar174 != uVar167);
                      }
                      auVar232 = auVar352._0_16_;
                      pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar179 * uVar167 * 0x20) * 4
                                         );
                      uVar168 = uVar168 + 1;
                    } while (uVar168 != uVar165);
                  }
                  switch(iVar191) {
                  case 1:
                    auVar232 = vmaxps_avx(auVar232,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar228 = vmaxps_avx(auVar232,(undefined1  [16])0x0);
                    in_ZMM8 = ZEXT1664(auVar228);
                    auVar232 = vminps_avx(auVar232,(undefined1  [16])0x0);
                    uVar2 = *(this->super_Deconvolution).activation_params.data;
                    auVar59._4_4_ = uVar2;
                    auVar59._0_4_ = uVar2;
                    auVar59._8_4_ = uVar2;
                    auVar59._12_4_ = uVar2;
                    auVar232 = vfmadd132ps_avx512vl(auVar232,auVar228,auVar59);
                    break;
                  case 3:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar57._4_4_ = uVar2;
                    auVar57._0_4_ = uVar2;
                    auVar57._8_4_ = uVar2;
                    auVar57._12_4_ = uVar2;
                    auVar232 = vmaxps_avx512vl(auVar232,auVar57);
                    uVar2 = puVar12[1];
                    auVar58._4_4_ = uVar2;
                    auVar58._0_4_ = uVar2;
                    auVar58._8_4_ = uVar2;
                    auVar58._12_4_ = uVar2;
                    auVar232 = vminps_avx512vl(auVar232,auVar58);
                    break;
                  case 4:
                    auVar55._8_4_ = 0x80000000;
                    auVar55._0_8_ = 0x8000000080000000;
                    auVar55._12_4_ = 0x80000000;
                    auVar232 = vxorps_avx512vl(auVar232,auVar55);
                    auVar232 = vminps_avx(auVar232,auVar385);
                    auVar232 = vmaxps_avx(auVar232,auVar392);
                    auVar228 = vfmadd231ps_fma(auVar400,auVar232,auVar406);
                    auVar229 = vcvttps2dq_avx512vl(auVar228);
                    auVar229 = vcvtdq2ps_avx512vl(auVar229);
                    uVar168 = vcmpps_avx512vl(auVar228,auVar229,1);
                    auVar228 = vsubps_avx512vl(auVar229,auVar412);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar238._0_4_ =
                         (uint)bVar194 * auVar228._0_4_ | (uint)!bVar194 * auVar229._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar238._4_4_ =
                         (uint)bVar194 * auVar228._4_4_ | (uint)!bVar194 * auVar229._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar238._8_4_ =
                         (uint)bVar194 * auVar228._8_4_ | (uint)!bVar194 * auVar229._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar238._12_4_ =
                         (uint)bVar194 * auVar228._12_4_ | (uint)!bVar194 * auVar229._12_4_;
                    in_ZMM16 = ZEXT1664(auVar238);
                    auVar232 = vfmsub231ps_avx512vl(auVar232,auVar238,auVar418);
                    auVar56._8_4_ = 0x395e8083;
                    auVar56._0_8_ = 0x395e8083395e8083;
                    auVar56._12_4_ = 0x395e8083;
                    auVar228 = vfmsub231ps_avx512vl(auVar232,auVar238,auVar56);
                    auVar428._0_4_ = auVar228._0_4_ * auVar228._0_4_;
                    auVar428._4_4_ = auVar228._4_4_ * auVar228._4_4_;
                    auVar428._8_4_ = auVar228._8_4_ * auVar228._8_4_;
                    auVar428._12_4_ = auVar228._12_4_ * auVar228._12_4_;
                    auVar232 = vfmadd213ps_fma(auVar198,auVar228,auVar470);
                    auVar232 = vfmadd213ps_fma(auVar232,auVar228,auVar476);
                    auVar232 = vfmadd213ps_fma(auVar232,auVar228,auVar482);
                    auVar232 = vfmadd213ps_fma(auVar232,auVar228,auVar488);
                    auVar232 = vfmadd213ps_fma(auVar232,auVar228,auVar400);
                    auVar232 = vfmadd213ps_fma(auVar232,auVar428,auVar228);
                    auVar372._0_4_ = auVar232._0_4_ + 1.0;
                    auVar372._4_4_ = auVar232._4_4_ + 1.0;
                    auVar372._8_4_ = auVar232._8_4_ + 1.0;
                    auVar372._12_4_ = auVar232._12_4_ + 1.0;
                    auVar232 = vcvttps2dq_avx512vl(auVar238);
                    auVar232 = vpslld_avx(auVar232,0x17);
                    auVar232 = vpaddd_avx(auVar232,auVar494);
                    auVar232 = vfmadd213ps_fma(auVar232,auVar372,auVar412);
                    in_ZMM8 = ZEXT1664(auVar232);
                    auVar232 = vdivps_avx(auVar412,auVar232);
                    break;
                  case 5:
                    auVar228 = vminps_avx(auVar232,auVar385);
                    auVar228 = vmaxps_avx(auVar228,auVar392);
                    auVar229 = vfmadd213ps_fma(auVar406,auVar228,auVar400);
                    auVar230 = vcvttps2dq_avx512vl(auVar229);
                    auVar230 = vcvtdq2ps_avx512vl(auVar230);
                    uVar168 = vcmpps_avx512vl(auVar229,auVar230,1);
                    auVar229 = vsubps_avx512vl(auVar230,auVar412);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar233._0_4_ =
                         (uint)bVar194 * auVar229._0_4_ | (uint)!bVar194 * auVar230._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar233._4_4_ =
                         (uint)bVar194 * auVar229._4_4_ | (uint)!bVar194 * auVar230._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar233._8_4_ =
                         (uint)bVar194 * auVar229._8_4_ | (uint)!bVar194 * auVar230._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar233._12_4_ =
                         (uint)bVar194 * auVar229._12_4_ | (uint)!bVar194 * auVar230._12_4_;
                    auVar228 = vfmsub231ps_avx512vl(auVar228,auVar233,auVar418);
                    auVar228 = vfnmsub231ps_avx512vl(auVar228,auVar233,auVar500);
                    auVar451._0_4_ = auVar228._0_4_ * auVar228._0_4_;
                    auVar451._4_4_ = auVar228._4_4_ * auVar228._4_4_;
                    auVar451._8_4_ = auVar228._8_4_ * auVar228._8_4_;
                    auVar451._12_4_ = auVar228._12_4_ * auVar228._12_4_;
                    auVar229 = vfmadd213ps_avx512vl(auVar198,auVar228,auVar470);
                    auVar229 = vfmadd213ps_avx512vl(auVar229,auVar228,auVar476);
                    auVar229 = vfmadd213ps_avx512vl(auVar229,auVar228,auVar482);
                    auVar229 = vfmadd213ps_avx512vl(auVar229,auVar228,auVar488);
                    auVar229 = vfmadd213ps_avx512vl(auVar229,auVar228,auVar400);
                    auVar228 = vfmadd213ps_avx512vl(auVar229,auVar451,auVar228);
                    auVar229 = vaddps_avx512vl(auVar228,auVar412);
                    auVar228 = vcvttps2dq_avx512vl(auVar233);
                    auVar228 = vpslld_avx(auVar228,0x17);
                    auVar228 = vpaddd_avx(auVar228,auVar494);
                    auVar228 = vfmadd213ps_fma(auVar228,auVar229,auVar412);
                    uVar168 = vcmpps_avx512vl(auVar228,(undefined1  [16])0x0,2);
                    auVar49._8_4_ = 0x800000;
                    auVar49._0_8_ = 0x80000000800000;
                    auVar49._12_4_ = 0x800000;
                    auVar228 = vmaxps_avx512vl(auVar228,auVar49);
                    auVar231 = vpsrld_avx(auVar228,0x17);
                    auVar229 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar50._8_4_ = 0x3f000000;
                    auVar50._0_8_ = 0x3f0000003f000000;
                    auVar50._12_4_ = 0x3f000000;
                    auVar228 = vpternlogd_avx512vl(auVar228,auVar229,auVar50,0xea);
                    auVar51._8_4_ = 0x3f3504f3;
                    auVar51._0_8_ = 0x3f3504f33f3504f3;
                    auVar51._12_4_ = 0x3f3504f3;
                    uVar169 = vcmpps_avx512vl(auVar228,auVar51,1);
                    auVar52._8_4_ = 0xbf800000;
                    auVar52._0_8_ = 0xbf800000bf800000;
                    auVar52._12_4_ = 0xbf800000;
                    auVar229 = vaddps_avx512vl(auVar228,auVar52);
                    auVar228 = vaddps_avx512vl(auVar229,auVar228);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar234._0_4_ =
                         (uint)bVar194 * auVar228._0_4_ | (uint)!bVar194 * auVar229._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar234._4_4_ =
                         (uint)bVar194 * auVar228._4_4_ | (uint)!bVar194 * auVar229._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar234._8_4_ =
                         (uint)bVar194 * auVar228._8_4_ | (uint)!bVar194 * auVar229._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar234._12_4_ =
                         (uint)bVar194 * auVar228._12_4_ | (uint)!bVar194 * auVar229._12_4_;
                    auVar229 = vmulps_avx512vl(auVar234,auVar234);
                    auVar53._8_4_ = 0xbdebd1b8;
                    auVar53._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar53._12_4_ = 0xbdebd1b8;
                    auVar228 = vfmadd213ps_avx512vl(auVar199,auVar234,auVar53);
                    auVar228 = vfmadd213ps_avx512vl(auVar228,auVar234,auVar200);
                    auVar228 = vfmadd213ps_avx512vl(auVar228,auVar234,auVar221);
                    auVar228 = vfmadd213ps_avx512vl(auVar228,auVar234,auVar222);
                    auVar228 = vfmadd213ps_avx512vl(auVar228,auVar234,auVar223);
                    auVar228 = vfmadd213ps_avx512vl(auVar228,auVar234,auVar224);
                    auVar228 = vfmadd213ps_avx512vl(auVar228,auVar234,auVar225);
                    auVar228 = vfmadd213ps_avx512vl(auVar228,auVar234,auVar226);
                    auVar230 = vmulps_avx512vl(auVar229,auVar234);
                    auVar230 = vmulps_avx512vl(auVar230,auVar228);
                    auVar54._8_4_ = 0xffffff82;
                    auVar54._0_8_ = 0xffffff82ffffff82;
                    auVar54._12_4_ = 0xffffff82;
                    auVar228 = vpaddd_avx512vl(auVar231,auVar54);
                    auVar228 = vcvtdq2ps_avx(auVar228);
                    auVar231 = vsubps_avx512vl(auVar228,auVar412);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar235._0_4_ =
                         (uint)bVar194 * auVar231._0_4_ | (uint)!bVar194 * auVar228._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar235._4_4_ =
                         (uint)bVar194 * auVar231._4_4_ | (uint)!bVar194 * auVar228._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar235._8_4_ =
                         (uint)bVar194 * auVar231._8_4_ | (uint)!bVar194 * auVar228._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar235._12_4_ =
                         (uint)bVar194 * auVar231._12_4_ | (uint)!bVar194 * auVar228._12_4_;
                    auVar228 = vfmadd231ps_avx512vl(auVar230,auVar235,auVar500);
                    auVar228 = vfmsub231ps_avx512vl(auVar228,auVar400,auVar229);
                    auVar228 = vsubps_avx512vl(auVar228,auVar234);
                    auVar228 = vfnmadd231ps_fma(auVar228,auVar418,auVar235);
                    auVar229 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar236._0_4_ =
                         (uint)bVar194 * auVar229._0_4_ |
                         (uint)!bVar194 * (int)(auVar228._0_4_ + auVar228._0_4_);
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar236._4_4_ =
                         (uint)bVar194 * auVar229._4_4_ |
                         (uint)!bVar194 * (int)(auVar228._4_4_ + auVar228._4_4_);
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar236._8_4_ =
                         (uint)bVar194 * auVar229._8_4_ |
                         (uint)!bVar194 * (int)(auVar228._8_4_ + auVar228._8_4_);
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar236._12_4_ =
                         (uint)bVar194 * auVar229._12_4_ |
                         (uint)!bVar194 * (int)(auVar228._12_4_ + auVar228._12_4_);
                    auVar228 = vminps_avx(auVar236,auVar385);
                    auVar228 = vmaxps_avx(auVar228,auVar392);
                    auVar229 = vfmadd213ps_fma(auVar406,auVar228,auVar400);
                    auVar230 = vcvttps2dq_avx512vl(auVar229);
                    auVar230 = vcvtdq2ps_avx512vl(auVar230);
                    uVar168 = vcmpps_avx512vl(auVar229,auVar230,1);
                    auVar229 = vsubps_avx512vl(auVar230,auVar412);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar237._0_4_ =
                         (uint)bVar194 * auVar229._0_4_ | (uint)!bVar194 * auVar230._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar237._4_4_ =
                         (uint)bVar194 * auVar229._4_4_ | (uint)!bVar194 * auVar230._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar237._8_4_ =
                         (uint)bVar194 * auVar229._8_4_ | (uint)!bVar194 * auVar230._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar237._12_4_ =
                         (uint)bVar194 * auVar229._12_4_ | (uint)!bVar194 * auVar230._12_4_;
                    in_ZMM16 = ZEXT1664(auVar237);
                    auVar228 = vfmsub231ps_avx512vl(auVar228,auVar237,auVar418);
                    auVar228 = vfnmsub231ps_avx512vl(auVar228,auVar237,auVar500);
                    auVar452._0_4_ = auVar228._0_4_ * auVar228._0_4_;
                    auVar452._4_4_ = auVar228._4_4_ * auVar228._4_4_;
                    auVar452._8_4_ = auVar228._8_4_ * auVar228._8_4_;
                    auVar452._12_4_ = auVar228._12_4_ * auVar228._12_4_;
                    auVar229 = vfmadd213ps_avx512vl(auVar198,auVar228,auVar470);
                    auVar229 = vfmadd213ps_avx512vl(auVar229,auVar228,auVar476);
                    auVar229 = vfmadd213ps_avx512vl(auVar229,auVar228,auVar482);
                    auVar229 = vfmadd213ps_avx512vl(auVar229,auVar228,auVar488);
                    auVar229 = vfmadd213ps_avx512vl(auVar229,auVar228,auVar400);
                    auVar228 = vfmadd213ps_avx512vl(auVar229,auVar452,auVar228);
                    auVar229 = vaddps_avx512vl(auVar228,auVar412);
                    auVar228 = vcvttps2dq_avx512vl(auVar237);
                    auVar228 = vpslld_avx(auVar228,0x17);
                    auVar228 = vpaddd_avx(auVar228,auVar494);
                    auVar228 = vfmadd213ps_fma(auVar228,auVar229,auVar412);
                    auVar228 = vdivps_avx512vl(auVar227,auVar228);
                    in_ZMM8 = ZEXT1664(auVar228);
                    auVar232 = vfmsub231ps_fma(auVar232,auVar232,auVar228);
                    break;
                  case 6:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar429._4_4_ = uVar2;
                    auVar429._0_4_ = uVar2;
                    auVar429._8_4_ = uVar2;
                    auVar429._12_4_ = uVar2;
                    uVar2 = puVar12[1];
                    auVar48._4_4_ = uVar2;
                    auVar48._0_4_ = uVar2;
                    auVar48._8_4_ = uVar2;
                    auVar48._12_4_ = uVar2;
                    auVar228 = vfmadd213ps_avx512vl(auVar429,auVar232,auVar48);
                    auVar228 = vmaxps_avx(auVar228,(undefined1  [16])0x0);
                    auVar228 = vminps_avx(auVar228,auVar412);
                    in_ZMM8 = ZEXT1664(auVar228);
                    auVar373._0_4_ = auVar228._0_4_ * auVar232._0_4_;
                    auVar373._4_4_ = auVar228._4_4_ * auVar232._4_4_;
                    auVar373._8_4_ = auVar228._8_4_ * auVar232._8_4_;
                    auVar373._12_4_ = auVar228._12_4_ * auVar232._12_4_;
                    auVar232 = auVar373;
                  }
                  *pauVar187 = auVar232;
                  pauVar187 = pauVar187 + 1;
                  uVar173 = uVar173 + 1;
                  iVar192 = iVar192 + 1;
                } while (uVar173 != local_228.w);
              }
              iVar170 = iVar170 + 1;
            } while (iVar170 != local_228.h);
          }
          local_2e8 = local_2e8 + 1;
        } while (local_2e8 != (long)local_228.c);
      }
      local_1e0._0_4_ = (uint)local_1e0 | local_158._0_4_ ^ 1;
      if (((uint)local_1e0 == 0) && (0 < (long)local_228.c)) {
        iVar8 = (this->super_Deconvolution).dilation_w;
        iVar9 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar171 = (this->super_Deconvolution).stride_h;
        iVar191 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar179 = (this->super_Deconvolution).kernel_w;
        uVar167 = (this->super_Deconvolution).kernel_h;
        local_2e8 = 0;
        auVar390._8_4_ = 0x42b0c0a5;
        auVar390._0_8_ = 0x42b0c0a542b0c0a5;
        auVar390._12_4_ = 0x42b0c0a5;
        auVar390._16_4_ = 0x42b0c0a5;
        auVar390._20_4_ = 0x42b0c0a5;
        auVar390._24_4_ = 0x42b0c0a5;
        auVar390._28_4_ = 0x42b0c0a5;
        auVar399._8_4_ = 0xc2b0c0a5;
        auVar399._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar399._12_4_ = 0xc2b0c0a5;
        auVar399._16_4_ = 0xc2b0c0a5;
        auVar399._20_4_ = 0xc2b0c0a5;
        auVar399._24_4_ = 0xc2b0c0a5;
        auVar399._28_4_ = 0xc2b0c0a5;
        auVar405._8_4_ = 0x3f000000;
        auVar405._0_8_ = 0x3f0000003f000000;
        auVar405._12_4_ = 0x3f000000;
        auVar405._16_4_ = 0x3f000000;
        auVar405._20_4_ = 0x3f000000;
        auVar405._24_4_ = 0x3f000000;
        auVar405._28_4_ = 0x3f000000;
        auVar411._8_4_ = 0x3fb8aa3b;
        auVar411._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar411._12_4_ = 0x3fb8aa3b;
        auVar411._16_4_ = 0x3fb8aa3b;
        auVar411._20_4_ = 0x3fb8aa3b;
        auVar411._24_4_ = 0x3fb8aa3b;
        auVar411._28_4_ = 0x3fb8aa3b;
        auVar417._8_4_ = 0x3f800000;
        auVar417._0_8_ = 0x3f8000003f800000;
        auVar417._12_4_ = 0x3f800000;
        auVar417._16_4_ = 0x3f800000;
        auVar417._20_4_ = 0x3f800000;
        auVar417._24_4_ = 0x3f800000;
        auVar417._28_4_ = 0x3f800000;
        auVar423._8_4_ = 0x3f318000;
        auVar423._0_8_ = 0x3f3180003f318000;
        auVar423._12_4_ = 0x3f318000;
        auVar423._16_4_ = 0x3f318000;
        auVar423._20_4_ = 0x3f318000;
        auVar423._24_4_ = 0x3f318000;
        auVar423._28_4_ = 0x3f318000;
        auVar251 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar475._8_4_ = 0x3ab743ce;
        auVar475._0_8_ = 0x3ab743ce3ab743ce;
        auVar475._12_4_ = 0x3ab743ce;
        auVar475._16_4_ = 0x3ab743ce;
        auVar475._20_4_ = 0x3ab743ce;
        auVar475._24_4_ = 0x3ab743ce;
        auVar475._28_4_ = 0x3ab743ce;
        auVar481._8_4_ = 0x3c088908;
        auVar481._0_8_ = 0x3c0889083c088908;
        auVar481._12_4_ = 0x3c088908;
        auVar481._16_4_ = 0x3c088908;
        auVar481._20_4_ = 0x3c088908;
        auVar481._24_4_ = 0x3c088908;
        auVar481._28_4_ = 0x3c088908;
        auVar487._8_4_ = 0x3d2aa9c1;
        auVar487._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar487._12_4_ = 0x3d2aa9c1;
        auVar487._16_4_ = 0x3d2aa9c1;
        auVar487._20_4_ = 0x3d2aa9c1;
        auVar487._24_4_ = 0x3d2aa9c1;
        auVar487._28_4_ = 0x3d2aa9c1;
        auVar493._8_4_ = 0x3e2aaaaa;
        auVar493._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar493._12_4_ = 0x3e2aaaaa;
        auVar493._16_4_ = 0x3e2aaaaa;
        auVar493._20_4_ = 0x3e2aaaaa;
        auVar493._24_4_ = 0x3e2aaaaa;
        auVar493._28_4_ = 0x3e2aaaaa;
        auVar499._8_4_ = 0x3f800000;
        auVar499._0_8_ = 0x3f8000003f800000;
        auVar499._12_4_ = 0x3f800000;
        auVar499._16_4_ = 0x3f800000;
        auVar499._20_4_ = 0x3f800000;
        auVar499._24_4_ = 0x3f800000;
        auVar499._28_4_ = 0x3f800000;
        auVar505._8_4_ = 0xb95e8083;
        auVar505._0_8_ = 0xb95e8083b95e8083;
        auVar505._12_4_ = 0xb95e8083;
        auVar505._16_4_ = 0xb95e8083;
        auVar505._20_4_ = 0xb95e8083;
        auVar505._24_4_ = 0xb95e8083;
        auVar505._28_4_ = 0xb95e8083;
        auVar252 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar273 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar274 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar275 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar276 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar277 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar278 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar279 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar280 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar281 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar282 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar283 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar180 = bottom_blob->w;
            iVar190 = bottom_blob->h;
            pauVar189 = (undefined1 (*) [32])
                        (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
            uVar165 = bottom_blob->c;
            iVar170 = 0;
            do {
              if (0 < local_228.w) {
                uVar173 = 0;
                iVar192 = (1 - uVar179) * iVar8;
                do {
                  if (pvVar16 == (void *)0x0) {
                    auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar352 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar16 + local_2e8 * 0x20));
                  }
                  if (0 < (int)uVar165) {
                    pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    uVar168 = 0;
                    do {
                      if (0 < (int)uVar167) {
                        uVar174 = 0;
                        uVar169 = 0;
                        do {
                          iVar157 = (((int)uVar169 - uVar167) + 1) * iVar9 + iVar170;
                          if ((((-1 < iVar157) &&
                               (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                              (iVar158 < iVar190)) && (0 < (int)uVar179)) {
                            uVar178 = uVar174;
                            uVar183 = (ulong)uVar179;
                            iVar157 = iVar192;
                            do {
                              if (((-1 < iVar157) &&
                                  (iVar159 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                                 (iVar159 < iVar180)) {
                                uVar2 = *(undefined4 *)
                                         ((long)bottom_blob->data +
                                         (long)iVar159 * 4 +
                                         (long)iVar158 *
                                         (long)bottom_blob->w * bottom_blob->elemsize +
                                         bottom_blob->cstep * bottom_blob->elemsize * uVar168);
                                auVar443._4_4_ = uVar2;
                                auVar443._0_4_ = uVar2;
                                auVar443._8_4_ = uVar2;
                                auVar443._12_4_ = uVar2;
                                auVar443._16_4_ = uVar2;
                                auVar443._20_4_ = uVar2;
                                auVar443._24_4_ = uVar2;
                                auVar443._28_4_ = uVar2;
                                in_ZMM8 = ZEXT3264(auVar443);
                                auVar198 = vfmadd231ps_fma(auVar352._0_32_,auVar443,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar176 +
                                                            (uVar178 & 0xffffffff) * 4));
                                auVar352 = ZEXT1664(auVar198);
                              }
                              uVar178 = uVar178 + 8;
                              iVar157 = iVar157 + iVar8;
                              uVar183 = uVar183 - 1;
                            } while (uVar183 != 0);
                          }
                          uVar169 = uVar169 + 1;
                          uVar174 = uVar174 + (ulong)uVar179 * 8;
                        } while (uVar169 != uVar167);
                      }
                      pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar179 * uVar167 * 8) * 4);
                      uVar168 = uVar168 + 1;
                    } while (uVar168 != uVar165);
                  }
                  auVar284 = auVar352._0_32_;
                  auVar253 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                  switch(iVar191) {
                  case 1:
                    auVar284 = vmaxps_avx(auVar284,auVar253);
                    break;
                  case 2:
                    auVar254 = vmaxps_avx(auVar284,auVar253);
                    in_ZMM8 = ZEXT3264(auVar254);
                    auVar284 = vminps_avx(auVar284,auVar253);
                    uVar2 = *(this->super_Deconvolution).activation_params.data;
                    auVar118._4_4_ = uVar2;
                    auVar118._0_4_ = uVar2;
                    auVar118._8_4_ = uVar2;
                    auVar118._12_4_ = uVar2;
                    auVar118._16_4_ = uVar2;
                    auVar118._20_4_ = uVar2;
                    auVar118._24_4_ = uVar2;
                    auVar118._28_4_ = uVar2;
                    auVar284 = vfmadd132ps_avx512vl(auVar284,auVar254,auVar118);
                    break;
                  case 3:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar116._4_4_ = uVar2;
                    auVar116._0_4_ = uVar2;
                    auVar116._8_4_ = uVar2;
                    auVar116._12_4_ = uVar2;
                    auVar116._16_4_ = uVar2;
                    auVar116._20_4_ = uVar2;
                    auVar116._24_4_ = uVar2;
                    auVar116._28_4_ = uVar2;
                    auVar284 = vmaxps_avx512vl(auVar284,auVar116);
                    uVar2 = puVar12[1];
                    auVar117._4_4_ = uVar2;
                    auVar117._0_4_ = uVar2;
                    auVar117._8_4_ = uVar2;
                    auVar117._12_4_ = uVar2;
                    auVar117._16_4_ = uVar2;
                    auVar117._20_4_ = uVar2;
                    auVar117._24_4_ = uVar2;
                    auVar117._28_4_ = uVar2;
                    auVar284 = vminps_avx512vl(auVar284,auVar117);
                    break;
                  case 4:
                    auVar114._8_4_ = 0x80000000;
                    auVar114._0_8_ = 0x8000000080000000;
                    auVar114._12_4_ = 0x80000000;
                    auVar114._16_4_ = 0x80000000;
                    auVar114._20_4_ = 0x80000000;
                    auVar114._24_4_ = 0x80000000;
                    auVar114._28_4_ = 0x80000000;
                    auVar284 = vxorps_avx512vl(auVar284,auVar114);
                    auVar284 = vminps_avx(auVar284,auVar390);
                    auVar284 = vmaxps_avx(auVar284,auVar399);
                    auVar198 = vfmadd231ps_fma(auVar405,auVar284,auVar411);
                    auVar253 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar253,1);
                    auVar254 = vsubps_avx512vl(auVar253,auVar417);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar302._0_4_ =
                         (uint)bVar194 * auVar254._0_4_ | (uint)!bVar194 * auVar253._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar302._4_4_ =
                         (uint)bVar194 * auVar254._4_4_ | (uint)!bVar194 * auVar253._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar302._8_4_ =
                         (uint)bVar194 * auVar254._8_4_ | (uint)!bVar194 * auVar253._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar302._12_4_ =
                         (uint)bVar194 * auVar254._12_4_ | (uint)!bVar194 * auVar253._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar302._16_4_ =
                         (uint)bVar194 * auVar254._16_4_ | (uint)!bVar194 * auVar253._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar302._20_4_ =
                         (uint)bVar194 * auVar254._20_4_ | (uint)!bVar194 * auVar253._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar302._24_4_ =
                         (uint)bVar194 * auVar254._24_4_ | (uint)!bVar194 * auVar253._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar302._28_4_ =
                         (uint)bVar194 * auVar254._28_4_ | (uint)!bVar194 * auVar253._28_4_;
                    in_ZMM16 = ZEXT3264(auVar302);
                    auVar284 = vfmsub231ps_avx512vl(auVar284,auVar302,auVar423);
                    auVar115._8_4_ = 0x395e8083;
                    auVar115._0_8_ = 0x395e8083395e8083;
                    auVar115._12_4_ = 0x395e8083;
                    auVar115._16_4_ = 0x395e8083;
                    auVar115._20_4_ = 0x395e8083;
                    auVar115._24_4_ = 0x395e8083;
                    auVar115._28_4_ = 0x395e8083;
                    auVar284 = vfmsub231ps_avx512vl(auVar284,auVar302,auVar115);
                    auVar444._0_4_ = auVar284._0_4_ * auVar284._0_4_;
                    auVar444._4_4_ = auVar284._4_4_ * auVar284._4_4_;
                    auVar444._8_4_ = auVar284._8_4_ * auVar284._8_4_;
                    auVar444._12_4_ = auVar284._12_4_ * auVar284._12_4_;
                    auVar444._16_4_ = auVar284._16_4_ * auVar284._16_4_;
                    auVar444._20_4_ = auVar284._20_4_ * auVar284._20_4_;
                    auVar444._24_4_ = auVar284._24_4_ * auVar284._24_4_;
                    auVar444._28_4_ = 0;
                    auVar198 = vfmadd213ps_fma(auVar251,auVar284,auVar475);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar284,auVar481);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar284,auVar487);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar284,auVar493);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar284,auVar405);
                    auVar198 = vfmadd213ps_fma(ZEXT1632(auVar198),auVar444,auVar284);
                    auVar382._0_4_ = auVar198._0_4_ + 1.0;
                    auVar382._4_4_ = auVar198._4_4_ + 1.0;
                    auVar382._8_4_ = auVar198._8_4_ + 1.0;
                    auVar382._12_4_ = auVar198._12_4_ + 1.0;
                    auVar382._16_4_ = 0x3f800000;
                    auVar382._20_4_ = 0x3f800000;
                    auVar382._24_4_ = 0x3f800000;
                    auVar382._28_4_ = 0x3f800000;
                    auVar284 = vcvttps2dq_avx512vl(auVar302);
                    auVar284 = vpslld_avx2(auVar284,0x17);
                    auVar284 = vpaddd_avx2(auVar284,auVar499);
                    auVar198 = vfmadd213ps_fma(auVar284,auVar382,auVar417);
                    in_ZMM8 = ZEXT1664(auVar198);
                    auVar284 = vdivps_avx(auVar417,ZEXT1632(auVar198));
                    break;
                  case 5:
                    auVar284 = vminps_avx(auVar284,auVar390);
                    auVar284 = vmaxps_avx(auVar284,auVar399);
                    auVar198 = vfmadd213ps_fma(auVar411,auVar284,auVar405);
                    auVar254 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar254,1);
                    auVar255 = vsubps_avx512vl(auVar254,auVar417);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar297._0_4_ =
                         (uint)bVar194 * auVar255._0_4_ | (uint)!bVar194 * auVar254._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar297._4_4_ =
                         (uint)bVar194 * auVar255._4_4_ | (uint)!bVar194 * auVar254._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar297._8_4_ =
                         (uint)bVar194 * auVar255._8_4_ | (uint)!bVar194 * auVar254._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar297._12_4_ =
                         (uint)bVar194 * auVar255._12_4_ | (uint)!bVar194 * auVar254._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar297._16_4_ =
                         (uint)bVar194 * auVar255._16_4_ | (uint)!bVar194 * auVar254._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar297._20_4_ =
                         (uint)bVar194 * auVar255._20_4_ | (uint)!bVar194 * auVar254._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar297._24_4_ =
                         (uint)bVar194 * auVar255._24_4_ | (uint)!bVar194 * auVar254._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar297._28_4_ =
                         (uint)bVar194 * auVar255._28_4_ | (uint)!bVar194 * auVar254._28_4_;
                    auVar284 = vfmsub231ps_avx512vl(auVar284,auVar297,auVar423);
                    auVar284 = vfnmsub231ps_avx512vl(auVar284,auVar297,auVar505);
                    auVar468._0_4_ = auVar284._0_4_ * auVar284._0_4_;
                    auVar468._4_4_ = auVar284._4_4_ * auVar284._4_4_;
                    auVar468._8_4_ = auVar284._8_4_ * auVar284._8_4_;
                    auVar468._12_4_ = auVar284._12_4_ * auVar284._12_4_;
                    auVar468._16_4_ = auVar284._16_4_ * auVar284._16_4_;
                    auVar468._20_4_ = auVar284._20_4_ * auVar284._20_4_;
                    auVar468._24_4_ = auVar284._24_4_ * auVar284._24_4_;
                    auVar468._28_4_ = 0;
                    auVar254 = vfmadd213ps_avx512vl(auVar251,auVar284,auVar475);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar284,auVar481);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar284,auVar487);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar284,auVar493);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar284,auVar405);
                    auVar284 = vfmadd213ps_avx512vl(auVar254,auVar468,auVar284);
                    auVar254 = vaddps_avx512vl(auVar284,auVar417);
                    auVar284 = vcvttps2dq_avx512vl(auVar297);
                    auVar284 = vpslld_avx2(auVar284,0x17);
                    auVar284 = vpaddd_avx2(auVar284,auVar499);
                    auVar198 = vfmadd213ps_fma(auVar284,auVar254,auVar417);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar253,2);
                    auVar111._8_4_ = 0x800000;
                    auVar111._0_8_ = 0x80000000800000;
                    auVar111._12_4_ = 0x800000;
                    auVar111._16_4_ = 0x800000;
                    auVar111._20_4_ = 0x800000;
                    auVar111._24_4_ = 0x800000;
                    auVar111._28_4_ = 0x800000;
                    auVar284 = vmaxps_avx512vl(ZEXT1632(auVar198),auVar111);
                    auVar255 = vpsrld_avx2(auVar284,0x17);
                    auVar253 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar112._8_4_ = 0x3f000000;
                    auVar112._0_8_ = 0x3f0000003f000000;
                    auVar112._12_4_ = 0x3f000000;
                    auVar112._16_4_ = 0x3f000000;
                    auVar112._20_4_ = 0x3f000000;
                    auVar112._24_4_ = 0x3f000000;
                    auVar112._28_4_ = 0x3f000000;
                    auVar284 = vpternlogd_avx512vl(auVar284,auVar253,auVar112,0xea);
                    uVar169 = vcmpps_avx512vl(auVar284,auVar252,1);
                    auVar253 = vaddps_avx512vl(auVar284,auVar273);
                    auVar284 = vaddps_avx512vl(auVar253,auVar284);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar298._0_4_ =
                         (uint)bVar194 * auVar284._0_4_ | (uint)!bVar194 * auVar253._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar298._4_4_ =
                         (uint)bVar194 * auVar284._4_4_ | (uint)!bVar194 * auVar253._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar298._8_4_ =
                         (uint)bVar194 * auVar284._8_4_ | (uint)!bVar194 * auVar253._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar298._12_4_ =
                         (uint)bVar194 * auVar284._12_4_ | (uint)!bVar194 * auVar253._12_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                    auVar298._16_4_ =
                         (uint)bVar194 * auVar284._16_4_ | (uint)!bVar194 * auVar253._16_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                    auVar298._20_4_ =
                         (uint)bVar194 * auVar284._20_4_ | (uint)!bVar194 * auVar253._20_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                    auVar298._24_4_ =
                         (uint)bVar194 * auVar284._24_4_ | (uint)!bVar194 * auVar253._24_4_;
                    bVar194 = SUB81(uVar169 >> 7,0);
                    auVar298._28_4_ =
                         (uint)bVar194 * auVar284._28_4_ | (uint)!bVar194 * auVar253._28_4_;
                    auVar253 = vmulps_avx512vl(auVar298,auVar298);
                    auVar284 = vfmadd213ps_avx512vl(auVar274,auVar298,auVar275);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar298,auVar276);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar298,auVar277);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar298,auVar278);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar298,auVar279);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar298,auVar280);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar298,auVar281);
                    auVar284 = vfmadd213ps_avx512vl(auVar284,auVar298,auVar282);
                    auVar254 = vmulps_avx512vl(auVar253,auVar298);
                    auVar254 = vmulps_avx512vl(auVar254,auVar284);
                    auVar113._8_4_ = 0xffffff82;
                    auVar113._0_8_ = 0xffffff82ffffff82;
                    auVar113._12_4_ = 0xffffff82;
                    auVar113._16_4_ = 0xffffff82;
                    auVar113._20_4_ = 0xffffff82;
                    auVar113._24_4_ = 0xffffff82;
                    auVar113._28_4_ = 0xffffff82;
                    auVar284 = vpaddd_avx512vl(auVar255,auVar113);
                    auVar284 = vcvtdq2ps_avx(auVar284);
                    auVar255 = vsubps_avx512vl(auVar284,auVar417);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar299._0_4_ =
                         (uint)bVar194 * auVar255._0_4_ | (uint)!bVar194 * auVar284._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar299._4_4_ =
                         (uint)bVar194 * auVar255._4_4_ | (uint)!bVar194 * auVar284._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar299._8_4_ =
                         (uint)bVar194 * auVar255._8_4_ | (uint)!bVar194 * auVar284._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar299._12_4_ =
                         (uint)bVar194 * auVar255._12_4_ | (uint)!bVar194 * auVar284._12_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 4) & 1);
                    auVar299._16_4_ =
                         (uint)bVar194 * auVar255._16_4_ | (uint)!bVar194 * auVar284._16_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 5) & 1);
                    auVar299._20_4_ =
                         (uint)bVar194 * auVar255._20_4_ | (uint)!bVar194 * auVar284._20_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 6) & 1);
                    auVar299._24_4_ =
                         (uint)bVar194 * auVar255._24_4_ | (uint)!bVar194 * auVar284._24_4_;
                    bVar194 = SUB81(uVar169 >> 7,0);
                    auVar299._28_4_ =
                         (uint)bVar194 * auVar255._28_4_ | (uint)!bVar194 * auVar284._28_4_;
                    auVar284 = vfmadd231ps_avx512vl(auVar254,auVar299,auVar505);
                    auVar284 = vfmsub231ps_avx512vl(auVar284,auVar405,auVar253);
                    auVar284 = vsubps_avx512vl(auVar284,auVar298);
                    auVar198 = vfmsub231ps_fma(auVar284,auVar423,auVar299);
                    auVar284 = vmulps_avx512vl(ZEXT1632(auVar198),auVar283);
                    auVar253 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar300._0_4_ =
                         (uint)bVar194 * auVar253._0_4_ | (uint)!bVar194 * auVar284._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar300._4_4_ =
                         (uint)bVar194 * auVar253._4_4_ | (uint)!bVar194 * auVar284._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar300._8_4_ =
                         (uint)bVar194 * auVar253._8_4_ | (uint)!bVar194 * auVar284._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar300._12_4_ =
                         (uint)bVar194 * auVar253._12_4_ | (uint)!bVar194 * auVar284._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar300._16_4_ =
                         (uint)bVar194 * auVar253._16_4_ | (uint)!bVar194 * auVar284._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar300._20_4_ =
                         (uint)bVar194 * auVar253._20_4_ | (uint)!bVar194 * auVar284._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar300._24_4_ =
                         (uint)bVar194 * auVar253._24_4_ | (uint)!bVar194 * auVar284._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar300._28_4_ =
                         (uint)bVar194 * auVar253._28_4_ | (uint)!bVar194 * auVar284._28_4_;
                    auVar284 = vminps_avx(auVar300,auVar390);
                    auVar284 = vmaxps_avx(auVar284,auVar399);
                    auVar198 = vfmadd213ps_fma(auVar411,auVar284,auVar405);
                    auVar253 = vrndscaleps_avx512vl(ZEXT1632(auVar198),1);
                    uVar168 = vcmpps_avx512vl(ZEXT1632(auVar198),auVar253,1);
                    auVar254 = vsubps_avx512vl(auVar253,auVar417);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar301._0_4_ =
                         (uint)bVar194 * auVar254._0_4_ | (uint)!bVar194 * auVar253._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar301._4_4_ =
                         (uint)bVar194 * auVar254._4_4_ | (uint)!bVar194 * auVar253._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar301._8_4_ =
                         (uint)bVar194 * auVar254._8_4_ | (uint)!bVar194 * auVar253._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar301._12_4_ =
                         (uint)bVar194 * auVar254._12_4_ | (uint)!bVar194 * auVar253._12_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 4) & 1);
                    auVar301._16_4_ =
                         (uint)bVar194 * auVar254._16_4_ | (uint)!bVar194 * auVar253._16_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 5) & 1);
                    auVar301._20_4_ =
                         (uint)bVar194 * auVar254._20_4_ | (uint)!bVar194 * auVar253._20_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 6) & 1);
                    auVar301._24_4_ =
                         (uint)bVar194 * auVar254._24_4_ | (uint)!bVar194 * auVar253._24_4_;
                    bVar194 = SUB81(uVar168 >> 7,0);
                    auVar301._28_4_ =
                         (uint)bVar194 * auVar254._28_4_ | (uint)!bVar194 * auVar253._28_4_;
                    in_ZMM16 = ZEXT3264(auVar301);
                    auVar284 = vfmsub231ps_avx512vl(auVar284,auVar301,auVar423);
                    auVar284 = vfnmsub231ps_avx512vl(auVar284,auVar301,auVar505);
                    auVar469._0_4_ = auVar284._0_4_ * auVar284._0_4_;
                    auVar469._4_4_ = auVar284._4_4_ * auVar284._4_4_;
                    auVar469._8_4_ = auVar284._8_4_ * auVar284._8_4_;
                    auVar469._12_4_ = auVar284._12_4_ * auVar284._12_4_;
                    auVar469._16_4_ = auVar284._16_4_ * auVar284._16_4_;
                    auVar469._20_4_ = auVar284._20_4_ * auVar284._20_4_;
                    auVar469._24_4_ = auVar284._24_4_ * auVar284._24_4_;
                    auVar469._28_4_ = 0;
                    auVar253 = vfmadd213ps_avx512vl(auVar251,auVar284,auVar475);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar284,auVar481);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar284,auVar487);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar284,auVar493);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar284,auVar405);
                    auVar284 = vfmadd213ps_avx512vl(auVar253,auVar469,auVar284);
                    auVar253 = vaddps_avx512vl(auVar284,auVar417);
                    auVar284 = vcvttps2dq_avx512vl(auVar301);
                    auVar284 = vpslld_avx2(auVar284,0x17);
                    auVar284 = vpaddd_avx2(auVar284,auVar499);
                    auVar198 = vfmadd213ps_fma(auVar284,auVar253,auVar417);
                    auVar284 = vdivps_avx(auVar417,ZEXT1632(auVar198));
                    auVar284 = vfnmadd213ps_avx512vl(auVar284,auVar283,auVar273);
                    goto LAB_0028faaa;
                  case 6:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar445._4_4_ = uVar2;
                    auVar445._0_4_ = uVar2;
                    auVar445._8_4_ = uVar2;
                    auVar445._12_4_ = uVar2;
                    auVar445._16_4_ = uVar2;
                    auVar445._20_4_ = uVar2;
                    auVar445._24_4_ = uVar2;
                    auVar445._28_4_ = uVar2;
                    uVar2 = puVar12[1];
                    auVar110._4_4_ = uVar2;
                    auVar110._0_4_ = uVar2;
                    auVar110._8_4_ = uVar2;
                    auVar110._12_4_ = uVar2;
                    auVar110._16_4_ = uVar2;
                    auVar110._20_4_ = uVar2;
                    auVar110._24_4_ = uVar2;
                    auVar110._28_4_ = uVar2;
                    auVar284 = vfmadd213ps_avx512vl(auVar445,auVar284,auVar110);
                    auVar284 = vmaxps_avx(auVar284,auVar253);
                    auVar284 = vminps_avx(auVar284,auVar417);
LAB_0028faaa:
                    in_ZMM8 = ZEXT3264(auVar284);
                    auVar383._0_4_ = auVar284._0_4_ * auVar352._0_4_;
                    auVar383._4_4_ = auVar284._4_4_ * auVar352._4_4_;
                    auVar383._8_4_ = auVar284._8_4_ * auVar352._8_4_;
                    auVar383._12_4_ = auVar284._12_4_ * auVar352._12_4_;
                    auVar383._16_4_ = auVar284._16_4_ * auVar352._16_4_;
                    auVar383._20_4_ = auVar284._20_4_ * auVar352._20_4_;
                    auVar383._28_36_ = auVar352._28_36_;
                    auVar383._24_4_ = auVar284._24_4_ * auVar352._24_4_;
                    auVar284 = auVar383._0_32_;
                  }
                  *pauVar189 = auVar284;
                  pauVar189 = pauVar189 + 1;
                  uVar173 = uVar173 + 1;
                  iVar192 = iVar192 + 1;
                } while (uVar173 != local_228.w);
              }
              iVar170 = iVar170 + 1;
            } while (iVar170 != local_228.h);
          }
          local_2e8 = local_2e8 + 1;
        } while (local_2e8 != (long)local_228.c);
      }
      uVar177 = uVar177 ^ 1;
      if ((local_158._0_4_ == 8 && uVar177 == 0) &&
         (local_1e0 = (ulong)local_228.c, 0 < (long)local_1e0)) {
        iVar8 = (this->super_Deconvolution).dilation_w;
        iVar9 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar171 = (this->super_Deconvolution).stride_h;
        iVar191 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar179 = (this->super_Deconvolution).kernel_w;
        uVar167 = (this->super_Deconvolution).kernel_h;
        local_1c8 = local_228.data;
        local_1c0 = local_228.elemsize * local_228.cstep;
        iVar180 = bottom_blob->w;
        iVar190 = bottom_blob->h;
        uVar165 = bottom_blob->c;
        local_2e8 = 0;
        do {
          if (0 < iVar166) {
            sVar17 = (this->weight_data_tm).cstep;
            sVar13 = (this->weight_data_tm).elemsize;
            local_2b8 = (float *)(local_1c0 * local_2e8 + (long)local_1c8);
            pvVar176 = (this->weight_data_tm).data;
            iVar170 = 0;
            do {
              if (0 < iVar182) {
                iVar157 = bottom_blob->w;
                pvVar11 = bottom_blob->data;
                sVar14 = bottom_blob->elemsize;
                sVar15 = bottom_blob->cstep;
                local_1a8._0_8_ = (this->super_Deconvolution).activation_params.data;
                uVar173 = 0;
                iVar192 = (1 - uVar179) * iVar8;
                do {
                  if (pvVar16 == (void *)0x0) {
                    fVar367 = 0.0;
                  }
                  else {
                    fVar367 = *(float *)((long)pvVar16 + local_2e8 * 4);
                  }
                  if ((int)uVar165 < 1) {
                    auVar251 = SUB6432(ZEXT864(0),0);
                  }
                  else {
                    auVar352 = ZEXT864(0);
                    uVar168 = 0;
                    pvVar185 = (void *)(sVar17 * local_2e8 * sVar13 + (long)pvVar176);
                    do {
                      if (0 < (int)uVar167) {
                        uVar169 = 0;
                        uVar174 = 0;
                        do {
                          iVar158 = (((int)uVar174 - uVar167) + 1) * iVar9 + iVar170;
                          if ((((-1 < iVar158) &&
                               (iVar159 = iVar158 / iVar171, iVar158 % iVar171 == 0)) &&
                              (0 < (int)uVar179)) && (iVar159 < iVar190)) {
                            uVar178 = (ulong)uVar179;
                            uVar183 = uVar169;
                            iVar158 = iVar192;
                            do {
                              if (((-1 < iVar158) &&
                                  (iVar160 = iVar158 / iVar156, iVar158 % iVar156 == 0)) &&
                                 (iVar160 < iVar180)) {
                                auVar198 = vfmadd231ps_fma(auVar352._0_32_,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar11 +
                                                            (long)(iVar160 << 3) * 4 +
                                                            (long)iVar159 * (long)iVar157 * sVar14 +
                                                            sVar15 * sVar14 * uVar168),
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar185 +
                                                            (uVar183 & 0xffffffff) * 4));
                                auVar352 = ZEXT1664(auVar198);
                              }
                              uVar183 = uVar183 + 8;
                              iVar158 = iVar158 + iVar8;
                              uVar178 = uVar178 - 1;
                            } while (uVar178 != 0);
                          }
                          uVar174 = uVar174 + 1;
                          uVar169 = uVar169 + (ulong)uVar179 * 8;
                        } while (uVar174 != uVar167);
                      }
                      auVar251 = auVar352._0_32_;
                      pvVar185 = (void *)((long)pvVar185 + (long)(int)(uVar179 * uVar167 * 8) * 4);
                      uVar168 = uVar168 + 1;
                    } while (uVar168 != uVar165);
                  }
                  auVar199._0_4_ = auVar251._16_4_ + auVar251._0_4_;
                  auVar199._4_4_ = auVar251._20_4_ + auVar251._4_4_;
                  auVar199._8_4_ = auVar251._24_4_ + auVar251._8_4_;
                  auVar199._12_4_ = auVar251._28_4_ + auVar251._12_4_;
                  auVar198 = vshufpd_avx(auVar199,auVar199,1);
                  auVar200._0_4_ = auVar198._0_4_ + auVar199._0_4_;
                  auVar200._4_4_ = auVar198._4_4_ + auVar199._4_4_;
                  auVar200._8_4_ = auVar198._8_4_ + auVar199._8_4_;
                  auVar200._12_4_ = auVar198._12_4_ + auVar199._12_4_;
                  auVar198 = vmovshdup_avx(auVar200);
                  fVar367 = auVar198._0_4_ + fVar367 + auVar200._0_4_;
                  auVar198 = ZEXT416((uint)fVar367);
                  fVar384 = fVar367;
                  if (iVar191 - 1U < 6) {
                    switch(iVar191) {
                    case 1:
                      auVar198 = vmaxss_avx(ZEXT416((uint)fVar367),ZEXT416(0));
                      fVar384 = auVar198._0_4_;
                      break;
                    case 2:
                      uVar37 = vcmpss_avx512f(ZEXT416((uint)fVar367),ZEXT416(0),0xe);
                      bVar194 = (bool)((byte)uVar37 & 1);
                      fVar384 = (float)((uint)bVar194 * 0x3f800000 +
                                       (uint)!bVar194 * (int)*(float *)local_1a8._0_8_) * fVar367;
                      break;
                    case 3:
                      auVar198 = vmaxss_avx(auVar198,ZEXT416((uint)*(float *)local_1a8._0_8_));
                      fVar384 = auVar198._0_4_;
                      if (*(float *)(local_1a8._0_8_ + 4) < auVar198._0_4_) {
                        fVar384 = *(float *)(local_1a8._0_8_ + 4);
                      }
                      break;
                    case 4:
                      auVar198 = vminss_avx(auVar198,SUB6416(ZEXT464(0x42b0c0a5),0));
                      auVar61._8_4_ = 0x80000000;
                      auVar61._0_8_ = 0x8000000080000000;
                      auVar61._12_4_ = 0x80000000;
                      auVar199 = vxorps_avx512vl(auVar198,auVar61);
                      uVar37 = vcmpss_avx512f(auVar198,ZEXT416(0xc2b0c0a5),1);
                      bVar194 = (bool)((byte)uVar37 & 1);
                      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                      fVar367 = expf((float)((uint)bVar194 * 0x42b0c0a5 +
                                            (uint)!bVar194 * auVar199._0_4_));
                      fVar384 = 1.0 / (fVar367 + 1.0);
                      break;
                    case 5:
                      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                      fVar384 = expf(fVar367);
                      fVar384 = logf(fVar384 + 1.0);
                      fVar384 = tanhf(fVar384);
                      fVar384 = fVar384 * fVar367;
                      break;
                    case 6:
                      fVar3 = *(float *)local_1a8._0_8_;
                      auVar60._8_4_ = 0x80000000;
                      auVar60._0_8_ = 0x8000000080000000;
                      auVar60._12_4_ = 0x80000000;
                      auVar199 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_1a8._0_8_ + 4)),
                                                 auVar60);
                      fVar391 = auVar199._0_4_ / fVar3;
                      fVar384 = 0.0;
                      if ((fVar391 <= fVar367) &&
                         (fVar384 = fVar367, fVar367 <= fVar391 + 1.0 / fVar3)) {
                        auVar198 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar198,
                                                   ZEXT416((uint)*(float *)(local_1a8._0_8_ + 4)));
                        fVar384 = auVar198._0_4_ * fVar367;
                      }
                    }
                  }
                  *local_2b8 = fVar384;
                  local_2b8 = local_2b8 + 1;
                  uVar173 = uVar173 + 1;
                  iVar192 = iVar192 + 1;
                } while (uVar173 != iVar182);
              }
              iVar170 = iVar170 + 1;
            } while (iVar170 != iVar166);
          }
          local_2e8 = local_2e8 + 1;
        } while (local_2e8 != local_1e0);
      }
      iVar9 = local_228.h;
      iVar8 = local_228.w;
      uVar179 = local_158._0_4_;
      if ((uVar179 == 4 && (uint)local_168 == 0) && (0 < (long)local_228.c)) {
        iVar182 = (this->super_Deconvolution).dilation_w;
        iVar166 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar171 = (this->super_Deconvolution).stride_h;
        iVar191 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar167 = (this->super_Deconvolution).kernel_w;
        uVar165 = (this->super_Deconvolution).kernel_h;
        local_2e8 = 0;
        auVar386._8_4_ = 0x42b0c0a5;
        auVar386._0_8_ = 0x42b0c0a542b0c0a5;
        auVar386._12_4_ = 0x42b0c0a5;
        auVar393._8_4_ = 0xc2b0c0a5;
        auVar393._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar393._12_4_ = 0xc2b0c0a5;
        auVar401._8_4_ = 0x3f000000;
        auVar401._0_8_ = 0x3f0000003f000000;
        auVar401._12_4_ = 0x3f000000;
        auVar407._8_4_ = 0x3fb8aa3b;
        auVar407._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar407._12_4_ = 0x3fb8aa3b;
        auVar413._8_4_ = 0x3f800000;
        auVar413._0_8_ = 0x3f8000003f800000;
        auVar413._12_4_ = 0x3f800000;
        auVar419._8_4_ = 0x3f318000;
        auVar419._0_8_ = 0x3f3180003f318000;
        auVar419._12_4_ = 0x3f318000;
        auVar198 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar471._8_4_ = 0x3ab743ce;
        auVar471._0_8_ = 0x3ab743ce3ab743ce;
        auVar471._12_4_ = 0x3ab743ce;
        auVar477._8_4_ = 0x3c088908;
        auVar477._0_8_ = 0x3c0889083c088908;
        auVar477._12_4_ = 0x3c088908;
        auVar483._8_4_ = 0x3d2aa9c1;
        auVar483._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar483._12_4_ = 0x3d2aa9c1;
        auVar489._8_4_ = 0x3e2aaaaa;
        auVar489._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar489._12_4_ = 0x3e2aaaaa;
        auVar495._8_4_ = 0x3f800000;
        auVar495._0_8_ = 0x3f8000003f800000;
        auVar495._12_4_ = 0x3f800000;
        auVar501._8_4_ = 0xb95e8083;
        auVar501._0_8_ = 0xb95e8083b95e8083;
        auVar501._12_4_ = 0xb95e8083;
        auVar199 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar200 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar221 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar222 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar223 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar224 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar225 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar226 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar227 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar232 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar228 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar229 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar180 = bottom_blob->w;
            iVar190 = bottom_blob->h;
            pauVar187 = (undefined1 (*) [16])
                        (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
            uVar173 = bottom_blob->c;
            iVar170 = 0;
            do {
              if (0 < local_228.w) {
                uVar181 = 0;
                iVar192 = (1 - uVar167) * iVar182;
                do {
                  if (pvVar16 == (void *)0x0) {
                    auVar230 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar230 = *(undefined1 (*) [16])((long)pvVar16 + local_2e8 * 0x10);
                  }
                  auVar352 = ZEXT1664(auVar230);
                  if (0 < (int)uVar173) {
                    pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar11 = bottom_blob->data;
                    uVar168 = 0;
                    do {
                      if (0 < (int)uVar165) {
                        uVar169 = 0;
                        uVar174 = 0;
                        do {
                          iVar157 = (((int)uVar174 - uVar165) + 1) * iVar166 + iVar170;
                          if ((((-1 < iVar157) &&
                               (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                              (0 < (int)uVar167)) && (iVar158 < iVar190)) {
                            lVar186 = (long)iVar158 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar168;
                            uVar178 = (ulong)uVar167;
                            uVar183 = uVar169;
                            iVar157 = iVar192;
                            do {
                              if (((-1 < iVar157) &&
                                  (iVar158 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                                 (iVar158 < iVar180)) {
                                lVar161 = (long)(iVar158 << 2);
                                uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186);
                                auVar430._4_4_ = uVar2;
                                auVar430._0_4_ = uVar2;
                                auVar430._8_4_ = uVar2;
                                auVar430._12_4_ = uVar2;
                                in_ZMM8 = ZEXT1664(auVar430);
                                uVar2 = *(undefined4 *)((long)pvVar11 + lVar161 * 4 + lVar186 + 4);
                                auVar453._4_4_ = uVar2;
                                auVar453._0_4_ = uVar2;
                                auVar453._8_4_ = uVar2;
                                auVar453._12_4_ = uVar2;
                                auVar231 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 8)));
                                in_ZMM16 = ZEXT1664(auVar231);
                                auVar201 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar11 +
                                                                       lVar161 * 4 + lVar186 + 0xc))
                                                     );
                                uVar196 = uVar183 & 0xffffffff;
                                auVar230 = vfmadd231ps_fma(auVar352._0_16_,auVar430,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar176 + uVar196 * 4));
                                auVar230 = vfmadd231ps_fma(auVar230,auVar453,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar176 + uVar196 * 4 + 0x10));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar231,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x20));
                                auVar230 = vfmadd231ps_avx512vl
                                                     (auVar230,auVar201,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar176 + uVar196 * 4 + 0x30));
                                auVar352 = ZEXT1664(auVar230);
                              }
                              uVar183 = uVar183 + 0x10;
                              iVar157 = iVar157 + iVar182;
                              uVar178 = uVar178 - 1;
                            } while (uVar178 != 0);
                          }
                          uVar174 = uVar174 + 1;
                          uVar169 = uVar169 + (ulong)uVar167 * 0x10;
                        } while (uVar174 != uVar165);
                      }
                      auVar230 = auVar352._0_16_;
                      pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar167 * uVar165 * 0x10) * 4
                                         );
                      uVar168 = uVar168 + 1;
                    } while (uVar168 != uVar173);
                  }
                  switch(iVar191) {
                  case 1:
                    auVar230 = vmaxps_avx(auVar230,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar231 = vmaxps_avx(auVar230,(undefined1  [16])0x0);
                    in_ZMM8 = ZEXT1664(auVar231);
                    auVar230 = vminps_avx(auVar230,(undefined1  [16])0x0);
                    uVar2 = *(this->super_Deconvolution).activation_params.data;
                    auVar70._4_4_ = uVar2;
                    auVar70._0_4_ = uVar2;
                    auVar70._8_4_ = uVar2;
                    auVar70._12_4_ = uVar2;
                    auVar230 = vfmadd132ps_avx512vl(auVar230,auVar231,auVar70);
                    break;
                  case 3:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar68._4_4_ = uVar2;
                    auVar68._0_4_ = uVar2;
                    auVar68._8_4_ = uVar2;
                    auVar68._12_4_ = uVar2;
                    auVar230 = vmaxps_avx512vl(auVar230,auVar68);
                    uVar2 = puVar12[1];
                    auVar69._4_4_ = uVar2;
                    auVar69._0_4_ = uVar2;
                    auVar69._8_4_ = uVar2;
                    auVar69._12_4_ = uVar2;
                    auVar230 = vminps_avx512vl(auVar230,auVar69);
                    break;
                  case 4:
                    auVar66._8_4_ = 0x80000000;
                    auVar66._0_8_ = 0x8000000080000000;
                    auVar66._12_4_ = 0x80000000;
                    auVar230 = vxorps_avx512vl(auVar230,auVar66);
                    auVar230 = vminps_avx(auVar230,auVar386);
                    auVar230 = vmaxps_avx(auVar230,auVar393);
                    auVar231 = vfmadd231ps_fma(auVar401,auVar230,auVar407);
                    auVar201 = vcvttps2dq_avx512vl(auVar231);
                    auVar201 = vcvtdq2ps_avx512vl(auVar201);
                    uVar168 = vcmpps_avx512vl(auVar231,auVar201,1);
                    auVar231 = vsubps_avx512vl(auVar201,auVar413);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar244._0_4_ =
                         (uint)bVar194 * auVar231._0_4_ | (uint)!bVar194 * auVar201._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar244._4_4_ =
                         (uint)bVar194 * auVar231._4_4_ | (uint)!bVar194 * auVar201._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar244._8_4_ =
                         (uint)bVar194 * auVar231._8_4_ | (uint)!bVar194 * auVar201._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar244._12_4_ =
                         (uint)bVar194 * auVar231._12_4_ | (uint)!bVar194 * auVar201._12_4_;
                    in_ZMM16 = ZEXT1664(auVar244);
                    auVar230 = vfmsub231ps_avx512vl(auVar230,auVar244,auVar419);
                    auVar67._8_4_ = 0x395e8083;
                    auVar67._0_8_ = 0x395e8083395e8083;
                    auVar67._12_4_ = 0x395e8083;
                    auVar231 = vfmsub231ps_avx512vl(auVar230,auVar244,auVar67);
                    auVar431._0_4_ = auVar231._0_4_ * auVar231._0_4_;
                    auVar431._4_4_ = auVar231._4_4_ * auVar231._4_4_;
                    auVar431._8_4_ = auVar231._8_4_ * auVar231._8_4_;
                    auVar431._12_4_ = auVar231._12_4_ * auVar231._12_4_;
                    auVar230 = vfmadd213ps_fma(auVar198,auVar231,auVar471);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar231,auVar477);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar231,auVar483);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar231,auVar489);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar231,auVar401);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar431,auVar231);
                    auVar374._0_4_ = auVar230._0_4_ + 1.0;
                    auVar374._4_4_ = auVar230._4_4_ + 1.0;
                    auVar374._8_4_ = auVar230._8_4_ + 1.0;
                    auVar374._12_4_ = auVar230._12_4_ + 1.0;
                    auVar230 = vcvttps2dq_avx512vl(auVar244);
                    auVar230 = vpslld_avx(auVar230,0x17);
                    auVar230 = vpaddd_avx(auVar230,auVar495);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar374,auVar413);
                    in_ZMM8 = ZEXT1664(auVar230);
                    auVar230 = vdivps_avx(auVar413,auVar230);
                    break;
                  case 5:
                    auVar231 = vminps_avx(auVar230,auVar386);
                    auVar231 = vmaxps_avx(auVar231,auVar393);
                    auVar201 = vfmadd213ps_fma(auVar407,auVar231,auVar401);
                    auVar202 = vcvttps2dq_avx512vl(auVar201);
                    auVar202 = vcvtdq2ps_avx512vl(auVar202);
                    uVar168 = vcmpps_avx512vl(auVar201,auVar202,1);
                    auVar201 = vsubps_avx512vl(auVar202,auVar413);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar239._0_4_ =
                         (uint)bVar194 * auVar201._0_4_ | (uint)!bVar194 * auVar202._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar239._4_4_ =
                         (uint)bVar194 * auVar201._4_4_ | (uint)!bVar194 * auVar202._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar239._8_4_ =
                         (uint)bVar194 * auVar201._8_4_ | (uint)!bVar194 * auVar202._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar239._12_4_ =
                         (uint)bVar194 * auVar201._12_4_ | (uint)!bVar194 * auVar202._12_4_;
                    auVar231 = vfmsub231ps_avx512vl(auVar231,auVar239,auVar419);
                    auVar231 = vfnmsub231ps_avx512vl(auVar231,auVar239,auVar501);
                    auVar454._0_4_ = auVar231._0_4_ * auVar231._0_4_;
                    auVar454._4_4_ = auVar231._4_4_ * auVar231._4_4_;
                    auVar454._8_4_ = auVar231._8_4_ * auVar231._8_4_;
                    auVar454._12_4_ = auVar231._12_4_ * auVar231._12_4_;
                    auVar201 = vfmadd213ps_avx512vl(auVar198,auVar231,auVar471);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar477);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar483);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar489);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar401);
                    auVar231 = vfmadd213ps_avx512vl(auVar201,auVar454,auVar231);
                    auVar201 = vaddps_avx512vl(auVar231,auVar413);
                    auVar231 = vcvttps2dq_avx512vl(auVar239);
                    auVar231 = vpslld_avx(auVar231,0x17);
                    auVar231 = vpaddd_avx(auVar231,auVar495);
                    auVar231 = vfmadd213ps_fma(auVar231,auVar201,auVar413);
                    uVar168 = vcmpps_avx512vl(auVar231,(undefined1  [16])0x0,2);
                    auVar63._8_4_ = 0x800000;
                    auVar63._0_8_ = 0x80000000800000;
                    auVar63._12_4_ = 0x800000;
                    auVar231 = vmaxps_avx512vl(auVar231,auVar63);
                    auVar203 = vpsrld_avx(auVar231,0x17);
                    auVar201 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar64._8_4_ = 0x3f000000;
                    auVar64._0_8_ = 0x3f0000003f000000;
                    auVar64._12_4_ = 0x3f000000;
                    auVar231 = vpternlogd_avx512vl(auVar231,auVar201,auVar64,0xea);
                    uVar169 = vcmpps_avx512vl(auVar231,auVar199,1);
                    auVar201 = vaddps_avx512vl(auVar231,auVar200);
                    auVar231 = vaddps_avx512vl(auVar201,auVar231);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar240._0_4_ =
                         (uint)bVar194 * auVar231._0_4_ | (uint)!bVar194 * auVar201._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar240._4_4_ =
                         (uint)bVar194 * auVar231._4_4_ | (uint)!bVar194 * auVar201._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar240._8_4_ =
                         (uint)bVar194 * auVar231._8_4_ | (uint)!bVar194 * auVar201._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar240._12_4_ =
                         (uint)bVar194 * auVar231._12_4_ | (uint)!bVar194 * auVar201._12_4_;
                    auVar201 = vmulps_avx512vl(auVar240,auVar240);
                    auVar231 = vfmadd213ps_avx512vl(auVar221,auVar240,auVar222);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar240,auVar223);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar240,auVar224);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar240,auVar225);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar240,auVar226);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar240,auVar227);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar240,auVar232);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar240,auVar228);
                    auVar202 = vmulps_avx512vl(auVar201,auVar240);
                    auVar202 = vmulps_avx512vl(auVar202,auVar231);
                    auVar65._8_4_ = 0xffffff82;
                    auVar65._0_8_ = 0xffffff82ffffff82;
                    auVar65._12_4_ = 0xffffff82;
                    auVar231 = vpaddd_avx512vl(auVar203,auVar65);
                    auVar231 = vcvtdq2ps_avx(auVar231);
                    auVar203 = vsubps_avx512vl(auVar231,auVar413);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar241._0_4_ =
                         (uint)bVar194 * auVar203._0_4_ | (uint)!bVar194 * auVar231._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar241._4_4_ =
                         (uint)bVar194 * auVar203._4_4_ | (uint)!bVar194 * auVar231._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar241._8_4_ =
                         (uint)bVar194 * auVar203._8_4_ | (uint)!bVar194 * auVar231._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar241._12_4_ =
                         (uint)bVar194 * auVar203._12_4_ | (uint)!bVar194 * auVar231._12_4_;
                    auVar231 = vfmadd231ps_avx512vl(auVar202,auVar241,auVar501);
                    auVar231 = vfmsub231ps_avx512vl(auVar231,auVar401,auVar201);
                    auVar231 = vsubps_avx512vl(auVar231,auVar240);
                    auVar231 = vfnmadd231ps_fma(auVar231,auVar419,auVar241);
                    auVar201 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar242._0_4_ =
                         (uint)bVar194 * auVar201._0_4_ |
                         (uint)!bVar194 * (int)(auVar231._0_4_ + auVar231._0_4_);
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar242._4_4_ =
                         (uint)bVar194 * auVar201._4_4_ |
                         (uint)!bVar194 * (int)(auVar231._4_4_ + auVar231._4_4_);
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar242._8_4_ =
                         (uint)bVar194 * auVar201._8_4_ |
                         (uint)!bVar194 * (int)(auVar231._8_4_ + auVar231._8_4_);
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar242._12_4_ =
                         (uint)bVar194 * auVar201._12_4_ |
                         (uint)!bVar194 * (int)(auVar231._12_4_ + auVar231._12_4_);
                    auVar231 = vminps_avx(auVar242,auVar386);
                    auVar231 = vmaxps_avx(auVar231,auVar393);
                    auVar201 = vfmadd213ps_fma(auVar407,auVar231,auVar401);
                    auVar202 = vcvttps2dq_avx512vl(auVar201);
                    auVar202 = vcvtdq2ps_avx512vl(auVar202);
                    uVar168 = vcmpps_avx512vl(auVar201,auVar202,1);
                    auVar201 = vsubps_avx512vl(auVar202,auVar413);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar243._0_4_ =
                         (uint)bVar194 * auVar201._0_4_ | (uint)!bVar194 * auVar202._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar243._4_4_ =
                         (uint)bVar194 * auVar201._4_4_ | (uint)!bVar194 * auVar202._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar243._8_4_ =
                         (uint)bVar194 * auVar201._8_4_ | (uint)!bVar194 * auVar202._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar243._12_4_ =
                         (uint)bVar194 * auVar201._12_4_ | (uint)!bVar194 * auVar202._12_4_;
                    in_ZMM16 = ZEXT1664(auVar243);
                    auVar231 = vfmsub231ps_avx512vl(auVar231,auVar243,auVar419);
                    auVar231 = vfnmsub231ps_avx512vl(auVar231,auVar243,auVar501);
                    auVar455._0_4_ = auVar231._0_4_ * auVar231._0_4_;
                    auVar455._4_4_ = auVar231._4_4_ * auVar231._4_4_;
                    auVar455._8_4_ = auVar231._8_4_ * auVar231._8_4_;
                    auVar455._12_4_ = auVar231._12_4_ * auVar231._12_4_;
                    auVar201 = vfmadd213ps_avx512vl(auVar198,auVar231,auVar471);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar477);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar483);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar489);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar401);
                    auVar231 = vfmadd213ps_avx512vl(auVar201,auVar455,auVar231);
                    auVar201 = vaddps_avx512vl(auVar231,auVar413);
                    auVar231 = vcvttps2dq_avx512vl(auVar243);
                    auVar231 = vpslld_avx(auVar231,0x17);
                    auVar231 = vpaddd_avx(auVar231,auVar495);
                    auVar231 = vfmadd213ps_fma(auVar231,auVar201,auVar413);
                    auVar231 = vdivps_avx512vl(auVar229,auVar231);
                    in_ZMM8 = ZEXT1664(auVar231);
                    auVar230 = vfmsub231ps_fma(auVar230,auVar230,auVar231);
                    break;
                  case 6:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar432._4_4_ = uVar2;
                    auVar432._0_4_ = uVar2;
                    auVar432._8_4_ = uVar2;
                    auVar432._12_4_ = uVar2;
                    uVar2 = puVar12[1];
                    auVar62._4_4_ = uVar2;
                    auVar62._0_4_ = uVar2;
                    auVar62._8_4_ = uVar2;
                    auVar62._12_4_ = uVar2;
                    auVar231 = vfmadd213ps_avx512vl(auVar432,auVar230,auVar62);
                    auVar231 = vmaxps_avx(auVar231,(undefined1  [16])0x0);
                    auVar231 = vminps_avx(auVar231,auVar413);
                    in_ZMM8 = ZEXT1664(auVar231);
                    auVar375._0_4_ = auVar231._0_4_ * auVar230._0_4_;
                    auVar375._4_4_ = auVar231._4_4_ * auVar230._4_4_;
                    auVar375._8_4_ = auVar231._8_4_ * auVar230._8_4_;
                    auVar375._12_4_ = auVar231._12_4_ * auVar230._12_4_;
                    auVar230 = auVar375;
                  }
                  *pauVar187 = auVar230;
                  pauVar187 = pauVar187 + 1;
                  uVar181 = uVar181 + 1;
                  iVar192 = iVar192 + 1;
                } while (uVar181 != local_228.w);
              }
              iVar170 = iVar170 + 1;
            } while (iVar170 != local_228.h);
          }
          local_2e8 = local_2e8 + 1;
        } while (local_2e8 != (long)local_228.c);
      }
      uVar167 = (uint)local_168 | uVar179 ^ 1;
      local_168 = (void *)CONCAT44(local_168._4_4_,uVar167);
      if ((uVar167 == 0) && (0 < (long)local_228.c)) {
        iVar182 = (this->super_Deconvolution).dilation_w;
        iVar166 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar171 = (this->super_Deconvolution).stride_h;
        iVar191 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar167 = (this->super_Deconvolution).kernel_w;
        uVar165 = (this->super_Deconvolution).kernel_h;
        local_2e8 = 0;
        auVar387._8_4_ = 0x42b0c0a5;
        auVar387._0_8_ = 0x42b0c0a542b0c0a5;
        auVar387._12_4_ = 0x42b0c0a5;
        auVar394._8_4_ = 0xc2b0c0a5;
        auVar394._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar394._12_4_ = 0xc2b0c0a5;
        auVar402._8_4_ = 0x3f000000;
        auVar402._0_8_ = 0x3f0000003f000000;
        auVar402._12_4_ = 0x3f000000;
        auVar408._8_4_ = 0x3fb8aa3b;
        auVar408._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar408._12_4_ = 0x3fb8aa3b;
        auVar414._8_4_ = 0x3f800000;
        auVar414._0_8_ = 0x3f8000003f800000;
        auVar414._12_4_ = 0x3f800000;
        auVar420._8_4_ = 0x3f318000;
        auVar420._0_8_ = 0x3f3180003f318000;
        auVar420._12_4_ = 0x3f318000;
        auVar198 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar472._8_4_ = 0x3ab743ce;
        auVar472._0_8_ = 0x3ab743ce3ab743ce;
        auVar472._12_4_ = 0x3ab743ce;
        auVar478._8_4_ = 0x3c088908;
        auVar478._0_8_ = 0x3c0889083c088908;
        auVar478._12_4_ = 0x3c088908;
        auVar484._8_4_ = 0x3d2aa9c1;
        auVar484._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar484._12_4_ = 0x3d2aa9c1;
        auVar490._8_4_ = 0x3e2aaaaa;
        auVar490._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar490._12_4_ = 0x3e2aaaaa;
        auVar496._8_4_ = 0x3f800000;
        auVar496._0_8_ = 0x3f8000003f800000;
        auVar496._12_4_ = 0x3f800000;
        auVar502._8_4_ = 0xb95e8083;
        auVar502._0_8_ = 0xb95e8083b95e8083;
        auVar502._12_4_ = 0xb95e8083;
        auVar199 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar200 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar221 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar222 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar223 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar224 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar225 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar226 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar227 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar232 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar228 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar229 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar180 = bottom_blob->w;
            iVar190 = bottom_blob->h;
            pauVar187 = (undefined1 (*) [16])
                        (local_228.cstep * local_2e8 * local_228.elemsize + (long)local_228.data);
            uVar173 = bottom_blob->c;
            iVar170 = 0;
            do {
              if (0 < local_228.w) {
                uVar181 = 0;
                iVar192 = (1 - uVar167) * iVar182;
                do {
                  if (pvVar16 == (void *)0x0) {
                    auVar230 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar230 = *(undefined1 (*) [16])((long)pvVar16 + local_2e8 * 0x10);
                  }
                  auVar352 = ZEXT1664(auVar230);
                  if (0 < (int)uVar173) {
                    pvVar176 = (void *)((this->weight_data_tm).cstep * local_2e8 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    uVar168 = 0;
                    do {
                      if (0 < (int)uVar165) {
                        uVar174 = 0;
                        uVar169 = 0;
                        do {
                          iVar157 = (((int)uVar169 - uVar165) + 1) * iVar166 + iVar170;
                          if ((((-1 < iVar157) &&
                               (iVar158 = iVar157 / iVar171, iVar157 % iVar171 == 0)) &&
                              (iVar158 < iVar190)) && (0 < (int)uVar167)) {
                            uVar178 = uVar174;
                            uVar183 = (ulong)uVar167;
                            iVar157 = iVar192;
                            do {
                              if (((-1 < iVar157) &&
                                  (iVar159 = iVar157 / iVar156, iVar157 % iVar156 == 0)) &&
                                 (iVar159 < iVar180)) {
                                uVar2 = *(undefined4 *)
                                         ((long)bottom_blob->data +
                                         (long)iVar159 * 4 +
                                         (long)iVar158 *
                                         (long)bottom_blob->w * bottom_blob->elemsize +
                                         bottom_blob->cstep * bottom_blob->elemsize * uVar168);
                                auVar433._4_4_ = uVar2;
                                auVar433._0_4_ = uVar2;
                                auVar433._8_4_ = uVar2;
                                auVar433._12_4_ = uVar2;
                                in_ZMM8 = ZEXT1664(auVar433);
                                auVar230 = vfmadd231ps_fma(auVar352._0_16_,auVar433,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar176 +
                                                            (uVar178 & 0xffffffff) * 4));
                                auVar352 = ZEXT1664(auVar230);
                              }
                              uVar178 = uVar178 + 4;
                              iVar157 = iVar157 + iVar182;
                              uVar183 = uVar183 - 1;
                            } while (uVar183 != 0);
                          }
                          uVar169 = uVar169 + 1;
                          uVar174 = uVar174 + (ulong)uVar167 * 4;
                        } while (uVar169 != uVar165);
                      }
                      auVar230 = auVar352._0_16_;
                      pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar167 * uVar165 * 4) * 4);
                      uVar168 = uVar168 + 1;
                    } while (uVar168 != uVar173);
                  }
                  switch(iVar191) {
                  case 1:
                    auVar230 = vmaxps_avx(auVar230,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar231 = vmaxps_avx(auVar230,(undefined1  [16])0x0);
                    in_ZMM8 = ZEXT1664(auVar231);
                    auVar230 = vminps_avx(auVar230,(undefined1  [16])0x0);
                    uVar2 = *(this->super_Deconvolution).activation_params.data;
                    auVar79._4_4_ = uVar2;
                    auVar79._0_4_ = uVar2;
                    auVar79._8_4_ = uVar2;
                    auVar79._12_4_ = uVar2;
                    auVar230 = vfmadd132ps_avx512vl(auVar230,auVar231,auVar79);
                    break;
                  case 3:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar77._4_4_ = uVar2;
                    auVar77._0_4_ = uVar2;
                    auVar77._8_4_ = uVar2;
                    auVar77._12_4_ = uVar2;
                    auVar230 = vmaxps_avx512vl(auVar230,auVar77);
                    uVar2 = puVar12[1];
                    auVar78._4_4_ = uVar2;
                    auVar78._0_4_ = uVar2;
                    auVar78._8_4_ = uVar2;
                    auVar78._12_4_ = uVar2;
                    auVar230 = vminps_avx512vl(auVar230,auVar78);
                    break;
                  case 4:
                    auVar75._8_4_ = 0x80000000;
                    auVar75._0_8_ = 0x8000000080000000;
                    auVar75._12_4_ = 0x80000000;
                    auVar230 = vxorps_avx512vl(auVar230,auVar75);
                    auVar230 = vminps_avx(auVar230,auVar387);
                    auVar230 = vmaxps_avx(auVar230,auVar394);
                    auVar231 = vfmadd231ps_fma(auVar402,auVar230,auVar408);
                    auVar201 = vcvttps2dq_avx512vl(auVar231);
                    auVar201 = vcvtdq2ps_avx512vl(auVar201);
                    uVar168 = vcmpps_avx512vl(auVar231,auVar201,1);
                    auVar231 = vsubps_avx512vl(auVar201,auVar414);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar250._0_4_ =
                         (uint)bVar194 * auVar231._0_4_ | (uint)!bVar194 * auVar201._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar250._4_4_ =
                         (uint)bVar194 * auVar231._4_4_ | (uint)!bVar194 * auVar201._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar250._8_4_ =
                         (uint)bVar194 * auVar231._8_4_ | (uint)!bVar194 * auVar201._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar250._12_4_ =
                         (uint)bVar194 * auVar231._12_4_ | (uint)!bVar194 * auVar201._12_4_;
                    in_ZMM16 = ZEXT1664(auVar250);
                    auVar230 = vfmsub231ps_avx512vl(auVar230,auVar250,auVar420);
                    auVar76._8_4_ = 0x395e8083;
                    auVar76._0_8_ = 0x395e8083395e8083;
                    auVar76._12_4_ = 0x395e8083;
                    auVar231 = vfmsub231ps_avx512vl(auVar230,auVar250,auVar76);
                    auVar434._0_4_ = auVar231._0_4_ * auVar231._0_4_;
                    auVar434._4_4_ = auVar231._4_4_ * auVar231._4_4_;
                    auVar434._8_4_ = auVar231._8_4_ * auVar231._8_4_;
                    auVar434._12_4_ = auVar231._12_4_ * auVar231._12_4_;
                    auVar230 = vfmadd213ps_fma(auVar198,auVar231,auVar472);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar231,auVar478);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar231,auVar484);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar231,auVar490);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar231,auVar402);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar434,auVar231);
                    auVar376._0_4_ = auVar230._0_4_ + 1.0;
                    auVar376._4_4_ = auVar230._4_4_ + 1.0;
                    auVar376._8_4_ = auVar230._8_4_ + 1.0;
                    auVar376._12_4_ = auVar230._12_4_ + 1.0;
                    auVar230 = vcvttps2dq_avx512vl(auVar250);
                    auVar230 = vpslld_avx(auVar230,0x17);
                    auVar230 = vpaddd_avx(auVar230,auVar496);
                    auVar230 = vfmadd213ps_fma(auVar230,auVar376,auVar414);
                    in_ZMM8 = ZEXT1664(auVar230);
                    auVar230 = vdivps_avx(auVar414,auVar230);
                    break;
                  case 5:
                    auVar231 = vminps_avx(auVar230,auVar387);
                    auVar231 = vmaxps_avx(auVar231,auVar394);
                    auVar201 = vfmadd213ps_fma(auVar408,auVar231,auVar402);
                    auVar202 = vcvttps2dq_avx512vl(auVar201);
                    auVar202 = vcvtdq2ps_avx512vl(auVar202);
                    uVar168 = vcmpps_avx512vl(auVar201,auVar202,1);
                    auVar201 = vsubps_avx512vl(auVar202,auVar414);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar245._0_4_ =
                         (uint)bVar194 * auVar201._0_4_ | (uint)!bVar194 * auVar202._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar245._4_4_ =
                         (uint)bVar194 * auVar201._4_4_ | (uint)!bVar194 * auVar202._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar245._8_4_ =
                         (uint)bVar194 * auVar201._8_4_ | (uint)!bVar194 * auVar202._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar245._12_4_ =
                         (uint)bVar194 * auVar201._12_4_ | (uint)!bVar194 * auVar202._12_4_;
                    auVar231 = vfmsub231ps_avx512vl(auVar231,auVar245,auVar420);
                    auVar231 = vfnmsub231ps_avx512vl(auVar231,auVar245,auVar502);
                    auVar456._0_4_ = auVar231._0_4_ * auVar231._0_4_;
                    auVar456._4_4_ = auVar231._4_4_ * auVar231._4_4_;
                    auVar456._8_4_ = auVar231._8_4_ * auVar231._8_4_;
                    auVar456._12_4_ = auVar231._12_4_ * auVar231._12_4_;
                    auVar201 = vfmadd213ps_avx512vl(auVar198,auVar231,auVar472);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar478);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar484);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar490);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar402);
                    auVar231 = vfmadd213ps_avx512vl(auVar201,auVar456,auVar231);
                    auVar201 = vaddps_avx512vl(auVar231,auVar414);
                    auVar231 = vcvttps2dq_avx512vl(auVar245);
                    auVar231 = vpslld_avx(auVar231,0x17);
                    auVar231 = vpaddd_avx(auVar231,auVar496);
                    auVar231 = vfmadd213ps_fma(auVar231,auVar201,auVar414);
                    uVar168 = vcmpps_avx512vl(auVar231,(undefined1  [16])0x0,2);
                    auVar72._8_4_ = 0x800000;
                    auVar72._0_8_ = 0x80000000800000;
                    auVar72._12_4_ = 0x800000;
                    auVar231 = vmaxps_avx512vl(auVar231,auVar72);
                    auVar203 = vpsrld_avx(auVar231,0x17);
                    auVar201 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar73._8_4_ = 0x3f000000;
                    auVar73._0_8_ = 0x3f0000003f000000;
                    auVar73._12_4_ = 0x3f000000;
                    auVar231 = vpternlogd_avx512vl(auVar231,auVar201,auVar73,0xea);
                    uVar169 = vcmpps_avx512vl(auVar231,auVar199,1);
                    auVar201 = vaddps_avx512vl(auVar231,auVar200);
                    auVar231 = vaddps_avx512vl(auVar201,auVar231);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar246._0_4_ =
                         (uint)bVar194 * auVar231._0_4_ | (uint)!bVar194 * auVar201._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar246._4_4_ =
                         (uint)bVar194 * auVar231._4_4_ | (uint)!bVar194 * auVar201._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar246._8_4_ =
                         (uint)bVar194 * auVar231._8_4_ | (uint)!bVar194 * auVar201._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar246._12_4_ =
                         (uint)bVar194 * auVar231._12_4_ | (uint)!bVar194 * auVar201._12_4_;
                    auVar201 = vmulps_avx512vl(auVar246,auVar246);
                    auVar231 = vfmadd213ps_avx512vl(auVar221,auVar246,auVar222);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar246,auVar223);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar246,auVar224);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar246,auVar225);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar246,auVar226);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar246,auVar227);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar246,auVar232);
                    auVar231 = vfmadd213ps_avx512vl(auVar231,auVar246,auVar228);
                    auVar202 = vmulps_avx512vl(auVar201,auVar246);
                    auVar202 = vmulps_avx512vl(auVar202,auVar231);
                    auVar74._8_4_ = 0xffffff82;
                    auVar74._0_8_ = 0xffffff82ffffff82;
                    auVar74._12_4_ = 0xffffff82;
                    auVar231 = vpaddd_avx512vl(auVar203,auVar74);
                    auVar231 = vcvtdq2ps_avx(auVar231);
                    auVar203 = vsubps_avx512vl(auVar231,auVar414);
                    bVar194 = (bool)((byte)uVar169 & 1);
                    auVar247._0_4_ =
                         (uint)bVar194 * auVar203._0_4_ | (uint)!bVar194 * auVar231._0_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 1) & 1);
                    auVar247._4_4_ =
                         (uint)bVar194 * auVar203._4_4_ | (uint)!bVar194 * auVar231._4_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 2) & 1);
                    auVar247._8_4_ =
                         (uint)bVar194 * auVar203._8_4_ | (uint)!bVar194 * auVar231._8_4_;
                    bVar194 = (bool)((byte)(uVar169 >> 3) & 1);
                    auVar247._12_4_ =
                         (uint)bVar194 * auVar203._12_4_ | (uint)!bVar194 * auVar231._12_4_;
                    auVar231 = vfmadd231ps_avx512vl(auVar202,auVar247,auVar502);
                    auVar231 = vfmsub231ps_avx512vl(auVar231,auVar402,auVar201);
                    auVar231 = vsubps_avx512vl(auVar231,auVar246);
                    auVar231 = vfnmadd231ps_fma(auVar231,auVar420,auVar247);
                    auVar201 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar248._0_4_ =
                         (uint)bVar194 * auVar201._0_4_ |
                         (uint)!bVar194 * (int)(auVar231._0_4_ + auVar231._0_4_);
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar248._4_4_ =
                         (uint)bVar194 * auVar201._4_4_ |
                         (uint)!bVar194 * (int)(auVar231._4_4_ + auVar231._4_4_);
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar248._8_4_ =
                         (uint)bVar194 * auVar201._8_4_ |
                         (uint)!bVar194 * (int)(auVar231._8_4_ + auVar231._8_4_);
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar248._12_4_ =
                         (uint)bVar194 * auVar201._12_4_ |
                         (uint)!bVar194 * (int)(auVar231._12_4_ + auVar231._12_4_);
                    auVar231 = vminps_avx(auVar248,auVar387);
                    auVar231 = vmaxps_avx(auVar231,auVar394);
                    auVar201 = vfmadd213ps_fma(auVar408,auVar231,auVar402);
                    auVar202 = vcvttps2dq_avx512vl(auVar201);
                    auVar202 = vcvtdq2ps_avx512vl(auVar202);
                    uVar168 = vcmpps_avx512vl(auVar201,auVar202,1);
                    auVar201 = vsubps_avx512vl(auVar202,auVar414);
                    bVar194 = (bool)((byte)uVar168 & 1);
                    auVar249._0_4_ =
                         (uint)bVar194 * auVar201._0_4_ | (uint)!bVar194 * auVar202._0_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 1) & 1);
                    auVar249._4_4_ =
                         (uint)bVar194 * auVar201._4_4_ | (uint)!bVar194 * auVar202._4_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 2) & 1);
                    auVar249._8_4_ =
                         (uint)bVar194 * auVar201._8_4_ | (uint)!bVar194 * auVar202._8_4_;
                    bVar194 = (bool)((byte)(uVar168 >> 3) & 1);
                    auVar249._12_4_ =
                         (uint)bVar194 * auVar201._12_4_ | (uint)!bVar194 * auVar202._12_4_;
                    in_ZMM16 = ZEXT1664(auVar249);
                    auVar231 = vfmsub231ps_avx512vl(auVar231,auVar249,auVar420);
                    auVar231 = vfnmsub231ps_avx512vl(auVar231,auVar249,auVar502);
                    auVar457._0_4_ = auVar231._0_4_ * auVar231._0_4_;
                    auVar457._4_4_ = auVar231._4_4_ * auVar231._4_4_;
                    auVar457._8_4_ = auVar231._8_4_ * auVar231._8_4_;
                    auVar457._12_4_ = auVar231._12_4_ * auVar231._12_4_;
                    auVar201 = vfmadd213ps_avx512vl(auVar198,auVar231,auVar472);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar478);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar484);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar490);
                    auVar201 = vfmadd213ps_avx512vl(auVar201,auVar231,auVar402);
                    auVar231 = vfmadd213ps_avx512vl(auVar201,auVar457,auVar231);
                    auVar201 = vaddps_avx512vl(auVar231,auVar414);
                    auVar231 = vcvttps2dq_avx512vl(auVar249);
                    auVar231 = vpslld_avx(auVar231,0x17);
                    auVar231 = vpaddd_avx(auVar231,auVar496);
                    auVar231 = vfmadd213ps_fma(auVar231,auVar201,auVar414);
                    auVar231 = vdivps_avx512vl(auVar229,auVar231);
                    in_ZMM8 = ZEXT1664(auVar231);
                    auVar230 = vfmsub231ps_fma(auVar230,auVar230,auVar231);
                    break;
                  case 6:
                    puVar12 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar2 = *puVar12;
                    auVar435._4_4_ = uVar2;
                    auVar435._0_4_ = uVar2;
                    auVar435._8_4_ = uVar2;
                    auVar435._12_4_ = uVar2;
                    uVar2 = puVar12[1];
                    auVar71._4_4_ = uVar2;
                    auVar71._0_4_ = uVar2;
                    auVar71._8_4_ = uVar2;
                    auVar71._12_4_ = uVar2;
                    auVar231 = vfmadd213ps_avx512vl(auVar435,auVar230,auVar71);
                    auVar231 = vmaxps_avx(auVar231,(undefined1  [16])0x0);
                    auVar231 = vminps_avx(auVar231,auVar414);
                    in_ZMM8 = ZEXT1664(auVar231);
                    auVar377._0_4_ = auVar231._0_4_ * auVar230._0_4_;
                    auVar377._4_4_ = auVar231._4_4_ * auVar230._4_4_;
                    auVar377._8_4_ = auVar231._8_4_ * auVar230._8_4_;
                    auVar377._12_4_ = auVar231._12_4_ * auVar230._12_4_;
                    auVar230 = auVar377;
                  }
                  *pauVar187 = auVar230;
                  pauVar187 = pauVar187 + 1;
                  uVar181 = uVar181 + 1;
                  iVar192 = iVar192 + 1;
                } while (uVar181 != local_228.w);
              }
              iVar170 = iVar170 + 1;
            } while (iVar170 != local_228.h);
          }
          local_2e8 = local_2e8 + 1;
        } while (local_2e8 != (long)local_228.c);
      }
      if ((uVar179 == 4 && uVar177 == 0) && (local_1e0 = (ulong)local_228.c, 0 < (long)local_1e0)) {
        iVar182 = (this->super_Deconvolution).dilation_w;
        iVar166 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar171 = (this->super_Deconvolution).stride_h;
        iVar191 = (this->super_Deconvolution).activation_type;
        pvVar16 = (this->super_Deconvolution).bias_data.data;
        uVar179 = (this->super_Deconvolution).kernel_w;
        uVar167 = (this->super_Deconvolution).kernel_h;
        local_1c8 = local_228.data;
        local_1c0 = local_228.elemsize * local_228.cstep;
        iVar180 = bottom_blob->w;
        iVar190 = bottom_blob->h;
        uVar165 = bottom_blob->c;
        local_2e8 = 0;
        do {
          if (0 < iVar9) {
            sVar17 = (this->weight_data_tm).cstep;
            sVar13 = (this->weight_data_tm).elemsize;
            local_2b8 = (float *)(local_1c0 * local_2e8 + (long)local_1c8);
            pvVar176 = (this->weight_data_tm).data;
            iVar170 = 0;
            do {
              if (0 < iVar8) {
                iVar157 = bottom_blob->w;
                pvVar11 = bottom_blob->data;
                sVar14 = bottom_blob->elemsize;
                sVar15 = bottom_blob->cstep;
                local_1a8._0_8_ = (this->super_Deconvolution).activation_params.data;
                uVar173 = 0;
                iVar192 = (1 - uVar179) * iVar182;
                do {
                  if (pvVar16 == (void *)0x0) {
                    fVar367 = 0.0;
                  }
                  else {
                    fVar367 = *(float *)((long)pvVar16 + local_2e8 * 4);
                  }
                  if ((int)uVar165 < 1) {
                    auVar198 = SUB6416(ZEXT864(0),0);
                  }
                  else {
                    auVar352 = ZEXT864(0);
                    uVar168 = 0;
                    pvVar185 = (void *)(sVar17 * local_2e8 * sVar13 + (long)pvVar176);
                    do {
                      if (0 < (int)uVar167) {
                        uVar169 = 0;
                        uVar174 = 0;
                        do {
                          iVar158 = (((int)uVar174 - uVar167) + 1) * iVar166 + iVar170;
                          if ((((-1 < iVar158) &&
                               (iVar159 = iVar158 / iVar171, iVar158 % iVar171 == 0)) &&
                              (0 < (int)uVar179)) && (iVar159 < iVar190)) {
                            uVar178 = (ulong)uVar179;
                            uVar183 = uVar169;
                            iVar158 = iVar192;
                            do {
                              if (((-1 < iVar158) &&
                                  (iVar160 = iVar158 / iVar156, iVar158 % iVar156 == 0)) &&
                                 (iVar160 < iVar180)) {
                                auVar198 = vfmadd231ps_fma(auVar352._0_16_,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar11 +
                                                            (long)(iVar160 << 2) * 4 +
                                                            (long)iVar159 * (long)iVar157 * sVar14 +
                                                            sVar15 * sVar14 * uVar168),
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar185 +
                                                            (uVar183 & 0xffffffff) * 4));
                                auVar352 = ZEXT1664(auVar198);
                              }
                              uVar183 = uVar183 + 4;
                              iVar158 = iVar158 + iVar182;
                              uVar178 = uVar178 - 1;
                            } while (uVar178 != 0);
                          }
                          uVar174 = uVar174 + 1;
                          uVar169 = uVar169 + (ulong)uVar179 * 4;
                        } while (uVar174 != uVar167);
                      }
                      auVar198 = auVar352._0_16_;
                      pvVar185 = (void *)((long)pvVar185 + (long)(int)(uVar179 * uVar167 * 4) * 4);
                      uVar168 = uVar168 + 1;
                    } while (uVar168 != uVar165);
                  }
                  auVar199 = vshufpd_avx(auVar198,auVar198,1);
                  auVar378._0_4_ = auVar199._0_4_ + auVar198._0_4_;
                  auVar378._4_4_ = auVar199._4_4_ + auVar198._4_4_;
                  auVar378._8_4_ = auVar199._8_4_ + auVar198._8_4_;
                  auVar378._12_4_ = auVar199._12_4_ + auVar198._12_4_;
                  auVar198 = vmovshdup_avx(auVar378);
                  fVar367 = auVar198._0_4_ + fVar367 + auVar378._0_4_;
                  auVar198 = ZEXT416((uint)fVar367);
                  fVar384 = fVar367;
                  if (iVar191 - 1U < 6) {
                    switch(iVar191) {
                    case 1:
                      auVar198 = vmaxss_avx(ZEXT416((uint)fVar367),ZEXT416(0));
                      fVar384 = auVar198._0_4_;
                      break;
                    case 2:
                      uVar37 = vcmpss_avx512f(ZEXT416((uint)fVar367),ZEXT416(0),0xe);
                      bVar194 = (bool)((byte)uVar37 & 1);
                      fVar384 = (float)((uint)bVar194 * 0x3f800000 +
                                       (uint)!bVar194 * (int)*(float *)local_1a8._0_8_) * fVar367;
                      break;
                    case 3:
                      auVar198 = vmaxss_avx(auVar198,ZEXT416((uint)*(float *)local_1a8._0_8_));
                      fVar384 = auVar198._0_4_;
                      if (*(float *)(local_1a8._0_8_ + 4) < auVar198._0_4_) {
                        fVar384 = *(float *)(local_1a8._0_8_ + 4);
                      }
                      break;
                    case 4:
                      auVar198 = vminss_avx(auVar198,SUB6416(ZEXT464(0x42b0c0a5),0));
                      auVar81._8_4_ = 0x80000000;
                      auVar81._0_8_ = 0x8000000080000000;
                      auVar81._12_4_ = 0x80000000;
                      auVar199 = vxorps_avx512vl(auVar198,auVar81);
                      uVar37 = vcmpss_avx512f(auVar198,ZEXT416(0xc2b0c0a5),1);
                      bVar194 = (bool)((byte)uVar37 & 1);
                      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                      fVar367 = expf((float)((uint)bVar194 * 0x42b0c0a5 +
                                            (uint)!bVar194 * auVar199._0_4_));
                      fVar384 = 1.0 / (fVar367 + 1.0);
                      break;
                    case 5:
                      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                      fVar384 = expf(fVar367);
                      fVar384 = logf(fVar384 + 1.0);
                      fVar384 = tanhf(fVar384);
                      fVar384 = fVar384 * fVar367;
                      break;
                    case 6:
                      fVar3 = *(float *)local_1a8._0_8_;
                      auVar80._8_4_ = 0x80000000;
                      auVar80._0_8_ = 0x8000000080000000;
                      auVar80._12_4_ = 0x80000000;
                      auVar199 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_1a8._0_8_ + 4)),
                                                 auVar80);
                      fVar391 = auVar199._0_4_ / fVar3;
                      fVar384 = 0.0;
                      if ((fVar391 <= fVar367) &&
                         (fVar384 = fVar367, fVar367 <= fVar391 + 1.0 / fVar3)) {
                        auVar198 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar198,
                                                   ZEXT416((uint)*(float *)(local_1a8._0_8_ + 4)));
                        fVar384 = auVar198._0_4_ * fVar367;
                      }
                    }
                  }
                  *local_2b8 = fVar384;
                  local_2b8 = local_2b8 + 1;
                  uVar173 = uVar173 + 1;
                  iVar192 = iVar192 + 1;
                } while (uVar173 != iVar8);
              }
              iVar170 = iVar170 + 1;
            } while (iVar170 != iVar9);
          }
          local_2e8 = local_2e8 + 1;
        } while (local_2e8 != local_1e0);
      }
      iVar8 = local_228.w;
      if ((uVar177 == 0 && local_158._0_4_ == 1) &&
         (local_1c0 = (long)(this->super_Deconvolution).num_output, 0 < local_1c0)) {
        local_168 = local_228.data;
        local_d0 = local_228.cstep * local_228.elemsize;
        iVar9 = bottom_blob->h;
        uVar179 = bottom_blob->c;
        uVar168 = (ulong)(uint)local_228.w;
        local_1c8 = (void *)CONCAT44(local_1c8._4_4_,local_228.h);
        lVar186 = (long)(int)local_1d0;
        local_1d0 = (long)local_228.w;
        auVar303 = vpbroadcastd_avx512f(ZEXT416((uint)bottom_blob->w));
        auVar352._56_8_ = 0;
        auVar352._0_56_ = local_1a8._8_56_;
        local_1a8 = auVar352 << 0x40;
        auVar304 = ZEXT1264(ZEXT812(0));
        auVar357 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar356 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar355 = vpmovsxbd_avx512f(_DAT_005aa784);
        auVar354 = vpternlogd_avx512f(in_ZMM16,in_ZMM16,in_ZMM16,0xff);
        auVar353 = vpbroadcastq_avx512f(ZEXT816(0x10));
        auVar352 = vpbroadcastd_avx512f(ZEXT416(0x10));
        local_158 = vmovdqu64_avx512f(auVar303);
        do {
          if (0 < (int)local_1c8) {
            local_260 = (void *)(local_d0 * local_1a8._0_8_ + (long)local_168);
            iVar182 = (this->super_Deconvolution).bias_term;
            iVar166 = (this->super_Deconvolution).activation_type;
            lVar161 = (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize *
                      local_1a8._0_8_;
            pvVar16 = (this->weight_data_tm).data;
            local_1e0 = local_1e0 & 0xffffffff00000000;
            do {
              if (0 < iVar8) {
                pvVar176 = (this->super_Deconvolution).bias_data.data;
                iVar156 = bottom_blob->w;
                pvVar11 = bottom_blob->data;
                sVar17 = bottom_blob->elemsize;
                sVar13 = bottom_blob->cstep;
                uVar177 = (this->super_Deconvolution).kernel_h;
                iVar171 = (uint)local_1e0 - local_1ac;
                pfVar193 = (float *)(this->super_Deconvolution).activation_params.data;
                uVar169 = 0;
                do {
                  if (iVar182 == 0) {
                    auVar305 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar305 = ZEXT464(*(uint *)((long)pvVar176 + local_1a8._0_8_ * 4));
                  }
                  auVar198 = auVar305._0_16_;
                  if (0 < (int)uVar179) {
                    uVar167 = (this->super_Deconvolution).kernel_w;
                    iVar191 = (this->super_Deconvolution).stride_h;
                    uVar165 = (this->super_Deconvolution).stride_w;
                    auVar306 = vpbroadcastq_avx512f();
                    auVar307 = vpbroadcastd_avx512f
                                         (ZEXT416((uint)(this->super_Deconvolution).dilation_w));
                    auVar308 = vpbroadcastd_avx512f();
                    uVar174 = 0;
                    pvVar185 = (void *)(lVar161 + (long)pvVar16);
                    do {
                      if (0 < (int)uVar177) {
                        uVar178 = 0;
                        pvVar184 = pvVar185;
                        do {
                          iVar180 = (this->super_Deconvolution).dilation_h * (int)uVar178 + iVar171;
                          if ((((-1 < iVar180) &&
                               (iVar190 = iVar180 / iVar191, iVar180 % iVar191 == 0)) &&
                              (iVar190 < iVar9)) && (0 < (int)uVar167)) {
                            auVar424 = ZEXT1664(CONCAT124(auVar304._4_12_,auVar305._0_4_));
                            uVar183 = 0;
                            auVar305 = vmovdqa64_avx512f(auVar356);
                            auVar309 = vmovdqa64_avx512f(auVar357);
                            auVar310 = vmovdqa64_avx512f(auVar355);
                            do {
                              uVar37 = vpcmpuq_avx512f(auVar305,auVar306,2);
                              uVar38 = vpcmpuq_avx512f(auVar309,auVar306,2);
                              bVar27 = (byte)uVar38;
                              uVar195 = CONCAT11(bVar27,(byte)uVar37);
                              auVar311 = vpmulld_avx512f(auVar307,auVar310);
                              auVar311 = vpaddd_avx512f(auVar308,auVar311);
                              uVar196 = vpcmpgtd_avx512f(auVar311,auVar354);
                              uVar196 = uVar195 & uVar196;
                              if ((uVar196 & 1) != 0) {
                                in_ZMM8 = ZEXT464((uint)(auVar311._0_4_ % (int)uVar165));
                              }
                              if ((uVar196 & 2) != 0) {
                                auVar198 = vpinsrd_avx(in_ZMM8._0_16_,auVar311._4_4_ % (int)uVar165,
                                                       1);
                                in_ZMM8 = vinserti32x4_avx512f(in_ZMM8,auVar198,0);
                              }
                              if ((uVar196 & 4) != 0) {
                                auVar198 = vpinsrd_avx(in_ZMM8._0_16_,auVar311._8_4_ % (int)uVar165,
                                                       2);
                                in_ZMM8 = vinserti32x4_avx512f(in_ZMM8,auVar198,0);
                              }
                              if ((uVar196 & 8) != 0) {
                                auVar198 = vpinsrd_avx(in_ZMM8._0_16_,auVar311._12_4_ % (int)uVar165
                                                       ,3);
                                in_ZMM8 = vinserti32x4_avx512f(in_ZMM8,auVar198,0);
                              }
                              auVar327 = in_ZMM8;
                              if ((uVar196 & 0x10) != 0) {
                                auVar312 = vpbroadcastd_avx512f();
                                auVar327._0_16_ = in_ZMM8._0_16_;
                                auVar327._16_4_ = auVar312._16_4_;
                                auVar327._20_4_ = in_ZMM8._20_4_;
                                auVar327._24_4_ = in_ZMM8._24_4_;
                                auVar327._28_4_ = in_ZMM8._28_4_;
                                auVar327._32_4_ = in_ZMM8._32_4_;
                                auVar327._36_4_ = in_ZMM8._36_4_;
                                auVar327._40_4_ = in_ZMM8._40_4_;
                                auVar327._44_4_ = in_ZMM8._44_4_;
                                auVar327._48_4_ = in_ZMM8._48_4_;
                                auVar327._52_4_ = in_ZMM8._52_4_;
                                auVar327._56_4_ = in_ZMM8._56_4_;
                                auVar327._60_4_ = in_ZMM8._60_4_;
                              }
                              auVar328 = auVar327;
                              if ((uVar196 & 0x20) != 0) {
                                auVar312 = vpbroadcastd_avx512f();
                                auVar328._0_20_ = auVar327._0_20_;
                                auVar328._20_4_ = auVar312._20_4_;
                                auVar328._24_4_ = auVar327._24_4_;
                                auVar328._28_4_ = auVar327._28_4_;
                                auVar328._32_4_ = auVar327._32_4_;
                                auVar328._36_4_ = auVar327._36_4_;
                                auVar328._40_4_ = auVar327._40_4_;
                                auVar328._44_4_ = auVar327._44_4_;
                                auVar328._48_4_ = auVar327._48_4_;
                                auVar328._52_4_ = auVar327._52_4_;
                                auVar328._56_4_ = auVar327._56_4_;
                                auVar328._60_4_ = auVar327._60_4_;
                              }
                              auVar329 = auVar328;
                              if ((uVar196 & 0x40) != 0) {
                                auVar312 = vpbroadcastd_avx512f();
                                auVar329._0_24_ = auVar328._0_24_;
                                auVar329._24_4_ = auVar312._24_4_;
                                auVar329._28_4_ = auVar328._28_4_;
                                auVar329._32_4_ = auVar328._32_4_;
                                auVar329._36_4_ = auVar328._36_4_;
                                auVar329._40_4_ = auVar328._40_4_;
                                auVar329._44_4_ = auVar328._44_4_;
                                auVar329._48_4_ = auVar328._48_4_;
                                auVar329._52_4_ = auVar328._52_4_;
                                auVar329._56_4_ = auVar328._56_4_;
                                auVar329._60_4_ = auVar328._60_4_;
                              }
                              auVar330 = auVar329;
                              if ((uVar196 & 0x80) != 0) {
                                auVar312 = vpbroadcastd_avx512f();
                                auVar330._0_28_ = auVar329._0_28_;
                                auVar330._28_4_ = auVar312._28_4_;
                                auVar330._32_4_ = auVar329._32_4_;
                                auVar330._36_4_ = auVar329._36_4_;
                                auVar330._40_4_ = auVar329._40_4_;
                                auVar330._44_4_ = auVar329._44_4_;
                                auVar330._48_4_ = auVar329._48_4_;
                                auVar330._52_4_ = auVar329._52_4_;
                                auVar330._56_4_ = auVar329._56_4_;
                                auVar330._60_4_ = auVar329._60_4_;
                              }
                              auVar331 = auVar330;
                              if ((uVar196 & 0x100) != 0) {
                                vextracti32x4_avx512f(auVar311,2);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar331._0_32_ = auVar330._0_32_;
                                auVar331._32_4_ = auVar312._32_4_;
                                auVar331._36_4_ = auVar330._36_4_;
                                auVar331._40_4_ = auVar330._40_4_;
                                auVar331._44_4_ = auVar330._44_4_;
                                auVar331._48_4_ = auVar330._48_4_;
                                auVar331._52_4_ = auVar330._52_4_;
                                auVar331._56_4_ = auVar330._56_4_;
                                auVar331._60_4_ = auVar330._60_4_;
                              }
                              auVar332 = auVar331;
                              if ((uVar196 & 0x200) != 0) {
                                vextracti32x4_avx512f(auVar311,2);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar332._0_36_ = auVar331._0_36_;
                                auVar332._36_4_ = auVar312._36_4_;
                                auVar332._40_4_ = auVar331._40_4_;
                                auVar332._44_4_ = auVar331._44_4_;
                                auVar332._48_4_ = auVar331._48_4_;
                                auVar332._52_4_ = auVar331._52_4_;
                                auVar332._56_4_ = auVar331._56_4_;
                                auVar332._60_4_ = auVar331._60_4_;
                              }
                              auVar333 = auVar332;
                              if ((uVar196 & 0x400) != 0) {
                                vextracti32x4_avx512f(auVar311,2);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar333._0_40_ = auVar332._0_40_;
                                auVar333._40_4_ = auVar312._40_4_;
                                auVar333._44_4_ = auVar332._44_4_;
                                auVar333._48_4_ = auVar332._48_4_;
                                auVar333._52_4_ = auVar332._52_4_;
                                auVar333._56_4_ = auVar332._56_4_;
                                auVar333._60_4_ = auVar332._60_4_;
                              }
                              auVar334 = auVar333;
                              if ((uVar196 & 0x800) != 0) {
                                vextracti32x4_avx512f(auVar311,2);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar334._0_44_ = auVar333._0_44_;
                                auVar334._44_4_ = auVar312._44_4_;
                                auVar334._48_4_ = auVar333._48_4_;
                                auVar334._52_4_ = auVar333._52_4_;
                                auVar334._56_4_ = auVar333._56_4_;
                                auVar334._60_4_ = auVar333._60_4_;
                              }
                              auVar335 = auVar334;
                              if ((uVar196 & 0x1000) != 0) {
                                vextracti32x4_avx512f(auVar311,3);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar335._0_48_ = auVar334._0_48_;
                                auVar335._48_4_ = auVar312._48_4_;
                                auVar335._52_4_ = auVar334._52_4_;
                                auVar335._56_4_ = auVar334._56_4_;
                                auVar335._60_4_ = auVar334._60_4_;
                              }
                              auVar336 = auVar335;
                              if ((uVar196 & 0x2000) != 0) {
                                vextracti32x4_avx512f(auVar311,3);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar336._0_52_ = auVar335._0_52_;
                                auVar336._52_4_ = auVar312._52_4_;
                                auVar336._56_4_ = auVar335._56_4_;
                                auVar336._60_4_ = auVar335._60_4_;
                              }
                              auVar337 = auVar336;
                              if ((uVar196 & 0x4000) != 0) {
                                vextracti32x4_avx512f(auVar311,3);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar337._0_56_ = auVar336._0_56_;
                                auVar337._56_4_ = auVar312._56_4_;
                                auVar337._60_4_ = auVar336._60_4_;
                              }
                              auVar446 = auVar337;
                              if ((uVar196 & 0x8000) != 0) {
                                vextracti32x4_avx512f(auVar311,3);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar446._60_4_ = auVar312._60_4_;
                                auVar446._0_60_ = auVar337._0_60_;
                              }
                              uVar197 = vptestnmd_avx512f(auVar446,auVar446);
                              uVar196 = uVar196 & uVar197;
                              if ((uVar196 & 1) != 0) {
                                auVar446 = ZEXT464((uint)(auVar311._0_4_ / (int)uVar165));
                              }
                              if ((uVar196 & 2) != 0) {
                                auVar198 = vpinsrd_avx(auVar446._0_16_,auVar311._4_4_ / (int)uVar165
                                                       ,1);
                                auVar446 = vinserti32x4_avx512f(auVar446,auVar198,0);
                              }
                              if ((uVar196 & 4) != 0) {
                                auVar198 = vpinsrd_avx(auVar446._0_16_,auVar311._8_4_ / (int)uVar165
                                                       ,2);
                                auVar446 = vinserti32x4_avx512f(auVar446,auVar198,0);
                              }
                              if ((uVar196 & 8) != 0) {
                                auVar198 = vpinsrd_avx(auVar446._0_16_,
                                                       auVar311._12_4_ / (int)uVar165,3);
                                auVar446 = vinserti32x4_avx512f(auVar446,auVar198,0);
                              }
                              auVar338 = auVar446;
                              if ((uVar196 & 0x10) != 0) {
                                auVar312 = vpbroadcastd_avx512f();
                                auVar338._0_16_ = auVar446._0_16_;
                                auVar338._16_4_ = auVar312._16_4_;
                                auVar338._20_4_ = auVar446._20_4_;
                                auVar338._24_4_ = auVar446._24_4_;
                                auVar338._28_4_ = auVar446._28_4_;
                                auVar338._32_4_ = auVar446._32_4_;
                                auVar338._36_4_ = auVar446._36_4_;
                                auVar338._40_4_ = auVar446._40_4_;
                                auVar338._44_4_ = auVar446._44_4_;
                                auVar338._48_4_ = auVar446._48_4_;
                                auVar338._52_4_ = auVar446._52_4_;
                                auVar338._56_4_ = auVar446._56_4_;
                                auVar338._60_4_ = auVar446._60_4_;
                              }
                              auVar339 = auVar338;
                              if ((uVar196 & 0x20) != 0) {
                                auVar312 = vpbroadcastd_avx512f();
                                auVar339._0_20_ = auVar338._0_20_;
                                auVar339._20_4_ = auVar312._20_4_;
                                auVar339._24_4_ = auVar338._24_4_;
                                auVar339._28_4_ = auVar338._28_4_;
                                auVar339._32_4_ = auVar338._32_4_;
                                auVar339._36_4_ = auVar338._36_4_;
                                auVar339._40_4_ = auVar338._40_4_;
                                auVar339._44_4_ = auVar338._44_4_;
                                auVar339._48_4_ = auVar338._48_4_;
                                auVar339._52_4_ = auVar338._52_4_;
                                auVar339._56_4_ = auVar338._56_4_;
                                auVar339._60_4_ = auVar338._60_4_;
                              }
                              auVar340 = auVar339;
                              if ((uVar196 & 0x40) != 0) {
                                auVar312 = vpbroadcastd_avx512f();
                                auVar340._0_24_ = auVar339._0_24_;
                                auVar340._24_4_ = auVar312._24_4_;
                                auVar340._28_4_ = auVar339._28_4_;
                                auVar340._32_4_ = auVar339._32_4_;
                                auVar340._36_4_ = auVar339._36_4_;
                                auVar340._40_4_ = auVar339._40_4_;
                                auVar340._44_4_ = auVar339._44_4_;
                                auVar340._48_4_ = auVar339._48_4_;
                                auVar340._52_4_ = auVar339._52_4_;
                                auVar340._56_4_ = auVar339._56_4_;
                                auVar340._60_4_ = auVar339._60_4_;
                              }
                              auVar341 = auVar340;
                              if ((uVar196 & 0x80) != 0) {
                                auVar312 = vpbroadcastd_avx512f();
                                auVar341._0_28_ = auVar340._0_28_;
                                auVar341._28_4_ = auVar312._28_4_;
                                auVar341._32_4_ = auVar340._32_4_;
                                auVar341._36_4_ = auVar340._36_4_;
                                auVar341._40_4_ = auVar340._40_4_;
                                auVar341._44_4_ = auVar340._44_4_;
                                auVar341._48_4_ = auVar340._48_4_;
                                auVar341._52_4_ = auVar340._52_4_;
                                auVar341._56_4_ = auVar340._56_4_;
                                auVar341._60_4_ = auVar340._60_4_;
                              }
                              auVar342 = auVar341;
                              if ((uVar196 & 0x100) != 0) {
                                vextracti32x4_avx512f(auVar311,2);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar342._0_32_ = auVar341._0_32_;
                                auVar342._32_4_ = auVar312._32_4_;
                                auVar342._36_4_ = auVar341._36_4_;
                                auVar342._40_4_ = auVar341._40_4_;
                                auVar342._44_4_ = auVar341._44_4_;
                                auVar342._48_4_ = auVar341._48_4_;
                                auVar342._52_4_ = auVar341._52_4_;
                                auVar342._56_4_ = auVar341._56_4_;
                                auVar342._60_4_ = auVar341._60_4_;
                              }
                              auVar343 = auVar342;
                              if ((uVar196 & 0x200) != 0) {
                                vextracti32x4_avx512f(auVar311,2);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar343._0_36_ = auVar342._0_36_;
                                auVar343._36_4_ = auVar312._36_4_;
                                auVar343._40_4_ = auVar342._40_4_;
                                auVar343._44_4_ = auVar342._44_4_;
                                auVar343._48_4_ = auVar342._48_4_;
                                auVar343._52_4_ = auVar342._52_4_;
                                auVar343._56_4_ = auVar342._56_4_;
                                auVar343._60_4_ = auVar342._60_4_;
                              }
                              auVar344 = auVar343;
                              if ((uVar196 & 0x400) != 0) {
                                vextracti32x4_avx512f(auVar311,2);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar344._0_40_ = auVar343._0_40_;
                                auVar344._40_4_ = auVar312._40_4_;
                                auVar344._44_4_ = auVar343._44_4_;
                                auVar344._48_4_ = auVar343._48_4_;
                                auVar344._52_4_ = auVar343._52_4_;
                                auVar344._56_4_ = auVar343._56_4_;
                                auVar344._60_4_ = auVar343._60_4_;
                              }
                              auVar345 = auVar344;
                              if ((uVar196 & 0x800) != 0) {
                                vextracti32x4_avx512f(auVar311,2);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar345._0_44_ = auVar344._0_44_;
                                auVar345._44_4_ = auVar312._44_4_;
                                auVar345._48_4_ = auVar344._48_4_;
                                auVar345._52_4_ = auVar344._52_4_;
                                auVar345._56_4_ = auVar344._56_4_;
                                auVar345._60_4_ = auVar344._60_4_;
                              }
                              auVar346 = auVar345;
                              if ((uVar196 & 0x1000) != 0) {
                                vextracti32x4_avx512f(auVar311,3);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar346._0_48_ = auVar345._0_48_;
                                auVar346._48_4_ = auVar312._48_4_;
                                auVar346._52_4_ = auVar345._52_4_;
                                auVar346._56_4_ = auVar345._56_4_;
                                auVar346._60_4_ = auVar345._60_4_;
                              }
                              auVar347 = auVar346;
                              if ((uVar196 & 0x2000) != 0) {
                                vextracti32x4_avx512f(auVar311,3);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar347._0_52_ = auVar346._0_52_;
                                auVar347._52_4_ = auVar312._52_4_;
                                auVar347._56_4_ = auVar346._56_4_;
                                auVar347._60_4_ = auVar346._60_4_;
                              }
                              auVar348 = auVar347;
                              if ((uVar196 & 0x4000) != 0) {
                                vextracti32x4_avx512f(auVar311,3);
                                auVar312 = vpbroadcastd_avx512f();
                                auVar348._0_56_ = auVar347._0_56_;
                                auVar348._56_4_ = auVar312._56_4_;
                                auVar348._60_4_ = auVar347._60_4_;
                              }
                              in_ZMM8 = auVar348;
                              if ((uVar196 & 0x8000) != 0) {
                                vextracti32x4_avx512f(auVar311,3);
                                auVar311 = vpbroadcastd_avx512f();
                                in_ZMM8._60_4_ = auVar311._60_4_;
                                in_ZMM8._0_60_ = auVar348._0_60_;
                              }
                              uVar197 = vpcmpgtd_avx512f(auVar303,in_ZMM8);
                              uVar197 = uVar196 & uVar197;
                              auVar311 = vgatherdps_avx512f(*(undefined4 *)
                                                             ((long)pvVar11 +
                                                             (ulong)uVar165 * 4 +
                                                             (long)iVar190 * (long)iVar156 * sVar17
                                                             + sVar13 * sVar17 * uVar174));
                              bVar19 = (byte)uVar197;
                              auVar349._4_4_ = (uint)((byte)(uVar197 >> 1) & 1) * auVar311._4_4_;
                              auVar349._0_4_ = (uint)(bVar19 & 1) * auVar311._0_4_;
                              auVar349._8_4_ = (uint)((byte)(uVar197 >> 2) & 1) * auVar311._8_4_;
                              auVar349._12_4_ = (uint)((byte)(uVar197 >> 3) & 1) * auVar311._12_4_;
                              auVar349._16_4_ = (uint)((byte)(uVar197 >> 4) & 1) * auVar311._16_4_;
                              auVar349._20_4_ = (uint)((byte)(uVar197 >> 5) & 1) * auVar311._20_4_;
                              auVar349._24_4_ = (uint)((byte)(uVar197 >> 6) & 1) * auVar311._24_4_;
                              auVar349._28_4_ = (uint)((byte)(uVar197 >> 7) & 1) * auVar311._28_4_;
                              bVar28 = (byte)(uVar197 >> 8);
                              auVar349._32_4_ = (uint)(bVar28 & 1) * auVar311._32_4_;
                              auVar349._36_4_ = (uint)((byte)(uVar197 >> 9) & 1) * auVar311._36_4_;
                              auVar349._40_4_ = (uint)((byte)(uVar197 >> 10) & 1) * auVar311._40_4_;
                              auVar349._44_4_ = (uint)((byte)(uVar197 >> 0xb) & 1) * auVar311._44_4_
                              ;
                              auVar349._48_4_ = (uint)((byte)(uVar197 >> 0xc) & 1) * auVar311._48_4_
                              ;
                              auVar349._52_4_ = (uint)((byte)(uVar197 >> 0xd) & 1) * auVar311._52_4_
                              ;
                              auVar349._56_4_ = (uint)((byte)(uVar197 >> 0xe) & 1) * auVar311._56_4_
                              ;
                              auVar349._60_4_ = (uint)(byte)(uVar197 >> 0xf) * auVar311._60_4_;
                              piVar10 = (int *)((long)pvVar184 + uVar183 * 4);
                              auVar350._4_4_ = (uint)((byte)(uVar197 >> 1) & 1) * piVar10[1];
                              auVar350._0_4_ = (uint)(bVar19 & 1) * *piVar10;
                              auVar350._8_4_ = (uint)((byte)(uVar197 >> 2) & 1) * piVar10[2];
                              auVar350._12_4_ = (uint)((byte)(uVar197 >> 3) & 1) * piVar10[3];
                              auVar350._16_4_ = (uint)((byte)(uVar197 >> 4) & 1) * piVar10[4];
                              auVar350._20_4_ = (uint)((byte)(uVar197 >> 5) & 1) * piVar10[5];
                              auVar350._24_4_ = (uint)((byte)(uVar197 >> 6) & 1) * piVar10[6];
                              auVar350._28_4_ = (uint)((byte)(uVar197 >> 7) & 1) * piVar10[7];
                              auVar350._32_4_ = (uint)(bVar28 & 1) * piVar10[8];
                              auVar350._36_4_ = (uint)((byte)(uVar197 >> 9) & 1) * piVar10[9];
                              auVar350._40_4_ = (uint)((byte)(uVar197 >> 10) & 1) * piVar10[10];
                              auVar350._44_4_ = (uint)((byte)(uVar197 >> 0xb) & 1) * piVar10[0xb];
                              auVar350._48_4_ = (uint)((byte)(uVar197 >> 0xc) & 1) * piVar10[0xc];
                              auVar350._52_4_ = (uint)((byte)(uVar197 >> 0xd) & 1) * piVar10[0xd];
                              auVar350._56_4_ = (uint)((byte)(uVar197 >> 0xe) & 1) * piVar10[0xe];
                              auVar350._60_4_ = (uint)(byte)(uVar197 >> 0xf) * piVar10[0xf];
                              uVar36 = vpcmpd_avx512f(in_ZMM8,auVar303,5);
                              uVar196 = uVar196 & uVar36;
                              auVar311 = vfmadd231ps_avx512f(auVar424,auVar350,auVar349);
                              iVar180 = auVar424._0_4_;
                              bVar20 = (bool)((byte)(uVar197 >> 1) & 1);
                              iVar170 = auVar424._4_4_;
                              bVar21 = (bool)((byte)(uVar197 >> 2) & 1);
                              iVar192 = auVar424._8_4_;
                              bVar22 = (bool)((byte)(uVar197 >> 3) & 1);
                              iVar157 = auVar424._12_4_;
                              bVar23 = (bool)((byte)(uVar197 >> 4) & 1);
                              iVar158 = auVar424._16_4_;
                              bVar24 = (bool)((byte)(uVar197 >> 5) & 1);
                              iVar159 = auVar424._20_4_;
                              bVar25 = (bool)((byte)(uVar197 >> 6) & 1);
                              iVar160 = auVar424._24_4_;
                              bVar26 = (bool)((byte)(uVar197 >> 7) & 1);
                              iVar358 = auVar424._28_4_;
                              iVar359 = auVar424._32_4_;
                              bVar29 = (bool)((byte)(uVar197 >> 9) & 1);
                              iVar360 = auVar424._36_4_;
                              bVar30 = (bool)((byte)(uVar197 >> 10) & 1);
                              iVar361 = auVar424._40_4_;
                              bVar31 = (bool)((byte)(uVar197 >> 0xb) & 1);
                              iVar362 = auVar424._44_4_;
                              bVar32 = (bool)((byte)(uVar197 >> 0xc) & 1);
                              iVar363 = auVar424._48_4_;
                              bVar33 = (bool)((byte)(uVar197 >> 0xd) & 1);
                              iVar364 = auVar424._52_4_;
                              bVar34 = (bool)((byte)(uVar197 >> 0xe) & 1);
                              iVar365 = auVar424._56_4_;
                              bVar35 = SUB81(uVar197 >> 0xf,0);
                              iVar366 = auVar424._60_4_;
                              bVar194 = (bool)((byte)uVar196 & 1);
                              auVar424._0_4_ =
                                   (uint)bVar194 * iVar180 |
                                   (uint)!bVar194 *
                                   ((uint)(bVar19 & 1) * auVar311._0_4_ |
                                   (uint)!(bool)(bVar19 & 1) * iVar180);
                              bVar194 = (bool)((byte)(uVar196 >> 1) & 1);
                              auVar424._4_4_ =
                                   (uint)bVar194 * iVar170 |
                                   (uint)!bVar194 *
                                   ((uint)bVar20 * auVar311._4_4_ | (uint)!bVar20 * iVar170);
                              bVar194 = (bool)((byte)(uVar196 >> 2) & 1);
                              auVar424._8_4_ =
                                   (uint)bVar194 * iVar192 |
                                   (uint)!bVar194 *
                                   ((uint)bVar21 * auVar311._8_4_ | (uint)!bVar21 * iVar192);
                              bVar194 = (bool)((byte)(uVar196 >> 3) & 1);
                              auVar424._12_4_ =
                                   (uint)bVar194 * iVar157 |
                                   (uint)!bVar194 *
                                   ((uint)bVar22 * auVar311._12_4_ | (uint)!bVar22 * iVar157);
                              bVar194 = (bool)((byte)(uVar196 >> 4) & 1);
                              auVar424._16_4_ =
                                   (uint)bVar194 * iVar158 |
                                   (uint)!bVar194 *
                                   ((uint)bVar23 * auVar311._16_4_ | (uint)!bVar23 * iVar158);
                              bVar194 = (bool)((byte)(uVar196 >> 5) & 1);
                              auVar424._20_4_ =
                                   (uint)bVar194 * iVar159 |
                                   (uint)!bVar194 *
                                   ((uint)bVar24 * auVar311._20_4_ | (uint)!bVar24 * iVar159);
                              bVar194 = (bool)((byte)(uVar196 >> 6) & 1);
                              auVar424._24_4_ =
                                   (uint)bVar194 * iVar160 |
                                   (uint)!bVar194 *
                                   ((uint)bVar25 * auVar311._24_4_ | (uint)!bVar25 * iVar160);
                              bVar194 = (bool)((byte)(uVar196 >> 7) & 1);
                              auVar424._28_4_ =
                                   (uint)bVar194 * iVar358 |
                                   (uint)!bVar194 *
                                   ((uint)bVar26 * auVar311._28_4_ | (uint)!bVar26 * iVar358);
                              bVar194 = (bool)((byte)(uVar196 >> 8) & 1);
                              auVar424._32_4_ =
                                   (uint)bVar194 * iVar359 |
                                   (uint)!bVar194 *
                                   ((uint)(bVar28 & 1) * auVar311._32_4_ |
                                   (uint)!(bool)(bVar28 & 1) * iVar359);
                              bVar194 = (bool)((byte)(uVar196 >> 9) & 1);
                              auVar424._36_4_ =
                                   (uint)bVar194 * iVar360 |
                                   (uint)!bVar194 *
                                   ((uint)bVar29 * auVar311._36_4_ | (uint)!bVar29 * iVar360);
                              bVar194 = (bool)((byte)(uVar196 >> 10) & 1);
                              auVar424._40_4_ =
                                   (uint)bVar194 * iVar361 |
                                   (uint)!bVar194 *
                                   ((uint)bVar30 * auVar311._40_4_ | (uint)!bVar30 * iVar361);
                              bVar194 = (bool)((byte)(uVar196 >> 0xb) & 1);
                              auVar424._44_4_ =
                                   (uint)bVar194 * iVar362 |
                                   (uint)!bVar194 *
                                   ((uint)bVar31 * auVar311._44_4_ | (uint)!bVar31 * iVar362);
                              bVar194 = (bool)((byte)(uVar196 >> 0xc) & 1);
                              auVar424._48_4_ =
                                   (uint)bVar194 * iVar363 |
                                   (uint)!bVar194 *
                                   ((uint)bVar32 * auVar311._48_4_ | (uint)!bVar32 * iVar363);
                              bVar194 = (bool)((byte)(uVar196 >> 0xd) & 1);
                              auVar424._52_4_ =
                                   (uint)bVar194 * iVar364 |
                                   (uint)!bVar194 *
                                   ((uint)bVar33 * auVar311._52_4_ | (uint)!bVar33 * iVar364);
                              bVar194 = (bool)((byte)(uVar196 >> 0xe) & 1);
                              auVar424._56_4_ =
                                   (uint)bVar194 * iVar365 |
                                   (uint)!bVar194 *
                                   ((uint)bVar34 * auVar311._56_4_ | (uint)!bVar34 * iVar365);
                              bVar194 = SUB81(uVar196 >> 0xf,0);
                              auVar424._60_4_ =
                                   (uint)bVar194 * iVar366 |
                                   (uint)!bVar194 *
                                   ((uint)bVar35 * auVar311._60_4_ | (uint)!bVar35 * iVar366);
                              uVar183 = uVar183 + 0x10;
                              auVar305 = vpaddq_avx512f(auVar305,auVar353);
                              auVar309 = vpaddq_avx512f(auVar309,auVar353);
                              auVar310 = vpaddd_avx512f(auVar310,auVar352);
                            } while ((uVar167 + 0xf & 0xfffffff0) != uVar183);
                            bVar194 = (bool)((byte)uVar37 & 1);
                            auVar351._0_4_ = bVar194 * auVar424._0_4_ | (uint)!bVar194 * iVar180;
                            bVar194 = (bool)((byte)(uVar195 >> 1) & 1);
                            auVar351._4_4_ = bVar194 * auVar424._4_4_ | (uint)!bVar194 * iVar170;
                            bVar194 = (bool)((byte)(uVar195 >> 2) & 1);
                            auVar351._8_4_ = bVar194 * auVar424._8_4_ | (uint)!bVar194 * iVar192;
                            bVar194 = (bool)((byte)(uVar195 >> 3) & 1);
                            auVar351._12_4_ = bVar194 * auVar424._12_4_ | (uint)!bVar194 * iVar157;
                            bVar194 = (bool)((byte)(uVar195 >> 4) & 1);
                            auVar351._16_4_ = bVar194 * auVar424._16_4_ | (uint)!bVar194 * iVar158;
                            bVar194 = (bool)((byte)(uVar195 >> 5) & 1);
                            auVar351._20_4_ = bVar194 * auVar424._20_4_ | (uint)!bVar194 * iVar159;
                            bVar194 = (bool)((byte)(uVar195 >> 6) & 1);
                            auVar351._24_4_ = bVar194 * auVar424._24_4_ | (uint)!bVar194 * iVar160;
                            bVar194 = (bool)((byte)(uVar195 >> 7) & 1);
                            auVar351._28_4_ = bVar194 * auVar424._28_4_ | (uint)!bVar194 * iVar358;
                            auVar351._32_4_ =
                                 (bVar27 & 1) * auVar424._32_4_ |
                                 (uint)!(bool)(bVar27 & 1) * iVar359;
                            bVar194 = (bool)(bVar27 >> 1 & 1);
                            auVar351._36_4_ = bVar194 * auVar424._36_4_ | (uint)!bVar194 * iVar360;
                            bVar194 = (bool)(bVar27 >> 2 & 1);
                            auVar351._40_4_ = bVar194 * auVar424._40_4_ | (uint)!bVar194 * iVar361;
                            bVar194 = (bool)(bVar27 >> 3 & 1);
                            auVar351._44_4_ = bVar194 * auVar424._44_4_ | (uint)!bVar194 * iVar362;
                            bVar194 = (bool)(bVar27 >> 4 & 1);
                            auVar351._48_4_ = bVar194 * auVar424._48_4_ | (uint)!bVar194 * iVar363;
                            bVar194 = (bool)(bVar27 >> 5 & 1);
                            auVar351._52_4_ = bVar194 * auVar424._52_4_ | (uint)!bVar194 * iVar364;
                            bVar194 = (bool)(bVar27 >> 6 & 1);
                            auVar351._56_4_ = bVar194 * auVar424._56_4_ | (uint)!bVar194 * iVar365;
                            auVar351._60_4_ =
                                 (bVar27 >> 7) * auVar424._60_4_ |
                                 (uint)!(bool)(bVar27 >> 7) * iVar366;
                            auVar251 = vextractf64x4_avx512f(auVar351,1);
                            auVar305 = vaddps_avx512f(auVar351,ZEXT3264(auVar251));
                            auVar395._0_4_ = auVar305._0_4_ + auVar305._16_4_;
                            auVar395._4_4_ = auVar305._4_4_ + auVar305._20_4_;
                            auVar395._8_4_ = auVar305._8_4_ + auVar305._24_4_;
                            auVar395._12_4_ = auVar305._12_4_ + auVar305._28_4_;
                            auVar198 = vshufpd_avx(auVar395,auVar395,1);
                            auVar396._0_4_ = auVar395._0_4_ + auVar198._0_4_;
                            auVar396._4_4_ = auVar395._4_4_ + auVar198._4_4_;
                            auVar396._8_4_ = auVar395._8_4_ + auVar198._8_4_;
                            auVar396._12_4_ = auVar395._12_4_ + auVar198._12_4_;
                            auVar198 = vhaddps_avx(auVar396,auVar396);
                            auVar305 = ZEXT1664(auVar198);
                          }
                          uVar178 = uVar178 + 1;
                          pvVar184 = (void *)((long)pvVar184 + (ulong)uVar167 * 4);
                        } while (uVar178 != uVar177);
                      }
                      auVar198 = auVar305._0_16_;
                      uVar174 = uVar174 + 1;
                      pvVar185 = (void *)((long)pvVar185 + lVar186 * 4);
                    } while (uVar174 != uVar179);
                  }
                  fVar384 = auVar198._0_4_;
                  fVar367 = fVar384;
                  switch(iVar166) {
                  case 1:
                    auVar198 = vmaxss_avx(auVar198,ZEXT416(0));
                    fVar367 = auVar198._0_4_;
                    break;
                  case 2:
                    uVar37 = vcmpss_avx512f(auVar198,ZEXT416(0),0xe);
                    bVar194 = (bool)((byte)uVar37 & 1);
                    fVar367 = (float)((uint)bVar194 * 0x3f800000 + (uint)!bVar194 * (int)*pfVar193)
                              * fVar384;
                    break;
                  case 3:
                    auVar198 = vmaxss_avx(auVar198,ZEXT416((uint)*pfVar193));
                    fVar367 = auVar198._0_4_;
                    if (pfVar193[1] < auVar198._0_4_) {
                      fVar367 = pfVar193[1];
                    }
                    break;
                  case 4:
                    auVar198 = vminss_avx(auVar198,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar83._8_4_ = 0x80000000;
                    auVar83._0_8_ = 0x8000000080000000;
                    auVar83._12_4_ = 0x80000000;
                    auVar199 = vxorps_avx512vl(auVar198,auVar83);
                    uVar37 = vcmpss_avx512f(auVar198,ZEXT416(0xc2b0c0a5),1);
                    bVar194 = (bool)((byte)uVar37 & 1);
                    in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                    fVar367 = expf((float)((uint)bVar194 * 0x42b0c0a5 +
                                          (uint)!bVar194 * auVar199._0_4_));
                    auVar352 = vpbroadcastd_avx512f(ZEXT416(0x10));
                    auVar353 = vpbroadcastq_avx512f(ZEXT816(0x10));
                    auVar354 = vpternlogd_avx512f(auVar354,auVar354,auVar354,0xff);
                    auVar355 = vpmovsxbd_avx512f(_DAT_005aa784);
                    auVar356 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    auVar357 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                    auVar304 = ZEXT1264(ZEXT812(0));
                    auVar303 = vmovdqu64_avx512f(local_158);
                    fVar367 = 1.0 / (fVar367 + 1.0);
                    break;
                  case 5:
                    in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                    fVar367 = expf(fVar384);
                    fVar367 = logf(fVar367 + 1.0);
                    fVar367 = tanhf(fVar367);
                    auVar352 = vpbroadcastd_avx512f(ZEXT416(0x10));
                    auVar353 = vpbroadcastq_avx512f(ZEXT816(0x10));
                    auVar354 = vpternlogd_avx512f(auVar354,auVar354,auVar354,0xff);
                    auVar355 = vpmovsxbd_avx512f(_DAT_005aa784);
                    auVar356 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    auVar357 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                    auVar304 = ZEXT1264(ZEXT812(0));
                    auVar303 = vmovdqu64_avx512f(local_158);
                    fVar367 = fVar367 * fVar384;
                    break;
                  case 6:
                    fVar3 = *pfVar193;
                    auVar82._8_4_ = 0x80000000;
                    auVar82._0_8_ = 0x8000000080000000;
                    auVar82._12_4_ = 0x80000000;
                    auVar199 = vxorps_avx512vl(ZEXT416((uint)pfVar193[1]),auVar82);
                    fVar391 = auVar199._0_4_ / fVar3;
                    fVar367 = 0.0;
                    if ((fVar391 <= fVar384) &&
                       (fVar367 = fVar384, fVar384 <= fVar391 + 1.0 / fVar3)) {
                      auVar198 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar198,
                                                 ZEXT416((uint)pfVar193[1]));
                      fVar367 = auVar198._0_4_ * fVar384;
                    }
                  }
                  *(float *)((long)local_260 + uVar169 * 4) = fVar367;
                  uVar169 = uVar169 + 1;
                } while (uVar169 != uVar168);
              }
              local_260 = (void *)((long)local_260 + local_1d0 * 4);
              iVar156 = (uint)local_1e0 + 1;
              local_1e0 = CONCAT44(local_1e0._4_4_,iVar156);
            } while (iVar156 != (int)local_1c8);
          }
          lVar161 = local_1a8._0_8_ + 1;
          local_1a8._0_8_ = lVar161;
        } while (lVar161 != local_1c0);
      }
    }
  }
LAB_002922db:
  pMVar155 = local_160;
  Deconvolution::cut_padding(&this->super_Deconvolution,&local_228,local_160,local_1b8);
  if ((pMVar155->data == (void *)0x0) || (iVar156 = 0, (long)pMVar155->c * pMVar155->cstep == 0)) {
    iVar156 = -100;
  }
LAB_00292320:
  piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if (local_228.data != (void *)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar156;
}

Assistant:

int Deconvolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}